

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules2.cpp
# Opt level: O2

void opengv::relative_pose::modules::sixpt::setupAction
               (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *L1,vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *L2,Matrix<double,_64,_64,_0,_64,_64> *Action)

{
  pointer pMVar1;
  pointer pMVar2;
  Matrix<double,_64,_64,_0,_64,_64> *dst;
  long lVar3;
  int primI;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int secI;
  int iVar8;
  ulong uVar9;
  int row;
  int row_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  Matrix<double,_15,_84,_0,_15,_84> M1;
  Matrix<double,_93,_157,_0,_93,_157> M2;
  vector<double,_std::allocator<double>_> m [6] [5] [3];
  Matrix<double,_15,_15,_0,_15,_15> BtB;
  Matrix<double,_93,_64,_0,_93,_64> M3;
  Matrix<double,_15,_60,_0,_15,_60> Bt;
  Matrix<double,_60,_15,_0,_60,_15> B;
  Matrix<double,_60,_84,_0,_60,_84> M1p;
  PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> lu;
  undefined8 auStack_4a260 [16];
  undefined8 uStack_4a1e0;
  undefined8 uStack_4a160;
  undefined8 uStack_4a0e0;
  undefined8 uStack_4a060;
  undefined8 uStack_49fe0;
  undefined8 uStack_49f60;
  undefined8 uStack_49ee0;
  undefined8 uStack_49e60;
  undefined8 uStack_49de0;
  undefined8 uStack_49d60;
  undefined8 uStack_49ce0;
  undefined8 uStack_49c60;
  undefined8 uStack_49be0;
  ulong uStack_49b60;
  undefined8 uStack_49b58;
  undefined8 uStack_49b50;
  undefined8 uStack_49b48;
  undefined8 uStack_49b40;
  undefined8 uStack_49b38;
  undefined8 uStack_49b30;
  undefined8 uStack_49b28;
  undefined8 uStack_49b20;
  undefined8 uStack_49b18;
  undefined8 uStack_49b10;
  undefined8 uStack_49b08;
  undefined8 uStack_49b00;
  undefined8 uStack_49af8;
  undefined8 uStack_49af0;
  ulong uStack_49ae8;
  undefined8 uStack_49ae0;
  undefined8 uStack_49ad8;
  undefined8 uStack_49ad0;
  undefined8 uStack_49ac8;
  undefined8 uStack_49ac0;
  undefined8 uStack_49ab8;
  undefined8 uStack_49ab0;
  undefined8 uStack_49aa8;
  undefined8 uStack_49aa0;
  undefined8 uStack_49a98;
  undefined8 uStack_49a90;
  undefined8 uStack_49a88;
  undefined8 uStack_49a80;
  undefined8 uStack_49a78;
  ulong uStack_49a70;
  undefined8 uStack_49a68;
  undefined8 uStack_49a60;
  undefined8 uStack_49a58;
  undefined8 uStack_49a50;
  undefined8 uStack_49a48;
  undefined8 uStack_49a40;
  undefined8 uStack_49a38;
  undefined8 uStack_49a30;
  undefined8 uStack_49a28;
  undefined8 uStack_49a20;
  undefined8 uStack_49a18;
  undefined8 uStack_49a10;
  undefined8 uStack_49a08;
  undefined8 uStack_49a00;
  ulong uStack_499f8;
  undefined8 uStack_499f0;
  undefined8 uStack_499e8;
  undefined8 uStack_499e0;
  undefined8 uStack_499d8;
  undefined8 uStack_499d0;
  undefined8 uStack_499c8;
  undefined8 uStack_499c0;
  undefined8 uStack_499b8;
  undefined8 uStack_499b0;
  undefined8 uStack_499a8;
  undefined8 uStack_499a0;
  undefined8 uStack_49998;
  undefined8 uStack_49990;
  undefined8 uStack_49988;
  ulong uStack_49980;
  undefined8 uStack_49978;
  undefined8 uStack_49970;
  undefined8 uStack_49968;
  undefined8 uStack_49960;
  undefined8 uStack_49958;
  undefined8 uStack_49950;
  undefined8 uStack_49948;
  undefined8 uStack_49940;
  undefined8 uStack_49938;
  undefined8 uStack_49930;
  undefined8 uStack_49928;
  undefined8 uStack_49920;
  undefined8 uStack_49918;
  undefined8 uStack_49910;
  ulong uStack_49908;
  undefined8 uStack_49900;
  undefined8 uStack_498f8;
  undefined8 uStack_498f0;
  undefined8 uStack_498e8;
  undefined8 uStack_498e0;
  undefined8 uStack_498d8;
  undefined8 uStack_498d0;
  undefined8 uStack_498c8;
  undefined8 uStack_498c0;
  undefined8 uStack_498b8;
  undefined8 uStack_498b0;
  undefined8 uStack_498a8;
  undefined8 uStack_498a0;
  undefined8 uStack_49898;
  ulong uStack_49890;
  undefined8 uStack_49888;
  undefined8 uStack_49880;
  undefined8 uStack_49878;
  undefined8 uStack_49870;
  undefined8 uStack_49868;
  undefined8 uStack_49860;
  undefined8 uStack_49858;
  undefined8 uStack_49850;
  undefined8 uStack_49848;
  undefined8 uStack_49840;
  undefined8 uStack_49838;
  undefined8 uStack_49830;
  undefined8 uStack_49828;
  undefined8 uStack_49820;
  ulong uStack_49818;
  undefined8 uStack_49810;
  undefined8 uStack_49808;
  undefined8 uStack_49800;
  undefined8 uStack_497f8;
  undefined8 uStack_497f0;
  undefined8 uStack_497e8;
  undefined8 uStack_497e0;
  undefined8 uStack_497d8;
  undefined8 uStack_497d0;
  undefined8 uStack_497c8;
  undefined8 uStack_497c0;
  undefined8 uStack_497b8;
  undefined8 uStack_497b0;
  undefined8 uStack_497a8;
  ulong uStack_497a0;
  undefined8 uStack_49798;
  undefined8 uStack_49790;
  undefined8 uStack_49788;
  undefined8 uStack_49780;
  undefined8 uStack_49778;
  undefined8 uStack_49770;
  undefined8 uStack_49768;
  undefined8 uStack_49760;
  undefined8 uStack_49758;
  undefined8 uStack_49750;
  undefined8 uStack_49748;
  undefined8 uStack_49740;
  undefined8 uStack_49738;
  undefined8 uStack_49730;
  ulong uStack_49728;
  undefined8 uStack_49720;
  undefined8 uStack_49718;
  undefined8 uStack_49710;
  undefined8 uStack_49708;
  undefined8 uStack_49700;
  undefined8 uStack_496f8;
  undefined8 uStack_496f0;
  undefined8 uStack_496e8;
  undefined8 uStack_496e0;
  undefined8 uStack_496d8;
  undefined8 uStack_496d0;
  undefined8 uStack_496c8;
  undefined8 uStack_496c0;
  undefined8 uStack_496b8;
  ulong uStack_496b0;
  undefined8 uStack_496a8;
  undefined8 uStack_496a0;
  undefined8 uStack_49698;
  undefined8 uStack_49690;
  undefined8 uStack_49688;
  undefined8 uStack_49680;
  undefined8 uStack_49678;
  undefined8 uStack_49670;
  undefined8 uStack_49668;
  undefined8 uStack_49660;
  undefined8 uStack_49658;
  undefined8 uStack_49650;
  undefined8 uStack_49648;
  undefined8 uStack_49640;
  ulong uStack_49638;
  undefined8 uStack_49630;
  undefined8 uStack_49628;
  undefined8 uStack_49620;
  undefined8 uStack_49618;
  undefined8 uStack_49610;
  undefined8 uStack_49608;
  undefined8 uStack_49600;
  undefined8 uStack_495f8;
  undefined8 uStack_495f0;
  undefined8 uStack_495e8;
  undefined8 uStack_495e0;
  undefined8 uStack_495d8;
  undefined8 uStack_495d0;
  undefined8 uStack_495c8;
  ulong uStack_495c0;
  undefined8 uStack_495b8;
  undefined8 uStack_495b0;
  undefined8 uStack_495a8;
  undefined8 uStack_495a0;
  undefined8 uStack_49598;
  undefined8 uStack_49590;
  undefined8 uStack_49588;
  undefined8 uStack_49580;
  undefined8 uStack_49578;
  undefined8 uStack_49570;
  undefined8 uStack_49568;
  undefined8 uStack_49560;
  undefined8 uStack_49558;
  undefined8 uStack_49550;
  ulong uStack_49548;
  undefined8 uStack_49540;
  undefined8 uStack_49538;
  undefined8 uStack_49530;
  undefined8 uStack_49528;
  undefined8 uStack_49520;
  undefined8 uStack_49518;
  undefined8 uStack_49510;
  undefined8 uStack_49508;
  undefined8 uStack_49500;
  undefined8 uStack_494f8;
  undefined8 uStack_494f0;
  undefined8 uStack_494e8;
  undefined8 uStack_494e0;
  undefined8 uStack_494d8;
  ulong uStack_494d0;
  undefined8 uStack_494c8;
  undefined8 uStack_494c0;
  undefined8 uStack_494b8;
  undefined8 uStack_494b0;
  undefined8 uStack_494a8;
  undefined8 uStack_494a0;
  undefined8 uStack_49498;
  undefined8 uStack_49490;
  undefined8 uStack_49488;
  undefined8 uStack_49480;
  undefined8 uStack_49478;
  undefined8 uStack_49470;
  undefined8 uStack_49468;
  undefined8 uStack_49460;
  ulong uStack_49458;
  undefined8 uStack_49450;
  undefined8 uStack_49448;
  undefined8 uStack_49440;
  undefined8 uStack_49438;
  undefined8 uStack_49430;
  undefined8 uStack_49428;
  undefined8 uStack_49420;
  undefined8 uStack_49418;
  undefined8 uStack_49410;
  undefined8 uStack_49408;
  undefined8 uStack_49400;
  undefined8 uStack_493f8;
  undefined8 uStack_493f0;
  undefined8 uStack_493e8;
  ulong uStack_493e0;
  undefined8 uStack_493d8;
  undefined8 uStack_493d0;
  undefined8 uStack_493c8;
  undefined8 uStack_493c0;
  undefined8 uStack_493b8;
  undefined8 uStack_493b0;
  undefined8 uStack_493a8;
  undefined8 uStack_493a0;
  undefined8 uStack_49398;
  undefined8 uStack_49390;
  undefined8 uStack_49388;
  undefined8 uStack_49380;
  undefined8 uStack_49378;
  undefined8 uStack_49370;
  ulong uStack_49368;
  undefined8 uStack_49360;
  undefined8 uStack_49358;
  undefined8 uStack_49350;
  undefined8 uStack_49348;
  undefined8 uStack_49340;
  undefined8 uStack_49338;
  undefined8 uStack_49330;
  undefined8 uStack_49328;
  undefined8 uStack_49320;
  undefined8 uStack_49318;
  undefined8 uStack_49310;
  undefined8 uStack_49308;
  undefined8 uStack_49300;
  undefined8 uStack_492f8;
  ulong uStack_492f0;
  undefined8 uStack_492e8;
  undefined8 uStack_492e0;
  undefined8 uStack_492d8;
  undefined8 uStack_492d0;
  undefined8 uStack_492c8;
  undefined8 uStack_492c0;
  undefined8 uStack_492b8;
  undefined8 uStack_492b0;
  undefined8 uStack_492a8;
  undefined8 uStack_492a0;
  undefined8 uStack_49298;
  undefined8 uStack_49290;
  undefined8 uStack_49288;
  undefined8 uStack_49280;
  ulong uStack_49278;
  undefined8 uStack_49270;
  undefined8 uStack_49268;
  undefined8 uStack_49260;
  undefined8 uStack_49258;
  undefined8 uStack_49250;
  undefined8 uStack_49248;
  undefined8 uStack_49240;
  undefined8 uStack_49238;
  undefined8 uStack_49230;
  undefined8 uStack_49228;
  undefined8 uStack_49220;
  undefined8 uStack_49218;
  undefined8 uStack_49210;
  undefined8 uStack_49208;
  ulong uStack_49200;
  undefined8 uStack_491f8;
  undefined8 uStack_491f0;
  undefined8 uStack_491e8;
  undefined8 uStack_491e0;
  undefined8 uStack_491d8;
  undefined8 uStack_491d0;
  undefined8 uStack_491c8;
  undefined8 uStack_491c0;
  undefined8 uStack_491b8;
  undefined8 uStack_491b0;
  undefined8 uStack_491a8;
  undefined8 uStack_491a0;
  undefined8 uStack_49198;
  undefined8 uStack_49190;
  ulong uStack_49188;
  undefined8 uStack_49180;
  undefined8 uStack_49178;
  undefined8 uStack_49170;
  undefined8 uStack_49168;
  undefined8 uStack_49160;
  undefined8 uStack_49158;
  undefined8 uStack_49150;
  undefined8 uStack_49148;
  undefined8 uStack_49140;
  undefined8 uStack_49138;
  undefined8 uStack_49130;
  undefined8 uStack_49128;
  undefined8 uStack_49120;
  undefined8 uStack_49118;
  ulong uStack_49110;
  undefined8 uStack_49108;
  undefined8 uStack_49100;
  undefined8 uStack_490f8;
  undefined8 uStack_490f0;
  undefined8 uStack_490e8;
  undefined8 uStack_490e0;
  undefined8 uStack_490d8;
  undefined8 uStack_490d0;
  undefined8 uStack_490c8;
  undefined8 uStack_490c0;
  undefined8 uStack_490b8;
  undefined8 uStack_490b0;
  undefined8 uStack_490a8;
  undefined8 uStack_490a0;
  ulong uStack_49098;
  undefined8 uStack_49090;
  undefined8 uStack_49088;
  undefined8 uStack_49080;
  undefined8 uStack_49078;
  undefined8 uStack_49070;
  undefined8 uStack_49068;
  undefined8 uStack_49060;
  undefined8 uStack_49058;
  undefined8 uStack_49050;
  undefined8 uStack_49048;
  undefined8 uStack_49040;
  undefined8 uStack_49038;
  undefined8 uStack_49030;
  undefined8 uStack_49028;
  ulong uStack_49020;
  undefined8 uStack_49018;
  undefined8 uStack_49010;
  undefined8 uStack_49008;
  undefined8 uStack_49000;
  undefined8 uStack_48ff8;
  undefined8 uStack_48ff0;
  undefined8 uStack_48fe8;
  undefined8 uStack_48fe0;
  undefined8 uStack_48fd8;
  undefined8 uStack_48fd0;
  undefined8 uStack_48fc8;
  undefined8 uStack_48fc0;
  undefined8 uStack_48fb8;
  undefined8 uStack_48fb0;
  ulong uStack_48fa8;
  undefined8 uStack_48fa0;
  undefined8 uStack_48f98;
  undefined8 uStack_48f90;
  undefined8 uStack_48f88;
  undefined8 uStack_48f80;
  undefined8 uStack_48f78;
  undefined8 uStack_48f70;
  undefined8 uStack_48f68;
  undefined8 uStack_48f60;
  undefined8 uStack_48f58;
  undefined8 uStack_48f50;
  undefined8 uStack_48f48;
  undefined8 uStack_48f40;
  undefined8 uStack_48f38;
  ulong uStack_48f30;
  undefined8 uStack_48f28;
  undefined8 uStack_48f20;
  undefined8 uStack_48f18;
  undefined8 uStack_48f10;
  undefined8 uStack_48f08;
  undefined8 uStack_48f00;
  undefined8 uStack_48ef8;
  undefined8 uStack_48ef0;
  undefined8 uStack_48ee8;
  undefined8 uStack_48ee0;
  undefined8 uStack_48ed8;
  undefined8 uStack_48ed0;
  undefined8 uStack_48ec8;
  undefined8 uStack_48ec0;
  ulong uStack_48eb8;
  undefined8 uStack_48eb0;
  undefined8 uStack_48ea8;
  undefined8 uStack_48ea0;
  undefined8 uStack_48e98;
  undefined8 uStack_48e90;
  undefined8 uStack_48e88;
  undefined8 uStack_48e80;
  undefined8 uStack_48e78;
  undefined8 uStack_48e70;
  undefined8 uStack_48e68;
  undefined8 uStack_48e60;
  undefined8 uStack_48e58;
  undefined8 uStack_48e50;
  undefined8 uStack_48e48;
  ulong uStack_48e40;
  undefined8 uStack_48e38;
  undefined8 uStack_48e30;
  undefined8 uStack_48e28;
  undefined8 uStack_48e20;
  undefined8 uStack_48e18;
  undefined8 uStack_48e10;
  undefined8 uStack_48e08;
  undefined8 uStack_48e00;
  undefined8 uStack_48df8;
  undefined8 uStack_48df0;
  undefined8 uStack_48de8;
  undefined8 uStack_48de0;
  undefined8 uStack_48dd8;
  undefined8 uStack_48dd0;
  ulong uStack_48dc8;
  undefined8 uStack_48dc0;
  undefined8 uStack_48db8;
  undefined8 uStack_48db0;
  undefined8 uStack_48da8;
  undefined8 uStack_48da0;
  undefined8 uStack_48d98;
  undefined8 uStack_48d90;
  undefined8 uStack_48d88;
  undefined8 uStack_48d80;
  undefined8 uStack_48d78;
  undefined8 uStack_48d70;
  undefined8 uStack_48d68;
  undefined8 uStack_48d60;
  undefined8 uStack_48d58;
  ulong uStack_48d50;
  undefined8 uStack_48d48;
  undefined8 uStack_48d40;
  undefined8 uStack_48d38;
  undefined8 uStack_48d30;
  undefined8 uStack_48d28;
  undefined8 uStack_48d20;
  undefined8 uStack_48d18;
  undefined8 uStack_48d10;
  undefined8 uStack_48d08;
  undefined8 uStack_48d00;
  undefined8 uStack_48cf8;
  undefined8 uStack_48cf0;
  undefined8 uStack_48ce8;
  undefined8 uStack_48ce0;
  ulong uStack_48cd8;
  undefined8 uStack_48cd0;
  undefined8 uStack_48cc8;
  undefined8 uStack_48cc0;
  undefined8 uStack_48cb8;
  undefined8 uStack_48cb0;
  undefined8 uStack_48ca8;
  undefined8 uStack_48ca0;
  undefined8 uStack_48c98;
  undefined8 uStack_48c90;
  undefined8 uStack_48c88;
  undefined8 uStack_48c80;
  undefined8 uStack_48c78;
  undefined8 uStack_48c70;
  undefined8 uStack_48c68;
  ulong uStack_48c60;
  undefined8 uStack_48c58;
  undefined8 uStack_48c50;
  undefined8 uStack_48c48;
  undefined8 uStack_48c40;
  undefined8 uStack_48c38;
  undefined8 uStack_48c30;
  undefined8 uStack_48c28;
  undefined8 uStack_48c20;
  undefined8 uStack_48c18;
  undefined8 uStack_48c10;
  undefined8 uStack_48c08;
  undefined8 uStack_48c00;
  undefined8 uStack_48bf8;
  undefined8 uStack_48bf0;
  ulong uStack_48be8;
  undefined8 uStack_48be0;
  undefined8 uStack_48bd8;
  undefined8 uStack_48bd0;
  undefined8 uStack_48bc8;
  undefined8 uStack_48bc0;
  undefined8 uStack_48bb8;
  undefined8 uStack_48bb0;
  undefined8 uStack_48ba8;
  undefined8 uStack_48ba0;
  undefined8 uStack_48b98;
  undefined8 uStack_48b90;
  undefined8 uStack_48b88;
  undefined8 uStack_48b80;
  undefined8 uStack_48b78;
  ulong uStack_48b70;
  undefined8 uStack_48b68;
  undefined8 uStack_48b60;
  undefined8 uStack_48b58;
  undefined8 uStack_48b50;
  undefined8 uStack_48b48;
  undefined8 uStack_48b40;
  undefined8 uStack_48b38;
  undefined8 uStack_48b30;
  undefined8 uStack_48b28;
  undefined8 uStack_48b20;
  undefined8 uStack_48b18;
  undefined8 uStack_48b10;
  undefined8 uStack_48b08;
  undefined8 uStack_48b00;
  ulong uStack_48af8;
  undefined8 uStack_48af0;
  undefined8 uStack_48ae8;
  undefined8 uStack_48ae0;
  undefined8 uStack_48ad8;
  undefined8 uStack_48ad0;
  undefined8 uStack_48ac8;
  undefined8 uStack_48ac0;
  undefined8 uStack_48ab8;
  undefined8 uStack_48ab0;
  undefined8 uStack_48aa8;
  undefined8 uStack_48aa0;
  undefined8 uStack_48a98;
  undefined8 uStack_48a90;
  undefined8 uStack_48a88;
  ulong uStack_48a80;
  undefined8 uStack_48a78;
  undefined8 uStack_48a70;
  undefined8 uStack_48a68;
  undefined8 uStack_48a60;
  undefined8 uStack_48a58;
  undefined8 uStack_48a50;
  undefined8 uStack_48a48;
  undefined8 uStack_48a40;
  undefined8 uStack_48a38;
  undefined8 uStack_48a30;
  undefined8 uStack_48a28;
  undefined8 uStack_48a20;
  undefined8 uStack_48a18;
  undefined8 uStack_48a10;
  ulong uStack_48a08;
  undefined8 uStack_48a00;
  undefined8 uStack_489f8;
  undefined8 uStack_489f0;
  undefined8 uStack_489e8;
  undefined8 uStack_489e0;
  undefined8 uStack_489d8;
  undefined8 uStack_489d0;
  undefined8 uStack_489c8;
  undefined8 uStack_489c0;
  undefined8 uStack_489b8;
  undefined8 uStack_489b0;
  undefined8 uStack_489a8;
  undefined8 uStack_489a0;
  undefined8 uStack_48998;
  ulong uStack_48990;
  undefined8 uStack_48988;
  undefined8 uStack_48980;
  undefined8 uStack_48978;
  undefined8 uStack_48970;
  undefined8 uStack_48968;
  undefined8 uStack_48960;
  undefined8 uStack_48958;
  undefined8 uStack_48950;
  undefined8 uStack_48948;
  undefined8 uStack_48940;
  undefined8 uStack_48938;
  undefined8 uStack_48930;
  undefined8 uStack_48928;
  undefined8 uStack_48920;
  ulong uStack_48918;
  undefined8 uStack_48910;
  undefined8 uStack_48908;
  undefined8 uStack_48900;
  undefined8 uStack_488f8;
  undefined8 uStack_488f0;
  undefined8 uStack_488e8;
  undefined8 uStack_488e0;
  undefined8 uStack_488d8;
  undefined8 uStack_488d0;
  undefined8 uStack_488c8;
  undefined8 uStack_488c0;
  undefined8 uStack_488b8;
  undefined8 uStack_488b0;
  undefined8 uStack_488a8;
  ulong uStack_488a0;
  undefined8 uStack_48898;
  undefined8 uStack_48890;
  undefined8 uStack_48888;
  undefined8 uStack_48880;
  undefined8 uStack_48878;
  undefined8 uStack_48870;
  undefined8 uStack_48868;
  undefined8 uStack_48860;
  undefined8 uStack_48858;
  undefined8 uStack_48850;
  undefined8 uStack_48848;
  undefined8 uStack_48840;
  undefined8 uStack_48838;
  undefined8 uStack_48830;
  ulong uStack_48828;
  undefined8 uStack_48820;
  undefined8 uStack_48818;
  undefined8 uStack_48810;
  undefined8 uStack_48808;
  undefined8 uStack_48800;
  undefined8 uStack_487f8;
  undefined8 uStack_487f0;
  undefined8 uStack_487e8;
  undefined8 uStack_487e0;
  undefined8 uStack_487d8;
  undefined8 uStack_487d0;
  undefined8 uStack_487c8;
  undefined8 uStack_487c0;
  undefined8 uStack_487b8;
  ulong uStack_487b0;
  undefined8 uStack_487a8;
  undefined8 uStack_487a0;
  undefined8 uStack_48798;
  undefined8 uStack_48790;
  undefined8 uStack_48788;
  undefined8 uStack_48780;
  undefined8 uStack_48778;
  undefined8 uStack_48770;
  undefined8 uStack_48768;
  undefined8 uStack_48760;
  undefined8 uStack_48758;
  undefined8 uStack_48750;
  undefined8 uStack_48748;
  undefined8 uStack_48740;
  ulong uStack_48738;
  undefined8 uStack_48730;
  undefined8 uStack_48728;
  undefined8 uStack_48720;
  undefined8 uStack_48718;
  undefined8 uStack_48710;
  undefined8 uStack_48708;
  undefined8 uStack_48700;
  undefined8 uStack_486f8;
  undefined8 uStack_486f0;
  undefined8 uStack_486e8;
  undefined8 uStack_486e0;
  undefined8 uStack_486d8;
  undefined8 uStack_486d0;
  undefined8 uStack_486c8;
  ulong uStack_486c0;
  undefined8 uStack_486b8;
  undefined8 uStack_486b0;
  undefined8 uStack_486a8;
  undefined8 uStack_486a0;
  undefined8 uStack_48698;
  undefined8 uStack_48690;
  undefined8 uStack_48688;
  undefined8 uStack_48680;
  undefined8 uStack_48678;
  undefined8 uStack_48670;
  undefined8 uStack_48668;
  undefined8 uStack_48660;
  undefined8 uStack_48658;
  undefined8 uStack_48650;
  ulong uStack_48648;
  undefined8 uStack_48640;
  undefined8 uStack_48638;
  undefined8 uStack_48630;
  undefined8 uStack_48628;
  undefined8 uStack_48620;
  undefined8 uStack_48618;
  undefined8 uStack_48610;
  undefined8 uStack_48608;
  undefined8 uStack_48600;
  undefined8 uStack_485f8;
  undefined8 uStack_485f0;
  undefined8 uStack_485e8;
  undefined8 uStack_485e0;
  undefined8 uStack_485d8;
  ulong uStack_485d0;
  undefined8 uStack_485c8;
  undefined8 uStack_485c0;
  undefined8 uStack_485b8;
  undefined8 uStack_485b0;
  undefined8 uStack_485a8;
  undefined8 uStack_485a0;
  undefined8 uStack_48598;
  undefined8 uStack_48590;
  undefined8 uStack_48588;
  undefined8 uStack_48580;
  undefined8 uStack_48578;
  undefined8 uStack_48570;
  undefined8 uStack_48568;
  undefined8 uStack_48560;
  ulong uStack_48558;
  undefined8 uStack_48550;
  undefined8 uStack_48548;
  undefined8 uStack_48540;
  undefined8 uStack_48538;
  undefined8 uStack_48530;
  undefined8 uStack_48528;
  undefined8 uStack_48520;
  undefined8 uStack_48518;
  undefined8 uStack_48510;
  undefined8 uStack_48508;
  undefined8 uStack_48500;
  undefined8 uStack_484f8;
  undefined8 uStack_484f0;
  undefined8 uStack_484e8;
  ulong uStack_484e0;
  undefined8 uStack_484d8;
  undefined8 uStack_484d0;
  undefined8 uStack_484c8;
  undefined8 uStack_484c0;
  undefined8 uStack_484b8;
  undefined8 uStack_484b0;
  undefined8 uStack_484a8;
  undefined8 uStack_484a0;
  undefined8 uStack_48498;
  undefined8 uStack_48490;
  undefined8 uStack_48488;
  undefined8 uStack_48480;
  undefined8 uStack_48478;
  undefined8 uStack_48470;
  ulong uStack_48468;
  undefined8 uStack_48460;
  undefined8 uStack_48458;
  undefined8 uStack_48450;
  undefined8 uStack_48448;
  undefined8 uStack_48440;
  undefined8 uStack_48438;
  undefined8 uStack_48430;
  undefined8 uStack_48428;
  undefined8 uStack_48420;
  undefined8 uStack_48418;
  undefined8 uStack_48410;
  undefined8 uStack_48408;
  undefined8 uStack_48400;
  undefined8 uStack_483f8;
  ulong uStack_483f0;
  undefined8 uStack_483e8;
  undefined8 uStack_483e0;
  undefined8 uStack_483d8;
  undefined8 uStack_483d0;
  undefined8 uStack_483c8;
  undefined8 uStack_483c0;
  undefined8 uStack_483b8;
  undefined8 uStack_483b0;
  undefined8 uStack_483a8;
  undefined8 uStack_483a0;
  undefined8 uStack_48398;
  undefined8 uStack_48390;
  undefined8 uStack_48388;
  undefined8 uStack_48380;
  ulong uStack_48378;
  undefined8 uStack_48370;
  undefined8 uStack_48368;
  undefined8 uStack_48360;
  undefined8 uStack_48358;
  undefined8 uStack_48350;
  undefined8 uStack_48348;
  undefined8 uStack_48340;
  undefined8 uStack_48338;
  undefined8 uStack_48330;
  undefined8 uStack_48328;
  undefined8 uStack_48320;
  undefined8 uStack_48318;
  undefined8 uStack_48310;
  undefined8 uStack_48308;
  ulong uStack_48300;
  undefined8 uStack_482f8;
  undefined8 uStack_482f0;
  undefined8 uStack_482e8;
  undefined8 uStack_482e0;
  undefined8 uStack_482d8;
  undefined8 uStack_482d0;
  undefined8 uStack_482c8;
  undefined8 uStack_482c0;
  undefined8 uStack_482b8;
  undefined8 uStack_482b0;
  undefined8 uStack_482a8;
  undefined8 uStack_482a0;
  undefined8 uStack_48298;
  undefined8 uStack_48290;
  ulong uStack_48288;
  undefined8 uStack_48280;
  undefined8 uStack_48278;
  undefined8 uStack_48270;
  undefined8 uStack_48268;
  undefined8 uStack_48260;
  undefined8 uStack_48258;
  undefined8 uStack_48250;
  undefined8 uStack_48248;
  undefined8 uStack_48240;
  undefined8 uStack_48238;
  undefined8 uStack_48230;
  undefined8 uStack_48228;
  undefined8 uStack_48220;
  undefined8 uStack_48218;
  undefined8 uStack_48210;
  undefined8 uStack_48208;
  undefined8 uStack_48200;
  undefined8 uStack_481f8;
  undefined8 uStack_481f0;
  undefined8 uStack_481e8;
  undefined8 uStack_481e0;
  undefined8 uStack_481d8;
  undefined8 uStack_481d0;
  undefined8 uStack_481c8;
  undefined8 uStack_481c0;
  undefined8 uStack_481b8;
  undefined8 uStack_481b0;
  undefined8 uStack_481a8;
  undefined8 uStack_481a0;
  undefined8 uStack_48198;
  undefined8 uStack_48190;
  undefined8 uStack_48188;
  undefined8 uStack_48180;
  undefined8 uStack_48178;
  undefined8 uStack_48170;
  undefined8 uStack_48168;
  undefined8 uStack_48160;
  undefined8 uStack_48158;
  undefined8 uStack_48150;
  undefined8 uStack_48148;
  undefined8 uStack_48140;
  undefined8 uStack_48138;
  undefined8 uStack_48130;
  undefined8 uStack_48128;
  undefined8 uStack_48120;
  undefined8 uStack_48118;
  undefined8 uStack_48110;
  undefined8 uStack_48108;
  undefined8 uStack_48100;
  undefined8 uStack_480f8;
  undefined8 uStack_480f0;
  undefined8 uStack_480e8;
  undefined8 uStack_480e0;
  undefined8 uStack_480d8;
  undefined8 uStack_480d0;
  undefined8 uStack_480c8;
  undefined8 uStack_480c0;
  undefined8 uStack_480b8;
  undefined8 uStack_480b0;
  undefined8 uStack_480a8;
  undefined8 uStack_480a0;
  undefined8 uStack_48098;
  undefined8 uStack_48090;
  undefined8 uStack_48088;
  undefined8 uStack_48080;
  undefined8 uStack_48078;
  undefined8 uStack_48070;
  undefined8 uStack_48068;
  undefined8 uStack_48060;
  undefined8 uStack_48058;
  undefined8 uStack_48050;
  undefined8 uStack_48048;
  undefined8 uStack_48040;
  undefined8 uStack_48038;
  undefined8 uStack_48030;
  undefined8 uStack_48028;
  undefined8 uStack_48020;
  undefined8 uStack_48018;
  undefined8 uStack_48010;
  undefined8 uStack_48008;
  undefined8 uStack_48000;
  undefined8 uStack_47ff8;
  undefined8 uStack_47ff0;
  undefined8 uStack_47fe8;
  undefined8 uStack_47fe0;
  undefined8 uStack_47fd8;
  undefined8 uStack_47fd0;
  undefined8 uStack_47fc8;
  undefined8 uStack_47fc0;
  undefined8 uStack_47fb8;
  undefined8 uStack_47fb0;
  undefined8 uStack_47fa8;
  undefined8 uStack_47fa0;
  undefined8 uStack_47f98;
  undefined8 uStack_47f90;
  undefined8 uStack_47f88;
  undefined8 uStack_47f80;
  undefined8 uStack_47f78;
  undefined8 uStack_47f70;
  undefined8 uStack_47f68;
  undefined8 uStack_47f60;
  undefined8 uStack_47f58;
  undefined8 uStack_47f50;
  undefined8 uStack_47f48;
  undefined8 uStack_47f40;
  undefined8 uStack_47f38;
  undefined8 uStack_47f30;
  undefined8 uStack_47f28;
  undefined8 uStack_47f20;
  undefined8 uStack_47f18;
  undefined8 uStack_47f10;
  undefined8 uStack_47f08;
  undefined8 uStack_47f00;
  undefined8 uStack_47ef8;
  undefined8 uStack_47ef0;
  undefined8 uStack_47ee8;
  undefined8 uStack_47ee0;
  undefined8 uStack_47ed8;
  undefined8 uStack_47ed0;
  undefined8 uStack_47ec8;
  undefined8 uStack_47ec0;
  undefined8 uStack_47eb8;
  undefined8 uStack_47eb0;
  undefined8 uStack_47ea8;
  undefined8 uStack_47ea0;
  undefined8 uStack_47e98;
  undefined8 uStack_47e90;
  undefined8 uStack_47e88;
  undefined8 uStack_47e80;
  undefined8 uStack_47e78;
  undefined8 uStack_47e70;
  undefined8 uStack_47e68;
  undefined8 uStack_47e60;
  undefined8 uStack_47e58;
  undefined8 uStack_47e50;
  undefined8 uStack_47e48;
  undefined8 uStack_47e40;
  undefined8 uStack_47e38;
  undefined8 uStack_47e30;
  undefined8 uStack_47e28;
  undefined8 uStack_47e20;
  undefined8 uStack_47e18;
  undefined8 uStack_47e10;
  undefined8 uStack_47e08;
  undefined8 uStack_47e00;
  undefined8 uStack_47df8;
  undefined8 uStack_47df0;
  undefined8 uStack_47de8;
  undefined8 uStack_47de0;
  undefined8 uStack_47dd8;
  undefined8 uStack_47dd0;
  undefined8 uStack_47dc8;
  undefined8 uStack_47dc0;
  undefined8 uStack_47db8;
  undefined8 uStack_47db0;
  undefined8 uStack_47da8;
  undefined8 uStack_47da0;
  undefined8 uStack_47d98;
  undefined8 uStack_47d90;
  undefined8 uStack_47d88;
  undefined8 uStack_47d80;
  undefined8 uStack_47d78;
  undefined8 uStack_47d70;
  undefined8 uStack_47d68;
  undefined8 uStack_47d60;
  undefined8 uStack_47d58;
  undefined8 uStack_47d50;
  undefined8 uStack_47d48;
  undefined8 uStack_47d40;
  undefined8 uStack_47d38;
  undefined8 uStack_47d30;
  undefined8 uStack_47d28;
  undefined8 uStack_47d20;
  undefined8 uStack_47d18;
  undefined8 uStack_47d10;
  undefined8 uStack_47d08;
  undefined8 uStack_47d00;
  undefined8 uStack_47cf8;
  undefined8 uStack_47cf0;
  undefined8 uStack_47ce8;
  undefined8 uStack_47ce0;
  undefined8 uStack_47cd8;
  undefined8 uStack_47cd0;
  undefined8 uStack_47cc8;
  undefined8 uStack_47cc0;
  undefined8 uStack_47cb8;
  undefined8 uStack_47cb0;
  undefined8 uStack_47ca8;
  undefined8 uStack_47ca0;
  undefined8 uStack_47c98;
  undefined8 uStack_47c90;
  undefined8 uStack_47c88;
  undefined8 uStack_47c80;
  undefined8 uStack_47c78;
  undefined8 uStack_47c70;
  undefined8 uStack_47c68;
  undefined8 uStack_47c60;
  undefined8 uStack_47c58;
  undefined8 uStack_47c50;
  undefined8 uStack_47c48;
  undefined8 uStack_47c40;
  undefined8 uStack_47c38;
  undefined8 uStack_47c30;
  undefined8 uStack_47c28;
  undefined8 uStack_47c20;
  undefined8 uStack_47c18;
  undefined8 uStack_47c10;
  undefined8 uStack_47c08;
  undefined8 uStack_47c00;
  undefined8 uStack_47bf8;
  undefined8 uStack_47bf0;
  undefined8 uStack_47be8;
  undefined8 uStack_47be0;
  undefined8 uStack_47bd8;
  undefined8 uStack_47bd0;
  undefined8 uStack_47bc8;
  undefined8 uStack_47bc0;
  undefined8 uStack_47bb8;
  undefined8 uStack_47bb0;
  undefined8 uStack_47ba8;
  undefined8 uStack_47ba0;
  undefined8 uStack_47b98;
  undefined8 uStack_47b90;
  undefined8 uStack_47b88;
  undefined8 uStack_47b80;
  undefined8 uStack_47b78;
  undefined8 uStack_47b70;
  undefined8 uStack_47b68;
  undefined8 uStack_47b60;
  undefined8 uStack_47b58;
  undefined8 uStack_47b50;
  undefined8 uStack_47b48;
  undefined8 uStack_47b40;
  undefined8 uStack_47b38;
  undefined8 uStack_47b30;
  undefined8 uStack_47b28;
  undefined8 uStack_47b20;
  undefined8 uStack_47b18;
  undefined8 uStack_47b10;
  undefined8 uStack_47b08;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *pvStack_47ae8;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_64,_64,_0,_64,_64>_>
  CStack_47ae0;
  PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *pPStack_47ad0;
  undefined8 uStack_47ac8;
  undefined8 uStack_47ac0;
  undefined8 uStack_47ab8;
  PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *pPStack_47ab0;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_64,_64,_0,_64,_64>_>
  *pCStack_47aa8;
  Matrix<double,_64,_64,_0,_64,_64> *pMStack_47aa0;
  undefined8 uStack_47a98;
  undefined8 uStack_47a90;
  undefined8 uStack_47a88;
  ulong uStack_47a80;
  ulong uStack_47a78;
  ulong uStack_47a70;
  ulong uStack_47a68;
  ulong uStack_47a60;
  ulong uStack_47a58;
  ulong uStack_47a50;
  ulong uStack_47a48;
  ulong uStack_47a40;
  ulong uStack_47a38;
  ulong uStack_47a30;
  ulong uStack_47a28;
  ulong uStack_47a20;
  ulong uStack_47a18;
  ulong uStack_47a10;
  ulong uStack_47a08;
  ulong uStack_47a00;
  ulong uStack_479f8;
  ulong uStack_479f0;
  ulong uStack_479e8;
  ulong uStack_479e0;
  ulong uStack_479d8;
  ulong uStack_479d0;
  ulong uStack_479c8;
  ulong uStack_479c0;
  ulong uStack_479b8;
  ulong uStack_479b0;
  ulong uStack_479a8;
  ulong uStack_479a0;
  ulong uStack_47998;
  ulong uStack_47990;
  ulong uStack_47988;
  ulong uStack_47980;
  ulong uStack_47978;
  ulong uStack_47970;
  ulong uStack_47968;
  ulong uStack_47960;
  ulong uStack_47958;
  Matrix<double,_64,_64,_0,_64,_64> *pMStack_47950;
  PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *pPStack_47948;
  PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *pPStack_47940;
  Matrix<double,_60,_84,_0,_60,_84> *pMStack_47938;
  undefined8 uStack_47930;
  undefined8 uStack_47928;
  undefined8 uStack_47920;
  undefined8 uStack_478d0;
  undefined8 uStack_47870;
  undefined8 uStack_475e0;
  undefined8 uStack_47580;
  undefined8 uStack_472f0;
  undefined8 uStack_47290;
  undefined8 uStack_47000;
  undefined8 uStack_46fa0;
  undefined8 uStack_46d10;
  undefined8 uStack_46cb0;
  undefined8 uStack_46a20;
  undefined8 uStack_469c0;
  undefined8 uStack_467c8;
  undefined8 uStack_46730;
  undefined8 uStack_466d0;
  undefined8 uStack_464d8;
  undefined8 uStack_46440;
  undefined8 uStack_463e0;
  undefined8 uStack_461e8;
  undefined8 uStack_46150;
  undefined8 uStack_460f0;
  undefined8 uStack_45ef8;
  undefined8 uStack_45e60;
  undefined8 uStack_45bf8;
  undefined8 uStack_45b70;
  ulong uStack_45b18;
  undefined8 uStack_45920;
  undefined8 uStack_45908;
  ulong uStack_45880;
  undefined8 uStack_45878;
  undefined8 uStack_45870;
  undefined8 uStack_45868;
  undefined8 uStack_45860;
  undefined8 uStack_45858;
  undefined8 uStack_45850;
  undefined8 uStack_45848;
  undefined8 uStack_45840;
  undefined8 uStack_45838;
  ulong uStack_45830;
  ulong uStack_45630;
  undefined8 uStack_45618;
  undefined8 uStack_455f0;
  undefined8 uStack_455e8;
  undefined8 uStack_455e0;
  undefined8 uStack_455d8;
  undefined8 uStack_455d0;
  undefined8 uStack_455c8;
  undefined8 uStack_455c0;
  undefined8 uStack_455b8;
  undefined8 uStack_455b0;
  undefined8 uStack_455a8;
  undefined8 uStack_455a0;
  ulong uStack_45598;
  undefined8 uStack_45590;
  undefined8 uStack_45588;
  undefined8 uStack_45580;
  undefined8 uStack_45578;
  undefined8 uStack_45570;
  undefined8 uStack_45568;
  undefined8 uStack_45560;
  undefined8 uStack_45558;
  undefined8 uStack_45550;
  ulong uStack_45548;
  undefined8 uStack_45370;
  undefined8 uStack_45368;
  undefined8 uStack_45360;
  undefined8 uStack_45358;
  undefined8 uStack_45350;
  ulong uStack_45348;
  undefined8 uStack_45328;
  undefined8 uStack_45308;
  undefined8 uStack_45300;
  undefined8 uStack_452f8;
  undefined8 uStack_452f0;
  undefined8 uStack_452e8;
  undefined8 uStack_452e0;
  undefined8 uStack_452d8;
  undefined8 uStack_452d0;
  undefined8 uStack_452c8;
  undefined8 uStack_452c0;
  undefined8 uStack_452b8;
  ulong uStack_452b0;
  undefined8 uStack_452a8;
  undefined8 uStack_452a0;
  undefined8 uStack_45298;
  undefined8 uStack_45290;
  undefined8 uStack_45288;
  undefined8 uStack_45280;
  undefined8 uStack_45278;
  undefined8 uStack_45270;
  undefined8 uStack_45268;
  ulong uStack_45260;
  undefined8 uStack_45088;
  undefined8 uStack_45080;
  undefined8 uStack_45078;
  undefined8 uStack_45070;
  undefined8 uStack_45068;
  ulong uStack_45060;
  undefined8 uStack_45038;
  undefined8 uStack_45020;
  undefined8 uStack_45018;
  undefined8 uStack_45010;
  undefined8 uStack_45008;
  undefined8 uStack_45000;
  undefined8 uStack_44ff8;
  undefined8 uStack_44ff0;
  undefined8 uStack_44fe8;
  undefined8 uStack_44fe0;
  undefined8 uStack_44fd8;
  undefined8 uStack_44fd0;
  ulong uStack_44fc8;
  undefined8 uStack_44da0;
  undefined8 uStack_44d98;
  undefined8 uStack_44d90;
  undefined8 uStack_44d88;
  undefined8 uStack_44d80;
  ulong uStack_44d78;
  undefined8 uStack_44a60;
  undefined8 uStack_449f0;
  undefined8 uStack_449e8;
  undefined8 uStack_449e0;
  undefined8 uStack_449d8;
  undefined8 uStack_449d0;
  undefined8 uStack_449c8;
  undefined8 uStack_449c0;
  undefined8 uStack_449b8;
  undefined8 uStack_449b0;
  ulong uStack_449a8;
  ulong uStack_44770;
  undefined8 uStack_44768;
  undefined8 uStack_44760;
  undefined8 uStack_44758;
  undefined8 uStack_44750;
  undefined8 uStack_44748;
  undefined8 uStack_44740;
  undefined8 uStack_44738;
  undefined8 uStack_44730;
  undefined8 uStack_44728;
  undefined8 uStack_44720;
  undefined8 uStack_44718;
  ulong uStack_44710;
  undefined8 uStack_44708;
  undefined8 uStack_44700;
  undefined8 uStack_446f8;
  undefined8 uStack_446f0;
  undefined8 uStack_446e8;
  undefined8 uStack_446e0;
  undefined8 uStack_446d8;
  undefined8 uStack_446d0;
  undefined8 uStack_446c8;
  ulong uStack_446c0;
  undefined8 uStack_444e8;
  undefined8 uStack_444e0;
  undefined8 uStack_444d8;
  undefined8 uStack_444d0;
  undefined8 uStack_444c8;
  ulong uStack_444c0;
  undefined8 uStack_444b8;
  undefined8 uStack_444b0;
  undefined8 uStack_444a8;
  undefined8 uStack_444a0;
  undefined8 uStack_44498;
  undefined8 uStack_44490;
  ulong uStack_44488;
  undefined8 uStack_44480;
  undefined8 uStack_44478;
  undefined8 uStack_44470;
  undefined8 uStack_44468;
  undefined8 uStack_44460;
  undefined8 uStack_44458;
  undefined8 uStack_44450;
  undefined8 uStack_44448;
  undefined8 uStack_44440;
  undefined8 uStack_44438;
  undefined8 uStack_44430;
  ulong uStack_44428;
  undefined8 uStack_44420;
  undefined8 uStack_44418;
  undefined8 uStack_44410;
  undefined8 uStack_44408;
  undefined8 uStack_44400;
  undefined8 uStack_443f8;
  undefined8 uStack_443f0;
  undefined8 uStack_443e8;
  undefined8 uStack_443e0;
  ulong uStack_443d8;
  undefined8 uStack_44200;
  undefined8 uStack_441f8;
  undefined8 uStack_441f0;
  undefined8 uStack_441e8;
  undefined8 uStack_441e0;
  ulong uStack_441d8;
  undefined8 uStack_441d0;
  undefined8 uStack_441c8;
  undefined8 uStack_441c0;
  undefined8 uStack_441b8;
  undefined8 uStack_441b0;
  undefined8 uStack_441a8;
  ulong uStack_441a0;
  undefined8 uStack_44198;
  undefined8 uStack_44190;
  undefined8 uStack_44188;
  undefined8 uStack_44180;
  undefined8 uStack_44178;
  undefined8 uStack_44170;
  undefined8 uStack_44168;
  undefined8 uStack_44160;
  undefined8 uStack_44158;
  undefined8 uStack_44150;
  undefined8 uStack_44148;
  ulong uStack_44140;
  undefined8 uStack_44138;
  undefined8 uStack_44130;
  undefined8 uStack_44128;
  undefined8 uStack_44120;
  undefined8 uStack_44118;
  undefined8 uStack_44110;
  undefined8 uStack_44108;
  undefined8 uStack_44100;
  undefined8 uStack_440f8;
  ulong uStack_440f0;
  undefined8 uStack_43f18;
  undefined8 uStack_43f10;
  undefined8 uStack_43f08;
  undefined8 uStack_43f00;
  undefined8 uStack_43ef8;
  ulong uStack_43ef0;
  undefined8 uStack_43ee8;
  undefined8 uStack_43ee0;
  undefined8 uStack_43ed8;
  undefined8 uStack_43ed0;
  undefined8 uStack_43ec8;
  undefined8 uStack_43ec0;
  ulong uStack_43eb8;
  undefined8 uStack_43eb0;
  undefined8 uStack_43ea8;
  undefined8 uStack_43ea0;
  undefined8 uStack_43e98;
  undefined8 uStack_43e90;
  undefined8 uStack_43e88;
  undefined8 uStack_43e80;
  undefined8 uStack_43e78;
  undefined8 uStack_43e70;
  undefined8 uStack_43e68;
  undefined8 uStack_43e60;
  ulong uStack_43e58;
  undefined8 uStack_43c30;
  undefined8 uStack_43c28;
  undefined8 uStack_43c20;
  undefined8 uStack_43c18;
  undefined8 uStack_43c10;
  ulong uStack_43c08;
  undefined8 uStack_43918;
  undefined8 uStack_43910;
  undefined8 uStack_43908;
  undefined8 uStack_43900;
  undefined8 uStack_438f8;
  undefined8 uStack_438f0;
  ulong uStack_438e8;
  undefined8 uStack_43880;
  undefined8 uStack_43878;
  undefined8 uStack_43870;
  undefined8 uStack_43868;
  undefined8 uStack_43860;
  undefined8 uStack_43858;
  undefined8 uStack_43850;
  undefined8 uStack_43848;
  undefined8 uStack_43840;
  ulong uStack_43838;
  ulong uStack_43670;
  undefined8 uStack_43630;
  undefined8 uStack_43628;
  undefined8 uStack_43620;
  undefined8 uStack_43618;
  undefined8 uStack_43610;
  undefined8 uStack_43608;
  ulong uStack_43600;
  undefined8 uStack_435f8;
  undefined8 uStack_435f0;
  undefined8 uStack_435e8;
  undefined8 uStack_435e0;
  undefined8 uStack_435d8;
  undefined8 uStack_435d0;
  undefined8 uStack_435c8;
  undefined8 uStack_435c0;
  undefined8 uStack_435b8;
  undefined8 uStack_435b0;
  undefined8 uStack_435a8;
  ulong uStack_435a0;
  undefined8 uStack_43598;
  undefined8 uStack_43590;
  undefined8 uStack_43588;
  undefined8 uStack_43580;
  undefined8 uStack_43578;
  undefined8 uStack_43570;
  undefined8 uStack_43568;
  undefined8 uStack_43560;
  undefined8 uStack_43558;
  ulong uStack_43550;
  ulong uStack_43388;
  undefined8 uStack_43378;
  undefined8 uStack_43370;
  undefined8 uStack_43368;
  undefined8 uStack_43360;
  undefined8 uStack_43358;
  ulong uStack_43350;
  undefined8 uStack_43348;
  undefined8 uStack_43340;
  undefined8 uStack_43338;
  undefined8 uStack_43330;
  undefined8 uStack_43328;
  undefined8 uStack_43320;
  ulong uStack_43318;
  undefined8 uStack_43310;
  undefined8 uStack_43308;
  undefined8 uStack_43300;
  undefined8 uStack_432f8;
  undefined8 uStack_432f0;
  undefined8 uStack_432e8;
  undefined8 uStack_432e0;
  undefined8 uStack_432d8;
  undefined8 uStack_432d0;
  undefined8 uStack_432c8;
  undefined8 uStack_432c0;
  ulong uStack_432b8;
  undefined8 uStack_432b0;
  undefined8 uStack_432a8;
  undefined8 uStack_432a0;
  undefined8 uStack_43298;
  undefined8 uStack_43290;
  undefined8 uStack_43288;
  undefined8 uStack_43280;
  undefined8 uStack_43278;
  undefined8 uStack_43270;
  ulong uStack_43268;
  ulong uStack_430a0;
  undefined8 uStack_43090;
  undefined8 uStack_43088;
  undefined8 uStack_43080;
  undefined8 uStack_43078;
  undefined8 uStack_43070;
  ulong uStack_43068;
  undefined8 uStack_43060;
  undefined8 uStack_43058;
  undefined8 uStack_43050;
  undefined8 uStack_43048;
  undefined8 uStack_43040;
  undefined8 uStack_43038;
  ulong uStack_43030;
  undefined8 uStack_43028;
  undefined8 uStack_43020;
  undefined8 uStack_43018;
  undefined8 uStack_43010;
  undefined8 uStack_43008;
  undefined8 uStack_43000;
  undefined8 uStack_42ff8;
  undefined8 uStack_42ff0;
  undefined8 uStack_42fe8;
  undefined8 uStack_42fe0;
  undefined8 uStack_42fd8;
  ulong uStack_42fd0;
  ulong uStack_42db8;
  undefined8 uStack_42da8;
  undefined8 uStack_42da0;
  undefined8 uStack_42d98;
  undefined8 uStack_42d90;
  undefined8 uStack_42d88;
  ulong uStack_42d80;
  ulong uStack_42ad0;
  undefined8 uStack_42a90;
  undefined8 uStack_42a88;
  undefined8 uStack_42a80;
  undefined8 uStack_42a78;
  undefined8 uStack_42a70;
  undefined8 uStack_42a68;
  ulong uStack_42a60;
  undefined8 uStack_429f8;
  undefined8 uStack_429f0;
  undefined8 uStack_429e8;
  undefined8 uStack_429e0;
  undefined8 uStack_429d8;
  undefined8 uStack_429d0;
  undefined8 uStack_429c8;
  undefined8 uStack_429c0;
  undefined8 uStack_429b8;
  ulong uStack_429b0;
  ulong uStack_427e8;
  undefined8 uStack_427a8;
  undefined8 uStack_427a0;
  undefined8 uStack_42798;
  undefined8 uStack_42790;
  undefined8 uStack_42788;
  undefined8 uStack_42780;
  ulong uStack_42778;
  undefined8 uStack_42770;
  undefined8 uStack_42768;
  undefined8 uStack_42760;
  undefined8 uStack_42758;
  undefined8 uStack_42750;
  undefined8 uStack_42748;
  undefined8 uStack_42740;
  undefined8 uStack_42738;
  undefined8 uStack_42730;
  undefined8 uStack_42728;
  undefined8 uStack_42720;
  ulong uStack_42718;
  undefined8 uStack_42710;
  undefined8 uStack_42708;
  undefined8 uStack_42700;
  undefined8 uStack_426f8;
  undefined8 uStack_426f0;
  undefined8 uStack_426e8;
  undefined8 uStack_426e0;
  undefined8 uStack_426d8;
  undefined8 uStack_426d0;
  ulong uStack_426c8;
  ulong uStack_42500;
  undefined8 uStack_424f0;
  undefined8 uStack_424e8;
  undefined8 uStack_424e0;
  undefined8 uStack_424d8;
  undefined8 uStack_424d0;
  ulong uStack_424c8;
  undefined8 uStack_424c0;
  undefined8 uStack_424b8;
  undefined8 uStack_424b0;
  undefined8 uStack_424a8;
  undefined8 uStack_424a0;
  undefined8 uStack_42498;
  ulong uStack_42490;
  undefined8 uStack_42488;
  undefined8 uStack_42480;
  undefined8 uStack_42478;
  undefined8 uStack_42470;
  undefined8 uStack_42468;
  undefined8 uStack_42460;
  undefined8 uStack_42458;
  undefined8 uStack_42450;
  undefined8 uStack_42448;
  undefined8 uStack_42440;
  undefined8 uStack_42438;
  ulong uStack_42430;
  ulong uStack_42218;
  undefined8 uStack_42208;
  undefined8 uStack_42200;
  undefined8 uStack_421f8;
  undefined8 uStack_421f0;
  undefined8 uStack_421e8;
  ulong uStack_421e0;
  ulong uStack_41f30;
  undefined8 uStack_41ef0;
  undefined8 uStack_41ee8;
  undefined8 uStack_41ee0;
  undefined8 uStack_41ed8;
  undefined8 uStack_41ed0;
  undefined8 uStack_41ec8;
  ulong uStack_41ec0;
  undefined8 uStack_41e58;
  undefined8 uStack_41e50;
  undefined8 uStack_41e48;
  undefined8 uStack_41e40;
  undefined8 uStack_41e38;
  undefined8 uStack_41e30;
  undefined8 uStack_41e28;
  undefined8 uStack_41e20;
  undefined8 uStack_41e18;
  ulong uStack_41e10;
  ulong uStack_41c48;
  undefined8 uStack_41c08;
  undefined8 uStack_41c00;
  undefined8 uStack_41bf8;
  undefined8 uStack_41bf0;
  undefined8 uStack_41be8;
  undefined8 uStack_41be0;
  ulong uStack_41bd8;
  undefined8 uStack_41bd0;
  undefined8 uStack_41bc8;
  undefined8 uStack_41bc0;
  undefined8 uStack_41bb8;
  undefined8 uStack_41bb0;
  undefined8 uStack_41ba8;
  undefined8 uStack_41ba0;
  undefined8 uStack_41b98;
  undefined8 uStack_41b90;
  undefined8 uStack_41b88;
  undefined8 uStack_41b80;
  ulong uStack_41b78;
  ulong uStack_41960;
  undefined8 uStack_41950;
  undefined8 uStack_41948;
  undefined8 uStack_41940;
  undefined8 uStack_41938;
  undefined8 uStack_41930;
  ulong uStack_41928;
  ulong uStack_41678;
  undefined8 uStack_41638;
  undefined8 uStack_41630;
  undefined8 uStack_41628;
  undefined8 uStack_41620;
  undefined8 uStack_41618;
  undefined8 uStack_41610;
  ulong uStack_41608;
  ulong uStack_41390;
  ulong uStack_410a8;
  undefined8 uStack_40ce8;
  undefined8 uStack_40ce0;
  undefined8 uStack_40cd8;
  undefined8 uStack_40cd0;
  undefined8 uStack_40cc8;
  undefined8 uStack_40cc0;
  undefined8 uStack_40cb8;
  undefined8 uStack_40cb0;
  undefined8 uStack_40ca8;
  ulong uStack_40ca0;
  undefined8 uStack_40bc8;
  undefined8 uStack_40a60;
  undefined8 uStack_40a58;
  undefined8 uStack_40a50;
  undefined8 uStack_40a48;
  undefined8 uStack_40a40;
  undefined8 uStack_40a38;
  undefined8 uStack_40a30;
  undefined8 uStack_40a28;
  undefined8 uStack_40a20;
  undefined8 uStack_40a18;
  undefined8 uStack_40a10;
  ulong uStack_40a08;
  undefined8 uStack_40a00;
  undefined8 uStack_409f8;
  undefined8 uStack_409f0;
  undefined8 uStack_409e8;
  undefined8 uStack_409e0;
  undefined8 uStack_409d8;
  undefined8 uStack_409d0;
  undefined8 uStack_409c8;
  undefined8 uStack_409c0;
  ulong uStack_409b8;
  undefined8 uStack_408d8;
  undefined8 uStack_407e0;
  undefined8 uStack_407d8;
  undefined8 uStack_407d0;
  undefined8 uStack_407c8;
  undefined8 uStack_407c0;
  ulong uStack_407b8;
  undefined8 uStack_40778;
  undefined8 uStack_40770;
  undefined8 uStack_40768;
  undefined8 uStack_40760;
  undefined8 uStack_40758;
  undefined8 uStack_40750;
  undefined8 uStack_40748;
  undefined8 uStack_40740;
  undefined8 uStack_40738;
  undefined8 uStack_40730;
  undefined8 uStack_40728;
  ulong uStack_40720;
  undefined8 uStack_40718;
  undefined8 uStack_40710;
  undefined8 uStack_40708;
  undefined8 uStack_40700;
  undefined8 uStack_406f8;
  undefined8 uStack_406f0;
  undefined8 uStack_406e8;
  undefined8 uStack_406e0;
  undefined8 uStack_406d8;
  ulong uStack_406d0;
  undefined8 uStack_40668;
  undefined8 uStack_405e8;
  undefined8 uStack_404f8;
  undefined8 uStack_404f0;
  undefined8 uStack_404e8;
  undefined8 uStack_404e0;
  undefined8 uStack_404d8;
  ulong uStack_404d0;
  undefined8 uStack_40490;
  undefined8 uStack_40488;
  undefined8 uStack_40480;
  undefined8 uStack_40478;
  undefined8 uStack_40470;
  undefined8 uStack_40468;
  undefined8 uStack_40460;
  undefined8 uStack_40458;
  undefined8 uStack_40450;
  undefined8 uStack_40448;
  undefined8 uStack_40440;
  ulong uStack_40438;
  undefined8 uStack_40430;
  undefined8 uStack_40428;
  undefined8 uStack_40420;
  undefined8 uStack_40418;
  undefined8 uStack_40410;
  undefined8 uStack_40408;
  undefined8 uStack_40400;
  undefined8 uStack_403f8;
  undefined8 uStack_403f0;
  ulong uStack_403e8;
  undefined8 uStack_40378;
  undefined8 uStack_402f8;
  undefined8 uStack_40210;
  undefined8 uStack_40208;
  undefined8 uStack_40200;
  undefined8 uStack_401f8;
  undefined8 uStack_401f0;
  ulong uStack_401e8;
  undefined8 uStack_401a8;
  undefined8 uStack_401a0;
  undefined8 uStack_40198;
  undefined8 uStack_40190;
  undefined8 uStack_40188;
  undefined8 uStack_40180;
  undefined8 uStack_40178;
  undefined8 uStack_40170;
  undefined8 uStack_40168;
  undefined8 uStack_40160;
  undefined8 uStack_40158;
  ulong uStack_40150;
  undefined8 uStack_40148;
  undefined8 uStack_40140;
  undefined8 uStack_40138;
  undefined8 uStack_40130;
  undefined8 uStack_40128;
  undefined8 uStack_40120;
  undefined8 uStack_40118;
  undefined8 uStack_40110;
  undefined8 uStack_40108;
  ulong uStack_40100;
  undefined8 uStack_40088;
  undefined8 uStack_40008;
  undefined8 uStack_3ff28;
  undefined8 uStack_3ff20;
  undefined8 uStack_3ff18;
  undefined8 uStack_3ff10;
  undefined8 uStack_3ff08;
  ulong uStack_3ff00;
  undefined8 uStack_3fec0;
  undefined8 uStack_3feb8;
  undefined8 uStack_3feb0;
  undefined8 uStack_3fea8;
  undefined8 uStack_3fea0;
  undefined8 uStack_3fe98;
  undefined8 uStack_3fe90;
  undefined8 uStack_3fe88;
  undefined8 uStack_3fe80;
  undefined8 uStack_3fe78;
  undefined8 uStack_3fe70;
  ulong uStack_3fe68;
  undefined8 uStack_3fe60;
  undefined8 uStack_3fe58;
  undefined8 uStack_3fe50;
  undefined8 uStack_3fe48;
  undefined8 uStack_3fe40;
  undefined8 uStack_3fe38;
  undefined8 uStack_3fe30;
  undefined8 uStack_3fe28;
  undefined8 uStack_3fe20;
  ulong uStack_3fe18;
  undefined8 uStack_3fd98;
  undefined8 uStack_3fd18;
  undefined8 uStack_3fc40;
  undefined8 uStack_3fc38;
  undefined8 uStack_3fc30;
  undefined8 uStack_3fc28;
  undefined8 uStack_3fc20;
  ulong uStack_3fc18;
  undefined8 uStack_3fbd8;
  undefined8 uStack_3fbd0;
  undefined8 uStack_3fbc8;
  undefined8 uStack_3fbc0;
  undefined8 uStack_3fbb8;
  undefined8 uStack_3fbb0;
  undefined8 uStack_3fba8;
  undefined8 uStack_3fba0;
  undefined8 uStack_3fb98;
  undefined8 uStack_3fb90;
  undefined8 uStack_3fb88;
  ulong uStack_3fb80;
  undefined8 uStack_3faa8;
  undefined8 uStack_3fa28;
  undefined8 uStack_3f958;
  undefined8 uStack_3f950;
  undefined8 uStack_3f948;
  undefined8 uStack_3f940;
  undefined8 uStack_3f938;
  ulong uStack_3f930;
  undefined8 uStack_3f7b8;
  undefined8 uStack_3f640;
  undefined8 uStack_3f638;
  undefined8 uStack_3f630;
  undefined8 uStack_3f628;
  undefined8 uStack_3f620;
  undefined8 uStack_3f618;
  ulong uStack_3f610;
  undefined8 uStack_3f5a8;
  undefined8 uStack_3f5a0;
  undefined8 uStack_3f598;
  undefined8 uStack_3f590;
  undefined8 uStack_3f588;
  undefined8 uStack_3f580;
  undefined8 uStack_3f578;
  undefined8 uStack_3f570;
  undefined8 uStack_3f568;
  ulong uStack_3f560;
  undefined8 uStack_3f450;
  undefined8 uStack_3f358;
  undefined8 uStack_3f350;
  undefined8 uStack_3f348;
  undefined8 uStack_3f340;
  undefined8 uStack_3f338;
  undefined8 uStack_3f330;
  ulong uStack_3f328;
  undefined8 uStack_3f320;
  undefined8 uStack_3f318;
  undefined8 uStack_3f310;
  undefined8 uStack_3f308;
  undefined8 uStack_3f300;
  undefined8 uStack_3f2f8;
  undefined8 uStack_3f2f0;
  undefined8 uStack_3f2e8;
  undefined8 uStack_3f2e0;
  undefined8 uStack_3f2d8;
  undefined8 uStack_3f2d0;
  ulong uStack_3f2c8;
  undefined8 uStack_3f2c0;
  undefined8 uStack_3f2b8;
  undefined8 uStack_3f2b0;
  undefined8 uStack_3f2a8;
  undefined8 uStack_3f2a0;
  undefined8 uStack_3f298;
  undefined8 uStack_3f290;
  undefined8 uStack_3f288;
  undefined8 uStack_3f280;
  ulong uStack_3f278;
  undefined8 uStack_3f1e0;
  undefined8 uStack_3f160;
  undefined8 uStack_3f0a0;
  undefined8 uStack_3f098;
  undefined8 uStack_3f090;
  undefined8 uStack_3f088;
  undefined8 uStack_3f080;
  ulong uStack_3f078;
  undefined8 uStack_3f070;
  undefined8 uStack_3f068;
  undefined8 uStack_3f060;
  undefined8 uStack_3f058;
  undefined8 uStack_3f050;
  undefined8 uStack_3f048;
  ulong uStack_3f040;
  undefined8 uStack_3f038;
  undefined8 uStack_3f030;
  undefined8 uStack_3f028;
  undefined8 uStack_3f020;
  undefined8 uStack_3f018;
  undefined8 uStack_3f010;
  undefined8 uStack_3f008;
  undefined8 uStack_3f000;
  undefined8 uStack_3eff8;
  undefined8 uStack_3eff0;
  undefined8 uStack_3efe8;
  ulong uStack_3efe0;
  undefined8 uStack_3efd8;
  undefined8 uStack_3efd0;
  undefined8 uStack_3efc8;
  undefined8 uStack_3efc0;
  undefined8 uStack_3efb8;
  undefined8 uStack_3efb0;
  undefined8 uStack_3efa8;
  undefined8 uStack_3efa0;
  undefined8 uStack_3ef98;
  ulong uStack_3ef90;
  undefined8 uStack_3eef0;
  undefined8 uStack_3ee70;
  undefined8 uStack_3edb8;
  undefined8 uStack_3edb0;
  undefined8 uStack_3eda8;
  undefined8 uStack_3eda0;
  undefined8 uStack_3ed98;
  ulong uStack_3ed90;
  undefined8 uStack_3ed88;
  undefined8 uStack_3ed80;
  undefined8 uStack_3ed78;
  undefined8 uStack_3ed70;
  undefined8 uStack_3ed68;
  undefined8 uStack_3ed60;
  ulong uStack_3ed58;
  undefined8 uStack_3ed50;
  undefined8 uStack_3ed48;
  undefined8 uStack_3ed40;
  undefined8 uStack_3ed38;
  undefined8 uStack_3ed30;
  undefined8 uStack_3ed28;
  undefined8 uStack_3ed20;
  undefined8 uStack_3ed18;
  undefined8 uStack_3ed10;
  undefined8 uStack_3ed08;
  undefined8 uStack_3ed00;
  ulong uStack_3ecf8;
  undefined8 uStack_3ecf0;
  undefined8 uStack_3ece8;
  undefined8 uStack_3ece0;
  undefined8 uStack_3ecd8;
  undefined8 uStack_3ecd0;
  undefined8 uStack_3ecc8;
  undefined8 uStack_3ecc0;
  undefined8 uStack_3ecb8;
  undefined8 uStack_3ecb0;
  ulong uStack_3eca8;
  undefined8 uStack_3eca0;
  undefined8 uStack_3ec00;
  undefined8 uStack_3eb80;
  undefined8 uStack_3ead0;
  undefined8 uStack_3eac8;
  undefined8 uStack_3eac0;
  undefined8 uStack_3eab8;
  undefined8 uStack_3eab0;
  ulong uStack_3eaa8;
  undefined8 uStack_3eaa0;
  undefined8 uStack_3ea98;
  undefined8 uStack_3ea90;
  undefined8 uStack_3ea88;
  undefined8 uStack_3ea80;
  undefined8 uStack_3ea78;
  ulong uStack_3ea70;
  undefined8 uStack_3ea68;
  undefined8 uStack_3ea60;
  undefined8 uStack_3ea58;
  undefined8 uStack_3ea50;
  undefined8 uStack_3ea48;
  undefined8 uStack_3ea40;
  undefined8 uStack_3ea38;
  undefined8 uStack_3ea30;
  undefined8 uStack_3ea28;
  undefined8 uStack_3ea20;
  undefined8 uStack_3ea18;
  ulong uStack_3ea10;
  undefined8 uStack_3ea08;
  undefined8 uStack_3ea00;
  undefined8 uStack_3e9f8;
  undefined8 uStack_3e9f0;
  undefined8 uStack_3e9e8;
  undefined8 uStack_3e9e0;
  undefined8 uStack_3e9d8;
  undefined8 uStack_3e9d0;
  undefined8 uStack_3e9c8;
  ulong uStack_3e9c0;
  undefined8 uStack_3e9b0;
  undefined8 uStack_3e910;
  undefined8 uStack_3e890;
  undefined8 uStack_3e7e8;
  undefined8 uStack_3e7e0;
  undefined8 uStack_3e7d8;
  undefined8 uStack_3e7d0;
  undefined8 uStack_3e7c8;
  ulong uStack_3e7c0;
  undefined8 uStack_3e7b8;
  undefined8 uStack_3e7b0;
  undefined8 uStack_3e7a8;
  undefined8 uStack_3e7a0;
  undefined8 uStack_3e798;
  undefined8 uStack_3e790;
  ulong uStack_3e788;
  undefined8 uStack_3e780;
  undefined8 uStack_3e778;
  undefined8 uStack_3e770;
  undefined8 uStack_3e768;
  undefined8 uStack_3e760;
  undefined8 uStack_3e758;
  undefined8 uStack_3e750;
  undefined8 uStack_3e748;
  undefined8 uStack_3e740;
  undefined8 uStack_3e738;
  undefined8 uStack_3e730;
  ulong uStack_3e728;
  undefined8 uStack_3e6c0;
  undefined8 uStack_3e620;
  undefined8 uStack_3e5a0;
  undefined8 uStack_3e500;
  undefined8 uStack_3e4f8;
  undefined8 uStack_3e4f0;
  undefined8 uStack_3e4e8;
  undefined8 uStack_3e4e0;
  ulong uStack_3e4d8;
  undefined8 uStack_3e3d0;
  undefined8 uStack_3e330;
  ulong uStack_3e228;
  undefined8 uStack_3e1e8;
  undefined8 uStack_3e1e0;
  undefined8 uStack_3e1d8;
  undefined8 uStack_3e1d0;
  undefined8 uStack_3e1c8;
  undefined8 uStack_3e1c0;
  ulong uStack_3e1b8;
  undefined8 uStack_3e150;
  undefined8 uStack_3e148;
  undefined8 uStack_3e140;
  undefined8 uStack_3e138;
  undefined8 uStack_3e130;
  undefined8 uStack_3e128;
  undefined8 uStack_3e120;
  undefined8 uStack_3e118;
  undefined8 uStack_3e110;
  ulong uStack_3e108;
  undefined8 uStack_3e0e0;
  undefined8 uStack_3dfc8;
  ulong uStack_3df40;
  undefined8 uStack_3df00;
  undefined8 uStack_3def8;
  undefined8 uStack_3def0;
  undefined8 uStack_3dee8;
  undefined8 uStack_3dee0;
  undefined8 uStack_3ded8;
  ulong uStack_3ded0;
  undefined8 uStack_3dec8;
  undefined8 uStack_3dec0;
  undefined8 uStack_3deb8;
  undefined8 uStack_3deb0;
  undefined8 uStack_3dea8;
  undefined8 uStack_3dea0;
  undefined8 uStack_3de98;
  undefined8 uStack_3de90;
  undefined8 uStack_3de88;
  undefined8 uStack_3de80;
  undefined8 uStack_3de78;
  ulong uStack_3de70;
  undefined8 uStack_3de68;
  undefined8 uStack_3de60;
  undefined8 uStack_3de58;
  undefined8 uStack_3de50;
  undefined8 uStack_3de48;
  undefined8 uStack_3de40;
  undefined8 uStack_3de38;
  undefined8 uStack_3de30;
  undefined8 uStack_3de28;
  ulong uStack_3de20;
  undefined8 uStack_3ddf0;
  undefined8 uStack_3dd58;
  ulong uStack_3dcd8;
  ulong uStack_3dc58;
  undefined8 uStack_3dc48;
  undefined8 uStack_3dc40;
  undefined8 uStack_3dc38;
  undefined8 uStack_3dc30;
  undefined8 uStack_3dc28;
  ulong uStack_3dc20;
  undefined8 uStack_3dc18;
  undefined8 uStack_3dc10;
  undefined8 uStack_3dc08;
  undefined8 uStack_3dc00;
  undefined8 uStack_3dbf8;
  undefined8 uStack_3dbf0;
  ulong uStack_3dbe8;
  undefined8 uStack_3dbe0;
  undefined8 uStack_3dbd8;
  undefined8 uStack_3dbd0;
  undefined8 uStack_3dbc8;
  undefined8 uStack_3dbc0;
  undefined8 uStack_3dbb8;
  undefined8 uStack_3dbb0;
  undefined8 uStack_3dba8;
  undefined8 uStack_3dba0;
  undefined8 uStack_3db98;
  undefined8 uStack_3db90;
  ulong uStack_3db88;
  undefined8 uStack_3db80;
  undefined8 uStack_3db78;
  undefined8 uStack_3db70;
  undefined8 uStack_3db68;
  undefined8 uStack_3db60;
  undefined8 uStack_3db58;
  undefined8 uStack_3db50;
  undefined8 uStack_3db48;
  undefined8 uStack_3db40;
  ulong uStack_3db38;
  undefined8 uStack_3db00;
  ulong uStack_3da68;
  undefined8 uStack_3da60;
  undefined8 uStack_3da58;
  undefined8 uStack_3da50;
  undefined8 uStack_3da48;
  undefined8 uStack_3da40;
  undefined8 uStack_3da38;
  undefined8 uStack_3da30;
  undefined8 uStack_3da28;
  undefined8 uStack_3da20;
  undefined8 uStack_3da18;
  undefined8 uStack_3da10;
  undefined8 uStack_3da08;
  undefined8 uStack_3da00;
  undefined8 uStack_3d9f8;
  ulong uStack_3d9f0;
  ulong uStack_3d970;
  undefined8 uStack_3d960;
  undefined8 uStack_3d958;
  undefined8 uStack_3d950;
  undefined8 uStack_3d948;
  undefined8 uStack_3d940;
  ulong uStack_3d938;
  undefined8 uStack_3d930;
  undefined8 uStack_3d928;
  undefined8 uStack_3d920;
  undefined8 uStack_3d918;
  undefined8 uStack_3d910;
  undefined8 uStack_3d908;
  ulong uStack_3d900;
  undefined8 uStack_3d8f8;
  undefined8 uStack_3d8f0;
  undefined8 uStack_3d8e8;
  undefined8 uStack_3d8e0;
  undefined8 uStack_3d8d8;
  undefined8 uStack_3d8d0;
  undefined8 uStack_3d8c8;
  undefined8 uStack_3d8c0;
  undefined8 uStack_3d8b8;
  undefined8 uStack_3d8b0;
  undefined8 uStack_3d8a8;
  ulong uStack_3d8a0;
  undefined8 uStack_3d898;
  undefined8 uStack_3d890;
  undefined8 uStack_3d888;
  undefined8 uStack_3d880;
  undefined8 uStack_3d878;
  undefined8 uStack_3d870;
  undefined8 uStack_3d868;
  undefined8 uStack_3d860;
  undefined8 uStack_3d858;
  ulong uStack_3d850;
  undefined8 uStack_3d810;
  undefined8 uStack_3d7e8;
  undefined8 uStack_3d7e0;
  undefined8 uStack_3d7d8;
  undefined8 uStack_3d7d0;
  undefined8 uStack_3d7c8;
  undefined8 uStack_3d7c0;
  undefined8 uStack_3d7b8;
  undefined8 uStack_3d7b0;
  undefined8 uStack_3d7a8;
  undefined8 uStack_3d7a0;
  undefined8 uStack_3d798;
  undefined8 uStack_3d790;
  undefined8 uStack_3d788;
  ulong uStack_3d780;
  undefined8 uStack_3d778;
  undefined8 uStack_3d770;
  undefined8 uStack_3d768;
  undefined8 uStack_3d760;
  undefined8 uStack_3d758;
  undefined8 uStack_3d750;
  undefined8 uStack_3d748;
  undefined8 uStack_3d740;
  undefined8 uStack_3d738;
  undefined8 uStack_3d730;
  undefined8 uStack_3d728;
  undefined8 uStack_3d720;
  undefined8 uStack_3d718;
  undefined8 uStack_3d710;
  ulong uStack_3d708;
  ulong uStack_3d688;
  undefined8 uStack_3d678;
  undefined8 uStack_3d670;
  undefined8 uStack_3d668;
  undefined8 uStack_3d660;
  undefined8 uStack_3d658;
  ulong uStack_3d650;
  undefined8 uStack_3d648;
  undefined8 uStack_3d640;
  undefined8 uStack_3d638;
  undefined8 uStack_3d630;
  undefined8 uStack_3d628;
  undefined8 uStack_3d620;
  ulong uStack_3d618;
  undefined8 uStack_3d610;
  undefined8 uStack_3d608;
  undefined8 uStack_3d600;
  undefined8 uStack_3d5f8;
  undefined8 uStack_3d5f0;
  undefined8 uStack_3d5e8;
  undefined8 uStack_3d5e0;
  undefined8 uStack_3d5d8;
  undefined8 uStack_3d5d0;
  undefined8 uStack_3d5c8;
  undefined8 uStack_3d5c0;
  ulong uStack_3d5b8;
  undefined8 uStack_3d520;
  undefined8 uStack_3d500;
  undefined8 uStack_3d4f8;
  undefined8 uStack_3d4f0;
  undefined8 uStack_3d4e8;
  undefined8 uStack_3d4e0;
  undefined8 uStack_3d4d8;
  undefined8 uStack_3d4d0;
  undefined8 uStack_3d4c8;
  undefined8 uStack_3d4c0;
  undefined8 uStack_3d4b8;
  undefined8 uStack_3d4b0;
  undefined8 uStack_3d4a8;
  undefined8 uStack_3d4a0;
  ulong uStack_3d498;
  undefined8 uStack_3d490;
  undefined8 uStack_3d488;
  undefined8 uStack_3d480;
  undefined8 uStack_3d478;
  undefined8 uStack_3d470;
  undefined8 uStack_3d468;
  undefined8 uStack_3d460;
  undefined8 uStack_3d458;
  undefined8 uStack_3d450;
  undefined8 uStack_3d448;
  undefined8 uStack_3d440;
  undefined8 uStack_3d438;
  undefined8 uStack_3d430;
  undefined8 uStack_3d428;
  ulong uStack_3d420;
  ulong uStack_3d3a0;
  undefined8 uStack_3d390;
  undefined8 uStack_3d388;
  undefined8 uStack_3d380;
  undefined8 uStack_3d378;
  undefined8 uStack_3d370;
  ulong uStack_3d368;
  undefined8 uStack_3d230;
  undefined8 uStack_3d218;
  undefined8 uStack_3d210;
  undefined8 uStack_3d208;
  undefined8 uStack_3d200;
  undefined8 uStack_3d1f8;
  undefined8 uStack_3d1f0;
  undefined8 uStack_3d1e8;
  undefined8 uStack_3d1e0;
  undefined8 uStack_3d1d8;
  undefined8 uStack_3d1d0;
  undefined8 uStack_3d1c8;
  undefined8 uStack_3d1c0;
  undefined8 uStack_3d1b8;
  ulong uStack_3d1b0;
  ulong uStack_3d0b8;
  undefined8 uStack_3d078;
  undefined8 uStack_3d070;
  undefined8 uStack_3d068;
  undefined8 uStack_3d060;
  undefined8 uStack_3d058;
  undefined8 uStack_3d050;
  ulong uStack_3d048;
  undefined8 uStack_3cfe0;
  undefined8 uStack_3cfd8;
  undefined8 uStack_3cfd0;
  undefined8 uStack_3cfc8;
  undefined8 uStack_3cfc0;
  undefined8 uStack_3cfb8;
  undefined8 uStack_3cfb0;
  undefined8 uStack_3cfa8;
  undefined8 uStack_3cfa0;
  ulong uStack_3cf98;
  undefined8 uStack_3cf40;
  undefined8 uStack_3cec0;
  undefined8 uStack_3ceb8;
  undefined8 uStack_3ceb0;
  undefined8 uStack_3cea8;
  undefined8 uStack_3cea0;
  undefined8 uStack_3ce98;
  undefined8 uStack_3ce90;
  undefined8 uStack_3ce88;
  undefined8 uStack_3ce80;
  undefined8 uStack_3ce78;
  undefined8 uStack_3ce70;
  undefined8 uStack_3ce68;
  undefined8 uStack_3ce60;
  undefined8 uStack_3ce58;
  ulong uStack_3ce50;
  ulong uStack_3cdd0;
  undefined8 uStack_3cd90;
  undefined8 uStack_3cd88;
  undefined8 uStack_3cd80;
  undefined8 uStack_3cd78;
  undefined8 uStack_3cd70;
  undefined8 uStack_3cd68;
  ulong uStack_3cd60;
  undefined8 uStack_3cd58;
  undefined8 uStack_3cd50;
  undefined8 uStack_3cd48;
  undefined8 uStack_3cd40;
  undefined8 uStack_3cd38;
  undefined8 uStack_3cd30;
  undefined8 uStack_3cd28;
  undefined8 uStack_3cd20;
  undefined8 uStack_3cd18;
  undefined8 uStack_3cd10;
  undefined8 uStack_3cd08;
  ulong uStack_3cd00;
  undefined8 uStack_3ccf8;
  undefined8 uStack_3ccf0;
  undefined8 uStack_3cce8;
  undefined8 uStack_3cce0;
  undefined8 uStack_3ccd8;
  undefined8 uStack_3ccd0;
  undefined8 uStack_3ccc8;
  undefined8 uStack_3ccc0;
  undefined8 uStack_3ccb8;
  ulong uStack_3ccb0;
  ulong uStack_3cc50;
  undefined8 uStack_3cc48;
  undefined8 uStack_3cc40;
  undefined8 uStack_3cc38;
  undefined8 uStack_3cc30;
  undefined8 uStack_3cc28;
  undefined8 uStack_3cc20;
  undefined8 uStack_3cc18;
  undefined8 uStack_3cc10;
  undefined8 uStack_3cc08;
  undefined8 uStack_3cc00;
  undefined8 uStack_3cbf8;
  undefined8 uStack_3cbf0;
  undefined8 uStack_3cbe8;
  ulong uStack_3cbe0;
  undefined8 uStack_3cbd8;
  undefined8 uStack_3cbd0;
  undefined8 uStack_3cbc8;
  undefined8 uStack_3cbc0;
  undefined8 uStack_3cbb8;
  undefined8 uStack_3cbb0;
  undefined8 uStack_3cba8;
  undefined8 uStack_3cba0;
  undefined8 uStack_3cb98;
  undefined8 uStack_3cb90;
  undefined8 uStack_3cb88;
  undefined8 uStack_3cb80;
  undefined8 uStack_3cb78;
  undefined8 uStack_3cb70;
  ulong uStack_3cb68;
  ulong uStack_3cae8;
  undefined8 uStack_3cad8;
  undefined8 uStack_3cad0;
  undefined8 uStack_3cac8;
  undefined8 uStack_3cac0;
  undefined8 uStack_3cab8;
  ulong uStack_3cab0;
  undefined8 uStack_3caa8;
  undefined8 uStack_3caa0;
  undefined8 uStack_3ca98;
  undefined8 uStack_3ca90;
  undefined8 uStack_3ca88;
  undefined8 uStack_3ca80;
  ulong uStack_3ca78;
  undefined8 uStack_3ca70;
  undefined8 uStack_3ca68;
  undefined8 uStack_3ca60;
  undefined8 uStack_3ca58;
  undefined8 uStack_3ca50;
  undefined8 uStack_3ca48;
  undefined8 uStack_3ca40;
  undefined8 uStack_3ca38;
  undefined8 uStack_3ca30;
  undefined8 uStack_3ca28;
  undefined8 uStack_3ca20;
  ulong uStack_3ca18;
  undefined8 uStack_3ca10;
  undefined8 uStack_3ca08;
  undefined8 uStack_3ca00;
  undefined8 uStack_3c9f8;
  undefined8 uStack_3c9f0;
  undefined8 uStack_3c9e8;
  undefined8 uStack_3c9e0;
  undefined8 uStack_3c9d8;
  undefined8 uStack_3c9d0;
  ulong uStack_3c9c8;
  undefined8 uStack_3c9c0;
  undefined8 uStack_3c9b8;
  undefined8 uStack_3c9b0;
  undefined8 uStack_3c9a8;
  undefined8 uStack_3c9a0;
  undefined8 uStack_3c998;
  undefined8 uStack_3c990;
  undefined8 uStack_3c988;
  undefined8 uStack_3c980;
  undefined8 uStack_3c978;
  undefined8 uStack_3c970;
  ulong uStack_3c968;
  undefined8 uStack_3c960;
  undefined8 uStack_3c958;
  undefined8 uStack_3c950;
  undefined8 uStack_3c948;
  undefined8 uStack_3c940;
  undefined8 uStack_3c938;
  undefined8 uStack_3c930;
  undefined8 uStack_3c928;
  undefined8 uStack_3c920;
  undefined8 uStack_3c918;
  undefined8 uStack_3c910;
  undefined8 uStack_3c908;
  undefined8 uStack_3c900;
  ulong uStack_3c8f8;
  undefined8 uStack_3c8f0;
  undefined8 uStack_3c8e8;
  undefined8 uStack_3c8e0;
  undefined8 uStack_3c8d8;
  undefined8 uStack_3c8d0;
  undefined8 uStack_3c8c8;
  undefined8 uStack_3c8c0;
  undefined8 uStack_3c8b8;
  undefined8 uStack_3c8b0;
  undefined8 uStack_3c8a8;
  undefined8 uStack_3c8a0;
  undefined8 uStack_3c898;
  undefined8 uStack_3c890;
  undefined8 uStack_3c888;
  ulong uStack_3c880;
  ulong uStack_3c800;
  undefined8 uStack_3c7f0;
  undefined8 uStack_3c7e8;
  undefined8 uStack_3c7e0;
  undefined8 uStack_3c7d8;
  undefined8 uStack_3c7d0;
  ulong uStack_3c7c8;
  undefined8 uStack_3c7c0;
  undefined8 uStack_3c7b8;
  undefined8 uStack_3c7b0;
  undefined8 uStack_3c7a8;
  undefined8 uStack_3c7a0;
  undefined8 uStack_3c798;
  ulong uStack_3c790;
  undefined8 uStack_3c788;
  undefined8 uStack_3c780;
  undefined8 uStack_3c778;
  undefined8 uStack_3c770;
  undefined8 uStack_3c768;
  undefined8 uStack_3c760;
  undefined8 uStack_3c758;
  undefined8 uStack_3c750;
  undefined8 uStack_3c748;
  undefined8 uStack_3c740;
  undefined8 uStack_3c738;
  ulong uStack_3c730;
  undefined8 uStack_3c6d8;
  undefined8 uStack_3c6d0;
  undefined8 uStack_3c6c8;
  undefined8 uStack_3c6c0;
  undefined8 uStack_3c6b8;
  undefined8 uStack_3c6b0;
  undefined8 uStack_3c6a8;
  undefined8 uStack_3c6a0;
  undefined8 uStack_3c698;
  undefined8 uStack_3c690;
  undefined8 uStack_3c688;
  ulong uStack_3c680;
  undefined8 uStack_3c678;
  undefined8 uStack_3c670;
  undefined8 uStack_3c668;
  undefined8 uStack_3c660;
  undefined8 uStack_3c658;
  undefined8 uStack_3c650;
  undefined8 uStack_3c648;
  undefined8 uStack_3c640;
  undefined8 uStack_3c638;
  undefined8 uStack_3c630;
  undefined8 uStack_3c628;
  undefined8 uStack_3c620;
  undefined8 uStack_3c618;
  ulong uStack_3c610;
  undefined8 uStack_3c608;
  undefined8 uStack_3c600;
  undefined8 uStack_3c5f8;
  undefined8 uStack_3c5f0;
  undefined8 uStack_3c5e8;
  undefined8 uStack_3c5e0;
  undefined8 uStack_3c5d8;
  undefined8 uStack_3c5d0;
  undefined8 uStack_3c5c8;
  undefined8 uStack_3c5c0;
  undefined8 uStack_3c5b8;
  undefined8 uStack_3c5b0;
  undefined8 uStack_3c5a8;
  undefined8 uStack_3c5a0;
  ulong uStack_3c598;
  ulong uStack_3c518;
  undefined8 uStack_3c508;
  undefined8 uStack_3c500;
  undefined8 uStack_3c4f8;
  undefined8 uStack_3c4f0;
  undefined8 uStack_3c4e8;
  ulong uStack_3c4e0;
  undefined8 uStack_3c3f0;
  undefined8 uStack_3c3e8;
  undefined8 uStack_3c3e0;
  undefined8 uStack_3c3d8;
  undefined8 uStack_3c3d0;
  undefined8 uStack_3c3c8;
  undefined8 uStack_3c3c0;
  undefined8 uStack_3c3b8;
  undefined8 uStack_3c3b0;
  undefined8 uStack_3c3a8;
  undefined8 uStack_3c3a0;
  ulong uStack_3c398;
  undefined8 uStack_3c390;
  undefined8 uStack_3c388;
  undefined8 uStack_3c380;
  undefined8 uStack_3c378;
  undefined8 uStack_3c370;
  undefined8 uStack_3c368;
  undefined8 uStack_3c360;
  undefined8 uStack_3c358;
  undefined8 uStack_3c350;
  undefined8 uStack_3c348;
  undefined8 uStack_3c340;
  undefined8 uStack_3c338;
  undefined8 uStack_3c330;
  ulong uStack_3c328;
  ulong uStack_3c230;
  undefined8 uStack_3c1f0;
  undefined8 uStack_3c1e8;
  undefined8 uStack_3c1e0;
  undefined8 uStack_3c1d8;
  undefined8 uStack_3c1d0;
  undefined8 uStack_3c1c8;
  ulong uStack_3c1c0;
  undefined8 uStack_3c158;
  undefined8 uStack_3c150;
  undefined8 uStack_3c148;
  undefined8 uStack_3c140;
  undefined8 uStack_3c138;
  undefined8 uStack_3c130;
  undefined8 uStack_3c128;
  undefined8 uStack_3c120;
  undefined8 uStack_3c118;
  ulong uStack_3c110;
  undefined8 uStack_3c108;
  undefined8 uStack_3c100;
  undefined8 uStack_3c0f8;
  undefined8 uStack_3c0f0;
  undefined8 uStack_3c0e8;
  undefined8 uStack_3c0e0;
  undefined8 uStack_3c0d8;
  undefined8 uStack_3c0d0;
  undefined8 uStack_3c0c8;
  undefined8 uStack_3c0c0;
  undefined8 uStack_3c0b8;
  ulong uStack_3c0b0;
  undefined8 uStack_3c038;
  undefined8 uStack_3c030;
  undefined8 uStack_3c028;
  undefined8 uStack_3c020;
  undefined8 uStack_3c018;
  undefined8 uStack_3c010;
  undefined8 uStack_3c008;
  undefined8 uStack_3c000;
  undefined8 uStack_3bff8;
  undefined8 uStack_3bff0;
  undefined8 uStack_3bfe8;
  undefined8 uStack_3bfe0;
  undefined8 uStack_3bfd8;
  undefined8 uStack_3bfd0;
  ulong uStack_3bfc8;
  ulong uStack_3bf48;
  undefined8 uStack_3bf08;
  undefined8 uStack_3bf00;
  undefined8 uStack_3bef8;
  undefined8 uStack_3bef0;
  undefined8 uStack_3bee8;
  undefined8 uStack_3bee0;
  ulong uStack_3bed8;
  undefined8 uStack_3bed0;
  undefined8 uStack_3bec8;
  undefined8 uStack_3bec0;
  undefined8 uStack_3beb8;
  undefined8 uStack_3beb0;
  undefined8 uStack_3bea8;
  undefined8 uStack_3bea0;
  undefined8 uStack_3be98;
  undefined8 uStack_3be90;
  undefined8 uStack_3be88;
  undefined8 uStack_3be80;
  ulong uStack_3be78;
  undefined8 uStack_3be70;
  undefined8 uStack_3be68;
  undefined8 uStack_3be60;
  undefined8 uStack_3be58;
  undefined8 uStack_3be50;
  undefined8 uStack_3be48;
  undefined8 uStack_3be40;
  undefined8 uStack_3be38;
  undefined8 uStack_3be30;
  ulong uStack_3be28;
  undefined8 uStack_3be20;
  undefined8 uStack_3be18;
  undefined8 uStack_3be10;
  undefined8 uStack_3be08;
  undefined8 uStack_3be00;
  undefined8 uStack_3bdf8;
  undefined8 uStack_3bdf0;
  undefined8 uStack_3bde8;
  undefined8 uStack_3bde0;
  undefined8 uStack_3bdd8;
  undefined8 uStack_3bdd0;
  ulong uStack_3bdc8;
  undefined8 uStack_3bdc0;
  undefined8 uStack_3bdb8;
  undefined8 uStack_3bdb0;
  undefined8 uStack_3bda8;
  undefined8 uStack_3bda0;
  undefined8 uStack_3bd98;
  undefined8 uStack_3bd90;
  undefined8 uStack_3bd88;
  undefined8 uStack_3bd80;
  undefined8 uStack_3bd78;
  undefined8 uStack_3bd70;
  undefined8 uStack_3bd68;
  undefined8 uStack_3bd60;
  ulong uStack_3bd58;
  undefined8 uStack_3bd50;
  undefined8 uStack_3bd48;
  undefined8 uStack_3bd40;
  undefined8 uStack_3bd38;
  undefined8 uStack_3bd30;
  undefined8 uStack_3bd28;
  undefined8 uStack_3bd20;
  undefined8 uStack_3bd18;
  undefined8 uStack_3bd10;
  undefined8 uStack_3bd08;
  undefined8 uStack_3bd00;
  undefined8 uStack_3bcf8;
  undefined8 uStack_3bcf0;
  undefined8 uStack_3bce8;
  ulong uStack_3bce0;
  ulong uStack_3bc60;
  undefined8 uStack_3bc50;
  undefined8 uStack_3bc48;
  undefined8 uStack_3bc40;
  undefined8 uStack_3bc38;
  undefined8 uStack_3bc30;
  ulong uStack_3bc28;
  undefined8 uStack_3bc20;
  undefined8 uStack_3bc18;
  undefined8 uStack_3bc10;
  undefined8 uStack_3bc08;
  undefined8 uStack_3bc00;
  undefined8 uStack_3bbf8;
  ulong uStack_3bbf0;
  undefined8 uStack_3bbe8;
  undefined8 uStack_3bbe0;
  undefined8 uStack_3bbd8;
  undefined8 uStack_3bbd0;
  undefined8 uStack_3bbc8;
  undefined8 uStack_3bbc0;
  undefined8 uStack_3bbb8;
  undefined8 uStack_3bbb0;
  undefined8 uStack_3bba8;
  undefined8 uStack_3bba0;
  undefined8 uStack_3bb98;
  ulong uStack_3bb90;
  undefined8 uStack_3bb38;
  undefined8 uStack_3bb30;
  undefined8 uStack_3bb28;
  undefined8 uStack_3bb20;
  undefined8 uStack_3bb18;
  undefined8 uStack_3bb10;
  undefined8 uStack_3bb08;
  undefined8 uStack_3bb00;
  undefined8 uStack_3baf8;
  undefined8 uStack_3baf0;
  undefined8 uStack_3bae8;
  ulong uStack_3bae0;
  undefined8 uStack_3bad8;
  undefined8 uStack_3bad0;
  undefined8 uStack_3bac8;
  undefined8 uStack_3bac0;
  undefined8 uStack_3bab8;
  undefined8 uStack_3bab0;
  undefined8 uStack_3baa8;
  undefined8 uStack_3baa0;
  undefined8 uStack_3ba98;
  undefined8 uStack_3ba90;
  undefined8 uStack_3ba88;
  undefined8 uStack_3ba80;
  undefined8 uStack_3ba78;
  ulong uStack_3ba70;
  undefined8 uStack_3ba68;
  undefined8 uStack_3ba60;
  undefined8 uStack_3ba58;
  undefined8 uStack_3ba50;
  undefined8 uStack_3ba48;
  undefined8 uStack_3ba40;
  undefined8 uStack_3ba38;
  undefined8 uStack_3ba30;
  undefined8 uStack_3ba28;
  undefined8 uStack_3ba20;
  undefined8 uStack_3ba18;
  undefined8 uStack_3ba10;
  undefined8 uStack_3ba08;
  undefined8 uStack_3ba00;
  ulong uStack_3b9f8;
  ulong uStack_3b978;
  undefined8 uStack_3b968;
  undefined8 uStack_3b960;
  undefined8 uStack_3b958;
  undefined8 uStack_3b950;
  undefined8 uStack_3b948;
  ulong uStack_3b940;
  undefined8 uStack_3b850;
  undefined8 uStack_3b848;
  undefined8 uStack_3b840;
  undefined8 uStack_3b838;
  undefined8 uStack_3b830;
  undefined8 uStack_3b828;
  undefined8 uStack_3b820;
  undefined8 uStack_3b818;
  undefined8 uStack_3b810;
  undefined8 uStack_3b808;
  undefined8 uStack_3b800;
  ulong uStack_3b7f8;
  undefined8 uStack_3b7f0;
  undefined8 uStack_3b7e8;
  undefined8 uStack_3b7e0;
  undefined8 uStack_3b7d8;
  undefined8 uStack_3b7d0;
  undefined8 uStack_3b7c8;
  undefined8 uStack_3b7c0;
  undefined8 uStack_3b7b8;
  undefined8 uStack_3b7b0;
  undefined8 uStack_3b7a8;
  undefined8 uStack_3b7a0;
  undefined8 uStack_3b798;
  undefined8 uStack_3b790;
  ulong uStack_3b788;
  ulong uStack_3b690;
  undefined8 uStack_3b650;
  undefined8 uStack_3b648;
  undefined8 uStack_3b640;
  undefined8 uStack_3b638;
  undefined8 uStack_3b630;
  undefined8 uStack_3b628;
  ulong uStack_3b620;
  undefined8 uStack_3b5b8;
  undefined8 uStack_3b5b0;
  undefined8 uStack_3b5a8;
  undefined8 uStack_3b5a0;
  undefined8 uStack_3b598;
  undefined8 uStack_3b590;
  undefined8 uStack_3b588;
  undefined8 uStack_3b580;
  undefined8 uStack_3b578;
  ulong uStack_3b570;
  undefined8 uStack_3b568;
  undefined8 uStack_3b560;
  undefined8 uStack_3b558;
  undefined8 uStack_3b550;
  undefined8 uStack_3b548;
  undefined8 uStack_3b540;
  undefined8 uStack_3b538;
  undefined8 uStack_3b530;
  undefined8 uStack_3b528;
  undefined8 uStack_3b520;
  undefined8 uStack_3b518;
  ulong uStack_3b510;
  undefined8 uStack_3b498;
  undefined8 uStack_3b490;
  undefined8 uStack_3b488;
  undefined8 uStack_3b480;
  undefined8 uStack_3b478;
  undefined8 uStack_3b470;
  undefined8 uStack_3b468;
  undefined8 uStack_3b460;
  undefined8 uStack_3b458;
  undefined8 uStack_3b450;
  undefined8 uStack_3b448;
  undefined8 uStack_3b440;
  undefined8 uStack_3b438;
  undefined8 uStack_3b430;
  ulong uStack_3b428;
  ulong uStack_3b3a8;
  undefined8 uStack_3b368;
  undefined8 uStack_3b360;
  undefined8 uStack_3b358;
  undefined8 uStack_3b350;
  undefined8 uStack_3b348;
  undefined8 uStack_3b340;
  ulong uStack_3b338;
  undefined8 uStack_3b330;
  undefined8 uStack_3b328;
  undefined8 uStack_3b320;
  undefined8 uStack_3b318;
  undefined8 uStack_3b310;
  undefined8 uStack_3b308;
  undefined8 uStack_3b300;
  undefined8 uStack_3b2f8;
  undefined8 uStack_3b2f0;
  undefined8 uStack_3b2e8;
  undefined8 uStack_3b2e0;
  ulong uStack_3b2d8;
  undefined8 uStack_3b280;
  undefined8 uStack_3b278;
  undefined8 uStack_3b270;
  undefined8 uStack_3b268;
  undefined8 uStack_3b260;
  undefined8 uStack_3b258;
  undefined8 uStack_3b250;
  undefined8 uStack_3b248;
  undefined8 uStack_3b240;
  undefined8 uStack_3b238;
  undefined8 uStack_3b230;
  ulong uStack_3b228;
  undefined8 uStack_3b220;
  undefined8 uStack_3b218;
  undefined8 uStack_3b210;
  undefined8 uStack_3b208;
  undefined8 uStack_3b200;
  undefined8 uStack_3b1f8;
  undefined8 uStack_3b1f0;
  undefined8 uStack_3b1e8;
  undefined8 uStack_3b1e0;
  undefined8 uStack_3b1d8;
  undefined8 uStack_3b1d0;
  undefined8 uStack_3b1c8;
  undefined8 uStack_3b1c0;
  ulong uStack_3b1b8;
  undefined8 uStack_3b1b0;
  undefined8 uStack_3b1a8;
  undefined8 uStack_3b1a0;
  undefined8 uStack_3b198;
  undefined8 uStack_3b190;
  undefined8 uStack_3b188;
  undefined8 uStack_3b180;
  undefined8 uStack_3b178;
  undefined8 uStack_3b170;
  undefined8 uStack_3b168;
  undefined8 uStack_3b160;
  undefined8 uStack_3b158;
  undefined8 uStack_3b150;
  undefined8 uStack_3b148;
  ulong uStack_3b140;
  ulong uStack_3b0c0;
  undefined8 uStack_3b0b0;
  undefined8 uStack_3b0a8;
  undefined8 uStack_3b0a0;
  undefined8 uStack_3b098;
  undefined8 uStack_3b090;
  ulong uStack_3b088;
  undefined8 uStack_3af98;
  undefined8 uStack_3af90;
  undefined8 uStack_3af88;
  undefined8 uStack_3af80;
  undefined8 uStack_3af78;
  undefined8 uStack_3af70;
  undefined8 uStack_3af68;
  undefined8 uStack_3af60;
  undefined8 uStack_3af58;
  undefined8 uStack_3af50;
  undefined8 uStack_3af48;
  ulong uStack_3af40;
  undefined8 uStack_3af38;
  undefined8 uStack_3af30;
  undefined8 uStack_3af28;
  undefined8 uStack_3af20;
  undefined8 uStack_3af18;
  undefined8 uStack_3af10;
  undefined8 uStack_3af08;
  undefined8 uStack_3af00;
  undefined8 uStack_3aef8;
  undefined8 uStack_3aef0;
  undefined8 uStack_3aee8;
  undefined8 uStack_3aee0;
  undefined8 uStack_3aed8;
  ulong uStack_3aed0;
  ulong uStack_3add8;
  undefined8 uStack_3ad98;
  undefined8 uStack_3ad90;
  undefined8 uStack_3ad88;
  undefined8 uStack_3ad80;
  undefined8 uStack_3ad78;
  undefined8 uStack_3ad70;
  ulong uStack_3ad68;
  undefined8 uStack_3acb0;
  undefined8 uStack_3aca8;
  undefined8 uStack_3aca0;
  undefined8 uStack_3ac98;
  undefined8 uStack_3ac90;
  undefined8 uStack_3ac88;
  undefined8 uStack_3ac80;
  undefined8 uStack_3ac78;
  undefined8 uStack_3ac70;
  undefined8 uStack_3ac68;
  undefined8 uStack_3ac60;
  ulong uStack_3ac58;
  undefined8 uStack_3abe0;
  undefined8 uStack_3abd8;
  undefined8 uStack_3abd0;
  undefined8 uStack_3abc8;
  undefined8 uStack_3abc0;
  undefined8 uStack_3abb8;
  undefined8 uStack_3abb0;
  undefined8 uStack_3aba8;
  undefined8 uStack_3aba0;
  undefined8 uStack_3ab98;
  undefined8 uStack_3ab90;
  undefined8 uStack_3ab88;
  undefined8 uStack_3ab80;
  undefined8 uStack_3ab78;
  ulong uStack_3ab70;
  ulong uStack_3aaf0;
  undefined8 uStack_3a9c8;
  undefined8 uStack_3a9c0;
  undefined8 uStack_3a9b8;
  undefined8 uStack_3a9b0;
  undefined8 uStack_3a9a8;
  undefined8 uStack_3a9a0;
  undefined8 uStack_3a998;
  undefined8 uStack_3a990;
  undefined8 uStack_3a988;
  undefined8 uStack_3a980;
  undefined8 uStack_3a978;
  ulong uStack_3a970;
  undefined8 uStack_3a968;
  undefined8 uStack_3a960;
  undefined8 uStack_3a958;
  undefined8 uStack_3a950;
  undefined8 uStack_3a948;
  undefined8 uStack_3a940;
  undefined8 uStack_3a938;
  undefined8 uStack_3a930;
  undefined8 uStack_3a928;
  undefined8 uStack_3a920;
  undefined8 uStack_3a918;
  undefined8 uStack_3a910;
  undefined8 uStack_3a908;
  ulong uStack_3a900;
  undefined8 uStack_3a730;
  undefined8 uStack_3a728;
  undefined8 uStack_3a720;
  undefined8 uStack_3a718;
  undefined8 uStack_3a710;
  undefined8 uStack_3a708;
  undefined8 uStack_3a700;
  undefined8 uStack_3a6f8;
  undefined8 uStack_3a6f0;
  ulong uStack_3a6e8;
  undefined8 uStack_3a610;
  undefined8 uStack_3a608;
  undefined8 uStack_3a600;
  undefined8 uStack_3a5f8;
  undefined8 uStack_3a5f0;
  undefined8 uStack_3a5e8;
  undefined8 uStack_3a5e0;
  undefined8 uStack_3a5d8;
  undefined8 uStack_3a5d0;
  undefined8 uStack_3a5c8;
  undefined8 uStack_3a5c0;
  undefined8 uStack_3a5b8;
  undefined8 uStack_3a5b0;
  undefined8 uStack_3a5a8;
  ulong uStack_3a5a0;
  undefined8 uStack_3a598;
  undefined8 uStack_3a4a8;
  undefined8 uStack_3a4a0;
  undefined8 uStack_3a498;
  undefined8 uStack_3a490;
  undefined8 uStack_3a488;
  undefined8 uStack_3a480;
  undefined8 uStack_3a478;
  undefined8 uStack_3a470;
  undefined8 uStack_3a468;
  undefined8 uStack_3a460;
  undefined8 uStack_3a458;
  ulong uStack_3a450;
  undefined8 uStack_3a448;
  undefined8 uStack_3a440;
  undefined8 uStack_3a438;
  undefined8 uStack_3a430;
  undefined8 uStack_3a428;
  undefined8 uStack_3a420;
  undefined8 uStack_3a418;
  undefined8 uStack_3a410;
  undefined8 uStack_3a408;
  ulong uStack_3a400;
  undefined8 uStack_3a398;
  undefined8 uStack_3a390;
  undefined8 uStack_3a388;
  undefined8 uStack_3a380;
  undefined8 uStack_3a378;
  undefined8 uStack_3a370;
  undefined8 uStack_3a368;
  undefined8 uStack_3a360;
  undefined8 uStack_3a358;
  undefined8 uStack_3a350;
  undefined8 uStack_3a348;
  undefined8 uStack_3a340;
  undefined8 uStack_3a338;
  ulong uStack_3a330;
  undefined8 uStack_3a328;
  undefined8 uStack_3a320;
  undefined8 uStack_3a318;
  undefined8 uStack_3a310;
  undefined8 uStack_3a308;
  undefined8 uStack_3a300;
  undefined8 uStack_3a2f8;
  undefined8 uStack_3a2f0;
  undefined8 uStack_3a2e8;
  undefined8 uStack_3a2e0;
  undefined8 uStack_3a2d8;
  undefined8 uStack_3a2d0;
  undefined8 uStack_3a2c8;
  undefined8 uStack_3a2c0;
  ulong uStack_3a2b8;
  undefined8 uStack_3a2a8;
  undefined8 uStack_3a228;
  undefined8 uStack_3a220;
  undefined8 uStack_3a218;
  undefined8 uStack_3a210;
  undefined8 uStack_3a208;
  ulong uStack_3a200;
  undefined8 uStack_3a1c0;
  undefined8 uStack_3a1b8;
  undefined8 uStack_3a1b0;
  undefined8 uStack_3a1a8;
  undefined8 uStack_3a1a0;
  undefined8 uStack_3a198;
  undefined8 uStack_3a190;
  undefined8 uStack_3a188;
  undefined8 uStack_3a180;
  undefined8 uStack_3a178;
  undefined8 uStack_3a170;
  ulong uStack_3a168;
  undefined8 uStack_3a160;
  undefined8 uStack_3a158;
  undefined8 uStack_3a150;
  undefined8 uStack_3a148;
  undefined8 uStack_3a140;
  undefined8 uStack_3a138;
  undefined8 uStack_3a130;
  undefined8 uStack_3a128;
  undefined8 uStack_3a120;
  ulong uStack_3a118;
  undefined8 uStack_3a0b0;
  undefined8 uStack_3a0a8;
  undefined8 uStack_3a0a0;
  undefined8 uStack_3a098;
  undefined8 uStack_3a090;
  undefined8 uStack_3a088;
  undefined8 uStack_3a080;
  undefined8 uStack_3a078;
  undefined8 uStack_3a070;
  undefined8 uStack_3a068;
  undefined8 uStack_3a060;
  undefined8 uStack_3a058;
  undefined8 uStack_3a050;
  ulong uStack_3a048;
  undefined8 uStack_3a040;
  undefined8 uStack_3a038;
  undefined8 uStack_3a030;
  undefined8 uStack_3a028;
  undefined8 uStack_3a020;
  undefined8 uStack_3a018;
  undefined8 uStack_3a010;
  undefined8 uStack_3a008;
  undefined8 uStack_3a000;
  undefined8 uStack_39ff8;
  undefined8 uStack_39ff0;
  undefined8 uStack_39fe8;
  undefined8 uStack_39fe0;
  undefined8 uStack_39fd8;
  ulong uStack_39fd0;
  undefined8 uStack_39fb8;
  undefined8 uStack_39f40;
  undefined8 uStack_39f38;
  undefined8 uStack_39f30;
  undefined8 uStack_39f28;
  undefined8 uStack_39f20;
  ulong uStack_39f18;
  undefined8 uStack_39ed8;
  undefined8 uStack_39ed0;
  undefined8 uStack_39ec8;
  undefined8 uStack_39ec0;
  undefined8 uStack_39eb8;
  undefined8 uStack_39eb0;
  undefined8 uStack_39ea8;
  undefined8 uStack_39ea0;
  undefined8 uStack_39e98;
  undefined8 uStack_39e90;
  undefined8 uStack_39e88;
  ulong uStack_39e80;
  undefined8 uStack_39e78;
  undefined8 uStack_39e70;
  undefined8 uStack_39e68;
  undefined8 uStack_39e60;
  undefined8 uStack_39e58;
  undefined8 uStack_39e50;
  undefined8 uStack_39e48;
  undefined8 uStack_39e40;
  undefined8 uStack_39e38;
  ulong uStack_39e30;
  undefined8 uStack_39dc8;
  undefined8 uStack_39dc0;
  undefined8 uStack_39db8;
  undefined8 uStack_39db0;
  undefined8 uStack_39da8;
  undefined8 uStack_39da0;
  undefined8 uStack_39d98;
  undefined8 uStack_39d90;
  undefined8 uStack_39d88;
  undefined8 uStack_39d80;
  undefined8 uStack_39d78;
  undefined8 uStack_39d70;
  undefined8 uStack_39d68;
  ulong uStack_39d60;
  undefined8 uStack_39d58;
  undefined8 uStack_39d50;
  undefined8 uStack_39d48;
  undefined8 uStack_39d40;
  undefined8 uStack_39d38;
  undefined8 uStack_39d30;
  undefined8 uStack_39d28;
  undefined8 uStack_39d20;
  undefined8 uStack_39d18;
  undefined8 uStack_39d10;
  undefined8 uStack_39d08;
  undefined8 uStack_39d00;
  undefined8 uStack_39cf8;
  undefined8 uStack_39cf0;
  ulong uStack_39ce8;
  undefined8 uStack_39cc8;
  undefined8 uStack_39c58;
  undefined8 uStack_39c50;
  undefined8 uStack_39c48;
  undefined8 uStack_39c40;
  undefined8 uStack_39c38;
  ulong uStack_39c30;
  undefined8 uStack_39bf0;
  undefined8 uStack_39be8;
  undefined8 uStack_39be0;
  undefined8 uStack_39bd8;
  undefined8 uStack_39bd0;
  undefined8 uStack_39bc8;
  undefined8 uStack_39bc0;
  undefined8 uStack_39bb8;
  undefined8 uStack_39bb0;
  undefined8 uStack_39ba8;
  undefined8 uStack_39ba0;
  ulong uStack_39b98;
  undefined8 uStack_39b90;
  undefined8 uStack_39b88;
  undefined8 uStack_39b80;
  undefined8 uStack_39b78;
  undefined8 uStack_39b70;
  undefined8 uStack_39b68;
  undefined8 uStack_39b60;
  undefined8 uStack_39b58;
  undefined8 uStack_39b50;
  ulong uStack_39b48;
  undefined8 uStack_39ae0;
  undefined8 uStack_39ad8;
  undefined8 uStack_39ad0;
  undefined8 uStack_39ac8;
  undefined8 uStack_39ac0;
  undefined8 uStack_39ab8;
  undefined8 uStack_39ab0;
  undefined8 uStack_39aa8;
  undefined8 uStack_39aa0;
  undefined8 uStack_39a98;
  undefined8 uStack_39a90;
  undefined8 uStack_39a88;
  undefined8 uStack_39a80;
  ulong uStack_39a78;
  undefined8 uStack_39a70;
  undefined8 uStack_39a68;
  undefined8 uStack_39a60;
  undefined8 uStack_39a58;
  undefined8 uStack_39a50;
  undefined8 uStack_39a48;
  undefined8 uStack_39a40;
  undefined8 uStack_39a38;
  undefined8 uStack_39a30;
  undefined8 uStack_39a28;
  undefined8 uStack_39a20;
  undefined8 uStack_39a18;
  undefined8 uStack_39a10;
  undefined8 uStack_39a08;
  ulong uStack_39a00;
  undefined8 uStack_399d8;
  undefined8 uStack_39970;
  undefined8 uStack_39968;
  undefined8 uStack_39960;
  undefined8 uStack_39958;
  undefined8 uStack_39950;
  ulong uStack_39948;
  undefined8 uStack_39908;
  undefined8 uStack_39900;
  undefined8 uStack_398f8;
  undefined8 uStack_398f0;
  undefined8 uStack_398e8;
  undefined8 uStack_398e0;
  undefined8 uStack_398d8;
  undefined8 uStack_398d0;
  undefined8 uStack_398c8;
  undefined8 uStack_398c0;
  undefined8 uStack_398b8;
  ulong uStack_398b0;
  undefined8 uStack_397f8;
  undefined8 uStack_397f0;
  undefined8 uStack_397e8;
  undefined8 uStack_397e0;
  undefined8 uStack_397d8;
  undefined8 uStack_397d0;
  undefined8 uStack_397c8;
  undefined8 uStack_397c0;
  undefined8 uStack_397b8;
  undefined8 uStack_397b0;
  undefined8 uStack_397a8;
  undefined8 uStack_397a0;
  undefined8 uStack_39798;
  ulong uStack_39790;
  undefined8 uStack_39788;
  undefined8 uStack_39780;
  undefined8 uStack_39778;
  undefined8 uStack_39770;
  undefined8 uStack_39768;
  undefined8 uStack_39760;
  undefined8 uStack_39758;
  undefined8 uStack_39750;
  undefined8 uStack_39748;
  undefined8 uStack_39740;
  undefined8 uStack_39738;
  undefined8 uStack_39730;
  undefined8 uStack_39728;
  undefined8 uStack_39720;
  ulong uStack_39718;
  undefined8 uStack_396e8;
  undefined8 uStack_39688;
  undefined8 uStack_39680;
  undefined8 uStack_39678;
  undefined8 uStack_39670;
  undefined8 uStack_39668;
  ulong uStack_39660;
  undefined8 uStack_39510;
  undefined8 uStack_39508;
  undefined8 uStack_39500;
  undefined8 uStack_394f8;
  undefined8 uStack_394f0;
  undefined8 uStack_394e8;
  undefined8 uStack_394e0;
  undefined8 uStack_394d8;
  undefined8 uStack_394d0;
  undefined8 uStack_394c8;
  undefined8 uStack_394c0;
  undefined8 uStack_394b8;
  undefined8 uStack_394b0;
  ulong uStack_394a8;
  undefined8 uStack_393f8;
  undefined8 uStack_39370;
  undefined8 uStack_39368;
  undefined8 uStack_39360;
  undefined8 uStack_39358;
  undefined8 uStack_39350;
  undefined8 uStack_39348;
  ulong uStack_39340;
  undefined8 uStack_392d8;
  undefined8 uStack_392d0;
  undefined8 uStack_392c8;
  undefined8 uStack_392c0;
  undefined8 uStack_392b8;
  undefined8 uStack_392b0;
  undefined8 uStack_392a8;
  undefined8 uStack_392a0;
  undefined8 uStack_39298;
  ulong uStack_39290;
  undefined8 uStack_39288;
  undefined8 uStack_39280;
  undefined8 uStack_39278;
  undefined8 uStack_39270;
  undefined8 uStack_39268;
  undefined8 uStack_39260;
  undefined8 uStack_39258;
  undefined8 uStack_39250;
  undefined8 uStack_39248;
  undefined8 uStack_39240;
  undefined8 uStack_39238;
  ulong uStack_39230;
  undefined8 uStack_391b8;
  undefined8 uStack_391b0;
  undefined8 uStack_391a8;
  undefined8 uStack_391a0;
  undefined8 uStack_39198;
  undefined8 uStack_39190;
  undefined8 uStack_39188;
  undefined8 uStack_39180;
  undefined8 uStack_39178;
  undefined8 uStack_39170;
  undefined8 uStack_39168;
  undefined8 uStack_39160;
  undefined8 uStack_39158;
  undefined8 uStack_39150;
  ulong uStack_39148;
  undefined8 uStack_39108;
  undefined8 uStack_39088;
  undefined8 uStack_39080;
  undefined8 uStack_39078;
  undefined8 uStack_39070;
  undefined8 uStack_39068;
  undefined8 uStack_39060;
  ulong uStack_39058;
  undefined8 uStack_39050;
  undefined8 uStack_39048;
  undefined8 uStack_39040;
  undefined8 uStack_39038;
  undefined8 uStack_39030;
  undefined8 uStack_39028;
  undefined8 uStack_39020;
  undefined8 uStack_39018;
  undefined8 uStack_39010;
  undefined8 uStack_39008;
  undefined8 uStack_39000;
  ulong uStack_38ff8;
  undefined8 uStack_38ff0;
  undefined8 uStack_38fe8;
  undefined8 uStack_38fe0;
  undefined8 uStack_38fd8;
  undefined8 uStack_38fd0;
  undefined8 uStack_38fc8;
  undefined8 uStack_38fc0;
  undefined8 uStack_38fb8;
  undefined8 uStack_38fb0;
  ulong uStack_38fa8;
  undefined8 uStack_38fa0;
  undefined8 uStack_38f98;
  undefined8 uStack_38f90;
  undefined8 uStack_38f88;
  undefined8 uStack_38f80;
  undefined8 uStack_38f78;
  undefined8 uStack_38f70;
  undefined8 uStack_38f68;
  undefined8 uStack_38f60;
  undefined8 uStack_38f58;
  undefined8 uStack_38f50;
  ulong uStack_38f48;
  undefined8 uStack_38f40;
  undefined8 uStack_38f38;
  undefined8 uStack_38f30;
  undefined8 uStack_38f28;
  undefined8 uStack_38f20;
  undefined8 uStack_38f18;
  undefined8 uStack_38f10;
  undefined8 uStack_38f08;
  undefined8 uStack_38f00;
  undefined8 uStack_38ef8;
  undefined8 uStack_38ef0;
  undefined8 uStack_38ee8;
  undefined8 uStack_38ee0;
  ulong uStack_38ed8;
  undefined8 uStack_38ed0;
  undefined8 uStack_38ec8;
  undefined8 uStack_38ec0;
  undefined8 uStack_38eb8;
  undefined8 uStack_38eb0;
  undefined8 uStack_38ea8;
  undefined8 uStack_38ea0;
  undefined8 uStack_38e98;
  undefined8 uStack_38e90;
  undefined8 uStack_38e88;
  undefined8 uStack_38e80;
  undefined8 uStack_38e78;
  undefined8 uStack_38e70;
  undefined8 uStack_38e68;
  ulong uStack_38e60;
  undefined8 uStack_38e18;
  undefined8 uStack_38dd0;
  undefined8 uStack_38dc8;
  undefined8 uStack_38dc0;
  undefined8 uStack_38db8;
  undefined8 uStack_38db0;
  ulong uStack_38da8;
  undefined8 uStack_38da0;
  undefined8 uStack_38d98;
  undefined8 uStack_38d90;
  undefined8 uStack_38d88;
  undefined8 uStack_38d80;
  undefined8 uStack_38d78;
  ulong uStack_38d70;
  undefined8 uStack_38d68;
  undefined8 uStack_38d60;
  undefined8 uStack_38d58;
  undefined8 uStack_38d50;
  undefined8 uStack_38d48;
  undefined8 uStack_38d40;
  undefined8 uStack_38d38;
  undefined8 uStack_38d30;
  undefined8 uStack_38d28;
  undefined8 uStack_38d20;
  undefined8 uStack_38d18;
  ulong uStack_38d10;
  undefined8 uStack_38d08;
  undefined8 uStack_38d00;
  undefined8 uStack_38cf8;
  undefined8 uStack_38cf0;
  undefined8 uStack_38ce8;
  undefined8 uStack_38ce0;
  undefined8 uStack_38cd8;
  undefined8 uStack_38cd0;
  undefined8 uStack_38cc8;
  ulong uStack_38cc0;
  undefined8 uStack_38cb8;
  undefined8 uStack_38cb0;
  undefined8 uStack_38ca8;
  undefined8 uStack_38ca0;
  undefined8 uStack_38c98;
  undefined8 uStack_38c90;
  undefined8 uStack_38c88;
  undefined8 uStack_38c80;
  undefined8 uStack_38c78;
  undefined8 uStack_38c70;
  undefined8 uStack_38c68;
  ulong uStack_38c60;
  undefined8 uStack_38c58;
  undefined8 uStack_38c50;
  undefined8 uStack_38c48;
  undefined8 uStack_38c40;
  undefined8 uStack_38c38;
  undefined8 uStack_38c30;
  undefined8 uStack_38c28;
  undefined8 uStack_38c20;
  undefined8 uStack_38c18;
  undefined8 uStack_38c10;
  undefined8 uStack_38c08;
  undefined8 uStack_38c00;
  undefined8 uStack_38bf8;
  ulong uStack_38bf0;
  undefined8 uStack_38be8;
  undefined8 uStack_38be0;
  undefined8 uStack_38bd8;
  undefined8 uStack_38bd0;
  undefined8 uStack_38bc8;
  undefined8 uStack_38bc0;
  undefined8 uStack_38bb8;
  undefined8 uStack_38bb0;
  undefined8 uStack_38ba8;
  undefined8 uStack_38ba0;
  undefined8 uStack_38b98;
  undefined8 uStack_38b90;
  undefined8 uStack_38b88;
  undefined8 uStack_38b80;
  ulong uStack_38b78;
  undefined8 uStack_38b28;
  undefined8 uStack_38ae8;
  undefined8 uStack_38ae0;
  undefined8 uStack_38ad8;
  undefined8 uStack_38ad0;
  undefined8 uStack_38ac8;
  ulong uStack_38ac0;
  undefined8 uStack_38ab8;
  undefined8 uStack_38ab0;
  undefined8 uStack_38aa8;
  undefined8 uStack_38aa0;
  undefined8 uStack_38a98;
  undefined8 uStack_38a90;
  ulong uStack_38a88;
  undefined8 uStack_38a80;
  undefined8 uStack_38a78;
  undefined8 uStack_38a70;
  undefined8 uStack_38a68;
  undefined8 uStack_38a60;
  undefined8 uStack_38a58;
  undefined8 uStack_38a50;
  undefined8 uStack_38a48;
  undefined8 uStack_38a40;
  undefined8 uStack_38a38;
  undefined8 uStack_38a30;
  ulong uStack_38a28;
  undefined8 uStack_38a20;
  undefined8 uStack_38a18;
  undefined8 uStack_38a10;
  undefined8 uStack_38a08;
  undefined8 uStack_38a00;
  undefined8 uStack_389f8;
  undefined8 uStack_389f0;
  undefined8 uStack_389e8;
  undefined8 uStack_389e0;
  ulong uStack_389d8;
  undefined8 uStack_389d0;
  undefined8 uStack_389c8;
  undefined8 uStack_389c0;
  undefined8 uStack_389b8;
  undefined8 uStack_389b0;
  undefined8 uStack_389a8;
  undefined8 uStack_389a0;
  undefined8 uStack_38998;
  undefined8 uStack_38990;
  undefined8 uStack_38988;
  undefined8 uStack_38980;
  ulong uStack_38978;
  undefined8 uStack_38970;
  undefined8 uStack_38968;
  undefined8 uStack_38960;
  undefined8 uStack_38958;
  undefined8 uStack_38950;
  undefined8 uStack_38948;
  undefined8 uStack_38940;
  undefined8 uStack_38938;
  undefined8 uStack_38930;
  undefined8 uStack_38928;
  undefined8 uStack_38920;
  undefined8 uStack_38918;
  undefined8 uStack_38910;
  ulong uStack_38908;
  undefined8 uStack_38900;
  undefined8 uStack_388f8;
  undefined8 uStack_388f0;
  undefined8 uStack_388e8;
  undefined8 uStack_388e0;
  undefined8 uStack_388d8;
  undefined8 uStack_388d0;
  undefined8 uStack_388c8;
  undefined8 uStack_388c0;
  undefined8 uStack_388b8;
  undefined8 uStack_388b0;
  undefined8 uStack_388a8;
  undefined8 uStack_388a0;
  undefined8 uStack_38898;
  ulong uStack_38890;
  undefined8 uStack_38838;
  undefined8 uStack_38800;
  undefined8 uStack_387f8;
  undefined8 uStack_387f0;
  undefined8 uStack_387e8;
  undefined8 uStack_387e0;
  ulong uStack_387d8;
  undefined8 uStack_387d0;
  undefined8 uStack_387c8;
  undefined8 uStack_387c0;
  undefined8 uStack_387b8;
  undefined8 uStack_387b0;
  undefined8 uStack_387a8;
  ulong uStack_387a0;
  undefined8 uStack_38798;
  undefined8 uStack_38790;
  undefined8 uStack_38788;
  undefined8 uStack_38780;
  undefined8 uStack_38778;
  undefined8 uStack_38770;
  undefined8 uStack_38768;
  undefined8 uStack_38760;
  undefined8 uStack_38758;
  undefined8 uStack_38750;
  undefined8 uStack_38748;
  ulong uStack_38740;
  undefined8 uStack_386e8;
  undefined8 uStack_386e0;
  undefined8 uStack_386d8;
  undefined8 uStack_386d0;
  undefined8 uStack_386c8;
  undefined8 uStack_386c0;
  undefined8 uStack_386b8;
  undefined8 uStack_386b0;
  undefined8 uStack_386a8;
  undefined8 uStack_386a0;
  undefined8 uStack_38698;
  ulong uStack_38690;
  undefined8 uStack_38688;
  undefined8 uStack_38680;
  undefined8 uStack_38678;
  undefined8 uStack_38670;
  undefined8 uStack_38668;
  undefined8 uStack_38660;
  undefined8 uStack_38658;
  undefined8 uStack_38650;
  undefined8 uStack_38648;
  undefined8 uStack_38640;
  undefined8 uStack_38638;
  undefined8 uStack_38630;
  undefined8 uStack_38628;
  ulong uStack_38620;
  undefined8 uStack_38618;
  undefined8 uStack_38610;
  undefined8 uStack_38608;
  undefined8 uStack_38600;
  undefined8 uStack_385f8;
  undefined8 uStack_385f0;
  undefined8 uStack_385e8;
  undefined8 uStack_385e0;
  undefined8 uStack_385d8;
  undefined8 uStack_385d0;
  undefined8 uStack_385c8;
  undefined8 uStack_385c0;
  undefined8 uStack_385b8;
  undefined8 uStack_385b0;
  ulong uStack_385a8;
  undefined8 uStack_38548;
  undefined8 uStack_38518;
  undefined8 uStack_38510;
  undefined8 uStack_38508;
  undefined8 uStack_38500;
  undefined8 uStack_384f8;
  ulong uStack_384f0;
  undefined8 uStack_38400;
  undefined8 uStack_383f8;
  undefined8 uStack_383f0;
  undefined8 uStack_383e8;
  undefined8 uStack_383e0;
  undefined8 uStack_383d8;
  undefined8 uStack_383d0;
  undefined8 uStack_383c8;
  undefined8 uStack_383c0;
  undefined8 uStack_383b8;
  undefined8 uStack_383b0;
  ulong uStack_383a8;
  undefined8 uStack_383a0;
  undefined8 uStack_38398;
  undefined8 uStack_38390;
  undefined8 uStack_38388;
  undefined8 uStack_38380;
  undefined8 uStack_38378;
  undefined8 uStack_38370;
  undefined8 uStack_38368;
  undefined8 uStack_38360;
  undefined8 uStack_38358;
  undefined8 uStack_38350;
  undefined8 uStack_38348;
  undefined8 uStack_38340;
  ulong uStack_38338;
  undefined8 uStack_38258;
  ulong uStack_38240;
  undefined8 uStack_38200;
  undefined8 uStack_381f8;
  undefined8 uStack_381f0;
  undefined8 uStack_381e8;
  undefined8 uStack_381e0;
  undefined8 uStack_381d8;
  ulong uStack_381d0;
  undefined8 uStack_38168;
  undefined8 uStack_38160;
  undefined8 uStack_38158;
  undefined8 uStack_38150;
  undefined8 uStack_38148;
  undefined8 uStack_38140;
  undefined8 uStack_38138;
  undefined8 uStack_38130;
  undefined8 uStack_38128;
  ulong uStack_38120;
  undefined8 uStack_38118;
  undefined8 uStack_38110;
  undefined8 uStack_38108;
  undefined8 uStack_38100;
  undefined8 uStack_380f8;
  undefined8 uStack_380f0;
  undefined8 uStack_380e8;
  undefined8 uStack_380e0;
  undefined8 uStack_380d8;
  undefined8 uStack_380d0;
  undefined8 uStack_380c8;
  ulong uStack_380c0;
  undefined8 uStack_38048;
  undefined8 uStack_38040;
  undefined8 uStack_38038;
  undefined8 uStack_38030;
  undefined8 uStack_38028;
  undefined8 uStack_38020;
  undefined8 uStack_38018;
  undefined8 uStack_38010;
  undefined8 uStack_38008;
  undefined8 uStack_38000;
  undefined8 uStack_37ff8;
  undefined8 uStack_37ff0;
  undefined8 uStack_37fe8;
  undefined8 uStack_37fe0;
  ulong uStack_37fd8;
  undefined8 uStack_37f68;
  ulong uStack_37f58;
  undefined8 uStack_37f18;
  undefined8 uStack_37f10;
  undefined8 uStack_37f08;
  undefined8 uStack_37f00;
  undefined8 uStack_37ef8;
  undefined8 uStack_37ef0;
  ulong uStack_37ee8;
  undefined8 uStack_37ee0;
  undefined8 uStack_37ed8;
  undefined8 uStack_37ed0;
  undefined8 uStack_37ec8;
  undefined8 uStack_37ec0;
  undefined8 uStack_37eb8;
  undefined8 uStack_37eb0;
  undefined8 uStack_37ea8;
  undefined8 uStack_37ea0;
  undefined8 uStack_37e98;
  undefined8 uStack_37e90;
  ulong uStack_37e88;
  undefined8 uStack_37e80;
  undefined8 uStack_37e78;
  undefined8 uStack_37e70;
  undefined8 uStack_37e68;
  undefined8 uStack_37e60;
  undefined8 uStack_37e58;
  undefined8 uStack_37e50;
  undefined8 uStack_37e48;
  undefined8 uStack_37e40;
  ulong uStack_37e38;
  undefined8 uStack_37e30;
  undefined8 uStack_37e28;
  undefined8 uStack_37e20;
  undefined8 uStack_37e18;
  undefined8 uStack_37e10;
  undefined8 uStack_37e08;
  undefined8 uStack_37e00;
  undefined8 uStack_37df8;
  undefined8 uStack_37df0;
  undefined8 uStack_37de8;
  undefined8 uStack_37de0;
  ulong uStack_37dd8;
  undefined8 uStack_37dd0;
  undefined8 uStack_37dc8;
  undefined8 uStack_37dc0;
  undefined8 uStack_37db8;
  undefined8 uStack_37db0;
  undefined8 uStack_37da8;
  undefined8 uStack_37da0;
  undefined8 uStack_37d98;
  undefined8 uStack_37d90;
  undefined8 uStack_37d88;
  undefined8 uStack_37d80;
  undefined8 uStack_37d78;
  undefined8 uStack_37d70;
  ulong uStack_37d68;
  undefined8 uStack_37d60;
  undefined8 uStack_37d58;
  undefined8 uStack_37d50;
  undefined8 uStack_37d48;
  undefined8 uStack_37d40;
  undefined8 uStack_37d38;
  undefined8 uStack_37d30;
  undefined8 uStack_37d28;
  undefined8 uStack_37d20;
  undefined8 uStack_37d18;
  undefined8 uStack_37d10;
  undefined8 uStack_37d08;
  undefined8 uStack_37d00;
  undefined8 uStack_37cf8;
  ulong uStack_37cf0;
  ulong uStack_37c78;
  ulong uStack_37c70;
  undefined8 uStack_37c60;
  undefined8 uStack_37c58;
  undefined8 uStack_37c50;
  undefined8 uStack_37c48;
  undefined8 uStack_37c40;
  ulong uStack_37c38;
  undefined8 uStack_37c30;
  undefined8 uStack_37c28;
  undefined8 uStack_37c20;
  undefined8 uStack_37c18;
  undefined8 uStack_37c10;
  undefined8 uStack_37c08;
  ulong uStack_37c00;
  undefined8 uStack_37bf8;
  undefined8 uStack_37bf0;
  undefined8 uStack_37be8;
  undefined8 uStack_37be0;
  undefined8 uStack_37bd8;
  undefined8 uStack_37bd0;
  undefined8 uStack_37bc8;
  undefined8 uStack_37bc0;
  undefined8 uStack_37bb8;
  undefined8 uStack_37bb0;
  undefined8 uStack_37ba8;
  ulong uStack_37ba0;
  undefined8 uStack_37b98;
  undefined8 uStack_37b90;
  undefined8 uStack_37b88;
  undefined8 uStack_37b80;
  undefined8 uStack_37b78;
  undefined8 uStack_37b70;
  undefined8 uStack_37b68;
  undefined8 uStack_37b60;
  undefined8 uStack_37b58;
  ulong uStack_37b50;
  undefined8 uStack_37b48;
  undefined8 uStack_37b40;
  undefined8 uStack_37b38;
  undefined8 uStack_37b30;
  undefined8 uStack_37b28;
  undefined8 uStack_37b20;
  undefined8 uStack_37b18;
  undefined8 uStack_37b10;
  undefined8 uStack_37b08;
  undefined8 uStack_37b00;
  undefined8 uStack_37af8;
  ulong uStack_37af0;
  undefined8 uStack_37ae8;
  undefined8 uStack_37ae0;
  undefined8 uStack_37ad8;
  undefined8 uStack_37ad0;
  undefined8 uStack_37ac8;
  undefined8 uStack_37ac0;
  undefined8 uStack_37ab8;
  undefined8 uStack_37ab0;
  undefined8 uStack_37aa8;
  undefined8 uStack_37aa0;
  undefined8 uStack_37a98;
  undefined8 uStack_37a90;
  undefined8 uStack_37a88;
  ulong uStack_37a80;
  undefined8 uStack_37a78;
  undefined8 uStack_37a70;
  undefined8 uStack_37a68;
  undefined8 uStack_37a60;
  undefined8 uStack_37a58;
  undefined8 uStack_37a50;
  undefined8 uStack_37a48;
  undefined8 uStack_37a40;
  undefined8 uStack_37a38;
  undefined8 uStack_37a30;
  undefined8 uStack_37a28;
  undefined8 uStack_37a20;
  undefined8 uStack_37a18;
  undefined8 uStack_37a10;
  ulong uStack_37a08;
  undefined8 uStack_37a00;
  undefined8 uStack_379f8;
  undefined8 uStack_379f0;
  undefined8 uStack_379e8;
  undefined8 uStack_379e0;
  undefined8 uStack_379d8;
  undefined8 uStack_379d0;
  undefined8 uStack_379c8;
  undefined8 uStack_379c0;
  undefined8 uStack_379b8;
  undefined8 uStack_379b0;
  undefined8 uStack_379a8;
  undefined8 uStack_379a0;
  undefined8 uStack_37998;
  ulong uStack_37990;
  ulong uStack_37988;
  undefined8 uStack_37978;
  undefined8 uStack_37970;
  undefined8 uStack_37968;
  undefined8 uStack_37960;
  undefined8 uStack_37958;
  ulong uStack_37950;
  undefined1 auStack_36b00 [296];
  undefined8 uStack_369d8;
  undefined8 uStack_369d0;
  undefined8 uStack_369c8;
  undefined8 uStack_369c0;
  undefined8 uStack_369b8;
  undefined8 uStack_369b0;
  undefined8 uStack_369a8;
  undefined8 uStack_369a0;
  undefined8 uStack_36998;
  undefined8 uStack_36990;
  undefined8 uStack_36988;
  ulong uStack_36980;
  undefined8 uStack_36808;
  undefined8 uStack_36800;
  undefined8 uStack_367f8;
  undefined8 uStack_367f0;
  undefined8 uStack_367e8;
  ulong uStack_367e0;
  undefined8 uStack_366f0;
  undefined8 uStack_366e8;
  undefined8 uStack_366e0;
  undefined8 uStack_366d8;
  undefined8 uStack_366d0;
  undefined8 uStack_366c8;
  undefined8 uStack_366c0;
  undefined8 uStack_366b8;
  undefined8 uStack_366b0;
  undefined8 uStack_366a8;
  undefined8 uStack_366a0;
  ulong uStack_36698;
  undefined8 uStack_36690;
  undefined8 uStack_36688;
  undefined8 uStack_36680;
  undefined8 uStack_36678;
  undefined8 uStack_36670;
  undefined8 uStack_36668;
  undefined8 uStack_36660;
  undefined8 uStack_36658;
  undefined8 uStack_36650;
  undefined8 uStack_36648;
  undefined8 uStack_36640;
  undefined8 uStack_36638;
  undefined8 uStack_36630;
  ulong uStack_36628;
  undefined8 uStack_365a8;
  undefined8 uStack_365a0;
  undefined8 uStack_36598;
  undefined8 uStack_36590;
  undefined8 uStack_36588;
  undefined8 uStack_36580;
  undefined8 uStack_36578;
  undefined8 uStack_36570;
  undefined8 uStack_36568;
  undefined8 uStack_36560;
  undefined8 uStack_36558;
  undefined8 uStack_36550;
  undefined8 uStack_36548;
  undefined8 uStack_36540;
  ulong uStack_36538;
  undefined8 uStack_364f0;
  undefined8 uStack_364e8;
  undefined8 uStack_364e0;
  undefined8 uStack_364d8;
  undefined8 uStack_364d0;
  undefined8 uStack_364c8;
  ulong uStack_364c0;
  undefined8 uStack_36458;
  undefined8 uStack_36450;
  undefined8 uStack_36448;
  undefined8 uStack_36440;
  undefined8 uStack_36438;
  undefined8 uStack_36430;
  undefined8 uStack_36428;
  undefined8 uStack_36420;
  undefined8 uStack_36418;
  ulong uStack_36410;
  undefined8 uStack_36408;
  undefined8 uStack_36400;
  undefined8 uStack_363f8;
  undefined8 uStack_363f0;
  undefined8 uStack_363e8;
  undefined8 uStack_363e0;
  undefined8 uStack_363d8;
  undefined8 uStack_363d0;
  undefined8 uStack_363c8;
  undefined8 uStack_363c0;
  undefined8 uStack_363b8;
  ulong uStack_363b0;
  undefined8 uStack_36338;
  undefined8 uStack_36330;
  undefined8 uStack_36328;
  undefined8 uStack_36320;
  undefined8 uStack_36318;
  undefined8 uStack_36310;
  undefined8 uStack_36308;
  undefined8 uStack_36300;
  undefined8 uStack_362f8;
  undefined8 uStack_362f0;
  undefined8 uStack_362e8;
  undefined8 uStack_362e0;
  undefined8 uStack_362d8;
  undefined8 uStack_362d0;
  ulong uStack_362c8;
  undefined8 uStack_362c0;
  undefined8 uStack_362b8;
  undefined8 uStack_362b0;
  undefined8 uStack_362a8;
  undefined8 uStack_362a0;
  undefined8 uStack_36298;
  undefined8 uStack_36290;
  undefined8 uStack_36288;
  undefined8 uStack_36280;
  undefined8 uStack_36278;
  undefined8 uStack_36270;
  undefined8 uStack_36268;
  undefined8 uStack_36260;
  undefined8 uStack_36258;
  ulong uStack_36250;
  undefined8 uStack_36208;
  undefined8 uStack_36200;
  undefined8 uStack_361f8;
  undefined8 uStack_361f0;
  undefined8 uStack_361e8;
  undefined8 uStack_361e0;
  ulong uStack_361d8;
  undefined8 uStack_361d0;
  undefined8 uStack_361c8;
  undefined8 uStack_361c0;
  undefined8 uStack_361b8;
  undefined8 uStack_361b0;
  undefined8 uStack_361a8;
  undefined8 uStack_361a0;
  undefined8 uStack_36198;
  undefined8 uStack_36190;
  undefined8 uStack_36188;
  undefined8 uStack_36180;
  ulong uStack_36178;
  undefined8 uStack_36120;
  undefined8 uStack_36118;
  undefined8 uStack_36110;
  undefined8 uStack_36108;
  undefined8 uStack_36100;
  undefined8 uStack_360f8;
  undefined8 uStack_360f0;
  undefined8 uStack_360e8;
  undefined8 uStack_360e0;
  undefined8 uStack_360d8;
  undefined8 uStack_360d0;
  ulong uStack_360c8;
  undefined8 uStack_360c0;
  undefined8 uStack_360b8;
  undefined8 uStack_360b0;
  undefined8 uStack_360a8;
  undefined8 uStack_360a0;
  undefined8 uStack_36098;
  undefined8 uStack_36090;
  undefined8 uStack_36088;
  undefined8 uStack_36080;
  undefined8 uStack_36078;
  undefined8 uStack_36070;
  undefined8 uStack_36068;
  undefined8 uStack_36060;
  ulong uStack_36058;
  undefined8 uStack_36050;
  undefined8 uStack_36048;
  undefined8 uStack_36040;
  undefined8 uStack_36038;
  undefined8 uStack_36030;
  undefined8 uStack_36028;
  undefined8 uStack_36020;
  undefined8 uStack_36018;
  undefined8 uStack_36010;
  undefined8 uStack_36008;
  undefined8 uStack_36000;
  undefined8 uStack_35ff8;
  undefined8 uStack_35ff0;
  undefined8 uStack_35fe8;
  ulong uStack_35fe0;
  undefined8 uStack_35fd8;
  undefined8 uStack_35fd0;
  undefined8 uStack_35fc8;
  undefined8 uStack_35fc0;
  undefined8 uStack_35fb8;
  undefined8 uStack_35fb0;
  undefined8 uStack_35fa8;
  undefined8 uStack_35fa0;
  undefined8 uStack_35f98;
  undefined8 uStack_35f90;
  undefined8 uStack_35f88;
  undefined8 uStack_35f80;
  undefined8 uStack_35f78;
  undefined8 uStack_35f70;
  ulong uStack_35f68;
  undefined8 uStack_35f50;
  undefined8 uStack_35f48;
  undefined8 uStack_35f40;
  undefined8 uStack_35f38;
  undefined8 uStack_35f30;
  ulong uStack_35f28;
  undefined8 uStack_35e38;
  undefined8 uStack_35e30;
  undefined8 uStack_35e28;
  undefined8 uStack_35e20;
  undefined8 uStack_35e18;
  undefined8 uStack_35e10;
  undefined8 uStack_35e08;
  undefined8 uStack_35e00;
  undefined8 uStack_35df8;
  undefined8 uStack_35df0;
  undefined8 uStack_35de8;
  ulong uStack_35de0;
  undefined8 uStack_35dd8;
  undefined8 uStack_35dd0;
  undefined8 uStack_35dc8;
  undefined8 uStack_35dc0;
  undefined8 uStack_35db8;
  undefined8 uStack_35db0;
  undefined8 uStack_35da8;
  undefined8 uStack_35da0;
  undefined8 uStack_35d98;
  undefined8 uStack_35d90;
  undefined8 uStack_35d88;
  undefined8 uStack_35d80;
  undefined8 uStack_35d78;
  ulong uStack_35d70;
  undefined8 uStack_35cf0;
  undefined8 uStack_35ce8;
  undefined8 uStack_35ce0;
  undefined8 uStack_35cd8;
  undefined8 uStack_35cd0;
  undefined8 uStack_35cc8;
  undefined8 uStack_35cc0;
  undefined8 uStack_35cb8;
  undefined8 uStack_35cb0;
  undefined8 uStack_35ca8;
  undefined8 uStack_35ca0;
  undefined8 uStack_35c98;
  undefined8 uStack_35c90;
  undefined8 uStack_35c88;
  ulong uStack_35c80;
  undefined8 uStack_35c38;
  undefined8 uStack_35c30;
  undefined8 uStack_35c28;
  undefined8 uStack_35c20;
  undefined8 uStack_35c18;
  undefined8 uStack_35c10;
  ulong uStack_35c08;
  undefined8 uStack_35b50;
  undefined8 uStack_35b48;
  undefined8 uStack_35b40;
  undefined8 uStack_35b38;
  undefined8 uStack_35b30;
  undefined8 uStack_35b28;
  undefined8 uStack_35b20;
  undefined8 uStack_35b18;
  undefined8 uStack_35b10;
  undefined8 uStack_35b08;
  undefined8 uStack_35b00;
  ulong uStack_35af8;
  undefined8 uStack_35a80;
  undefined8 uStack_35a78;
  undefined8 uStack_35a70;
  undefined8 uStack_35a68;
  undefined8 uStack_35a60;
  undefined8 uStack_35a58;
  undefined8 uStack_35a50;
  undefined8 uStack_35a48;
  undefined8 uStack_35a40;
  undefined8 uStack_35a38;
  undefined8 uStack_35a30;
  undefined8 uStack_35a28;
  undefined8 uStack_35a20;
  undefined8 uStack_35a18;
  ulong uStack_35a10;
  undefined8 uStack_35a08;
  undefined8 uStack_35a00;
  undefined8 uStack_359f8;
  undefined8 uStack_359f0;
  undefined8 uStack_359e8;
  undefined8 uStack_359e0;
  undefined8 uStack_359d8;
  undefined8 uStack_359d0;
  undefined8 uStack_359c8;
  undefined8 uStack_359c0;
  undefined8 uStack_359b8;
  undefined8 uStack_359b0;
  undefined8 uStack_359a8;
  undefined8 uStack_359a0;
  ulong uStack_35998;
  undefined8 uStack_35868;
  undefined8 uStack_35860;
  undefined8 uStack_35858;
  undefined8 uStack_35850;
  undefined8 uStack_35848;
  undefined8 uStack_35840;
  undefined8 uStack_35838;
  undefined8 uStack_35830;
  undefined8 uStack_35828;
  undefined8 uStack_35820;
  undefined8 uStack_35818;
  ulong uStack_35810;
  undefined8 uStack_35808;
  undefined8 uStack_35800;
  undefined8 uStack_357f8;
  undefined8 uStack_357f0;
  undefined8 uStack_357e8;
  undefined8 uStack_357e0;
  undefined8 uStack_357d8;
  undefined8 uStack_357d0;
  undefined8 uStack_357c8;
  undefined8 uStack_357c0;
  undefined8 uStack_357b8;
  undefined8 uStack_357b0;
  undefined8 uStack_357a8;
  ulong uStack_357a0;
  undefined8 uStack_35720;
  undefined8 uStack_35718;
  undefined8 uStack_35710;
  undefined8 uStack_35708;
  undefined8 uStack_35700;
  undefined8 uStack_356f8;
  undefined8 uStack_356f0;
  undefined8 uStack_356e8;
  undefined8 uStack_356e0;
  undefined8 uStack_356d8;
  undefined8 uStack_356d0;
  undefined8 uStack_356c8;
  undefined8 uStack_356c0;
  undefined8 uStack_356b8;
  ulong uStack_356b0;
  undefined8 uStack_35580;
  undefined8 uStack_35578;
  undefined8 uStack_35570;
  undefined8 uStack_35568;
  undefined8 uStack_35560;
  undefined8 uStack_35558;
  undefined8 uStack_35550;
  undefined8 uStack_35548;
  undefined8 uStack_35540;
  undefined8 uStack_35538;
  undefined8 uStack_35530;
  ulong uStack_35528;
  undefined8 uStack_35438;
  undefined8 uStack_35430;
  undefined8 uStack_35428;
  undefined8 uStack_35420;
  undefined8 uStack_35418;
  undefined8 uStack_35410;
  undefined8 uStack_35408;
  undefined8 uStack_35400;
  undefined8 uStack_353f8;
  undefined8 uStack_353f0;
  undefined8 uStack_353e8;
  undefined8 uStack_353e0;
  undefined8 uStack_353d8;
  undefined8 uStack_353d0;
  ulong uStack_353c8;
  undefined8 uStack_352e8;
  undefined8 uStack_352e0;
  undefined8 uStack_352d8;
  undefined8 uStack_352d0;
  undefined8 uStack_352c8;
  undefined8 uStack_352c0;
  undefined8 uStack_352b8;
  undefined8 uStack_352b0;
  undefined8 uStack_352a8;
  ulong uStack_352a0;
  undefined8 uStack_351c8;
  undefined8 uStack_351c0;
  undefined8 uStack_351b8;
  undefined8 uStack_351b0;
  undefined8 uStack_351a8;
  undefined8 uStack_351a0;
  undefined8 uStack_35198;
  undefined8 uStack_35190;
  undefined8 uStack_35188;
  undefined8 uStack_35180;
  undefined8 uStack_35178;
  undefined8 uStack_35170;
  undefined8 uStack_35168;
  undefined8 uStack_35160;
  ulong uStack_35158;
  undefined8 uStack_35150;
  undefined8 uStack_35148;
  undefined8 uStack_35140;
  undefined8 uStack_35138;
  undefined8 uStack_35130;
  undefined8 uStack_35128;
  undefined8 uStack_35120;
  undefined8 uStack_35118;
  undefined8 uStack_35110;
  undefined8 uStack_35108;
  undefined8 uStack_35100;
  undefined8 uStack_350f8;
  undefined8 uStack_350f0;
  undefined8 uStack_350e8;
  ulong uStack_350e0;
  undefined8 uStack_35060;
  undefined8 uStack_35058;
  undefined8 uStack_35050;
  undefined8 uStack_35048;
  undefined8 uStack_35040;
  undefined8 uStack_35038;
  undefined8 uStack_35030;
  undefined8 uStack_35028;
  undefined8 uStack_35020;
  undefined8 uStack_35018;
  undefined8 uStack_35010;
  ulong uStack_35008;
  undefined8 uStack_35000;
  undefined8 uStack_34ff8;
  undefined8 uStack_34ff0;
  undefined8 uStack_34fe8;
  undefined8 uStack_34fe0;
  undefined8 uStack_34fd8;
  undefined8 uStack_34fd0;
  undefined8 uStack_34fc8;
  undefined8 uStack_34fc0;
  ulong uStack_34fb8;
  undefined8 uStack_34f50;
  undefined8 uStack_34f48;
  undefined8 uStack_34f40;
  undefined8 uStack_34f38;
  undefined8 uStack_34f30;
  undefined8 uStack_34f28;
  undefined8 uStack_34f20;
  undefined8 uStack_34f18;
  undefined8 uStack_34f10;
  undefined8 uStack_34f08;
  undefined8 uStack_34f00;
  undefined8 uStack_34ef8;
  undefined8 uStack_34ef0;
  ulong uStack_34ee8;
  undefined8 uStack_34ee0;
  undefined8 uStack_34ed8;
  undefined8 uStack_34ed0;
  undefined8 uStack_34ec8;
  undefined8 uStack_34ec0;
  undefined8 uStack_34eb8;
  undefined8 uStack_34eb0;
  undefined8 uStack_34ea8;
  undefined8 uStack_34ea0;
  undefined8 uStack_34e98;
  undefined8 uStack_34e90;
  undefined8 uStack_34e88;
  undefined8 uStack_34e80;
  undefined8 uStack_34e78;
  ulong uStack_34e70;
  undefined8 uStack_34e68;
  undefined8 uStack_34e60;
  undefined8 uStack_34e58;
  undefined8 uStack_34e50;
  undefined8 uStack_34e48;
  undefined8 uStack_34e40;
  undefined8 uStack_34e38;
  undefined8 uStack_34e30;
  undefined8 uStack_34e28;
  undefined8 uStack_34e20;
  undefined8 uStack_34e18;
  undefined8 uStack_34e10;
  undefined8 uStack_34e08;
  undefined8 uStack_34e00;
  ulong uStack_34df8;
  undefined8 uStack_34de0;
  undefined8 uStack_34dd8;
  undefined8 uStack_34dd0;
  undefined8 uStack_34dc8;
  undefined8 uStack_34dc0;
  ulong uStack_34db8;
  undefined8 uStack_34d78;
  undefined8 uStack_34d70;
  undefined8 uStack_34d68;
  undefined8 uStack_34d60;
  undefined8 uStack_34d58;
  undefined8 uStack_34d50;
  undefined8 uStack_34d48;
  undefined8 uStack_34d40;
  undefined8 uStack_34d38;
  undefined8 uStack_34d30;
  undefined8 uStack_34d28;
  ulong uStack_34d20;
  undefined8 uStack_34d18;
  undefined8 uStack_34d10;
  undefined8 uStack_34d08;
  undefined8 uStack_34d00;
  undefined8 uStack_34cf8;
  undefined8 uStack_34cf0;
  undefined8 uStack_34ce8;
  undefined8 uStack_34ce0;
  undefined8 uStack_34cd8;
  ulong uStack_34cd0;
  undefined8 uStack_34c68;
  undefined8 uStack_34c60;
  undefined8 uStack_34c58;
  undefined8 uStack_34c50;
  undefined8 uStack_34c48;
  undefined8 uStack_34c40;
  undefined8 uStack_34c38;
  undefined8 uStack_34c30;
  undefined8 uStack_34c28;
  undefined8 uStack_34c20;
  undefined8 uStack_34c18;
  undefined8 uStack_34c10;
  undefined8 uStack_34c08;
  ulong uStack_34c00;
  undefined8 uStack_34bf8;
  undefined8 uStack_34bf0;
  undefined8 uStack_34be8;
  undefined8 uStack_34be0;
  undefined8 uStack_34bd8;
  undefined8 uStack_34bd0;
  undefined8 uStack_34bc8;
  undefined8 uStack_34bc0;
  undefined8 uStack_34bb8;
  undefined8 uStack_34bb0;
  undefined8 uStack_34ba8;
  undefined8 uStack_34ba0;
  undefined8 uStack_34b98;
  undefined8 uStack_34b90;
  ulong uStack_34b88;
  undefined8 uStack_34b80;
  undefined8 uStack_34b78;
  undefined8 uStack_34b70;
  undefined8 uStack_34b68;
  undefined8 uStack_34b60;
  undefined8 uStack_34b58;
  undefined8 uStack_34b50;
  undefined8 uStack_34b48;
  undefined8 uStack_34b40;
  undefined8 uStack_34b38;
  undefined8 uStack_34b30;
  undefined8 uStack_34b28;
  undefined8 uStack_34b20;
  undefined8 uStack_34b18;
  ulong uStack_34b10;
  undefined8 uStack_34af8;
  undefined8 uStack_34af0;
  undefined8 uStack_34ae8;
  undefined8 uStack_34ae0;
  undefined8 uStack_34ad8;
  ulong uStack_34ad0;
  undefined8 uStack_34a90;
  undefined8 uStack_34a88;
  undefined8 uStack_34a80;
  undefined8 uStack_34a78;
  undefined8 uStack_34a70;
  undefined8 uStack_34a68;
  undefined8 uStack_34a60;
  undefined8 uStack_34a58;
  undefined8 uStack_34a50;
  undefined8 uStack_34a48;
  undefined8 uStack_34a40;
  ulong uStack_34a38;
  undefined8 uStack_34a30;
  undefined8 uStack_34a28;
  undefined8 uStack_34a20;
  undefined8 uStack_34a18;
  undefined8 uStack_34a10;
  undefined8 uStack_34a08;
  undefined8 uStack_34a00;
  undefined8 uStack_349f8;
  undefined8 uStack_349f0;
  ulong uStack_349e8;
  undefined8 uStack_34980;
  undefined8 uStack_34978;
  undefined8 uStack_34970;
  undefined8 uStack_34968;
  undefined8 uStack_34960;
  undefined8 uStack_34958;
  undefined8 uStack_34950;
  undefined8 uStack_34948;
  undefined8 uStack_34940;
  undefined8 uStack_34938;
  undefined8 uStack_34930;
  undefined8 uStack_34928;
  undefined8 uStack_34920;
  ulong uStack_34918;
  undefined8 uStack_34910;
  undefined8 uStack_34908;
  undefined8 uStack_34900;
  undefined8 uStack_348f8;
  undefined8 uStack_348f0;
  undefined8 uStack_348e8;
  undefined8 uStack_348e0;
  undefined8 uStack_348d8;
  undefined8 uStack_348d0;
  undefined8 uStack_348c8;
  undefined8 uStack_348c0;
  undefined8 uStack_348b8;
  undefined8 uStack_348b0;
  undefined8 uStack_348a8;
  ulong uStack_348a0;
  undefined8 uStack_34898;
  undefined8 uStack_34890;
  undefined8 uStack_34888;
  undefined8 uStack_34880;
  undefined8 uStack_34878;
  undefined8 uStack_34870;
  undefined8 uStack_34868;
  undefined8 uStack_34860;
  undefined8 uStack_34858;
  undefined8 uStack_34850;
  undefined8 uStack_34848;
  undefined8 uStack_34840;
  undefined8 uStack_34838;
  undefined8 uStack_34830;
  ulong uStack_34828;
  undefined8 uStack_34810;
  undefined8 uStack_34808;
  undefined8 uStack_34800;
  undefined8 uStack_347f8;
  undefined8 uStack_347f0;
  ulong uStack_347e8;
  undefined8 uStack_347a8;
  undefined8 uStack_347a0;
  undefined8 uStack_34798;
  undefined8 uStack_34790;
  undefined8 uStack_34788;
  undefined8 uStack_34780;
  undefined8 uStack_34778;
  undefined8 uStack_34770;
  undefined8 uStack_34768;
  undefined8 uStack_34760;
  undefined8 uStack_34758;
  ulong uStack_34750;
  undefined8 uStack_34698;
  undefined8 uStack_34690;
  undefined8 uStack_34688;
  undefined8 uStack_34680;
  undefined8 uStack_34678;
  undefined8 uStack_34670;
  undefined8 uStack_34668;
  undefined8 uStack_34660;
  undefined8 uStack_34658;
  undefined8 uStack_34650;
  undefined8 uStack_34648;
  undefined8 uStack_34640;
  undefined8 uStack_34638;
  ulong uStack_34630;
  undefined8 uStack_34628;
  undefined8 uStack_34620;
  undefined8 uStack_34618;
  undefined8 uStack_34610;
  undefined8 uStack_34608;
  undefined8 uStack_34600;
  undefined8 uStack_345f8;
  undefined8 uStack_345f0;
  undefined8 uStack_345e8;
  undefined8 uStack_345e0;
  undefined8 uStack_345d8;
  undefined8 uStack_345d0;
  undefined8 uStack_345c8;
  undefined8 uStack_345c0;
  ulong uStack_345b8;
  undefined8 uStack_345b0;
  undefined8 uStack_345a8;
  undefined8 uStack_345a0;
  undefined8 uStack_34598;
  undefined8 uStack_34590;
  undefined8 uStack_34588;
  undefined8 uStack_34580;
  undefined8 uStack_34578;
  undefined8 uStack_34570;
  undefined8 uStack_34568;
  undefined8 uStack_34560;
  undefined8 uStack_34558;
  undefined8 uStack_34550;
  undefined8 uStack_34548;
  ulong uStack_34540;
  undefined8 uStack_34528;
  undefined8 uStack_34520;
  undefined8 uStack_34518;
  undefined8 uStack_34510;
  undefined8 uStack_34508;
  ulong uStack_34500;
  undefined8 uStack_343b0;
  undefined8 uStack_343a8;
  undefined8 uStack_343a0;
  undefined8 uStack_34398;
  undefined8 uStack_34390;
  undefined8 uStack_34388;
  undefined8 uStack_34380;
  undefined8 uStack_34378;
  undefined8 uStack_34370;
  undefined8 uStack_34368;
  undefined8 uStack_34360;
  undefined8 uStack_34358;
  undefined8 uStack_34350;
  ulong uStack_34348;
  undefined8 uStack_342c8;
  undefined8 uStack_342c0;
  undefined8 uStack_342b8;
  undefined8 uStack_342b0;
  undefined8 uStack_342a8;
  undefined8 uStack_342a0;
  undefined8 uStack_34298;
  undefined8 uStack_34290;
  undefined8 uStack_34288;
  undefined8 uStack_34280;
  undefined8 uStack_34278;
  undefined8 uStack_34270;
  undefined8 uStack_34268;
  undefined8 uStack_34260;
  ulong uStack_34258;
  undefined8 uStack_34210;
  undefined8 uStack_34208;
  undefined8 uStack_34200;
  undefined8 uStack_341f8;
  undefined8 uStack_341f0;
  undefined8 uStack_341e8;
  ulong uStack_341e0;
  undefined8 uStack_34178;
  undefined8 uStack_34170;
  undefined8 uStack_34168;
  undefined8 uStack_34160;
  undefined8 uStack_34158;
  undefined8 uStack_34150;
  undefined8 uStack_34148;
  undefined8 uStack_34140;
  undefined8 uStack_34138;
  undefined8 uStack_34130;
  undefined8 uStack_34128;
  undefined8 uStack_34120;
  undefined8 uStack_34118;
  undefined8 uStack_34110;
  undefined8 uStack_34108;
  undefined8 uStack_34100;
  undefined8 uStack_340f8;
  undefined8 uStack_340f0;
  undefined8 uStack_340e8;
  undefined8 uStack_340e0;
  undefined8 uStack_340d8;
  ulong uStack_340d0;
  undefined8 uStack_34058;
  undefined8 uStack_34050;
  undefined8 uStack_34048;
  undefined8 uStack_34040;
  undefined8 uStack_34038;
  undefined8 uStack_34030;
  undefined8 uStack_34028;
  undefined8 uStack_34020;
  undefined8 uStack_34018;
  undefined8 uStack_34010;
  undefined8 uStack_34008;
  undefined8 uStack_34000;
  undefined8 uStack_33ff8;
  undefined8 uStack_33ff0;
  ulong uStack_33fe8;
  undefined8 uStack_33fe0;
  undefined8 uStack_33fd8;
  undefined8 uStack_33fd0;
  undefined8 uStack_33fc8;
  undefined8 uStack_33fc0;
  undefined8 uStack_33fb8;
  undefined8 uStack_33fb0;
  undefined8 uStack_33fa8;
  undefined8 uStack_33fa0;
  undefined8 uStack_33f98;
  undefined8 uStack_33f90;
  undefined8 uStack_33f88;
  undefined8 uStack_33f80;
  undefined8 uStack_33f78;
  ulong uStack_33f70;
  undefined8 uStack_33f28;
  undefined8 uStack_33f20;
  undefined8 uStack_33f18;
  undefined8 uStack_33f10;
  undefined8 uStack_33f08;
  undefined8 uStack_33f00;
  ulong uStack_33ef8;
  undefined8 uStack_33ef0;
  undefined8 uStack_33ee8;
  undefined8 uStack_33ee0;
  undefined8 uStack_33ed8;
  undefined8 uStack_33ed0;
  undefined8 uStack_33ec8;
  undefined8 uStack_33ec0;
  undefined8 uStack_33eb8;
  undefined8 uStack_33eb0;
  undefined8 uStack_33ea8;
  undefined8 uStack_33ea0;
  undefined8 uStack_33e98;
  undefined8 uStack_33e90;
  undefined8 uStack_33e88;
  undefined8 uStack_33e80;
  undefined8 uStack_33e78;
  undefined8 uStack_33e70;
  undefined8 uStack_33e68;
  undefined8 uStack_33e60;
  undefined8 uStack_33e58;
  undefined8 uStack_33e50;
  undefined8 uStack_33e48;
  undefined8 uStack_33e40;
  undefined8 uStack_33e38;
  undefined8 uStack_33e30;
  undefined8 uStack_33e28;
  undefined8 uStack_33e20;
  undefined8 uStack_33e18;
  undefined8 uStack_33e10;
  undefined8 uStack_33e08;
  undefined8 uStack_33e00;
  undefined8 uStack_33df8;
  undefined8 uStack_33df0;
  ulong uStack_33de8;
  undefined8 uStack_33de0;
  undefined8 uStack_33dd8;
  undefined8 uStack_33dd0;
  undefined8 uStack_33dc8;
  undefined8 uStack_33dc0;
  undefined8 uStack_33db8;
  undefined8 uStack_33db0;
  undefined8 uStack_33da8;
  undefined8 uStack_33da0;
  undefined8 uStack_33d98;
  undefined8 uStack_33d90;
  undefined8 uStack_33d88;
  undefined8 uStack_33d80;
  ulong uStack_33d78;
  undefined8 uStack_33d70;
  undefined8 uStack_33d68;
  undefined8 uStack_33d60;
  undefined8 uStack_33d58;
  undefined8 uStack_33d50;
  undefined8 uStack_33d48;
  undefined8 uStack_33d40;
  undefined8 uStack_33d38;
  undefined8 uStack_33d30;
  undefined8 uStack_33d28;
  undefined8 uStack_33d20;
  undefined8 uStack_33d18;
  undefined8 uStack_33d10;
  undefined8 uStack_33d08;
  ulong uStack_33d00;
  undefined8 uStack_33cf8;
  undefined8 uStack_33cf0;
  undefined8 uStack_33ce8;
  undefined8 uStack_33ce0;
  undefined8 uStack_33cd8;
  undefined8 uStack_33cd0;
  undefined8 uStack_33cc8;
  undefined8 uStack_33cc0;
  undefined8 uStack_33cb8;
  undefined8 uStack_33cb0;
  undefined8 uStack_33ca8;
  undefined8 uStack_33ca0;
  undefined8 uStack_33c98;
  undefined8 uStack_33c90;
  ulong uStack_33c88;
  undefined8 uStack_33c70;
  undefined8 uStack_33c68;
  undefined8 uStack_33c60;
  undefined8 uStack_33c58;
  undefined8 uStack_33c50;
  undefined8 uStack_33c48;
  undefined8 uStack_33c40;
  undefined8 uStack_33c38;
  undefined8 uStack_33c30;
  undefined8 uStack_33c28;
  undefined8 uStack_33c20;
  undefined8 uStack_33c18;
  ulong uStack_33c10;
  undefined8 uStack_33c08;
  undefined8 uStack_33c00;
  undefined8 uStack_33bf8;
  undefined8 uStack_33bf0;
  undefined8 uStack_33be8;
  undefined8 uStack_33be0;
  undefined8 uStack_33bd8;
  undefined8 uStack_33bd0;
  undefined8 uStack_33bc8;
  undefined8 uStack_33bc0;
  undefined8 uStack_33bb8;
  undefined8 uStack_33bb0;
  undefined8 uStack_33ba8;
  undefined8 uStack_33ba0;
  undefined8 uStack_33b98;
  undefined8 uStack_33b90;
  undefined8 uStack_33b88;
  undefined8 uStack_33b80;
  undefined8 uStack_33b78;
  undefined8 uStack_33b70;
  undefined8 uStack_33b68;
  undefined8 uStack_33b60;
  undefined8 uStack_33b58;
  undefined8 uStack_33b50;
  undefined8 uStack_33b48;
  undefined8 uStack_33b40;
  undefined8 uStack_33b38;
  undefined8 uStack_33b30;
  undefined8 uStack_33b28;
  undefined8 uStack_33b20;
  undefined8 uStack_33b18;
  undefined8 uStack_33b10;
  undefined8 uStack_33b08;
  ulong uStack_33b00;
  undefined8 uStack_33af8;
  undefined8 uStack_33af0;
  undefined8 uStack_33ae8;
  undefined8 uStack_33ae0;
  undefined8 uStack_33ad8;
  undefined8 uStack_33ad0;
  undefined8 uStack_33ac8;
  undefined8 uStack_33ac0;
  undefined8 uStack_33ab8;
  undefined8 uStack_33ab0;
  undefined8 uStack_33aa8;
  undefined8 uStack_33aa0;
  undefined8 uStack_33a98;
  ulong uStack_33a90;
  undefined8 uStack_33a88;
  undefined8 uStack_33a80;
  undefined8 uStack_33a78;
  undefined8 uStack_33a70;
  undefined8 uStack_33a68;
  undefined8 uStack_33a60;
  undefined8 uStack_33a58;
  undefined8 uStack_33a50;
  undefined8 uStack_33a48;
  undefined8 uStack_33a40;
  undefined8 uStack_33a38;
  undefined8 uStack_33a30;
  undefined8 uStack_33a28;
  undefined8 uStack_33a20;
  ulong uStack_33a18;
  undefined8 uStack_33a10;
  undefined8 uStack_33a08;
  undefined8 uStack_33a00;
  undefined8 uStack_339f8;
  undefined8 uStack_339f0;
  undefined8 uStack_339e8;
  undefined8 uStack_339e0;
  undefined8 uStack_339d8;
  undefined8 uStack_339d0;
  undefined8 uStack_339c8;
  undefined8 uStack_339c0;
  undefined8 uStack_339b8;
  undefined8 uStack_339b0;
  undefined8 uStack_339a8;
  ulong uStack_339a0;
  undefined8 uStack_33988;
  undefined8 uStack_33980;
  undefined8 uStack_33978;
  undefined8 uStack_33970;
  undefined8 uStack_33968;
  undefined8 uStack_33960;
  undefined8 uStack_33958;
  undefined8 uStack_33950;
  undefined8 uStack_33948;
  undefined8 uStack_33940;
  undefined8 uStack_33938;
  undefined8 uStack_33930;
  ulong uStack_33928;
  undefined8 uStack_33920;
  undefined8 uStack_33918;
  undefined8 uStack_33910;
  undefined8 uStack_33908;
  undefined8 uStack_33900;
  undefined8 uStack_338f8;
  undefined8 uStack_338f0;
  undefined8 uStack_338e8;
  undefined8 uStack_338e0;
  undefined8 uStack_338d8;
  undefined8 uStack_338d0;
  undefined8 uStack_338c8;
  undefined8 uStack_33870;
  undefined8 uStack_33868;
  undefined8 uStack_33860;
  undefined8 uStack_33858;
  undefined8 uStack_33850;
  undefined8 uStack_33848;
  undefined8 uStack_33840;
  undefined8 uStack_33838;
  undefined8 uStack_33830;
  undefined8 uStack_33828;
  undefined8 uStack_33820;
  ulong uStack_33818;
  undefined8 uStack_33810;
  undefined8 uStack_33808;
  undefined8 uStack_33800;
  undefined8 uStack_337f8;
  undefined8 uStack_337f0;
  undefined8 uStack_337e8;
  undefined8 uStack_337e0;
  undefined8 uStack_337d8;
  undefined8 uStack_337d0;
  undefined8 uStack_337c8;
  undefined8 uStack_337c0;
  undefined8 uStack_337b8;
  undefined8 uStack_337b0;
  ulong uStack_337a8;
  undefined8 uStack_337a0;
  undefined8 uStack_33798;
  undefined8 uStack_33790;
  undefined8 uStack_33788;
  undefined8 uStack_33780;
  undefined8 uStack_33778;
  undefined8 uStack_33770;
  undefined8 uStack_33768;
  undefined8 uStack_33760;
  undefined8 uStack_33758;
  undefined8 uStack_33750;
  undefined8 uStack_33748;
  undefined8 uStack_33740;
  undefined8 uStack_33738;
  ulong uStack_33730;
  undefined8 uStack_33728;
  undefined8 uStack_33720;
  undefined8 uStack_33718;
  undefined8 uStack_33710;
  undefined8 uStack_33708;
  undefined8 uStack_33700;
  undefined8 uStack_336f8;
  undefined8 uStack_336f0;
  undefined8 uStack_336e8;
  undefined8 uStack_336e0;
  undefined8 uStack_336d8;
  undefined8 uStack_336d0;
  undefined8 uStack_336c8;
  undefined8 uStack_336c0;
  ulong uStack_336b8;
  undefined8 uStack_336a0;
  undefined8 uStack_33698;
  undefined8 uStack_33690;
  undefined8 uStack_33688;
  undefined8 uStack_33680;
  undefined8 uStack_33678;
  undefined8 uStack_33588;
  undefined8 uStack_33580;
  undefined8 uStack_33578;
  undefined8 uStack_33570;
  undefined8 uStack_33568;
  undefined8 uStack_33560;
  undefined8 uStack_33558;
  undefined8 uStack_33550;
  undefined8 uStack_33548;
  undefined8 uStack_33540;
  undefined8 uStack_33538;
  ulong uStack_33530;
  undefined8 uStack_33528;
  undefined8 uStack_33520;
  undefined8 uStack_33518;
  undefined8 uStack_33510;
  undefined8 uStack_33508;
  undefined8 uStack_33500;
  undefined8 uStack_334f8;
  undefined8 uStack_334f0;
  undefined8 uStack_334e8;
  undefined8 uStack_334e0;
  undefined8 uStack_334d8;
  undefined8 uStack_334d0;
  undefined8 uStack_334c8;
  ulong uStack_334c0;
  undefined8 uStack_33440;
  undefined8 uStack_33438;
  undefined8 uStack_33430;
  undefined8 uStack_33428;
  undefined8 uStack_33420;
  undefined8 uStack_33418;
  undefined8 uStack_33410;
  undefined8 uStack_33408;
  undefined8 uStack_33400;
  undefined8 uStack_333f8;
  undefined8 uStack_333f0;
  undefined8 uStack_333e8;
  undefined8 uStack_333e0;
  undefined8 uStack_333d8;
  ulong uStack_333d0;
  undefined8 uStack_33388;
  undefined8 uStack_33380;
  undefined8 uStack_33378;
  undefined8 uStack_33370;
  undefined8 uStack_33368;
  undefined8 uStack_33360;
  undefined8 uStack_33358;
  undefined8 uStack_332f0;
  undefined8 uStack_332e8;
  undefined8 uStack_332e0;
  undefined8 uStack_332d8;
  undefined8 uStack_332d0;
  undefined8 uStack_332c8;
  undefined8 uStack_332c0;
  undefined8 uStack_332b8;
  undefined8 uStack_332b0;
  undefined8 uStack_332a8;
  undefined8 uStack_332a0;
  undefined8 uStack_33298;
  undefined8 uStack_33290;
  undefined8 uStack_33288;
  undefined8 uStack_33280;
  undefined8 uStack_33278;
  undefined8 uStack_33270;
  undefined8 uStack_33268;
  undefined8 uStack_33260;
  undefined8 uStack_33258;
  undefined8 uStack_33250;
  ulong uStack_33248;
  undefined8 uStack_331d0;
  undefined8 uStack_331c8;
  undefined8 uStack_331c0;
  undefined8 uStack_331b8;
  undefined8 uStack_331b0;
  undefined8 uStack_331a8;
  undefined8 uStack_331a0;
  undefined8 uStack_33198;
  undefined8 uStack_33190;
  undefined8 uStack_33188;
  undefined8 uStack_33180;
  undefined8 uStack_33178;
  undefined8 uStack_33170;
  undefined8 uStack_33168;
  ulong uStack_33160;
  undefined8 uStack_33158;
  undefined8 uStack_33150;
  undefined8 uStack_33148;
  undefined8 uStack_33140;
  undefined8 uStack_33138;
  undefined8 uStack_33130;
  undefined8 uStack_33128;
  undefined8 uStack_33120;
  undefined8 uStack_33118;
  undefined8 uStack_33110;
  undefined8 uStack_33108;
  undefined8 uStack_33100;
  undefined8 uStack_330f8;
  undefined8 uStack_330f0;
  ulong uStack_330e8;
  undefined8 uStack_330d8;
  undefined8 uStack_330a0;
  undefined8 uStack_33098;
  undefined8 uStack_33090;
  undefined8 uStack_33088;
  undefined8 uStack_33080;
  undefined8 uStack_33078;
  undefined8 uStack_33070;
  undefined8 uStack_33068;
  undefined8 uStack_33060;
  undefined8 uStack_33058;
  undefined8 uStack_33050;
  undefined8 uStack_33048;
  undefined8 uStack_33040;
  undefined8 uStack_33038;
  undefined8 uStack_33030;
  undefined8 uStack_33028;
  undefined8 uStack_33020;
  undefined8 uStack_33018;
  undefined8 uStack_33010;
  undefined8 uStack_33008;
  undefined8 uStack_33000;
  undefined8 uStack_32ff8;
  undefined8 uStack_32ff0;
  undefined8 uStack_32fe8;
  undefined8 uStack_32fe0;
  undefined8 uStack_32fd8;
  undefined8 uStack_32fd0;
  undefined8 uStack_32fc8;
  undefined8 uStack_32fc0;
  undefined8 uStack_32fb8;
  undefined8 uStack_32fb0;
  undefined8 uStack_32fa8;
  undefined8 uStack_32fa0;
  undefined8 uStack_32f98;
  undefined8 uStack_32f90;
  undefined8 uStack_32f88;
  undefined8 uStack_32f80;
  undefined8 uStack_32f78;
  undefined8 uStack_32f70;
  undefined8 uStack_32f68;
  ulong uStack_32f60;
  undefined8 uStack_32f58;
  undefined8 uStack_32f50;
  undefined8 uStack_32f48;
  undefined8 uStack_32f40;
  undefined8 uStack_32f38;
  undefined8 uStack_32f30;
  undefined8 uStack_32f28;
  undefined8 uStack_32f20;
  undefined8 uStack_32f18;
  undefined8 uStack_32f10;
  undefined8 uStack_32f08;
  undefined8 uStack_32f00;
  undefined8 uStack_32ef8;
  ulong uStack_32ef0;
  undefined8 uStack_32ee8;
  undefined8 uStack_32ee0;
  undefined8 uStack_32ed8;
  undefined8 uStack_32ed0;
  undefined8 uStack_32ec8;
  undefined8 uStack_32ec0;
  undefined8 uStack_32eb8;
  undefined8 uStack_32eb0;
  undefined8 uStack_32ea8;
  undefined8 uStack_32ea0;
  undefined8 uStack_32e98;
  undefined8 uStack_32e90;
  undefined8 uStack_32e88;
  undefined8 uStack_32e80;
  ulong uStack_32e78;
  undefined8 uStack_32e70;
  undefined8 uStack_32e68;
  undefined8 uStack_32e60;
  undefined8 uStack_32e58;
  undefined8 uStack_32e50;
  undefined8 uStack_32e48;
  undefined8 uStack_32e40;
  undefined8 uStack_32e38;
  undefined8 uStack_32e30;
  undefined8 uStack_32e28;
  undefined8 uStack_32e20;
  undefined8 uStack_32e18;
  undefined8 uStack_32e10;
  undefined8 uStack_32e08;
  ulong uStack_32e00;
  undefined8 uStack_32df0;
  undefined8 uStack_32de8;
  undefined8 uStack_32de0;
  undefined8 uStack_32dd8;
  undefined8 uStack_32dd0;
  undefined8 uStack_32dc8;
  undefined8 uStack_32dc0;
  undefined8 uStack_32db8;
  undefined8 uStack_32db0;
  undefined8 uStack_32da8;
  undefined8 uStack_32da0;
  undefined8 uStack_32d98;
  undefined8 uStack_32d90;
  undefined8 uStack_32d88;
  undefined8 uStack_32d80;
  undefined8 uStack_32d78;
  undefined8 uStack_32d70;
  undefined8 uStack_32d68;
  undefined8 uStack_32d60;
  undefined8 uStack_32d58;
  undefined8 uStack_32d50;
  undefined8 uStack_32d48;
  undefined8 uStack_32d40;
  undefined8 uStack_32d38;
  undefined8 uStack_32d30;
  undefined8 uStack_32d28;
  undefined8 uStack_32cd0;
  undefined8 uStack_32cc8;
  undefined8 uStack_32cc0;
  undefined8 uStack_32cb8;
  undefined8 uStack_32cb0;
  undefined8 uStack_32ca8;
  undefined8 uStack_32ca0;
  undefined8 uStack_32c98;
  undefined8 uStack_32c90;
  undefined8 uStack_32c88;
  undefined8 uStack_32c80;
  ulong uStack_32c78;
  undefined8 uStack_32c70;
  undefined8 uStack_32c68;
  undefined8 uStack_32c60;
  undefined8 uStack_32c58;
  undefined8 uStack_32c50;
  undefined8 uStack_32c48;
  undefined8 uStack_32c40;
  undefined8 uStack_32c38;
  undefined8 uStack_32c30;
  undefined8 uStack_32c28;
  undefined8 uStack_32c20;
  undefined8 uStack_32c18;
  undefined8 uStack_32c10;
  ulong uStack_32c08;
  undefined8 uStack_32c00;
  undefined8 uStack_32bf8;
  undefined8 uStack_32bf0;
  undefined8 uStack_32be8;
  undefined8 uStack_32be0;
  undefined8 uStack_32bd8;
  undefined8 uStack_32bd0;
  undefined8 uStack_32bc8;
  undefined8 uStack_32bc0;
  undefined8 uStack_32bb8;
  undefined8 uStack_32bb0;
  undefined8 uStack_32ba8;
  undefined8 uStack_32ba0;
  undefined8 uStack_32b98;
  ulong uStack_32b90;
  undefined8 uStack_32b88;
  undefined8 uStack_32b80;
  undefined8 uStack_32b78;
  undefined8 uStack_32b70;
  undefined8 uStack_32b68;
  undefined8 uStack_32b60;
  undefined8 uStack_32b58;
  undefined8 uStack_32b50;
  undefined8 uStack_32b48;
  undefined8 uStack_32b40;
  undefined8 uStack_32b38;
  undefined8 uStack_32b30;
  undefined8 uStack_32b28;
  undefined8 uStack_32b20;
  ulong uStack_32b18;
  undefined8 uStack_32b08;
  undefined8 uStack_32b00;
  undefined8 uStack_32af8;
  undefined8 uStack_32af0;
  undefined8 uStack_32ae8;
  undefined8 uStack_32ae0;
  undefined8 uStack_32ad8;
  undefined8 uStack_329e8;
  undefined8 uStack_329e0;
  undefined8 uStack_329d8;
  undefined8 uStack_329d0;
  undefined8 uStack_329c8;
  undefined8 uStack_329c0;
  undefined8 uStack_329b8;
  undefined8 uStack_329b0;
  undefined8 uStack_329a8;
  undefined8 uStack_329a0;
  undefined8 uStack_32998;
  ulong uStack_32990;
  undefined8 uStack_32988;
  undefined8 uStack_32980;
  undefined8 uStack_32978;
  undefined8 uStack_32970;
  undefined8 uStack_32968;
  undefined8 uStack_32960;
  undefined8 uStack_32958;
  undefined8 uStack_32950;
  undefined8 uStack_32948;
  undefined8 uStack_32940;
  undefined8 uStack_32938;
  undefined8 uStack_32930;
  undefined8 uStack_32928;
  ulong uStack_32920;
  undefined8 uStack_328a0;
  undefined8 uStack_32898;
  undefined8 uStack_32890;
  undefined8 uStack_32888;
  undefined8 uStack_32880;
  undefined8 uStack_32878;
  undefined8 uStack_32870;
  undefined8 uStack_32868;
  undefined8 uStack_32860;
  undefined8 uStack_32858;
  undefined8 uStack_32850;
  undefined8 uStack_32848;
  undefined8 uStack_32840;
  undefined8 uStack_32838;
  ulong uStack_32830;
  undefined8 uStack_32828;
  undefined8 uStack_327e8;
  undefined8 uStack_327e0;
  undefined8 uStack_327d8;
  undefined8 uStack_327d0;
  undefined8 uStack_327c8;
  undefined8 uStack_327c0;
  undefined8 uStack_327b8;
  undefined8 uStack_32750;
  undefined8 uStack_32748;
  undefined8 uStack_32740;
  undefined8 uStack_32738;
  undefined8 uStack_32730;
  undefined8 uStack_32728;
  undefined8 uStack_32720;
  undefined8 uStack_32718;
  undefined8 uStack_32710;
  undefined8 uStack_32708;
  undefined8 uStack_32700;
  undefined8 uStack_326f8;
  undefined8 uStack_326f0;
  undefined8 uStack_326e8;
  undefined8 uStack_326e0;
  undefined8 uStack_326d8;
  undefined8 uStack_326d0;
  undefined8 uStack_326c8;
  undefined8 uStack_326c0;
  undefined8 uStack_326b8;
  undefined8 uStack_326b0;
  ulong uStack_326a8;
  undefined8 uStack_32630;
  undefined8 uStack_32628;
  undefined8 uStack_32620;
  undefined8 uStack_32618;
  undefined8 uStack_32610;
  undefined8 uStack_32608;
  undefined8 uStack_32600;
  undefined8 uStack_325f8;
  undefined8 uStack_325f0;
  undefined8 uStack_325e8;
  undefined8 uStack_325e0;
  undefined8 uStack_325d8;
  undefined8 uStack_325d0;
  undefined8 uStack_325c8;
  ulong uStack_325c0;
  undefined8 uStack_325b8;
  undefined8 uStack_325b0;
  undefined8 uStack_325a8;
  undefined8 uStack_325a0;
  undefined8 uStack_32598;
  undefined8 uStack_32590;
  undefined8 uStack_32588;
  undefined8 uStack_32580;
  undefined8 uStack_32578;
  undefined8 uStack_32570;
  undefined8 uStack_32568;
  undefined8 uStack_32560;
  undefined8 uStack_32558;
  undefined8 uStack_32550;
  ulong uStack_32548;
  undefined8 uStack_32540;
  undefined8 uStack_32538;
  undefined8 uStack_32500;
  undefined8 uStack_324f8;
  undefined8 uStack_324f0;
  undefined8 uStack_324e8;
  undefined8 uStack_324e0;
  undefined8 uStack_324d8;
  undefined8 uStack_324d0;
  undefined8 uStack_324c8;
  undefined8 uStack_324c0;
  undefined8 uStack_324b8;
  undefined8 uStack_324b0;
  undefined8 uStack_324a8;
  undefined8 uStack_324a0;
  undefined8 uStack_32498;
  undefined8 uStack_32490;
  undefined8 uStack_32488;
  undefined8 uStack_32480;
  undefined8 uStack_32478;
  undefined8 uStack_32470;
  undefined8 uStack_32418;
  undefined8 uStack_32410;
  undefined8 uStack_32408;
  undefined8 uStack_32400;
  undefined8 uStack_323f8;
  undefined8 uStack_323f0;
  undefined8 uStack_323e8;
  undefined8 uStack_323e0;
  undefined8 uStack_323d8;
  undefined8 uStack_323d0;
  undefined8 uStack_323c8;
  ulong uStack_323c0;
  undefined8 uStack_323b8;
  undefined8 uStack_323b0;
  undefined8 uStack_323a8;
  undefined8 uStack_323a0;
  undefined8 uStack_32398;
  undefined8 uStack_32390;
  undefined8 uStack_32388;
  undefined8 uStack_32380;
  undefined8 uStack_32378;
  undefined8 uStack_32370;
  undefined8 uStack_32368;
  undefined8 uStack_32360;
  undefined8 uStack_32358;
  ulong uStack_32350;
  undefined8 uStack_32348;
  undefined8 uStack_32340;
  undefined8 uStack_32338;
  undefined8 uStack_32330;
  undefined8 uStack_32328;
  undefined8 uStack_32320;
  undefined8 uStack_32318;
  undefined8 uStack_32310;
  undefined8 uStack_32308;
  undefined8 uStack_32300;
  undefined8 uStack_322f8;
  undefined8 uStack_322f0;
  undefined8 uStack_322e8;
  undefined8 uStack_322e0;
  ulong uStack_322d8;
  undefined8 uStack_322d0;
  undefined8 uStack_322c8;
  undefined8 uStack_322c0;
  undefined8 uStack_322b8;
  undefined8 uStack_322b0;
  undefined8 uStack_322a8;
  undefined8 uStack_322a0;
  undefined8 uStack_32298;
  undefined8 uStack_32290;
  undefined8 uStack_32288;
  undefined8 uStack_32280;
  undefined8 uStack_32278;
  undefined8 uStack_32270;
  undefined8 uStack_32268;
  ulong uStack_32260;
  undefined8 uStack_32258;
  undefined8 uStack_32250;
  undefined8 uStack_32248;
  undefined8 uStack_32240;
  undefined8 uStack_32238;
  undefined8 uStack_32230;
  undefined8 uStack_32228;
  undefined8 uStack_32220;
  undefined8 uStack_32130;
  undefined8 uStack_32128;
  undefined8 uStack_32120;
  undefined8 uStack_32118;
  undefined8 uStack_32110;
  undefined8 uStack_32108;
  undefined8 uStack_32100;
  undefined8 uStack_320f8;
  undefined8 uStack_320f0;
  undefined8 uStack_320e8;
  undefined8 uStack_320e0;
  ulong uStack_320d8;
  undefined8 uStack_320d0;
  undefined8 uStack_320c8;
  undefined8 uStack_320c0;
  undefined8 uStack_320b8;
  undefined8 uStack_320b0;
  undefined8 uStack_320a8;
  undefined8 uStack_320a0;
  undefined8 uStack_32098;
  undefined8 uStack_32090;
  undefined8 uStack_32088;
  undefined8 uStack_32080;
  undefined8 uStack_32078;
  undefined8 uStack_32070;
  ulong uStack_32068;
  undefined8 uStack_31fe8;
  undefined8 uStack_31fe0;
  undefined8 uStack_31fd8;
  undefined8 uStack_31fd0;
  undefined8 uStack_31fc8;
  undefined8 uStack_31fc0;
  undefined8 uStack_31fb8;
  undefined8 uStack_31fb0;
  undefined8 uStack_31fa8;
  undefined8 uStack_31fa0;
  undefined8 uStack_31f98;
  undefined8 uStack_31f90;
  undefined8 uStack_31f88;
  undefined8 uStack_31f80;
  ulong uStack_31f78;
  undefined8 uStack_31f70;
  undefined8 uStack_31f30;
  undefined8 uStack_31f28;
  undefined8 uStack_31f20;
  undefined8 uStack_31f18;
  undefined8 uStack_31f10;
  undefined8 uStack_31f08;
  undefined8 uStack_31f00;
  undefined8 uStack_31e48;
  undefined8 uStack_31e40;
  undefined8 uStack_31e38;
  undefined8 uStack_31e30;
  undefined8 uStack_31e28;
  undefined8 uStack_31e20;
  undefined8 uStack_31e18;
  undefined8 uStack_31e10;
  undefined8 uStack_31e08;
  undefined8 uStack_31e00;
  undefined8 uStack_31df8;
  ulong uStack_31df0;
  undefined8 uStack_31d78;
  undefined8 uStack_31d70;
  undefined8 uStack_31d68;
  undefined8 uStack_31d60;
  undefined8 uStack_31d58;
  undefined8 uStack_31d50;
  undefined8 uStack_31d48;
  undefined8 uStack_31d40;
  undefined8 uStack_31d38;
  undefined8 uStack_31d30;
  undefined8 uStack_31d28;
  undefined8 uStack_31d20;
  undefined8 uStack_31d18;
  undefined8 uStack_31d10;
  ulong uStack_31d08;
  undefined8 uStack_31d00;
  undefined8 uStack_31cf8;
  undefined8 uStack_31cf0;
  undefined8 uStack_31ce8;
  undefined8 uStack_31ce0;
  undefined8 uStack_31cd8;
  undefined8 uStack_31cd0;
  undefined8 uStack_31cc8;
  undefined8 uStack_31cc0;
  undefined8 uStack_31cb8;
  undefined8 uStack_31cb0;
  undefined8 uStack_31ca8;
  undefined8 uStack_31ca0;
  undefined8 uStack_31c98;
  ulong uStack_31c90;
  undefined8 uStack_31c88;
  undefined8 uStack_31c80;
  undefined8 uStack_31b60;
  undefined8 uStack_31b58;
  undefined8 uStack_31b50;
  undefined8 uStack_31b48;
  undefined8 uStack_31b40;
  undefined8 uStack_31b38;
  undefined8 uStack_31b30;
  undefined8 uStack_31b28;
  undefined8 uStack_31b20;
  undefined8 uStack_31b18;
  undefined8 uStack_31b10;
  ulong uStack_31b08;
  undefined8 uStack_31b00;
  undefined8 uStack_31af8;
  undefined8 uStack_31af0;
  undefined8 uStack_31ae8;
  undefined8 uStack_31ae0;
  undefined8 uStack_31ad8;
  undefined8 uStack_31ad0;
  undefined8 uStack_31ac8;
  undefined8 uStack_31ac0;
  undefined8 uStack_31ab8;
  undefined8 uStack_31ab0;
  undefined8 uStack_31aa8;
  undefined8 uStack_31aa0;
  ulong uStack_31a98;
  undefined8 uStack_31a18;
  undefined8 uStack_31a10;
  undefined8 uStack_31a08;
  undefined8 uStack_31a00;
  undefined8 uStack_319f8;
  undefined8 uStack_319f0;
  undefined8 uStack_319e8;
  undefined8 uStack_319e0;
  undefined8 uStack_319d8;
  undefined8 uStack_319d0;
  undefined8 uStack_319c8;
  undefined8 uStack_319c0;
  undefined8 uStack_319b8;
  undefined8 uStack_319b0;
  ulong uStack_319a8;
  undefined8 uStack_319a0;
  undefined8 uStack_31878;
  undefined8 uStack_31870;
  undefined8 uStack_31868;
  undefined8 uStack_31860;
  undefined8 uStack_31858;
  undefined8 uStack_31850;
  undefined8 uStack_31848;
  undefined8 uStack_31840;
  undefined8 uStack_31838;
  undefined8 uStack_31830;
  undefined8 uStack_31828;
  ulong uStack_31820;
  undefined8 uStack_31730;
  undefined8 uStack_31728;
  undefined8 uStack_31720;
  undefined8 uStack_31718;
  undefined8 uStack_31710;
  undefined8 uStack_31708;
  undefined8 uStack_31700;
  undefined8 uStack_316f8;
  undefined8 uStack_316f0;
  undefined8 uStack_316e8;
  undefined8 uStack_316e0;
  undefined8 uStack_316d8;
  undefined8 uStack_316d0;
  undefined8 uStack_316c8;
  ulong uStack_316c0;
  undefined8 uStack_315e0;
  undefined8 uStack_315d8;
  undefined8 uStack_315d0;
  undefined8 uStack_315c8;
  undefined8 uStack_315c0;
  undefined8 uStack_315b8;
  undefined8 uStack_315b0;
  undefined8 uStack_315a8;
  undefined8 uStack_315a0;
  undefined8 uStack_31598;
  undefined8 uStack_314c0;
  undefined8 uStack_314b8;
  undefined8 uStack_314b0;
  undefined8 uStack_314a8;
  undefined8 uStack_314a0;
  undefined8 uStack_31498;
  undefined8 uStack_31490;
  undefined8 uStack_31488;
  undefined8 uStack_31480;
  undefined8 uStack_31478;
  undefined8 uStack_31470;
  undefined8 uStack_31468;
  undefined8 uStack_31460;
  undefined8 uStack_31458;
  ulong uStack_31450;
  undefined8 uStack_31448;
  undefined8 uStack_31440;
  undefined8 uStack_31438;
  undefined8 uStack_31430;
  undefined8 uStack_31428;
  undefined8 uStack_31420;
  undefined8 uStack_31418;
  undefined8 uStack_31410;
  undefined8 uStack_31408;
  undefined8 uStack_31400;
  undefined8 uStack_313f8;
  undefined8 uStack_313f0;
  undefined8 uStack_313e8;
  undefined8 uStack_313e0;
  ulong uStack_313d8;
  undefined8 uStack_31358;
  undefined8 uStack_31350;
  undefined8 uStack_31348;
  undefined8 uStack_31340;
  undefined8 uStack_31338;
  undefined8 uStack_31330;
  undefined8 uStack_31328;
  undefined8 uStack_31320;
  undefined8 uStack_31318;
  undefined8 uStack_31310;
  undefined8 uStack_31308;
  undefined8 uStack_31300;
  undefined8 uStack_312f8;
  undefined8 uStack_312f0;
  undefined8 uStack_312e8;
  undefined8 uStack_312e0;
  undefined8 uStack_312d8;
  undefined8 uStack_312d0;
  undefined8 uStack_312c8;
  undefined8 uStack_312c0;
  undefined8 uStack_312b8;
  undefined8 uStack_312b0;
  undefined8 uStack_31248;
  undefined8 uStack_31240;
  undefined8 uStack_31238;
  undefined8 uStack_31230;
  undefined8 uStack_31228;
  undefined8 uStack_31220;
  undefined8 uStack_31218;
  undefined8 uStack_31210;
  undefined8 uStack_31208;
  undefined8 uStack_31200;
  undefined8 uStack_311f8;
  undefined8 uStack_311f0;
  undefined8 uStack_311e8;
  ulong uStack_311e0;
  undefined8 uStack_311d8;
  undefined8 uStack_311d0;
  undefined8 uStack_311c8;
  undefined8 uStack_311c0;
  undefined8 uStack_311b8;
  undefined8 uStack_311b0;
  undefined8 uStack_311a8;
  undefined8 uStack_311a0;
  undefined8 uStack_31198;
  undefined8 uStack_31190;
  undefined8 uStack_31188;
  undefined8 uStack_31180;
  undefined8 uStack_31178;
  undefined8 uStack_31170;
  ulong uStack_31168;
  undefined8 uStack_31160;
  undefined8 uStack_31158;
  undefined8 uStack_31150;
  undefined8 uStack_31148;
  undefined8 uStack_31140;
  undefined8 uStack_31138;
  undefined8 uStack_31130;
  undefined8 uStack_31128;
  undefined8 uStack_31120;
  undefined8 uStack_31118;
  undefined8 uStack_31110;
  undefined8 uStack_31108;
  undefined8 uStack_31100;
  undefined8 uStack_310f8;
  ulong uStack_310f0;
  undefined8 uStack_310d8;
  undefined8 uStack_310d0;
  undefined8 uStack_310c8;
  undefined8 uStack_310c0;
  undefined8 uStack_310b8;
  undefined8 uStack_310b0;
  undefined8 uStack_31070;
  undefined8 uStack_31068;
  undefined8 uStack_31060;
  undefined8 uStack_31058;
  undefined8 uStack_31050;
  undefined8 uStack_31048;
  undefined8 uStack_31040;
  undefined8 uStack_31038;
  undefined8 uStack_31030;
  undefined8 uStack_31028;
  undefined8 uStack_31020;
  undefined8 uStack_31018;
  undefined8 uStack_31010;
  undefined8 uStack_31008;
  undefined8 uStack_31000;
  undefined8 uStack_30ff8;
  undefined8 uStack_30ff0;
  undefined8 uStack_30fe8;
  undefined8 uStack_30fe0;
  undefined8 uStack_30fd8;
  undefined8 uStack_30fd0;
  undefined8 uStack_30fc8;
  undefined8 uStack_30f60;
  undefined8 uStack_30f58;
  undefined8 uStack_30f50;
  undefined8 uStack_30f48;
  undefined8 uStack_30f40;
  undefined8 uStack_30f38;
  undefined8 uStack_30f30;
  undefined8 uStack_30f28;
  undefined8 uStack_30f20;
  undefined8 uStack_30f18;
  undefined8 uStack_30f10;
  undefined8 uStack_30f08;
  undefined8 uStack_30f00;
  ulong uStack_30ef8;
  undefined8 uStack_30ef0;
  undefined8 uStack_30ee8;
  undefined8 uStack_30ee0;
  undefined8 uStack_30ed8;
  undefined8 uStack_30ed0;
  undefined8 uStack_30ec8;
  undefined8 uStack_30ec0;
  undefined8 uStack_30eb8;
  undefined8 uStack_30eb0;
  undefined8 uStack_30ea8;
  undefined8 uStack_30ea0;
  undefined8 uStack_30e98;
  undefined8 uStack_30e90;
  undefined8 uStack_30e88;
  ulong uStack_30e80;
  undefined8 uStack_30e78;
  undefined8 uStack_30e70;
  undefined8 uStack_30e68;
  undefined8 uStack_30e60;
  undefined8 uStack_30e58;
  undefined8 uStack_30e50;
  undefined8 uStack_30e48;
  undefined8 uStack_30e40;
  undefined8 uStack_30e38;
  undefined8 uStack_30e30;
  undefined8 uStack_30e28;
  undefined8 uStack_30e20;
  undefined8 uStack_30e18;
  undefined8 uStack_30e10;
  ulong uStack_30e08;
  undefined8 uStack_30df0;
  undefined8 uStack_30de8;
  undefined8 uStack_30de0;
  undefined8 uStack_30dd8;
  undefined8 uStack_30dd0;
  undefined8 uStack_30dc8;
  undefined8 uStack_30d88;
  undefined8 uStack_30d80;
  undefined8 uStack_30d78;
  undefined8 uStack_30d70;
  undefined8 uStack_30d68;
  undefined8 uStack_30d60;
  undefined8 uStack_30d58;
  undefined8 uStack_30d50;
  undefined8 uStack_30d48;
  undefined8 uStack_30d40;
  undefined8 uStack_30d38;
  undefined8 uStack_30d30;
  undefined8 uStack_30c78;
  undefined8 uStack_30c70;
  undefined8 uStack_30c68;
  undefined8 uStack_30c60;
  undefined8 uStack_30c58;
  undefined8 uStack_30c50;
  undefined8 uStack_30c48;
  undefined8 uStack_30c40;
  undefined8 uStack_30c38;
  undefined8 uStack_30c30;
  undefined8 uStack_30c28;
  undefined8 uStack_30c20;
  undefined8 uStack_30c18;
  ulong uStack_30c10;
  undefined8 uStack_30c08;
  undefined8 uStack_30c00;
  undefined8 uStack_30bf8;
  undefined8 uStack_30bf0;
  undefined8 uStack_30be8;
  undefined8 uStack_30be0;
  undefined8 uStack_30bd8;
  undefined8 uStack_30bd0;
  undefined8 uStack_30bc8;
  undefined8 uStack_30bc0;
  undefined8 uStack_30bb8;
  undefined8 uStack_30bb0;
  undefined8 uStack_30ba8;
  undefined8 uStack_30ba0;
  ulong uStack_30b98;
  undefined8 uStack_30b90;
  undefined8 uStack_30b88;
  undefined8 uStack_30b80;
  undefined8 uStack_30b78;
  undefined8 uStack_30b70;
  undefined8 uStack_30b68;
  undefined8 uStack_30b60;
  undefined8 uStack_30b58;
  undefined8 uStack_30b50;
  undefined8 uStack_30b48;
  undefined8 uStack_30b40;
  undefined8 uStack_30b38;
  undefined8 uStack_30b30;
  undefined8 uStack_30b28;
  ulong uStack_30b20;
  undefined8 uStack_30b08;
  undefined8 uStack_30b00;
  undefined8 uStack_30af8;
  undefined8 uStack_30af0;
  undefined8 uStack_30ae8;
  undefined8 uStack_30ae0;
  undefined8 uStack_30990;
  undefined8 uStack_30988;
  undefined8 uStack_30980;
  undefined8 uStack_30978;
  undefined8 uStack_30970;
  undefined8 uStack_30968;
  undefined8 uStack_30960;
  undefined8 uStack_30958;
  undefined8 uStack_30950;
  undefined8 uStack_30948;
  undefined8 uStack_30940;
  undefined8 uStack_30938;
  undefined8 uStack_30930;
  ulong uStack_30928;
  undefined8 uStack_308a8;
  undefined8 uStack_308a0;
  undefined8 uStack_30898;
  undefined8 uStack_30890;
  undefined8 uStack_30888;
  undefined8 uStack_30880;
  undefined8 uStack_30878;
  undefined8 uStack_30870;
  undefined8 uStack_30868;
  undefined8 uStack_30860;
  undefined8 uStack_30858;
  undefined8 uStack_30850;
  undefined8 uStack_30848;
  undefined8 uStack_30840;
  ulong uStack_30838;
  undefined8 uStack_307f0;
  undefined8 uStack_307e8;
  undefined8 uStack_307e0;
  undefined8 uStack_307d8;
  undefined8 uStack_307d0;
  undefined8 uStack_307c8;
  undefined8 uStack_307c0;
  undefined8 uStack_30758;
  undefined8 uStack_30750;
  undefined8 uStack_30748;
  undefined8 uStack_30740;
  undefined8 uStack_30738;
  undefined8 uStack_30730;
  undefined8 uStack_30728;
  undefined8 uStack_30720;
  undefined8 uStack_30718;
  undefined8 uStack_30710;
  undefined8 uStack_30708;
  undefined8 uStack_30700;
  undefined8 uStack_306f8;
  undefined8 uStack_306f0;
  undefined8 uStack_306e8;
  undefined8 uStack_306e0;
  undefined8 uStack_306d8;
  undefined8 uStack_306d0;
  undefined8 uStack_306c8;
  undefined8 uStack_306c0;
  undefined8 uStack_306b8;
  ulong uStack_306b0;
  undefined8 uStack_30638;
  undefined8 uStack_30630;
  undefined8 uStack_30628;
  undefined8 uStack_30620;
  undefined8 uStack_30618;
  undefined8 uStack_30610;
  undefined8 uStack_30608;
  undefined8 uStack_30600;
  undefined8 uStack_305f8;
  undefined8 uStack_305f0;
  undefined8 uStack_305e8;
  undefined8 uStack_305e0;
  undefined8 uStack_305d8;
  undefined8 uStack_305d0;
  undefined8 uStack_305c8;
  undefined8 uStack_305c0;
  undefined8 uStack_305b8;
  undefined8 uStack_305b0;
  undefined8 uStack_305a8;
  undefined8 uStack_305a0;
  undefined8 uStack_30598;
  undefined8 uStack_30590;
  undefined8 uStack_30588;
  undefined8 uStack_30580;
  undefined8 uStack_30578;
  undefined8 uStack_30570;
  undefined8 uStack_30568;
  undefined8 uStack_30560;
  undefined8 uStack_30558;
  ulong uStack_30550;
  undefined8 uStack_30540;
  undefined8 uStack_30508;
  undefined8 uStack_30500;
  undefined8 uStack_304f8;
  undefined8 uStack_304f0;
  undefined8 uStack_304e8;
  undefined8 uStack_304e0;
  undefined8 uStack_304d8;
  undefined8 uStack_304d0;
  undefined8 uStack_304c8;
  undefined8 uStack_304c0;
  undefined8 uStack_304b8;
  undefined8 uStack_304b0;
  undefined8 uStack_304a8;
  undefined8 uStack_304a0;
  undefined8 uStack_30498;
  undefined8 uStack_30490;
  undefined8 uStack_30488;
  undefined8 uStack_30480;
  undefined8 uStack_30478;
  undefined8 uStack_30470;
  undefined8 uStack_30468;
  undefined8 uStack_30460;
  undefined8 uStack_30458;
  undefined8 uStack_30450;
  undefined8 uStack_30448;
  undefined8 uStack_30440;
  undefined8 uStack_30438;
  undefined8 uStack_30430;
  undefined8 uStack_30428;
  undefined8 uStack_30420;
  undefined8 uStack_30418;
  undefined8 uStack_30410;
  undefined8 uStack_30408;
  undefined8 uStack_30400;
  undefined8 uStack_303f8;
  undefined8 uStack_303f0;
  undefined8 uStack_303e8;
  undefined8 uStack_303e0;
  undefined8 uStack_303d8;
  undefined8 uStack_303d0;
  ulong uStack_303c8;
  undefined8 uStack_303c0;
  undefined8 uStack_303b8;
  undefined8 uStack_303b0;
  undefined8 uStack_303a8;
  undefined8 uStack_303a0;
  undefined8 uStack_30398;
  undefined8 uStack_30390;
  undefined8 uStack_30388;
  undefined8 uStack_30380;
  undefined8 uStack_30378;
  undefined8 uStack_30370;
  undefined8 uStack_30368;
  undefined8 uStack_30360;
  undefined8 uStack_30358;
  undefined8 uStack_30350;
  undefined8 uStack_30348;
  undefined8 uStack_30340;
  undefined8 uStack_30338;
  undefined8 uStack_30330;
  undefined8 uStack_30328;
  undefined8 uStack_30320;
  undefined8 uStack_30318;
  undefined8 uStack_30310;
  undefined8 uStack_30308;
  undefined8 uStack_30300;
  undefined8 uStack_302f8;
  undefined8 uStack_302f0;
  undefined8 uStack_302e8;
  undefined8 uStack_302e0;
  undefined8 uStack_302d8;
  undefined8 uStack_302d0;
  undefined8 uStack_302c8;
  undefined8 uStack_302c0;
  undefined8 uStack_302b8;
  undefined8 uStack_302b0;
  undefined8 uStack_302a8;
  undefined8 uStack_302a0;
  undefined8 uStack_30298;
  undefined8 uStack_30290;
  undefined8 uStack_30288;
  undefined8 uStack_30280;
  undefined8 uStack_30278;
  undefined8 uStack_30270;
  ulong uStack_30268;
  undefined8 uStack_30258;
  undefined8 uStack_30250;
  undefined8 uStack_30248;
  undefined8 uStack_30240;
  undefined8 uStack_30238;
  undefined8 uStack_30230;
  undefined8 uStack_30228;
  undefined8 uStack_30220;
  undefined8 uStack_30218;
  undefined8 uStack_30210;
  undefined8 uStack_30208;
  undefined8 uStack_30200;
  undefined8 uStack_301f8;
  undefined8 uStack_301f0;
  undefined8 uStack_301e8;
  undefined8 uStack_301e0;
  undefined8 uStack_301d8;
  undefined8 uStack_301d0;
  undefined8 uStack_301c8;
  undefined8 uStack_301c0;
  undefined8 uStack_301b8;
  undefined8 uStack_301b0;
  undefined8 uStack_301a8;
  undefined8 uStack_301a0;
  undefined8 uStack_30198;
  undefined8 uStack_30190;
  undefined8 uStack_30138;
  undefined8 uStack_30130;
  undefined8 uStack_30128;
  undefined8 uStack_30120;
  undefined8 uStack_30118;
  undefined8 uStack_30110;
  undefined8 uStack_30108;
  undefined8 uStack_30100;
  undefined8 uStack_300f8;
  undefined8 uStack_300f0;
  undefined8 uStack_300e8;
  ulong uStack_300e0;
  undefined8 uStack_300d8;
  undefined8 uStack_300d0;
  undefined8 uStack_300c8;
  undefined8 uStack_300c0;
  undefined8 uStack_300b8;
  undefined8 uStack_300b0;
  undefined8 uStack_300a8;
  undefined8 uStack_300a0;
  undefined8 uStack_30098;
  undefined8 uStack_30090;
  undefined8 uStack_30088;
  undefined8 uStack_30080;
  undefined8 uStack_30078;
  undefined8 uStack_30070;
  undefined8 uStack_30068;
  undefined8 uStack_30060;
  undefined8 uStack_30058;
  undefined8 uStack_30050;
  undefined8 uStack_30048;
  undefined8 uStack_30040;
  undefined8 uStack_30038;
  undefined8 uStack_30030;
  undefined8 uStack_30028;
  undefined8 uStack_30020;
  undefined8 uStack_30018;
  undefined8 uStack_30010;
  undefined8 uStack_30008;
  undefined8 uStack_30000;
  undefined8 uStack_2fff8;
  undefined8 uStack_2fff0;
  undefined8 uStack_2ffe8;
  undefined8 uStack_2ffe0;
  undefined8 uStack_2ffd8;
  undefined8 uStack_2ffd0;
  undefined8 uStack_2ffc8;
  undefined8 uStack_2ffc0;
  undefined8 uStack_2ffb8;
  undefined8 uStack_2ffb0;
  undefined8 uStack_2ffa8;
  undefined8 uStack_2ffa0;
  undefined8 uStack_2ff98;
  undefined8 uStack_2ff90;
  undefined8 uStack_2ff88;
  ulong uStack_2ff80;
  undefined8 uStack_2ff70;
  undefined8 uStack_2ff68;
  undefined8 uStack_2ff60;
  undefined8 uStack_2ff58;
  undefined8 uStack_2ff50;
  undefined8 uStack_2ff48;
  undefined8 uStack_2ff40;
  undefined8 uStack_2fe50;
  undefined8 uStack_2fe48;
  undefined8 uStack_2fe40;
  undefined8 uStack_2fe38;
  undefined8 uStack_2fe30;
  undefined8 uStack_2fe28;
  undefined8 uStack_2fe20;
  undefined8 uStack_2fe18;
  undefined8 uStack_2fe10;
  undefined8 uStack_2fe08;
  undefined8 uStack_2fe00;
  ulong uStack_2fdf8;
  undefined8 uStack_2fdf0;
  undefined8 uStack_2fde8;
  undefined8 uStack_2fde0;
  undefined8 uStack_2fdd8;
  undefined8 uStack_2fdd0;
  undefined8 uStack_2fdc8;
  undefined8 uStack_2fdc0;
  undefined8 uStack_2fdb8;
  undefined8 uStack_2fdb0;
  undefined8 uStack_2fda8;
  undefined8 uStack_2fda0;
  undefined8 uStack_2fd98;
  undefined8 uStack_2fd90;
  undefined8 uStack_2fd88;
  undefined8 uStack_2fd08;
  undefined8 uStack_2fd00;
  undefined8 uStack_2fcf8;
  undefined8 uStack_2fcf0;
  undefined8 uStack_2fce8;
  undefined8 uStack_2fce0;
  undefined8 uStack_2fcd8;
  undefined8 uStack_2fcd0;
  undefined8 uStack_2fcc8;
  undefined8 uStack_2fcc0;
  undefined8 uStack_2fcb8;
  undefined8 uStack_2fcb0;
  undefined8 uStack_2fca8;
  undefined8 uStack_2fca0;
  ulong uStack_2fc98;
  undefined8 uStack_2fc90;
  undefined8 uStack_2fc50;
  undefined8 uStack_2fc48;
  undefined8 uStack_2fc40;
  undefined8 uStack_2fc38;
  undefined8 uStack_2fc30;
  undefined8 uStack_2fc28;
  undefined8 uStack_2fc20;
  undefined8 uStack_2fbb8;
  undefined8 uStack_2fbb0;
  undefined8 uStack_2fba8;
  undefined8 uStack_2fba0;
  undefined8 uStack_2fb98;
  undefined8 uStack_2fb90;
  undefined8 uStack_2fb88;
  undefined8 uStack_2fb80;
  undefined8 uStack_2fb78;
  undefined8 uStack_2fb70;
  undefined8 uStack_2fb68;
  undefined8 uStack_2fb60;
  undefined8 uStack_2fb58;
  undefined8 uStack_2fb50;
  undefined8 uStack_2fb48;
  undefined8 uStack_2fb40;
  undefined8 uStack_2fb38;
  undefined8 uStack_2fb30;
  undefined8 uStack_2fb28;
  undefined8 uStack_2fb20;
  undefined8 uStack_2fb18;
  undefined8 uStack_2fb10;
  undefined8 uStack_2fa98;
  undefined8 uStack_2fa90;
  undefined8 uStack_2fa88;
  undefined8 uStack_2fa80;
  undefined8 uStack_2fa78;
  undefined8 uStack_2fa70;
  undefined8 uStack_2fa68;
  undefined8 uStack_2fa60;
  undefined8 uStack_2fa58;
  undefined8 uStack_2fa50;
  undefined8 uStack_2fa48;
  undefined8 uStack_2fa40;
  undefined8 uStack_2fa38;
  undefined8 uStack_2fa30;
  undefined8 uStack_2fa28;
  undefined8 uStack_2fa20;
  undefined8 uStack_2fa18;
  undefined8 uStack_2fa10;
  undefined8 uStack_2fa08;
  undefined8 uStack_2fa00;
  undefined8 uStack_2f9f8;
  undefined8 uStack_2f9f0;
  undefined8 uStack_2f9e8;
  undefined8 uStack_2f9e0;
  undefined8 uStack_2f9d8;
  undefined8 uStack_2f9d0;
  undefined8 uStack_2f9c8;
  undefined8 uStack_2f9c0;
  undefined8 uStack_2f9b8;
  ulong uStack_2f9b0;
  undefined8 uStack_2f9a8;
  undefined8 uStack_2f9a0;
  undefined8 uStack_2f968;
  undefined8 uStack_2f960;
  undefined8 uStack_2f958;
  undefined8 uStack_2f950;
  undefined8 uStack_2f948;
  undefined8 uStack_2f940;
  undefined8 uStack_2f938;
  undefined8 uStack_2f930;
  undefined8 uStack_2f928;
  undefined8 uStack_2f920;
  undefined8 uStack_2f918;
  undefined8 uStack_2f910;
  undefined8 uStack_2f908;
  undefined8 uStack_2f900;
  undefined8 uStack_2f8f8;
  undefined8 uStack_2f8f0;
  undefined8 uStack_2f8e8;
  undefined8 uStack_2f8e0;
  undefined8 uStack_2f8d8;
  undefined8 uStack_2f880;
  undefined8 uStack_2f878;
  undefined8 uStack_2f870;
  undefined8 uStack_2f868;
  undefined8 uStack_2f860;
  undefined8 uStack_2f858;
  undefined8 uStack_2f850;
  undefined8 uStack_2f848;
  undefined8 uStack_2f840;
  undefined8 uStack_2f838;
  undefined8 uStack_2f830;
  undefined8 uStack_2f828;
  undefined8 uStack_2f820;
  undefined8 uStack_2f818;
  undefined8 uStack_2f810;
  undefined8 uStack_2f808;
  undefined8 uStack_2f800;
  undefined8 uStack_2f7f8;
  undefined8 uStack_2f7f0;
  undefined8 uStack_2f7e8;
  undefined8 uStack_2f7e0;
  undefined8 uStack_2f7d8;
  undefined8 uStack_2f7d0;
  undefined8 uStack_2f7c8;
  undefined8 uStack_2f7c0;
  undefined8 uStack_2f7b8;
  undefined8 uStack_2f7b0;
  undefined8 uStack_2f7a8;
  undefined8 uStack_2f7a0;
  undefined8 uStack_2f798;
  undefined8 uStack_2f790;
  undefined8 uStack_2f788;
  undefined8 uStack_2f780;
  undefined8 uStack_2f778;
  undefined8 uStack_2f770;
  undefined8 uStack_2f768;
  undefined8 uStack_2f760;
  undefined8 uStack_2f758;
  undefined8 uStack_2f750;
  undefined8 uStack_2f748;
  undefined8 uStack_2f740;
  undefined8 uStack_2f738;
  undefined8 uStack_2f730;
  undefined8 uStack_2f728;
  undefined8 uStack_2f720;
  undefined8 uStack_2f718;
  undefined8 uStack_2f710;
  undefined8 uStack_2f708;
  undefined8 uStack_2f700;
  undefined8 uStack_2f6f8;
  undefined8 uStack_2f6f0;
  undefined8 uStack_2f6e8;
  undefined8 uStack_2f6e0;
  undefined8 uStack_2f6d8;
  undefined8 uStack_2f6d0;
  ulong uStack_2f6c8;
  undefined8 uStack_2f6c0;
  undefined8 uStack_2f6b8;
  undefined8 uStack_2f6b0;
  undefined8 uStack_2f6a8;
  undefined8 uStack_2f6a0;
  undefined8 uStack_2f698;
  undefined8 uStack_2f690;
  undefined8 uStack_2f688;
  undefined8 uStack_2f598;
  undefined8 uStack_2f590;
  undefined8 uStack_2f588;
  undefined8 uStack_2f580;
  undefined8 uStack_2f578;
  undefined8 uStack_2f570;
  undefined8 uStack_2f568;
  undefined8 uStack_2f560;
  undefined8 uStack_2f558;
  undefined8 uStack_2f550;
  undefined8 uStack_2f548;
  undefined8 uStack_2f540;
  undefined8 uStack_2f538;
  undefined8 uStack_2f530;
  undefined8 uStack_2f528;
  undefined8 uStack_2f520;
  undefined8 uStack_2f518;
  undefined8 uStack_2f510;
  undefined8 uStack_2f508;
  undefined8 uStack_2f500;
  undefined8 uStack_2f4f8;
  undefined8 uStack_2f4f0;
  undefined8 uStack_2f4e8;
  undefined8 uStack_2f4e0;
  undefined8 uStack_2f4d8;
  undefined8 uStack_2f4d0;
  undefined8 uStack_2f450;
  undefined8 uStack_2f448;
  undefined8 uStack_2f440;
  undefined8 uStack_2f438;
  undefined8 uStack_2f430;
  undefined8 uStack_2f428;
  undefined8 uStack_2f420;
  undefined8 uStack_2f418;
  undefined8 uStack_2f410;
  undefined8 uStack_2f408;
  undefined8 uStack_2f400;
  undefined8 uStack_2f3f8;
  undefined8 uStack_2f3f0;
  undefined8 uStack_2f3e8;
  ulong uStack_2f3e0;
  undefined8 uStack_2f3d8;
  undefined8 uStack_2f398;
  undefined8 uStack_2f390;
  undefined8 uStack_2f388;
  undefined8 uStack_2f380;
  undefined8 uStack_2f378;
  undefined8 uStack_2f370;
  undefined8 uStack_2f368;
  undefined8 uStack_2f2b0;
  undefined8 uStack_2f2a8;
  undefined8 uStack_2f2a0;
  undefined8 uStack_2f298;
  undefined8 uStack_2f290;
  undefined8 uStack_2f288;
  undefined8 uStack_2f280;
  undefined8 uStack_2f278;
  undefined8 uStack_2f270;
  undefined8 uStack_2f268;
  undefined8 uStack_2f260;
  undefined8 uStack_2f258;
  undefined8 uStack_2f1e0;
  undefined8 uStack_2f1d8;
  undefined8 uStack_2f1d0;
  undefined8 uStack_2f1c8;
  undefined8 uStack_2f1c0;
  undefined8 uStack_2f1b8;
  undefined8 uStack_2f1b0;
  undefined8 uStack_2f1a8;
  undefined8 uStack_2f1a0;
  undefined8 uStack_2f198;
  undefined8 uStack_2f190;
  undefined8 uStack_2f188;
  undefined8 uStack_2f180;
  undefined8 uStack_2f178;
  undefined8 uStack_2f170;
  undefined8 uStack_2f168;
  undefined8 uStack_2f160;
  undefined8 uStack_2f158;
  undefined8 uStack_2f150;
  undefined8 uStack_2f148;
  undefined8 uStack_2f140;
  undefined8 uStack_2f138;
  undefined8 uStack_2f130;
  undefined8 uStack_2f128;
  undefined8 uStack_2f120;
  undefined8 uStack_2f118;
  undefined8 uStack_2f110;
  undefined8 uStack_2f108;
  undefined8 uStack_2f100;
  ulong uStack_2f0f8;
  undefined8 uStack_2f0f0;
  undefined8 uStack_2f0e8;
  undefined8 uStack_2efc8;
  undefined8 uStack_2efc0;
  undefined8 uStack_2efb8;
  undefined8 uStack_2efb0;
  undefined8 uStack_2efa8;
  undefined8 uStack_2efa0;
  undefined8 uStack_2ef98;
  undefined8 uStack_2ef90;
  undefined8 uStack_2ef88;
  undefined8 uStack_2ef80;
  undefined8 uStack_2ef78;
  undefined8 uStack_2ef70;
  undefined8 uStack_2ef68;
  undefined8 uStack_2ef60;
  undefined8 uStack_2ef58;
  undefined8 uStack_2ef50;
  undefined8 uStack_2ef48;
  undefined8 uStack_2ef40;
  undefined8 uStack_2ef38;
  undefined8 uStack_2ef30;
  undefined8 uStack_2ef28;
  undefined8 uStack_2ef20;
  undefined8 uStack_2ef18;
  undefined8 uStack_2ef10;
  undefined8 uStack_2ef08;
  undefined8 uStack_2ef00;
  undefined8 uStack_2ee80;
  undefined8 uStack_2ee78;
  undefined8 uStack_2ee70;
  undefined8 uStack_2ee68;
  undefined8 uStack_2ee60;
  undefined8 uStack_2ee58;
  undefined8 uStack_2ee50;
  undefined8 uStack_2ee48;
  undefined8 uStack_2ee40;
  undefined8 uStack_2ee38;
  undefined8 uStack_2ee30;
  undefined8 uStack_2ee28;
  undefined8 uStack_2ee20;
  undefined8 uStack_2ee18;
  ulong uStack_2ee10;
  undefined8 uStack_2ee08;
  undefined8 uStack_2ece0;
  undefined8 uStack_2ecd8;
  undefined8 uStack_2ecd0;
  undefined8 uStack_2ecc8;
  undefined8 uStack_2ecc0;
  undefined8 uStack_2ecb8;
  undefined8 uStack_2ecb0;
  undefined8 uStack_2eca8;
  undefined8 uStack_2eca0;
  undefined8 uStack_2ec98;
  undefined8 uStack_2ec90;
  undefined8 uStack_2ec88;
  undefined8 uStack_2eb98;
  undefined8 uStack_2eb90;
  undefined8 uStack_2eb88;
  undefined8 uStack_2eb80;
  undefined8 uStack_2eb78;
  undefined8 uStack_2eb70;
  undefined8 uStack_2eb68;
  undefined8 uStack_2eb60;
  undefined8 uStack_2eb58;
  undefined8 uStack_2eb50;
  undefined8 uStack_2eb48;
  undefined8 uStack_2eb40;
  undefined8 uStack_2eb38;
  undefined8 uStack_2eb30;
  ulong uStack_2eb28;
  undefined8 uStack_2ea48;
  undefined8 uStack_2ea40;
  undefined8 uStack_2ea38;
  undefined8 uStack_2ea30;
  undefined8 uStack_2ea28;
  undefined8 uStack_2ea20;
  undefined8 uStack_2ea18;
  undefined8 uStack_2ea10;
  undefined8 uStack_2ea08;
  undefined8 uStack_2ea00;
  undefined8 uStack_2e928;
  undefined8 uStack_2e920;
  undefined8 uStack_2e918;
  undefined8 uStack_2e910;
  undefined8 uStack_2e908;
  undefined8 uStack_2e900;
  undefined8 uStack_2e8f8;
  undefined8 uStack_2e8f0;
  undefined8 uStack_2e8e8;
  undefined8 uStack_2e8e0;
  undefined8 uStack_2e8d8;
  undefined8 uStack_2e8d0;
  undefined8 uStack_2e8c8;
  undefined8 uStack_2e8c0;
  undefined8 uStack_2e8b8;
  undefined8 uStack_2e8b0;
  undefined8 uStack_2e8a8;
  undefined8 uStack_2e8a0;
  undefined8 uStack_2e898;
  undefined8 uStack_2e890;
  undefined8 uStack_2e888;
  undefined8 uStack_2e880;
  undefined8 uStack_2e878;
  undefined8 uStack_2e870;
  undefined8 uStack_2e868;
  undefined8 uStack_2e860;
  undefined8 uStack_2e858;
  undefined8 uStack_2e850;
  undefined8 uStack_2e848;
  ulong uStack_2e840;
  undefined8 uStack_2e7c0;
  undefined8 uStack_2e7b8;
  undefined8 uStack_2e7b0;
  undefined8 uStack_2e7a8;
  undefined8 uStack_2e7a0;
  undefined8 uStack_2e798;
  undefined8 uStack_2e790;
  undefined8 uStack_2e788;
  undefined8 uStack_2e780;
  undefined8 uStack_2e778;
  undefined8 uStack_2e770;
  undefined8 uStack_2e768;
  undefined8 uStack_2e760;
  undefined8 uStack_2e758;
  undefined8 uStack_2e750;
  undefined8 uStack_2e748;
  undefined8 uStack_2e740;
  undefined8 uStack_2e738;
  undefined8 uStack_2e730;
  undefined8 uStack_2e728;
  undefined8 uStack_2e720;
  undefined8 uStack_2e718;
  undefined8 uStack_2e6b0;
  undefined8 uStack_2e6a8;
  undefined8 uStack_2e6a0;
  undefined8 uStack_2e698;
  undefined8 uStack_2e690;
  undefined8 uStack_2e688;
  undefined8 uStack_2e680;
  undefined8 uStack_2e678;
  undefined8 uStack_2e670;
  undefined8 uStack_2e668;
  undefined8 uStack_2e660;
  undefined8 uStack_2e658;
  undefined8 uStack_2e650;
  undefined8 uStack_2e648;
  undefined8 uStack_2e640;
  undefined8 uStack_2e638;
  undefined8 uStack_2e630;
  undefined8 uStack_2e628;
  undefined8 uStack_2e620;
  undefined8 uStack_2e618;
  undefined8 uStack_2e610;
  undefined8 uStack_2e608;
  undefined8 uStack_2e600;
  undefined8 uStack_2e5f8;
  undefined8 uStack_2e5f0;
  undefined8 uStack_2e5e8;
  undefined8 uStack_2e5e0;
  undefined8 uStack_2e5d8;
  undefined8 uStack_2e5d0;
  undefined8 uStack_2e5c8;
  undefined8 uStack_2e5c0;
  undefined8 uStack_2e5b8;
  undefined8 uStack_2e5b0;
  undefined8 uStack_2e5a8;
  undefined8 uStack_2e5a0;
  undefined8 uStack_2e598;
  undefined8 uStack_2e590;
  undefined8 uStack_2e588;
  undefined8 uStack_2e580;
  undefined8 uStack_2e578;
  undefined8 uStack_2e570;
  undefined8 uStack_2e568;
  undefined8 uStack_2e560;
  ulong uStack_2e558;
  undefined8 uStack_2e540;
  undefined8 uStack_2e538;
  undefined8 uStack_2e530;
  undefined8 uStack_2e528;
  undefined8 uStack_2e520;
  undefined8 uStack_2e518;
  undefined8 uStack_2e4d8;
  undefined8 uStack_2e4d0;
  undefined8 uStack_2e4c8;
  undefined8 uStack_2e4c0;
  undefined8 uStack_2e4b8;
  undefined8 uStack_2e4b0;
  undefined8 uStack_2e4a8;
  undefined8 uStack_2e4a0;
  undefined8 uStack_2e498;
  undefined8 uStack_2e490;
  undefined8 uStack_2e488;
  undefined8 uStack_2e480;
  undefined8 uStack_2e3c8;
  undefined8 uStack_2e3c0;
  undefined8 uStack_2e3b8;
  undefined8 uStack_2e3b0;
  undefined8 uStack_2e3a8;
  undefined8 uStack_2e3a0;
  undefined8 uStack_2e398;
  undefined8 uStack_2e390;
  undefined8 uStack_2e388;
  undefined8 uStack_2e380;
  undefined8 uStack_2e378;
  undefined8 uStack_2e370;
  undefined8 uStack_2e368;
  undefined8 uStack_2e360;
  undefined8 uStack_2e358;
  undefined8 uStack_2e350;
  undefined8 uStack_2e348;
  undefined8 uStack_2e340;
  undefined8 uStack_2e338;
  undefined8 uStack_2e330;
  undefined8 uStack_2e328;
  undefined8 uStack_2e320;
  undefined8 uStack_2e318;
  undefined8 uStack_2e310;
  undefined8 uStack_2e308;
  undefined8 uStack_2e300;
  undefined8 uStack_2e2f8;
  undefined8 uStack_2e2f0;
  undefined8 uStack_2e2e8;
  undefined8 uStack_2e2e0;
  undefined8 uStack_2e2d8;
  undefined8 uStack_2e2d0;
  undefined8 uStack_2e2c8;
  undefined8 uStack_2e2c0;
  undefined8 uStack_2e2b8;
  undefined8 uStack_2e2b0;
  undefined8 uStack_2e2a8;
  undefined8 uStack_2e2a0;
  undefined8 uStack_2e298;
  undefined8 uStack_2e290;
  undefined8 uStack_2e288;
  undefined8 uStack_2e280;
  undefined8 uStack_2e278;
  ulong uStack_2e270;
  undefined8 uStack_2e258;
  undefined8 uStack_2e250;
  undefined8 uStack_2e248;
  undefined8 uStack_2e240;
  undefined8 uStack_2e238;
  undefined8 uStack_2e230;
  undefined8 uStack_2e0e0;
  undefined8 uStack_2e0d8;
  undefined8 uStack_2e0d0;
  undefined8 uStack_2e0c8;
  undefined8 uStack_2e0c0;
  undefined8 uStack_2e0b8;
  undefined8 uStack_2e0b0;
  undefined8 uStack_2e0a8;
  undefined8 uStack_2e0a0;
  undefined8 uStack_2e098;
  undefined8 uStack_2e090;
  undefined8 uStack_2e088;
  undefined8 uStack_2e080;
  undefined8 uStack_2e078;
  undefined8 uStack_2dff8;
  undefined8 uStack_2dff0;
  undefined8 uStack_2dfe8;
  undefined8 uStack_2dfe0;
  undefined8 uStack_2dfd8;
  undefined8 uStack_2dfd0;
  undefined8 uStack_2dfc8;
  undefined8 uStack_2dfc0;
  undefined8 uStack_2dfb8;
  undefined8 uStack_2dfb0;
  undefined8 uStack_2dfa8;
  undefined8 uStack_2dfa0;
  undefined8 uStack_2df98;
  undefined8 uStack_2df90;
  ulong uStack_2df88;
  undefined8 uStack_2df40;
  undefined8 uStack_2df38;
  undefined8 uStack_2df30;
  undefined8 uStack_2df28;
  undefined8 uStack_2df20;
  undefined8 uStack_2df18;
  undefined8 uStack_2df10;
  undefined8 uStack_2dea8;
  undefined8 uStack_2dea0;
  undefined8 uStack_2de98;
  undefined8 uStack_2de90;
  undefined8 uStack_2de88;
  undefined8 uStack_2de80;
  undefined8 uStack_2de78;
  undefined8 uStack_2de70;
  undefined8 uStack_2de68;
  undefined8 uStack_2de60;
  undefined8 uStack_2de58;
  undefined8 uStack_2de50;
  undefined8 uStack_2de48;
  undefined8 uStack_2de40;
  undefined8 uStack_2de38;
  undefined8 uStack_2de30;
  undefined8 uStack_2de28;
  undefined8 uStack_2de20;
  undefined8 uStack_2de18;
  undefined8 uStack_2de10;
  undefined8 uStack_2de08;
  undefined8 uStack_2de00;
  undefined8 uStack_2dd88;
  undefined8 uStack_2dd80;
  undefined8 uStack_2dd78;
  undefined8 uStack_2dd70;
  undefined8 uStack_2dd68;
  undefined8 uStack_2dd60;
  undefined8 uStack_2dd58;
  undefined8 uStack_2dd50;
  undefined8 uStack_2dd48;
  undefined8 uStack_2dd40;
  undefined8 uStack_2dd38;
  undefined8 uStack_2dd30;
  undefined8 uStack_2dd28;
  undefined8 uStack_2dd20;
  undefined8 uStack_2dd18;
  undefined8 uStack_2dd10;
  undefined8 uStack_2dd08;
  undefined8 uStack_2dd00;
  undefined8 uStack_2dcf8;
  undefined8 uStack_2dcf0;
  undefined8 uStack_2dce8;
  undefined8 uStack_2dce0;
  undefined8 uStack_2dcd8;
  undefined8 uStack_2dcd0;
  undefined8 uStack_2dcc8;
  undefined8 uStack_2dcc0;
  undefined8 uStack_2dcb8;
  undefined8 uStack_2dcb0;
  undefined8 uStack_2dca8;
  undefined8 uStack_2dca0;
  undefined8 uStack_2dc90;
  undefined8 uStack_2dc58;
  undefined8 uStack_2dc50;
  undefined8 uStack_2dc48;
  undefined8 uStack_2dc40;
  undefined8 uStack_2dc38;
  undefined8 uStack_2dc30;
  undefined8 uStack_2dc28;
  undefined8 uStack_2dc20;
  undefined8 uStack_2dc18;
  undefined8 uStack_2dc10;
  undefined8 uStack_2dc08;
  undefined8 uStack_2dc00;
  undefined8 uStack_2dbf8;
  undefined8 uStack_2dbf0;
  undefined8 uStack_2dbe8;
  undefined8 uStack_2dbe0;
  undefined8 uStack_2dbd8;
  undefined8 uStack_2dbd0;
  undefined8 uStack_2dbc8;
  undefined8 uStack_2db70;
  undefined8 uStack_2db68;
  undefined8 uStack_2db60;
  undefined8 uStack_2db58;
  undefined8 uStack_2db50;
  undefined8 uStack_2db48;
  undefined8 uStack_2db40;
  undefined8 uStack_2db38;
  undefined8 uStack_2db30;
  undefined8 uStack_2db28;
  undefined8 uStack_2db20;
  undefined8 uStack_2db18;
  undefined8 uStack_2db10;
  undefined8 uStack_2db08;
  undefined8 uStack_2db00;
  undefined8 uStack_2daf8;
  undefined8 uStack_2daf0;
  undefined8 uStack_2dae8;
  undefined8 uStack_2dae0;
  undefined8 uStack_2dad8;
  undefined8 uStack_2dad0;
  undefined8 uStack_2dac8;
  undefined8 uStack_2dac0;
  undefined8 uStack_2dab8;
  undefined8 uStack_2dab0;
  undefined8 uStack_2daa8;
  undefined8 uStack_2daa0;
  undefined8 uStack_2da98;
  undefined8 uStack_2da90;
  undefined8 uStack_2da88;
  undefined8 uStack_2da80;
  undefined8 uStack_2da78;
  undefined8 uStack_2da70;
  undefined8 uStack_2da68;
  undefined8 uStack_2da60;
  undefined8 uStack_2da58;
  undefined8 uStack_2da50;
  undefined8 uStack_2da48;
  undefined8 uStack_2da40;
  undefined8 uStack_2da38;
  undefined8 uStack_2da30;
  undefined8 uStack_2da28;
  undefined8 uStack_2da20;
  undefined8 uStack_2da18;
  undefined8 uStack_2da10;
  undefined8 uStack_2da08;
  undefined8 uStack_2da00;
  undefined8 uStack_2d9f8;
  undefined8 uStack_2d9f0;
  undefined8 uStack_2d9e8;
  undefined8 uStack_2d9e0;
  undefined8 uStack_2d9d8;
  undefined8 uStack_2d9d0;
  undefined8 uStack_2d9c8;
  undefined8 uStack_2d9c0;
  undefined8 uStack_2d9b8;
  undefined8 uStack_2d9a8;
  undefined8 uStack_2d9a0;
  undefined8 uStack_2d998;
  undefined8 uStack_2d990;
  undefined8 uStack_2d988;
  undefined8 uStack_2d980;
  undefined8 uStack_2d978;
  undefined8 uStack_2d888;
  undefined8 uStack_2d880;
  undefined8 uStack_2d878;
  undefined8 uStack_2d870;
  undefined8 uStack_2d868;
  undefined8 uStack_2d860;
  undefined8 uStack_2d858;
  undefined8 uStack_2d850;
  undefined8 uStack_2d848;
  undefined8 uStack_2d840;
  undefined8 uStack_2d838;
  undefined8 uStack_2d830;
  undefined8 uStack_2d828;
  undefined8 uStack_2d820;
  undefined8 uStack_2d818;
  undefined8 uStack_2d810;
  undefined8 uStack_2d808;
  undefined8 uStack_2d800;
  undefined8 uStack_2d7f8;
  undefined8 uStack_2d7f0;
  undefined8 uStack_2d7e8;
  undefined8 uStack_2d7e0;
  undefined8 uStack_2d7d8;
  undefined8 uStack_2d7d0;
  undefined8 uStack_2d7c8;
  undefined8 uStack_2d7c0;
  undefined8 uStack_2d740;
  undefined8 uStack_2d738;
  undefined8 uStack_2d730;
  undefined8 uStack_2d728;
  undefined8 uStack_2d720;
  undefined8 uStack_2d718;
  undefined8 uStack_2d710;
  undefined8 uStack_2d708;
  undefined8 uStack_2d700;
  undefined8 uStack_2d6f8;
  undefined8 uStack_2d6f0;
  undefined8 uStack_2d6e8;
  undefined8 uStack_2d6e0;
  undefined8 uStack_2d6d8;
  undefined8 uStack_2d6d0;
  undefined8 uStack_2d6c8;
  undefined8 uStack_2d688;
  undefined8 uStack_2d680;
  undefined8 uStack_2d678;
  undefined8 uStack_2d670;
  undefined8 uStack_2d668;
  undefined8 uStack_2d660;
  undefined8 uStack_2d658;
  undefined8 uStack_2d5a0;
  undefined8 uStack_2d598;
  undefined8 uStack_2d590;
  undefined8 uStack_2d588;
  undefined8 uStack_2d580;
  undefined8 uStack_2d578;
  undefined8 uStack_2d570;
  undefined8 uStack_2d568;
  undefined8 uStack_2d560;
  undefined8 uStack_2d558;
  undefined8 uStack_2d550;
  undefined8 uStack_2d548;
  undefined8 uStack_2d4d0;
  undefined8 uStack_2d4c8;
  undefined8 uStack_2d4c0;
  undefined8 uStack_2d4b8;
  undefined8 uStack_2d4b0;
  undefined8 uStack_2d4a8;
  undefined8 uStack_2d4a0;
  undefined8 uStack_2d498;
  undefined8 uStack_2d490;
  undefined8 uStack_2d488;
  undefined8 uStack_2d480;
  undefined8 uStack_2d478;
  undefined8 uStack_2d470;
  undefined8 uStack_2d468;
  undefined8 uStack_2d460;
  undefined8 uStack_2d458;
  undefined8 uStack_2d450;
  undefined8 uStack_2d448;
  undefined8 uStack_2d440;
  undefined8 uStack_2d438;
  undefined8 uStack_2d430;
  undefined8 uStack_2d428;
  undefined8 uStack_2d420;
  undefined8 uStack_2d418;
  undefined8 uStack_2d410;
  undefined8 uStack_2d408;
  undefined8 uStack_2d400;
  undefined8 uStack_2d3f8;
  undefined8 uStack_2d3f0;
  undefined8 uStack_2d3e8;
  undefined8 uStack_2d3e0;
  undefined8 uStack_2d3d8;
  undefined8 uStack_2d2b8;
  undefined8 uStack_2d2b0;
  undefined8 uStack_2d2a8;
  undefined8 uStack_2d2a0;
  undefined8 uStack_2d298;
  undefined8 uStack_2d290;
  undefined8 uStack_2d288;
  undefined8 uStack_2d280;
  undefined8 uStack_2d278;
  undefined8 uStack_2d270;
  undefined8 uStack_2d268;
  undefined8 uStack_2d260;
  undefined8 uStack_2d258;
  undefined8 uStack_2d250;
  undefined8 uStack_2d248;
  undefined8 uStack_2d240;
  undefined8 uStack_2d238;
  undefined8 uStack_2d230;
  undefined8 uStack_2d228;
  undefined8 uStack_2d220;
  undefined8 uStack_2d218;
  undefined8 uStack_2d210;
  undefined8 uStack_2d208;
  undefined8 uStack_2d200;
  undefined8 uStack_2d1f8;
  undefined8 uStack_2d1f0;
  undefined8 uStack_2d170;
  undefined8 uStack_2d168;
  undefined8 uStack_2d160;
  undefined8 uStack_2d158;
  undefined8 uStack_2d150;
  undefined8 uStack_2d148;
  undefined8 uStack_2d140;
  undefined8 uStack_2d138;
  undefined8 uStack_2d130;
  undefined8 uStack_2d128;
  undefined8 uStack_2d120;
  undefined8 uStack_2d118;
  undefined8 uStack_2d110;
  undefined8 uStack_2d108;
  undefined8 uStack_2d100;
  undefined8 uStack_2d0f8;
  undefined8 uStack_2cfd0;
  undefined8 uStack_2cfc8;
  undefined8 uStack_2cfc0;
  undefined8 uStack_2cfb8;
  undefined8 uStack_2cfb0;
  undefined8 uStack_2cfa8;
  undefined8 uStack_2cfa0;
  undefined8 uStack_2cf98;
  undefined8 uStack_2cf90;
  undefined8 uStack_2cf88;
  undefined8 uStack_2cf80;
  undefined8 uStack_2cf78;
  undefined8 uStack_2ce88;
  undefined8 uStack_2ce80;
  undefined8 uStack_2ce78;
  undefined8 uStack_2ce70;
  undefined8 uStack_2ce68;
  undefined8 uStack_2ce60;
  undefined8 uStack_2ce58;
  undefined8 uStack_2ce50;
  undefined8 uStack_2ce48;
  undefined8 uStack_2ce40;
  undefined8 uStack_2ce38;
  undefined8 uStack_2ce30;
  undefined8 uStack_2ce28;
  undefined8 uStack_2ce20;
  undefined8 uStack_2ce18;
  undefined8 uStack_2cd38;
  undefined8 uStack_2cd30;
  undefined8 uStack_2cd28;
  undefined8 uStack_2cd20;
  undefined8 uStack_2cd18;
  undefined8 uStack_2cd10;
  undefined8 uStack_2cd08;
  undefined8 uStack_2cd00;
  undefined8 uStack_2ccf8;
  undefined8 uStack_2ccf0;
  undefined8 uStack_2cc18;
  undefined8 uStack_2cc10;
  undefined8 uStack_2cc08;
  undefined8 uStack_2cc00;
  undefined8 uStack_2cbf8;
  undefined8 uStack_2cbf0;
  undefined8 uStack_2cbe8;
  undefined8 uStack_2cbe0;
  undefined8 uStack_2cbd8;
  undefined8 uStack_2cbd0;
  undefined8 uStack_2cbc8;
  undefined8 uStack_2cbc0;
  undefined8 uStack_2cbb8;
  undefined8 uStack_2cbb0;
  undefined8 uStack_2cba8;
  undefined8 uStack_2cba0;
  undefined8 uStack_2cb98;
  undefined8 uStack_2cb90;
  undefined8 uStack_2cb88;
  undefined8 uStack_2cb80;
  undefined8 uStack_2cb78;
  undefined8 uStack_2cb70;
  undefined8 uStack_2cb68;
  undefined8 uStack_2cb60;
  undefined8 uStack_2cb58;
  undefined8 uStack_2cb50;
  undefined8 uStack_2cb48;
  undefined8 uStack_2cb40;
  undefined8 uStack_2cb38;
  undefined8 uStack_2cb30;
  undefined8 uStack_2cab0;
  undefined8 uStack_2caa8;
  undefined8 uStack_2caa0;
  undefined8 uStack_2ca98;
  undefined8 uStack_2ca90;
  undefined8 uStack_2ca88;
  undefined8 uStack_2ca80;
  undefined8 uStack_2ca78;
  undefined8 uStack_2ca70;
  undefined8 uStack_2ca68;
  undefined8 uStack_2ca60;
  undefined8 uStack_2ca58;
  undefined8 uStack_2c9a0;
  undefined8 uStack_2c998;
  undefined8 uStack_2c990;
  undefined8 uStack_2c988;
  undefined8 uStack_2c980;
  undefined8 uStack_2c978;
  undefined8 uStack_2c970;
  undefined8 uStack_2c968;
  undefined8 uStack_2c960;
  undefined8 uStack_2c958;
  undefined8 uStack_2c950;
  undefined8 uStack_2c948;
  undefined8 uStack_2c940;
  undefined8 uStack_2c938;
  undefined8 uStack_2c930;
  undefined8 uStack_2c928;
  undefined8 uStack_2c920;
  undefined8 uStack_2c918;
  undefined8 uStack_2c910;
  undefined8 uStack_2c908;
  undefined8 uStack_2c900;
  undefined8 uStack_2c8f8;
  undefined8 uStack_2c8f0;
  undefined8 uStack_2c8e8;
  undefined8 uStack_2c8e0;
  undefined8 uStack_2c8d8;
  undefined8 uStack_2c8d0;
  undefined8 uStack_2c8c8;
  undefined8 uStack_2c8c0;
  undefined8 uStack_2c8b8;
  undefined8 uStack_2c8b0;
  undefined8 uStack_2c8a8;
  undefined8 uStack_2c8a0;
  undefined8 uStack_2c898;
  undefined8 uStack_2c890;
  undefined8 uStack_2c888;
  undefined8 uStack_2c880;
  undefined8 uStack_2c878;
  undefined8 uStack_2c870;
  undefined8 uStack_2c868;
  undefined8 uStack_2c860;
  undefined8 uStack_2c858;
  undefined8 uStack_2c850;
  undefined8 uStack_2c848;
  undefined8 uStack_2c830;
  undefined8 uStack_2c828;
  undefined8 uStack_2c820;
  undefined8 uStack_2c818;
  undefined8 uStack_2c810;
  undefined8 uStack_2c808;
  undefined8 uStack_2c6b8;
  undefined8 uStack_2c6b0;
  undefined8 uStack_2c6a8;
  undefined8 uStack_2c6a0;
  undefined8 uStack_2c698;
  undefined8 uStack_2c690;
  undefined8 uStack_2c688;
  undefined8 uStack_2c680;
  undefined8 uStack_2c678;
  undefined8 uStack_2c670;
  undefined8 uStack_2c668;
  undefined8 uStack_2c660;
  undefined8 uStack_2c658;
  undefined8 uStack_2c650;
  undefined8 uStack_2c5d0;
  undefined8 uStack_2c5c8;
  undefined8 uStack_2c5c0;
  undefined8 uStack_2c5b8;
  undefined8 uStack_2c5b0;
  undefined8 uStack_2c5a8;
  undefined8 uStack_2c5a0;
  undefined8 uStack_2c598;
  undefined8 uStack_2c590;
  undefined8 uStack_2c588;
  undefined8 uStack_2c580;
  undefined8 uStack_2c578;
  undefined8 uStack_2c570;
  undefined8 uStack_2c568;
  undefined8 uStack_2c560;
  undefined8 uStack_2c518;
  undefined8 uStack_2c510;
  undefined8 uStack_2c508;
  undefined8 uStack_2c500;
  undefined8 uStack_2c4f8;
  undefined8 uStack_2c4f0;
  undefined8 uStack_2c4e8;
  undefined8 uStack_2c430;
  undefined8 uStack_2c428;
  undefined8 uStack_2c420;
  undefined8 uStack_2c418;
  undefined8 uStack_2c410;
  undefined8 uStack_2c408;
  undefined8 uStack_2c400;
  undefined8 uStack_2c3f8;
  undefined8 uStack_2c3f0;
  undefined8 uStack_2c3e8;
  undefined8 uStack_2c3e0;
  undefined8 uStack_2c3d8;
  undefined8 uStack_2c360;
  undefined8 uStack_2c358;
  undefined8 uStack_2c350;
  undefined8 uStack_2c348;
  undefined8 uStack_2c340;
  undefined8 uStack_2c338;
  undefined8 uStack_2c330;
  undefined8 uStack_2c328;
  undefined8 uStack_2c320;
  undefined8 uStack_2c318;
  undefined8 uStack_2c310;
  undefined8 uStack_2c308;
  undefined8 uStack_2c300;
  undefined8 uStack_2c2f8;
  undefined8 uStack_2c2f0;
  undefined8 uStack_2c2e8;
  undefined8 uStack_2c2e0;
  undefined8 uStack_2c2d8;
  undefined8 uStack_2c2d0;
  undefined8 uStack_2c2c8;
  undefined8 uStack_2c2c0;
  undefined8 uStack_2c2b8;
  undefined8 uStack_2c2b0;
  undefined8 uStack_2c2a8;
  undefined8 uStack_2c2a0;
  undefined8 uStack_2c298;
  undefined8 uStack_2c290;
  undefined8 uStack_2c288;
  undefined8 uStack_2c280;
  undefined8 uStack_2c278;
  undefined8 uStack_2c268;
  undefined8 uStack_2c148;
  undefined8 uStack_2c140;
  undefined8 uStack_2c138;
  undefined8 uStack_2c130;
  undefined8 uStack_2c128;
  undefined8 uStack_2c120;
  undefined8 uStack_2c118;
  undefined8 uStack_2c110;
  undefined8 uStack_2c108;
  undefined8 uStack_2c100;
  undefined8 uStack_2c0f8;
  undefined8 uStack_2c0f0;
  undefined8 uStack_2c0e8;
  undefined8 uStack_2c0e0;
  undefined8 uStack_2c0d8;
  undefined8 uStack_2c0d0;
  undefined8 uStack_2c0c8;
  undefined8 uStack_2c0c0;
  undefined8 uStack_2c0b8;
  undefined8 uStack_2c0b0;
  undefined8 uStack_2c0a8;
  undefined8 uStack_2c0a0;
  undefined8 uStack_2c098;
  undefined8 uStack_2c090;
  undefined8 uStack_2c088;
  undefined8 uStack_2c080;
  undefined8 uStack_2c000;
  undefined8 uStack_2bff8;
  undefined8 uStack_2bff0;
  undefined8 uStack_2bfe8;
  undefined8 uStack_2bfe0;
  undefined8 uStack_2bfd8;
  undefined8 uStack_2bfd0;
  undefined8 uStack_2bfc8;
  undefined8 uStack_2bfc0;
  undefined8 uStack_2bfb8;
  undefined8 uStack_2bfb0;
  undefined8 uStack_2bfa8;
  undefined8 uStack_2bfa0;
  undefined8 uStack_2bf98;
  undefined8 uStack_2bf90;
  undefined8 uStack_2bf88;
  undefined8 uStack_2be60;
  undefined8 uStack_2be58;
  undefined8 uStack_2be50;
  undefined8 uStack_2be48;
  undefined8 uStack_2be40;
  undefined8 uStack_2be38;
  undefined8 uStack_2be30;
  undefined8 uStack_2be28;
  undefined8 uStack_2be20;
  undefined8 uStack_2be18;
  undefined8 uStack_2be10;
  undefined8 uStack_2be08;
  undefined8 uStack_2bd18;
  undefined8 uStack_2bd10;
  undefined8 uStack_2bd08;
  undefined8 uStack_2bd00;
  undefined8 uStack_2bcf8;
  undefined8 uStack_2bcf0;
  undefined8 uStack_2bce8;
  undefined8 uStack_2bce0;
  undefined8 uStack_2bcd8;
  undefined8 uStack_2bcd0;
  undefined8 uStack_2bcc8;
  undefined8 uStack_2bcc0;
  undefined8 uStack_2bcb8;
  undefined8 uStack_2bcb0;
  undefined8 uStack_2bca8;
  undefined8 uStack_2baa8;
  undefined8 uStack_2baa0;
  undefined8 uStack_2ba98;
  undefined8 uStack_2ba90;
  undefined8 uStack_2ba88;
  undefined8 uStack_2ba80;
  undefined8 uStack_2ba78;
  undefined8 uStack_2ba70;
  undefined8 uStack_2ba68;
  undefined8 uStack_2ba60;
  undefined8 uStack_2ba58;
  undefined8 uStack_2ba50;
  undefined8 uStack_2ba48;
  undefined8 uStack_2ba40;
  undefined8 uStack_2ba38;
  undefined8 uStack_2ba30;
  undefined8 uStack_2ba28;
  undefined8 uStack_2ba20;
  undefined8 uStack_2ba18;
  undefined8 uStack_2ba10;
  undefined8 uStack_2ba08;
  undefined8 uStack_2ba00;
  undefined8 uStack_2b9f8;
  undefined8 uStack_2b9f0;
  undefined8 uStack_2b9e8;
  undefined8 uStack_2b9e0;
  undefined8 uStack_2b9d8;
  undefined8 uStack_2b9d0;
  undefined8 uStack_2b9c8;
  undefined8 uStack_2b9c0;
  undefined8 uStack_2b830;
  undefined8 uStack_2b828;
  undefined8 uStack_2b820;
  undefined8 uStack_2b818;
  undefined8 uStack_2b810;
  undefined8 uStack_2b808;
  undefined8 uStack_2b800;
  undefined8 uStack_2b7f8;
  undefined8 uStack_2b7f0;
  undefined8 uStack_2b7e8;
  undefined8 uStack_2b7e0;
  undefined8 uStack_2b7d8;
  undefined8 uStack_2b7d0;
  undefined8 uStack_2b7c8;
  undefined8 uStack_2b748;
  undefined8 uStack_2b740;
  undefined8 uStack_2b738;
  undefined8 uStack_2b730;
  undefined8 uStack_2b728;
  undefined8 uStack_2b720;
  undefined8 uStack_2b718;
  undefined8 uStack_2b710;
  undefined8 uStack_2b708;
  undefined8 uStack_2b700;
  undefined8 uStack_2b6f8;
  undefined8 uStack_2b6f0;
  undefined8 uStack_2b6e8;
  undefined8 uStack_2b6e0;
  undefined8 uStack_2b6d8;
  undefined8 uStack_2b5a8;
  undefined8 uStack_2b5a0;
  undefined8 uStack_2b598;
  undefined8 uStack_2b590;
  undefined8 uStack_2b588;
  undefined8 uStack_2b580;
  undefined8 uStack_2b578;
  undefined8 uStack_2b570;
  undefined8 uStack_2b568;
  undefined8 uStack_2b560;
  undefined8 uStack_2b558;
  undefined8 uStack_2b550;
  undefined8 uStack_2b460;
  undefined8 uStack_2b458;
  undefined8 uStack_2b450;
  undefined8 uStack_2b448;
  undefined8 uStack_2b440;
  undefined8 uStack_2b438;
  undefined8 uStack_2b430;
  undefined8 uStack_2b428;
  undefined8 uStack_2b420;
  undefined8 uStack_2b418;
  undefined8 uStack_2b410;
  undefined8 uStack_2b408;
  undefined8 uStack_2b400;
  undefined8 uStack_2b3f8;
  undefined8 uStack_2b3f0;
  undefined8 uStack_2b178;
  undefined8 uStack_2b170;
  undefined8 uStack_2b168;
  undefined8 uStack_2b160;
  undefined8 uStack_2b158;
  undefined8 uStack_2b150;
  undefined8 uStack_2b148;
  undefined8 uStack_2b140;
  undefined8 uStack_2b138;
  undefined8 uStack_2b130;
  undefined8 uStack_2b128;
  undefined8 uStack_2b120;
  undefined8 uStack_2b118;
  undefined8 uStack_2b110;
  undefined8 uStack_2b108;
  _Vector_base<double,_std::allocator<double>_> _Stack_2b100;
  vector<double,_std::allocator<double>_> avStack_2b0e8 [89];
  PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>> aPStack_2a888 [1800];
  PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *apPStack_2a180 [2];
  PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *pPStack_2a170;
  undefined1 auStack_2a168 [16];
  undefined8 uStack_2a158;
  undefined1 auStack_2a060 [240];
  undefined1 auStack_29f70 [8];
  undefined1 auStack_29f68 [8];
  undefined1 auStack_29f60 [8];
  undefined1 auStack_29f58 [8];
  undefined1 auStack_29f50 [8];
  undefined1 auStack_29f48 [64];
  undefined1 auStack_29f08 [8];
  undefined1 auStack_29f00 [8];
  undefined1 auStack_29ef8 [8];
  undefined1 auStack_29ef0 [8];
  undefined1 auStack_29ee8 [8];
  undefined1 auStack_29ee0 [8];
  undefined1 auStack_29ed8 [8];
  undefined1 auStack_29ed0 [8];
  undefined1 auStack_29ec8 [8];
  undefined1 auStack_29ec0 [8];
  undefined1 auStack_29eb8 [8];
  undefined1 auStack_29eb0 [8];
  undefined1 auStack_29ea8 [8];
  undefined1 auStack_29ea0 [46880];
  PlainObjectBase<Eigen::Matrix<double,15,60,0,15,60>> aPStack_1e780 [7200];
  PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> aPStack_1cb60 [7200];
  Matrix<double,_60,_84,_0,_60,_84> MStack_1af40;
  PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> PStack_111b8;
  
  pvStack_47ae8 = L2;
  pMStack_47950 = Action;
  memset(&_Stack_2b100,0,0x870);
  for (uVar5 = 0; uVar5 != 6; uVar5 = uVar5 + 1) {
    for (uVar9 = 0; uVar9 != 6; uVar9 = uVar9 + 1) {
      if (uVar9 != uVar5) {
        pMVar1 = (L1->
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pMVar2 = (pvStack_47ae8->
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar3 = (long)(int)((int)uVar9 - (uint)(uVar5 < uVar9));
        fillRow1(pMVar1 + uVar5,pMVar2 + uVar5,pMVar1 + uVar9,pMVar2 + uVar9,
                 (vector<double,_std::allocator<double>_> *)
                 &(&_Stack_2b100)[uVar5 * 0xf + lVar3 * 3]._M_impl,
                 avStack_2b0e8 + uVar5 * 0xf + lVar3 * 3,avStack_2b0e8 + uVar5 * 0xf + lVar3 * 3 + 1
                );
      }
    }
  }
  pPStack_47940 = (PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,60,84,0,60,84>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,60,84,0,60,84>>>
            ((PlainObjectBase<Eigen::Matrix<double,60,84,0,60,84>> *)&MStack_1af40,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_60,_84,_0,_60,_84>_>_>
              *)&pPStack_47948);
  iVar8 = 2;
  iVar4 = 0;
  iVar7 = 0;
  iVar6 = 1;
  for (row_00 = 0; row_00 != 0x3c; row_00 = row_00 + 1) {
    lVar3 = (long)iVar4;
    fillRow2(&MStack_1af40,row_00,
             (vector<double,_std::allocator<double>_> (*) [3])
             &(&_Stack_2b100)[lVar3 * 0xf + (long)iVar7 * 3]._M_impl,
             (vector<double,_std::allocator<double>_> (*) [3])
             &(&_Stack_2b100)[lVar3 * 0xf + (long)iVar6 * 3]._M_impl,
             (vector<double,_std::allocator<double>_> (*) [3])
             &(&_Stack_2b100)[lVar3 * 0xf + (long)iVar8 * 3]._M_impl);
    if (iVar8 < 4) {
      iVar8 = iVar8 + 1;
    }
    else if (iVar6 < 3) {
      iVar8 = iVar6 + 2;
      iVar6 = iVar6 + 1;
    }
    else if (iVar7 < 2) {
      iVar6 = iVar7 + 2;
      iVar8 = iVar7 + 3;
      iVar7 = iVar7 + 1;
    }
    else {
      iVar4 = iVar4 + 1;
      iVar7 = 0;
      iVar8 = 2;
      iVar6 = 1;
    }
  }
  pPStack_47948 = (PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *)&MStack_1af40;
  uStack_47930 = 0;
  uStack_47928 = 0;
  uStack_47920 = 0x3c;
  pMStack_47938 = (Matrix<double,_60,_84,_0,_60,_84> *)pPStack_47948;
  Eigen::PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>>::
  _set_noalias<Eigen::Block<Eigen::Matrix<double,60,84,0,60,84>,60,15,false>>
            (aPStack_1cb60,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_60,_84,_0,_60,_84>,_60,_15,_false>_> *)
             &pPStack_47948);
  pPStack_47948 = aPStack_1cb60;
  Eigen::PlainObjectBase<Eigen::Matrix<double,15,60,0,15,60>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,60,15,0,60,15>>>
            (aPStack_1e780,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_60,_15,_0,_60,_15>_>_> *)
             &pPStack_47948);
  dst = pMStack_47950;
  pPStack_47948 = (PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *)aPStack_1e780;
  pPStack_47940 = aPStack_1cb60;
  Eigen::PlainObjectBase<Eigen::Matrix<double,15,15,0,15,15>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,15,60,0,15,60>,Eigen::Matrix<double,60,15,0,60,15>,0>>
            (aPStack_2a888,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_15,_60,_0,_15,_60>,_Eigen::Matrix<double,_60,_15,_0,_60,_15>,_0>_>
              *)&pPStack_47948);
  pMStack_47938 = &MStack_1af40;
  pPStack_47948 = (PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *)aPStack_2a888;
  pPStack_47940 = (PlainObjectBase<Eigen::Matrix<double,60,15,0,60,15>> *)aPStack_1e780;
  Eigen::PlainObjectBase<Eigen::Matrix<double,15,84,0,15,84>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,15,15,0,15,15>>,Eigen::Matrix<double,15,60,0,15,60>,0>,Eigen::Matrix<double,60,84,0,60,84>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,15,84,0,15,84>> *)auStack_4a260,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_Eigen::Matrix<double,_15,_60,_0,_15,_60>,_0>,_Eigen::Matrix<double,_60,_84,_0,_60,_84>,_0>_>
              *)&pPStack_47948);
  Eigen::PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,93,157,0,93,157>>>
            ((PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)&pPStack_47948,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_93,_157,_0,_93,_157>_>_>
              *)&PStack_111b8);
  pvStack_47ae8 =
       (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        *)uStack_49b60;
  uStack_43670 = uStack_49b60;
  uStack_43388 = uStack_49ae8;
  uStack_47958 = uStack_49ae8;
  uStack_47960 = uStack_49a70;
  uStack_430a0 = uStack_49a70;
  uStack_479a0 = uStack_496b0;
  uStack_47968 = uStack_499f8;
  uStack_42db8 = uStack_499f8;
  uStack_47970 = uStack_49980;
  uStack_42ad0 = uStack_49980;
  uStack_47978 = uStack_49908;
  uStack_427e8 = uStack_49908;
  uStack_47980 = uStack_49890;
  uStack_42500 = uStack_49890;
  uStack_47988 = uStack_49818;
  uStack_42218 = uStack_49818;
  uStack_47990 = uStack_497a0;
  uStack_41f30 = uStack_497a0;
  uStack_41c48 = uStack_49728;
  uStack_47998 = uStack_49728;
  uStack_41960 = uStack_496b0;
  uStack_479a8 = uStack_49638;
  uStack_41678 = uStack_49638;
  uStack_479b0 = uStack_495c0;
  uStack_41390 = uStack_495c0;
  uStack_479b8 = uStack_49548;
  uStack_410a8 = uStack_49548;
  uStack_479c0 = uStack_494d0;
  uStack_3e228 = uStack_494d0;
  uStack_479c8 = uStack_49458;
  uStack_3df40 = uStack_49458;
  uStack_479d0 = uStack_493e0;
  uStack_3dc58 = uStack_493e0;
  uStack_479d8 = uStack_49368;
  uStack_3d970 = uStack_49368;
  uStack_479e0 = uStack_492f0;
  uStack_3d688 = uStack_492f0;
  uStack_479e8 = uStack_49278;
  uStack_3d3a0 = uStack_49278;
  uStack_479f0 = uStack_49200;
  uStack_3d0b8 = uStack_49200;
  uStack_479f8 = uStack_49188;
  uStack_3cdd0 = uStack_49188;
  uStack_47a00 = uStack_49110;
  uStack_3cae8 = uStack_49110;
  uStack_47a08 = uStack_49098;
  uStack_3c800 = uStack_49098;
  uStack_47a10 = uStack_49020;
  uStack_3c518 = uStack_49020;
  uStack_47a18 = uStack_48fa8;
  uStack_3c230 = uStack_48fa8;
  uStack_47a20 = uStack_48f30;
  uStack_3bf48 = uStack_48f30;
  uStack_47a28 = uStack_48eb8;
  uStack_3bc60 = uStack_48eb8;
  uStack_47a30 = uStack_48e40;
  uStack_3b978 = uStack_48e40;
  uStack_47a38 = uStack_48dc8;
  uStack_3b690 = uStack_48dc8;
  uStack_47a40 = uStack_48d50;
  uStack_3b3a8 = uStack_48d50;
  uStack_47a48 = uStack_48cd8;
  uStack_3b0c0 = uStack_48cd8;
  uStack_47a50 = uStack_48c60;
  uStack_3add8 = uStack_48c60;
  uStack_47a58 = uStack_48be8;
  uStack_3aaf0 = uStack_48be8;
  uStack_47a60 = uStack_48af8;
  uStack_38240 = uStack_48af8;
  uStack_47a68 = uStack_48a80;
  uStack_37f58 = uStack_48a80;
  uStack_47a70 = uStack_48a08;
  uStack_37c70 = uStack_48a08;
  uStack_47a78 = uStack_48990;
  uStack_37988 = uStack_48990;
  uStack_47a80 = uStack_48918;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uStack_488a0;
  vmovsd_avx512f(auVar42);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uStack_48828;
  vmovsd_avx512f(auVar40);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uStack_487b0;
  vmovsd_avx512f(auVar38);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uStack_48b70;
  vmovsd_avx512f(auVar18);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uStack_48738;
  vmovsd_avx512f(auVar36);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uStack_486c0;
  vmovsd_avx512f(auVar34);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uStack_48648;
  vmovsd_avx512f(auVar32);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uStack_485d0;
  vmovsd_avx512f(auVar30);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uStack_48558;
  vmovsd_avx512f(auVar28);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uStack_484e0;
  vmovsd_avx512f(auVar26);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uStack_48468;
  vmovsd_avx512f(auVar24);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uStack_483f0;
  vmovsd_avx512f(auVar16);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uStack_48378;
  vmovsd_avx512f(auVar14);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uStack_48300;
  vmovsd_avx512f(auVar12);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uStack_48288;
  vmovsd_avx512f(auVar10);
  uStack_32828 = uStack_48210;
  uStack_32540 = uStack_48198;
  uStack_32258 = uStack_48120;
  uStack_31f70 = uStack_480a8;
  uStack_31c88 = uStack_48030;
  uStack_319a0 = uStack_47fb8;
  uStack_2fc90 = uStack_47f40;
  uStack_2f9a8 = uStack_47ec8;
  uStack_2f6c0 = uStack_47e50;
  uStack_2f3d8 = uStack_47dd8;
  uStack_2f0f0 = uStack_47d60;
  uStack_2ee08 = uStack_47ce8;
  uStack_2d6c8 = uStack_47c70;
  uStack_2d3e0 = uStack_47bf8;
  uStack_2d0f8 = uStack_47b80;
  uStack_2bf88 = uStack_47b08;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uStack_49b60;
  vmovsd_avx512f(auVar44);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uStack_49ae8;
  vmovsd_avx512f(auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uStack_49a70;
  vmovsd_avx512f(auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uStack_499f8;
  vmovsd_avx512f(auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uStack_49980;
  vmovsd_avx512f(auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uStack_49908;
  vmovsd_avx512f(auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uStack_49890;
  vmovsd_avx512f(auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uStack_49818;
  vmovsd_avx512f(auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uStack_497a0;
  vmovsd_avx512f(auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uStack_49728;
  vmovsd_avx512f(auVar53);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uStack_496b0;
  vmovsd_avx512f(auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uStack_49638;
  vmovsd_avx512f(auVar55);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uStack_495c0;
  vmovsd_avx512f(auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uStack_49548;
  vmovsd_avx512f(auVar57);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uStack_494d0;
  vmovsd_avx512f(auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uStack_49458;
  vmovsd_avx512f(auVar59);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uStack_493e0;
  vmovsd_avx512f(auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uStack_49368;
  vmovsd_avx512f(auVar61);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uStack_492f0;
  vmovsd_avx512f(auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uStack_49278;
  vmovsd_avx512f(auVar63);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uStack_49200;
  vmovsd_avx512f(auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uStack_49188;
  vmovsd_avx512f(auVar65);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uStack_49110;
  vmovsd_avx512f(auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uStack_49098;
  vmovsd_avx512f(auVar67);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uStack_49020;
  vmovsd_avx512f(auVar68);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uStack_48fa8;
  vmovsd_avx512f(auVar69);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uStack_48f30;
  vmovsd_avx512f(auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uStack_48eb8;
  vmovsd_avx512f(auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uStack_48e40;
  vmovsd_avx512f(auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uStack_48dc8;
  vmovsd_avx512f(auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uStack_48d50;
  vmovsd_avx512f(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uStack_48cd8;
  vmovsd_avx512f(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uStack_48c60;
  vmovsd_avx512f(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uStack_48be8;
  vmovsd_avx512f(auVar77);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uStack_48b70;
  vmovsd_avx512f(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uStack_48af8;
  vmovsd_avx512f(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uStack_48a80;
  vmovsd_avx512f(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uStack_48a08;
  vmovsd_avx512f(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uStack_48990;
  vmovsd_avx512f(auVar23);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uStack_48918;
  vmovsd_avx512f(auVar78);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uStack_488a0;
  vmovsd_avx512f(auVar43);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uStack_48828;
  vmovsd_avx512f(auVar41);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uStack_487b0;
  vmovsd_avx512f(auVar39);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uStack_48738;
  vmovsd_avx512f(auVar37);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uStack_486c0;
  vmovsd_avx512f(auVar35);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uStack_48648;
  vmovsd_avx512f(auVar33);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uStack_485d0;
  vmovsd_avx512f(auVar31);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uStack_48558;
  vmovsd_avx512f(auVar29);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uStack_484e0;
  vmovsd_avx512f(auVar27);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uStack_48468;
  vmovsd_avx512f(auVar25);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uStack_483f0;
  vmovsd_avx512f(auVar17);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uStack_48378;
  vmovsd_avx512f(auVar15);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uStack_48300;
  vmovsd_avx512f(auVar13);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uStack_48288;
  vmovsd_avx512f(auVar11);
  uStack_330d8 = uStack_48210;
  uStack_32df0 = uStack_48198;
  uStack_32b08 = uStack_48120;
  uStack_32538 = uStack_480a8;
  uStack_32250 = uStack_48030;
  uStack_31c80 = uStack_47fb8;
  uStack_30540 = uStack_47f40;
  uStack_30258 = uStack_47ec8;
  uStack_2ff70 = uStack_47e50;
  uStack_2f9a0 = uStack_47dd8;
  uStack_2f6b8 = uStack_47d60;
  uStack_2f0e8 = uStack_47ce8;
  uStack_2dc90 = uStack_47c70;
  uStack_2d9a8 = uStack_47bf8;
  uStack_2d3d8 = uStack_47b80;
  uStack_2c268 = uStack_47b08;
  uStack_467c8 = uStack_49e60;
  uStack_44da0 = uStack_49a28;
  uStack_444e8 = uStack_499b0;
  uStack_44200 = uStack_49938;
  uStack_43f18 = uStack_498c0;
  uStack_43c30 = uStack_49848;
  uStack_43378 = uStack_497d0;
  uStack_43090 = uStack_49758;
  uStack_42da8 = uStack_496e0;
  uStack_424f0 = uStack_49668;
  uStack_42208 = uStack_495f0;
  uStack_41950 = uStack_49578;
  uStack_407e0 = uStack_49500;
  uStack_404f8 = uStack_49488;
  uStack_40210 = uStack_49410;
  uStack_3ff28 = uStack_49398;
  uStack_3fc40 = uStack_49320;
  uStack_3f958 = uStack_492a8;
  uStack_3f0a0 = uStack_49230;
  uStack_3edb8 = uStack_491b8;
  uStack_3ead0 = uStack_49140;
  uStack_3e7e8 = uStack_490c8;
  uStack_3e500 = uStack_49050;
  uStack_3dc48 = uStack_48fd8;
  uStack_3d960 = uStack_48f60;
  uStack_3d678 = uStack_48ee8;
  uStack_3d390 = uStack_48e70;
  uStack_3cad8 = uStack_48df8;
  uStack_3c7f0 = uStack_48d80;
  uStack_3c508 = uStack_48d08;
  uStack_3bc50 = uStack_48c90;
  uStack_3b968 = uStack_48c18;
  uStack_3b0b0 = uStack_48ba0;
  uStack_3a228 = uStack_48b28;
  uStack_39f40 = uStack_48ab0;
  uStack_39c58 = uStack_48a38;
  uStack_39970 = uStack_489c0;
  uStack_39688 = uStack_48948;
  uStack_38dd0 = uStack_488d0;
  uStack_38ae8 = uStack_48858;
  uStack_38800 = uStack_487e0;
  uStack_38518 = uStack_48768;
  uStack_37c60 = uStack_486f0;
  uStack_37978 = uStack_48678;
  uStack_36808 = uStack_48510;
  uStack_35f50 = uStack_48498;
  uStack_34de0 = uStack_48420;
  uStack_34af8 = uStack_483a8;
  uStack_34810 = uStack_48330;
  uStack_34528 = uStack_482b8;
  uStack_33c70 = uStack_48240;
  uStack_33988 = uStack_481c8;
  uStack_336a0 = uStack_48150;
  uStack_32de8 = uStack_480d8;
  uStack_32b00 = uStack_48060;
  uStack_32248 = uStack_47fe8;
  uStack_310d8 = uStack_47f70;
  uStack_30df0 = uStack_47ef8;
  uStack_30b08 = uStack_47e80;
  uStack_30250 = uStack_47e08;
  uStack_2ff68 = uStack_47d90;
  uStack_2f6b0 = uStack_47d18;
  uStack_2e540 = uStack_47ca0;
  uStack_2e258 = uStack_47c28;
  uStack_2d9a0 = uStack_47bb0;
  uStack_2c830 = uStack_47b38;
  uStack_464d8 = uStack_49de0;
  uStack_45370 = uStack_49b18;
  uStack_45368 = uStack_49b10;
  uStack_45088 = uStack_49aa0;
  uStack_45080 = uStack_49a98;
  uStack_44d98 = uStack_49a20;
  uStack_444e0 = uStack_499a8;
  uStack_441f8 = uStack_49930;
  uStack_43f10 = uStack_498b8;
  uStack_43c28 = uStack_49840;
  uStack_43370 = uStack_497c8;
  uStack_43088 = uStack_49750;
  uStack_42da0 = uStack_496d8;
  uStack_424e8 = uStack_49660;
  uStack_42200 = uStack_495e8;
  uStack_41948 = uStack_49570;
  uStack_407d8 = uStack_494f8;
  uStack_404f0 = uStack_49480;
  uStack_40208 = uStack_49408;
  uStack_3ff20 = uStack_49390;
  uStack_3fc38 = uStack_49318;
  uStack_3f950 = uStack_492a0;
  uStack_3f098 = uStack_49228;
  uStack_3edb0 = uStack_491b0;
  uStack_3eac8 = uStack_49138;
  uStack_3e7e0 = uStack_490c0;
  uStack_3e4f8 = uStack_49048;
  uStack_3dc40 = uStack_48fd0;
  uStack_3d958 = uStack_48f58;
  uStack_3d670 = uStack_48ee0;
  uStack_3d388 = uStack_48e68;
  uStack_3cad0 = uStack_48df0;
  uStack_3c7e8 = uStack_48d78;
  uStack_3c500 = uStack_48d00;
  uStack_3bc48 = uStack_48c88;
  uStack_3b960 = uStack_48c10;
  uStack_3b0a8 = uStack_48b98;
  uStack_3a220 = uStack_48b20;
  uStack_39f38 = uStack_48aa8;
  uStack_39c50 = uStack_48a30;
  uStack_39968 = uStack_489b8;
  uStack_39680 = uStack_48940;
  uStack_38dc8 = uStack_488c8;
  uStack_38ae0 = uStack_48850;
  uStack_387f8 = uStack_487d8;
  uStack_38510 = uStack_48760;
  uStack_37c58 = uStack_486e8;
  uStack_37970 = uStack_48670;
  uStack_36800 = uStack_48508;
  uStack_35f48 = uStack_48490;
  uStack_34dd8 = uStack_48418;
  uStack_34af0 = uStack_483a0;
  uStack_34808 = uStack_48328;
  uStack_34520 = uStack_482b0;
  uStack_33c68 = uStack_48238;
  uStack_33980 = uStack_481c0;
  uStack_33698 = uStack_48148;
  uStack_32de0 = uStack_480d0;
  uStack_32af8 = uStack_48058;
  uStack_32240 = uStack_47fe0;
  uStack_310d0 = uStack_47f68;
  uStack_30de8 = uStack_47ef0;
  uStack_30b00 = uStack_47e78;
  uStack_30248 = uStack_47e00;
  uStack_2ff60 = uStack_47d88;
  uStack_2f6a8 = uStack_47d10;
  uStack_2e538 = uStack_47c98;
  uStack_2e250 = uStack_47c20;
  uStack_2d998 = uStack_47ba8;
  uStack_2c828 = uStack_47b30;
  uStack_461e8 = uStack_49d60;
  uStack_44d90 = uStack_49a18;
  uStack_444d8 = uStack_499a0;
  uStack_441f0 = uStack_49928;
  uStack_43f08 = uStack_498b0;
  uStack_43c20 = uStack_49838;
  uStack_43368 = uStack_497c0;
  uStack_43080 = uStack_49748;
  uStack_42d98 = uStack_496d0;
  uStack_424e0 = uStack_49658;
  uStack_421f8 = uStack_495e0;
  uStack_41940 = uStack_49568;
  uStack_407d0 = uStack_494f0;
  uStack_404e8 = uStack_49478;
  uStack_40200 = uStack_49400;
  uStack_3ff18 = uStack_49388;
  uStack_3fc30 = uStack_49310;
  uStack_3f948 = uStack_49298;
  uStack_3f090 = uStack_49220;
  uStack_3eda8 = uStack_491a8;
  uStack_3eac0 = uStack_49130;
  uStack_3e7d8 = uStack_490b8;
  uStack_3e4f0 = uStack_49040;
  uStack_3dc38 = uStack_48fc8;
  uStack_3d950 = uStack_48f50;
  uStack_3d668 = uStack_48ed8;
  uStack_3d380 = uStack_48e60;
  uStack_3cac8 = uStack_48de8;
  uStack_3c7e0 = uStack_48d70;
  uStack_3c4f8 = uStack_48cf8;
  uStack_3bc40 = uStack_48c80;
  uStack_3b958 = uStack_48c08;
  uStack_3b0a0 = uStack_48b90;
  uStack_3a218 = uStack_48b18;
  uStack_39f30 = uStack_48aa0;
  uStack_39c48 = uStack_48a28;
  uStack_39960 = uStack_489b0;
  uStack_39678 = uStack_48938;
  uStack_38dc0 = uStack_488c0;
  uStack_38ad8 = uStack_48848;
  uStack_387f0 = uStack_487d0;
  uStack_38508 = uStack_48758;
  uStack_37c50 = uStack_486e0;
  uStack_37968 = uStack_48668;
  uStack_367f8 = uStack_48500;
  uStack_35f40 = uStack_48488;
  uStack_34dd0 = uStack_48410;
  uStack_34ae8 = uStack_48398;
  uStack_34800 = uStack_48320;
  uStack_34518 = uStack_482a8;
  uStack_33c60 = uStack_48230;
  uStack_33978 = uStack_481b8;
  uStack_33690 = uStack_48140;
  uStack_32dd8 = uStack_480c8;
  uStack_32af0 = uStack_48050;
  uStack_32238 = uStack_47fd8;
  uStack_310c8 = uStack_47f60;
  uStack_30de0 = uStack_47ee8;
  uStack_30af8 = uStack_47e70;
  uStack_30240 = uStack_47df8;
  uStack_2ff58 = uStack_47d80;
  uStack_2f6a0 = uStack_47d08;
  uStack_2e530 = uStack_47c90;
  uStack_2e248 = uStack_47c18;
  uStack_2d990 = uStack_47ba0;
  uStack_2c820 = uStack_47b28;
  uStack_45ef8 = uStack_49ce0;
  uStack_45360 = uStack_49b08;
  uStack_45358 = uStack_49b00;
  uStack_45078 = uStack_49a90;
  uStack_45070 = uStack_49a88;
  uStack_44d88 = uStack_49a10;
  uStack_444d0 = uStack_49998;
  uStack_441e8 = uStack_49920;
  uStack_43f00 = uStack_498a8;
  uStack_43c18 = uStack_49830;
  uStack_43360 = uStack_497b8;
  uStack_43078 = uStack_49740;
  uStack_42d90 = uStack_496c8;
  uStack_424d8 = uStack_49650;
  uStack_421f0 = uStack_495d8;
  uStack_41938 = uStack_49560;
  uStack_407c8 = uStack_494e8;
  uStack_404e0 = uStack_49470;
  uStack_401f8 = uStack_493f8;
  uStack_3ff10 = uStack_49380;
  uStack_3fc28 = uStack_49308;
  uStack_3f940 = uStack_49290;
  uStack_3f088 = uStack_49218;
  uStack_3eda0 = uStack_491a0;
  uStack_3eab8 = uStack_49128;
  uStack_3e7d0 = uStack_490b0;
  uStack_3e4e8 = uStack_49038;
  uStack_3dc30 = uStack_48fc0;
  uStack_3d948 = uStack_48f48;
  uStack_3d660 = uStack_48ed0;
  uStack_3d378 = uStack_48e58;
  uStack_3cac0 = uStack_48de0;
  uStack_3c7d8 = uStack_48d68;
  uStack_3c4f0 = uStack_48cf0;
  uStack_3bc38 = uStack_48c78;
  uStack_3b950 = uStack_48c00;
  uStack_3b098 = uStack_48b88;
  uStack_3a210 = uStack_48b10;
  uStack_39f28 = uStack_48a98;
  uStack_39c40 = uStack_48a20;
  uStack_39958 = uStack_489a8;
  uStack_39670 = uStack_48930;
  uStack_38db8 = uStack_488b8;
  uStack_38ad0 = uStack_48840;
  uStack_387e8 = uStack_487c8;
  uStack_38500 = uStack_48750;
  uStack_37c48 = uStack_486d8;
  uStack_37960 = uStack_48660;
  uStack_367f0 = uStack_484f8;
  uStack_35f38 = uStack_48480;
  uStack_34dc8 = uStack_48408;
  uStack_34ae0 = uStack_48390;
  uStack_347f8 = uStack_48318;
  uStack_34510 = uStack_482a0;
  uStack_33c58 = uStack_48228;
  uStack_33970 = uStack_481b0;
  uStack_33688 = uStack_48138;
  uStack_32dd0 = uStack_480c0;
  uStack_32ae8 = uStack_48048;
  uStack_32230 = uStack_47fd0;
  uStack_310c0 = uStack_47f58;
  uStack_30dd8 = uStack_47ee0;
  uStack_30af0 = uStack_47e68;
  uStack_30238 = uStack_47df0;
  uStack_2ff50 = uStack_47d78;
  uStack_2f698 = uStack_47d00;
  uStack_2e528 = uStack_47c88;
  uStack_2e240 = uStack_47c10;
  uStack_2d988 = uStack_47b98;
  uStack_2c818 = uStack_47b20;
  uStack_45920 = uStack_49be0;
  uStack_44d80 = uStack_49a00;
  uStack_444c8 = uStack_49988;
  uStack_441e0 = uStack_49910;
  uStack_43ef8 = uStack_49898;
  uStack_43c10 = uStack_49820;
  uStack_43358 = uStack_497a8;
  uStack_43070 = uStack_49730;
  uStack_42d88 = uStack_496b8;
  uStack_424d0 = uStack_49640;
  uStack_421e8 = uStack_495c8;
  uStack_41930 = uStack_49550;
  uStack_407c0 = uStack_494d8;
  uStack_404d8 = uStack_49460;
  uStack_401f0 = uStack_493e8;
  uStack_3ff08 = uStack_49370;
  uStack_3fc20 = uStack_492f8;
  uStack_3f938 = uStack_49280;
  uStack_3f080 = uStack_49208;
  uStack_3ed98 = uStack_49190;
  uStack_3eab0 = uStack_49118;
  uStack_3e7c8 = uStack_490a0;
  uStack_3e4e0 = uStack_49028;
  uStack_3dc28 = uStack_48fb0;
  uStack_3d940 = uStack_48f38;
  uStack_3d658 = uStack_48ec0;
  uStack_3d370 = uStack_48e48;
  uStack_3cab8 = uStack_48dd0;
  uStack_3c7d0 = uStack_48d58;
  uStack_3c4e8 = uStack_48ce0;
  uStack_3bc30 = uStack_48c68;
  uStack_3b948 = uStack_48bf0;
  uStack_3b090 = uStack_48b78;
  uStack_3a208 = uStack_48b00;
  uStack_39f20 = uStack_48a88;
  uStack_39c38 = uStack_48a10;
  uStack_39950 = uStack_48998;
  uStack_39668 = uStack_48920;
  uStack_38db0 = uStack_488a8;
  uStack_38ac8 = uStack_48830;
  uStack_387e0 = uStack_487b8;
  uStack_384f8 = uStack_48740;
  uStack_37c40 = uStack_486c8;
  uStack_37958 = uStack_48650;
  uStack_367e8 = uStack_484e8;
  uStack_35f30 = uStack_48470;
  uStack_34dc0 = uStack_483f8;
  uStack_34ad8 = uStack_48380;
  uStack_347f0 = uStack_48308;
  uStack_34508 = uStack_48290;
  uStack_33c50 = uStack_48218;
  uStack_33968 = uStack_481a0;
  uStack_33680 = uStack_48128;
  uStack_32dc8 = uStack_480b0;
  uStack_32ae0 = uStack_48038;
  uStack_32228 = uStack_47fc0;
  uStack_310b8 = uStack_47f48;
  uStack_30dd0 = uStack_47ed0;
  uStack_30ae8 = uStack_47e58;
  uStack_30230 = uStack_47de0;
  uStack_2ff48 = uStack_47d68;
  uStack_2f690 = uStack_47cf0;
  uStack_2e520 = uStack_47c78;
  uStack_2e238 = uStack_47c00;
  uStack_2d980 = uStack_47b88;
  uStack_2c810 = uStack_47b10;
  uStack_45630 = uStack_49b60;
  uStack_45350 = uStack_49af0;
  uStack_45348 = uStack_49ae8;
  uStack_45068 = uStack_49a78;
  uStack_45060 = uStack_49a70;
  uStack_44d78 = uStack_499f8;
  uStack_444c0 = uStack_49980;
  uStack_441d8 = uStack_49908;
  uStack_43ef0 = uStack_49890;
  uStack_43c08 = uStack_49818;
  uStack_43350 = uStack_497a0;
  uStack_43068 = uStack_49728;
  uStack_42d80 = uStack_496b0;
  uStack_424c8 = uStack_49638;
  uStack_421e0 = uStack_495c0;
  uStack_41928 = uStack_49548;
  uStack_407b8 = uStack_494d0;
  uStack_404d0 = uStack_49458;
  uStack_401e8 = uStack_493e0;
  uStack_3ff00 = uStack_49368;
  uStack_3fc18 = uStack_492f0;
  uStack_3f930 = uStack_49278;
  uStack_3f078 = uStack_49200;
  uStack_3ed90 = uStack_49188;
  uStack_3eaa8 = uStack_49110;
  uStack_3e7c0 = uStack_49098;
  uStack_3e4d8 = uStack_49020;
  uStack_3dc20 = uStack_48fa8;
  uStack_3d938 = uStack_48f30;
  uStack_3d650 = uStack_48eb8;
  uStack_3d368 = uStack_48e40;
  uStack_3cab0 = uStack_48dc8;
  uStack_3c7c8 = uStack_48d50;
  uStack_3c4e0 = uStack_48cd8;
  uStack_3bc28 = uStack_48c60;
  uStack_3b940 = uStack_48be8;
  uStack_3b088 = uStack_48b70;
  uStack_3a200 = uStack_48af8;
  uStack_39f18 = uStack_48a80;
  uStack_39c30 = uStack_48a08;
  uStack_39948 = uStack_48990;
  uStack_39660 = uStack_48918;
  uStack_38da8 = uStack_488a0;
  uStack_38ac0 = uStack_48828;
  uStack_387d8 = uStack_487b0;
  uStack_384f0 = uStack_48738;
  uStack_37c38 = uStack_486c0;
  uStack_37950 = uStack_48648;
  uStack_367e0 = uStack_484e0;
  uStack_35f28 = uStack_48468;
  uStack_34db8 = uStack_483f0;
  uStack_34ad0 = uStack_48378;
  uStack_347e8 = uStack_48300;
  uStack_34500 = uStack_48288;
  uStack_33c48 = uStack_48210;
  uStack_33960 = uStack_48198;
  uStack_33678 = uStack_48120;
  uStack_32dc0 = uStack_480a8;
  uStack_32ad8 = uStack_48030;
  uStack_32220 = uStack_47fb8;
  uStack_310b0 = uStack_47f40;
  uStack_30dc8 = uStack_47ec8;
  uStack_30ae0 = uStack_47e50;
  uStack_30228 = uStack_47dd8;
  uStack_2ff40 = uStack_47d60;
  uStack_2f688 = uStack_47ce8;
  uStack_2e518 = uStack_47c70;
  uStack_2e230 = uStack_47bf8;
  uStack_2d978 = uStack_47b80;
  uStack_2c808 = uStack_47b08;
  uStack_45bf8 = uStack_49e60;
  uStack_444b8 = uStack_49b18;
  uStack_441d0 = uStack_49aa0;
  uStack_43ee8 = uStack_49a28;
  uStack_43918 = uStack_499b0;
  uStack_43630 = uStack_49938;
  uStack_43348 = uStack_498c0;
  uStack_43060 = uStack_49848;
  uStack_42a90 = uStack_497d0;
  uStack_427a8 = uStack_49758;
  uStack_424c0 = uStack_496e0;
  uStack_41ef0 = uStack_49668;
  uStack_41c08 = uStack_495f0;
  uStack_41638 = uStack_49578;
  uStack_3f640 = uStack_49500;
  uStack_3f358 = uStack_49488;
  uStack_3f070 = uStack_49410;
  uStack_3ed88 = uStack_49398;
  uStack_3eaa0 = uStack_49320;
  uStack_3e7b8 = uStack_492a8;
  uStack_3e1e8 = uStack_49230;
  uStack_3df00 = uStack_491b8;
  uStack_3dc18 = uStack_49140;
  uStack_3d930 = uStack_490c8;
  uStack_3d648 = uStack_49050;
  uStack_3d078 = uStack_48fd8;
  uStack_3cd90 = uStack_48f60;
  uStack_3caa8 = uStack_48ee8;
  uStack_3c7c0 = uStack_48e70;
  uStack_3c1f0 = uStack_48df8;
  uStack_3bf08 = uStack_48d80;
  uStack_3bc20 = uStack_48d08;
  uStack_3b650 = uStack_48c90;
  uStack_3b368 = uStack_48c18;
  uStack_3ad98 = uStack_48ba0;
  uStack_39370 = uStack_48b28;
  uStack_39088 = uStack_48ab0;
  uStack_38da0 = uStack_48a38;
  uStack_38ab8 = uStack_489c0;
  uStack_387d0 = uStack_48948;
  uStack_38200 = uStack_488d0;
  uStack_37f18 = uStack_48858;
  uStack_37c30 = uStack_487e0;
  uStack_364f0 = uStack_48588;
  uStack_36208 = uStack_48510;
  uStack_35c38 = uStack_48498;
  uStack_34210 = uStack_48420;
  uStack_33f28 = uStack_483a8;
  uStack_33c40 = uStack_48330;
  uStack_33958 = uStack_482b8;
  uStack_33388 = uStack_48240;
  uStack_330a0 = uStack_481c8;
  uStack_32db8 = uStack_48150;
  uStack_327e8 = uStack_480d8;
  uStack_32500 = uStack_48060;
  uStack_31f30 = uStack_47fe8;
  uStack_307f0 = uStack_47f70;
  uStack_30508 = uStack_47ef8;
  uStack_30220 = uStack_47e80;
  uStack_2fc50 = uStack_47e08;
  uStack_2f968 = uStack_47d90;
  uStack_2f398 = uStack_47d18;
  uStack_2df40 = uStack_47ca0;
  uStack_2dc58 = uStack_47c28;
  uStack_2d688 = uStack_47bb0;
  uStack_2c518 = uStack_47b38;
  uStack_45908 = uStack_49de0;
  uStack_444b0 = uStack_49b10;
  uStack_441c8 = uStack_49a98;
  uStack_43ee0 = uStack_49a20;
  uStack_43910 = uStack_499a8;
  uStack_43628 = uStack_49930;
  uStack_43340 = uStack_498b8;
  uStack_43058 = uStack_49840;
  uStack_42a88 = uStack_497c8;
  uStack_427a0 = uStack_49750;
  uStack_424b8 = uStack_496d8;
  uStack_41ee8 = uStack_49660;
  uStack_41c00 = uStack_495e8;
  uStack_41630 = uStack_49570;
  uStack_3f638 = uStack_494f8;
  uStack_3f350 = uStack_49480;
  uStack_3f068 = uStack_49408;
  uStack_3ed80 = uStack_49390;
  uStack_3ea98 = uStack_49318;
  uStack_3e7b0 = uStack_492a0;
  uStack_3e1e0 = uStack_49228;
  uStack_3def8 = uStack_491b0;
  uStack_3dc10 = uStack_49138;
  uStack_3d928 = uStack_490c0;
  uStack_3d640 = uStack_49048;
  uStack_3d070 = uStack_48fd0;
  uStack_3cd88 = uStack_48f58;
  uStack_3caa0 = uStack_48ee0;
  uStack_3c7b8 = uStack_48e68;
  uStack_3c1e8 = uStack_48df0;
  uStack_3bf00 = uStack_48d78;
  uStack_3bc18 = uStack_48d00;
  uStack_3b648 = uStack_48c88;
  uStack_3b360 = uStack_48c10;
  uStack_3ad90 = uStack_48b98;
  uStack_39368 = uStack_48b20;
  uStack_39080 = uStack_48aa8;
  uStack_38d98 = uStack_48a30;
  uStack_38ab0 = uStack_489b8;
  uStack_387c8 = uStack_48940;
  uStack_381f8 = uStack_488c8;
  uStack_37f10 = uStack_48850;
  uStack_37c28 = uStack_487d8;
  uStack_364e8 = uStack_48580;
  uStack_36200 = uStack_48508;
  uStack_35c30 = uStack_48490;
  uStack_34208 = uStack_48418;
  uStack_33f20 = uStack_483a0;
  uStack_33c38 = uStack_48328;
  uStack_33950 = uStack_482b0;
  uStack_33380 = uStack_48238;
  uStack_33098 = uStack_481c0;
  uStack_32db0 = uStack_48148;
  uStack_327e0 = uStack_480d0;
  uStack_324f8 = uStack_48058;
  uStack_31f28 = uStack_47fe0;
  uStack_307e8 = uStack_47f68;
  uStack_30500 = uStack_47ef0;
  uStack_30218 = uStack_47e78;
  uStack_2fc48 = uStack_47e00;
  uStack_2f960 = uStack_47d88;
  uStack_2f390 = uStack_47d10;
  uStack_2df38 = uStack_47c98;
  uStack_2dc50 = uStack_47c20;
  uStack_2d680 = uStack_47ba8;
  uStack_2c510 = uStack_47b30;
  uStack_45618 = uStack_49d60;
  uStack_444a8 = uStack_49b08;
  uStack_441c0 = uStack_49a90;
  uStack_43ed8 = uStack_49a18;
  uStack_43908 = uStack_499a0;
  uStack_43620 = uStack_49928;
  uStack_43338 = uStack_498b0;
  uStack_43050 = uStack_49838;
  uStack_42a80 = uStack_497c0;
  uStack_42798 = uStack_49748;
  uStack_424b0 = uStack_496d0;
  uStack_41ee0 = uStack_49658;
  uStack_41bf8 = uStack_495e0;
  uStack_41628 = uStack_49568;
  uStack_3f630 = uStack_494f0;
  uStack_3f348 = uStack_49478;
  uStack_3f060 = uStack_49400;
  uStack_3ed78 = uStack_49388;
  uStack_3ea90 = uStack_49310;
  uStack_3e7a8 = uStack_49298;
  uStack_3e1d8 = uStack_49220;
  uStack_3def0 = uStack_491a8;
  uStack_3dc08 = uStack_49130;
  uStack_3d920 = uStack_490b8;
  uStack_3d638 = uStack_49040;
  uStack_3d068 = uStack_48fc8;
  uStack_3cd80 = uStack_48f50;
  uStack_3ca98 = uStack_48ed8;
  uStack_3c7b0 = uStack_48e60;
  uStack_3c1e0 = uStack_48de8;
  uStack_3bef8 = uStack_48d70;
  uStack_3bc10 = uStack_48cf8;
  uStack_3b640 = uStack_48c80;
  uStack_3b358 = uStack_48c08;
  uStack_3ad88 = uStack_48b90;
  uStack_39360 = uStack_48b18;
  uStack_39078 = uStack_48aa0;
  uStack_38d90 = uStack_48a28;
  uStack_38aa8 = uStack_489b0;
  uStack_387c0 = uStack_48938;
  uStack_381f0 = uStack_488c0;
  uStack_37f08 = uStack_48848;
  uStack_37c20 = uStack_487d0;
  uStack_364e0 = uStack_48578;
  uStack_361f8 = uStack_48500;
  uStack_35c28 = uStack_48488;
  uStack_34200 = uStack_48410;
  uStack_33f18 = uStack_48398;
  uStack_33c30 = uStack_48320;
  uStack_33948 = uStack_482a8;
  uStack_33378 = uStack_48230;
  uStack_33090 = uStack_481b8;
  uStack_32da8 = uStack_48140;
  uStack_327d8 = uStack_480c8;
  uStack_324f0 = uStack_48050;
  uStack_31f20 = uStack_47fd8;
  uStack_307e0 = uStack_47f60;
  uStack_304f8 = uStack_47ee8;
  uStack_30210 = uStack_47e70;
  uStack_2fc40 = uStack_47df8;
  uStack_2f958 = uStack_47d80;
  uStack_2f388 = uStack_47d08;
  uStack_2df30 = uStack_47c90;
  uStack_2dc48 = uStack_47c18;
  uStack_2d678 = uStack_47ba0;
  uStack_2c508 = uStack_47b28;
  uStack_45328 = uStack_49ce0;
  uStack_444a0 = uStack_49b00;
  uStack_441b8 = uStack_49a88;
  uStack_43ed0 = uStack_49a10;
  uStack_43900 = uStack_49998;
  uStack_43618 = uStack_49920;
  uStack_43330 = uStack_498a8;
  uStack_43048 = uStack_49830;
  uStack_42a78 = uStack_497b8;
  uStack_42790 = uStack_49740;
  uStack_424a8 = uStack_496c8;
  uStack_41ed8 = uStack_49650;
  uStack_41bf0 = uStack_495d8;
  uStack_41620 = uStack_49560;
  uStack_3f628 = uStack_494e8;
  uStack_3f340 = uStack_49470;
  uStack_3f058 = uStack_493f8;
  uStack_3ed70 = uStack_49380;
  uStack_3ea88 = uStack_49308;
  uStack_3e7a0 = uStack_49290;
  uStack_3e1d0 = uStack_49218;
  uStack_3dee8 = uStack_491a0;
  uStack_3dc00 = uStack_49128;
  uStack_3d918 = uStack_490b0;
  uStack_3d630 = uStack_49038;
  uStack_3d060 = uStack_48fc0;
  uStack_3cd78 = uStack_48f48;
  uStack_3ca90 = uStack_48ed0;
  uStack_3c7a8 = uStack_48e58;
  uStack_3c1d8 = uStack_48de0;
  uStack_3bef0 = uStack_48d68;
  uStack_3bc08 = uStack_48cf0;
  uStack_3b638 = uStack_48c78;
  uStack_3b350 = uStack_48c00;
  uStack_3ad80 = uStack_48b88;
  uStack_39358 = uStack_48b10;
  uStack_39070 = uStack_48a98;
  uStack_38d88 = uStack_48a20;
  uStack_38aa0 = uStack_489a8;
  uStack_387b8 = uStack_48930;
  uStack_381e8 = uStack_488b8;
  uStack_37f00 = uStack_48840;
  uStack_37c18 = uStack_487c8;
  uStack_364d8 = uStack_48570;
  uStack_361f0 = uStack_484f8;
  uStack_35c20 = uStack_48480;
  uStack_341f8 = uStack_48408;
  uStack_33f10 = uStack_48390;
  uStack_33c28 = uStack_48318;
  uStack_33940 = uStack_482a0;
  uStack_33370 = uStack_48228;
  uStack_33088 = uStack_481b0;
  uStack_32da0 = uStack_48138;
  uStack_327d0 = uStack_480c0;
  uStack_324e8 = uStack_48048;
  uStack_31f18 = uStack_47fd0;
  uStack_307d8 = uStack_47f58;
  uStack_304f0 = uStack_47ee0;
  uStack_30208 = uStack_47e68;
  uStack_2fc38 = uStack_47df0;
  uStack_2f950 = uStack_47d78;
  uStack_2f380 = uStack_47d00;
  uStack_2df28 = uStack_47c88;
  uStack_2dc40 = uStack_47c10;
  uStack_2d670 = uStack_47b98;
  uStack_2c500 = uStack_47b20;
  uStack_45038 = uStack_49c60;
  uStack_44498 = uStack_49af8;
  uStack_441b0 = uStack_49a80;
  uStack_43ec8 = uStack_49a08;
  uStack_438f8 = uStack_49990;
  uStack_43610 = uStack_49918;
  uStack_43328 = uStack_498a0;
  uStack_43040 = uStack_49828;
  uStack_42a70 = uStack_497b0;
  uStack_42788 = uStack_49738;
  uStack_424a0 = uStack_496c0;
  uStack_41ed0 = uStack_49648;
  uStack_41be8 = uStack_495d0;
  uStack_41618 = uStack_49558;
  uStack_3f620 = uStack_494e0;
  uStack_3f338 = uStack_49468;
  uStack_3f050 = uStack_493f0;
  uStack_3ed68 = uStack_49378;
  uStack_3ea80 = uStack_49300;
  uStack_3e798 = uStack_49288;
  uStack_3e1c8 = uStack_49210;
  uStack_3dee0 = uStack_49198;
  uStack_3dbf8 = uStack_49120;
  uStack_3d910 = uStack_490a8;
  uStack_3d628 = uStack_49030;
  uStack_3d058 = uStack_48fb8;
  uStack_3cd70 = uStack_48f40;
  uStack_3ca88 = uStack_48ec8;
  uStack_3c7a0 = uStack_48e50;
  uStack_3c1d0 = uStack_48dd8;
  uStack_3bee8 = uStack_48d60;
  uStack_3bc00 = uStack_48ce8;
  uStack_3b630 = uStack_48c70;
  uStack_3b348 = uStack_48bf8;
  uStack_3ad78 = uStack_48b80;
  uStack_39350 = uStack_48b08;
  uStack_39068 = uStack_48a90;
  uStack_38d80 = uStack_48a18;
  uStack_38a98 = uStack_489a0;
  uStack_387b0 = uStack_48928;
  uStack_381e0 = uStack_488b0;
  uStack_37ef8 = uStack_48838;
  uStack_37c10 = uStack_487c0;
  uStack_364d0 = uStack_48568;
  uStack_361e8 = uStack_484f0;
  uStack_35c18 = uStack_48478;
  uStack_341f0 = uStack_48400;
  uStack_33f08 = uStack_48388;
  uStack_33c20 = uStack_48310;
  uStack_33938 = uStack_48298;
  uStack_33368 = uStack_48220;
  uStack_33080 = uStack_481a8;
  uStack_32d98 = uStack_48130;
  uStack_327c8 = uStack_480b8;
  uStack_324e0 = uStack_48040;
  uStack_31f10 = uStack_47fc8;
  uStack_307d0 = uStack_47f50;
  uStack_304e8 = uStack_47ed8;
  uStack_30200 = uStack_47e60;
  uStack_2fc30 = uStack_47de8;
  uStack_2f948 = uStack_47d70;
  uStack_2f378 = uStack_47cf8;
  uStack_2df20 = uStack_47c80;
  uStack_2dc38 = uStack_47c08;
  uStack_2d668 = uStack_47b90;
  uStack_2c4f8 = uStack_47b18;
  uStack_44a60 = uStack_49be0;
  uStack_44490 = uStack_49af0;
  uStack_441a8 = uStack_49a78;
  uStack_43ec0 = uStack_49a00;
  uStack_438f0 = uStack_49988;
  uStack_43608 = uStack_49910;
  uStack_43320 = uStack_49898;
  uStack_43038 = uStack_49820;
  uStack_42a68 = uStack_497a8;
  uStack_42780 = uStack_49730;
  uStack_42498 = uStack_496b8;
  uStack_41ec8 = uStack_49640;
  uStack_41be0 = uStack_495c8;
  uStack_41610 = uStack_49550;
  uStack_3f618 = uStack_494d8;
  uStack_3f330 = uStack_49460;
  uStack_3f048 = uStack_493e8;
  uStack_3ed60 = uStack_49370;
  uStack_3ea78 = uStack_492f8;
  uStack_3e790 = uStack_49280;
  uStack_3e1c0 = uStack_49208;
  uStack_3ded8 = uStack_49190;
  uStack_3dbf0 = uStack_49118;
  uStack_3d908 = uStack_490a0;
  uStack_3d620 = uStack_49028;
  uStack_3d050 = uStack_48fb0;
  uStack_3cd68 = uStack_48f38;
  uStack_3ca80 = uStack_48ec0;
  uStack_3c798 = uStack_48e48;
  uStack_3c1c8 = uStack_48dd0;
  uStack_3bee0 = uStack_48d58;
  uStack_3bbf8 = uStack_48ce0;
  uStack_3b628 = uStack_48c68;
  uStack_3b340 = uStack_48bf0;
  uStack_3ad70 = uStack_48b78;
  uStack_39348 = uStack_48b00;
  uStack_39060 = uStack_48a88;
  uStack_38d78 = uStack_48a10;
  uStack_38a90 = uStack_48998;
  uStack_387a8 = uStack_48920;
  uStack_381d8 = uStack_488a8;
  uStack_37ef0 = uStack_48830;
  uStack_37c08 = uStack_487b8;
  uStack_364c8 = uStack_48560;
  uStack_361e0 = uStack_484e8;
  uStack_35c10 = uStack_48470;
  uStack_341e8 = uStack_483f8;
  uStack_33f00 = uStack_48380;
  uStack_33c18 = uStack_48308;
  uStack_33930 = uStack_48290;
  uStack_33360 = uStack_48218;
  uStack_33078 = uStack_481a0;
  uStack_32d90 = uStack_48128;
  uStack_327c0 = uStack_480b0;
  uStack_324d8 = uStack_48038;
  uStack_31f08 = uStack_47fc0;
  uStack_307c8 = uStack_47f48;
  uStack_304e0 = uStack_47ed0;
  uStack_301f8 = uStack_47e58;
  uStack_2fc28 = uStack_47de0;
  uStack_2f940 = uStack_47d68;
  uStack_2f370 = uStack_47cf0;
  uStack_2df18 = uStack_47c78;
  uStack_2dc30 = uStack_47c00;
  uStack_2d660 = uStack_47b88;
  uStack_2c4f0 = uStack_47b10;
  uStack_44770 = uStack_49b60;
  uStack_44488 = uStack_49ae8;
  uStack_441a0 = uStack_49a70;
  uStack_43eb8 = uStack_499f8;
  uStack_438e8 = uStack_49980;
  uStack_43600 = uStack_49908;
  uStack_43318 = uStack_49890;
  uStack_43030 = uStack_49818;
  uStack_42a60 = uStack_497a0;
  uStack_42778 = uStack_49728;
  uStack_42490 = uStack_496b0;
  uStack_41ec0 = uStack_49638;
  uStack_41bd8 = uStack_495c0;
  uStack_41608 = uStack_49548;
  uStack_3f610 = uStack_494d0;
  uStack_3f328 = uStack_49458;
  uStack_3f040 = uStack_493e0;
  uStack_3ed58 = uStack_49368;
  uStack_3ea70 = uStack_492f0;
  uStack_3e788 = uStack_49278;
  uStack_3e1b8 = uStack_49200;
  uStack_3ded0 = uStack_49188;
  uStack_3dbe8 = uStack_49110;
  uStack_3d900 = uStack_49098;
  uStack_3d618 = uStack_49020;
  uStack_3d048 = uStack_48fa8;
  uStack_3cd60 = uStack_48f30;
  uStack_3ca78 = uStack_48eb8;
  uStack_3c790 = uStack_48e40;
  uStack_3c1c0 = uStack_48dc8;
  uStack_3bed8 = uStack_48d50;
  uStack_3bbf0 = uStack_48cd8;
  uStack_3b620 = uStack_48c60;
  uStack_3b338 = uStack_48be8;
  uStack_3ad68 = uStack_48b70;
  uStack_39340 = uStack_48af8;
  uStack_39058 = uStack_48a80;
  uStack_38d70 = uStack_48a08;
  uStack_38a88 = uStack_48990;
  uStack_387a0 = uStack_48918;
  uStack_381d0 = uStack_488a0;
  uStack_37ee8 = uStack_48828;
  uStack_37c00 = uStack_487b0;
  uStack_364c0 = uStack_48558;
  uStack_361d8 = uStack_484e0;
  uStack_35c08 = uStack_48468;
  uStack_341e0 = uStack_483f0;
  uStack_33ef8 = uStack_48378;
  uStack_33c10 = uStack_48300;
  uStack_33928 = uStack_48288;
  uStack_33358 = uStack_48210;
  uStack_33070 = uStack_48198;
  uStack_32d88 = uStack_48120;
  uStack_327b8 = uStack_480a8;
  uStack_324d0 = uStack_48030;
  uStack_31f00 = uStack_47fb8;
  uStack_307c0 = uStack_47f40;
  uStack_304d8 = uStack_47ec8;
  uStack_301f0 = uStack_47e50;
  uStack_2fc20 = uStack_47dd8;
  uStack_2f938 = uStack_47d60;
  uStack_2f368 = uStack_47ce8;
  uStack_2df10 = uStack_47c70;
  uStack_2dc28 = uStack_47bf8;
  uStack_2d658 = uStack_47b80;
  uStack_2c4e8 = uStack_47b08;
  uStack_478d0 = uStack_4a160;
  uStack_45020 = uStack_49a58;
  uStack_44768 = uStack_499e0;
  uStack_44480 = uStack_49968;
  uStack_44198 = uStack_498f0;
  uStack_43eb0 = uStack_49878;
  uStack_435f8 = uStack_49800;
  uStack_43310 = uStack_49788;
  uStack_43028 = uStack_49710;
  uStack_42770 = uStack_49698;
  uStack_42488 = uStack_49620;
  uStack_41bd0 = uStack_495a8;
  uStack_40a60 = uStack_49530;
  uStack_40778 = uStack_494b8;
  uStack_40490 = uStack_49440;
  uStack_401a8 = uStack_493c8;
  uStack_3fec0 = uStack_49350;
  uStack_3fbd8 = uStack_492d8;
  uStack_3f320 = uStack_49260;
  uStack_3f038 = uStack_491e8;
  uStack_3ed50 = uStack_49170;
  uStack_3ea68 = uStack_490f8;
  uStack_3e780 = uStack_49080;
  uStack_3dec8 = uStack_49008;
  uStack_3dbe0 = uStack_48f90;
  uStack_3d8f8 = uStack_48f18;
  uStack_3d610 = uStack_48ea0;
  uStack_3cd58 = uStack_48e28;
  uStack_3ca70 = uStack_48db0;
  uStack_3c788 = uStack_48d38;
  uStack_3bed0 = uStack_48cc0;
  uStack_3bbe8 = uStack_48c48;
  uStack_3b330 = uStack_48bd0;
  uStack_3a4a8 = uStack_48b58;
  uStack_3a1c0 = uStack_48ae0;
  uStack_39ed8 = uStack_48a68;
  uStack_39bf0 = uStack_489f0;
  uStack_39908 = uStack_48978;
  uStack_39050 = uStack_48900;
  uStack_38d68 = uStack_48888;
  uStack_38a80 = uStack_48810;
  uStack_38798 = uStack_48798;
  uStack_37ee0 = uStack_48720;
  uStack_37bf8 = uStack_486a8;
  uStack_361d0 = uStack_484c8;
  uStack_35060 = uStack_48450;
  uStack_34d78 = uStack_483d8;
  uStack_34a90 = uStack_48360;
  uStack_347a8 = uStack_482e8;
  uStack_33ef0 = uStack_48270;
  uStack_33c08 = uStack_481f8;
  uStack_33920 = uStack_48180;
  uStack_33068 = uStack_48108;
  uStack_32d80 = uStack_48090;
  uStack_324c8 = uStack_48018;
  uStack_31358 = uStack_47fa0;
  uStack_31070 = uStack_47f28;
  uStack_30d88 = uStack_47eb0;
  uStack_304d0 = uStack_47e38;
  uStack_301e8 = uStack_47dc0;
  uStack_2f930 = uStack_47d48;
  uStack_2e7c0 = uStack_47cd0;
  uStack_2e4d8 = uStack_47c58;
  uStack_2dc20 = uStack_47be0;
  uStack_2cab0 = uStack_47b68;
  uStack_475e0 = uStack_4a0e0;
  uStack_455f0 = uStack_49b48;
  uStack_455e8 = uStack_49b40;
  uStack_45308 = uStack_49ad0;
  uStack_45300 = uStack_49ac8;
  uStack_45018 = uStack_49a50;
  uStack_44760 = uStack_499d8;
  uStack_44478 = uStack_49960;
  uStack_44190 = uStack_498e8;
  uStack_43ea8 = uStack_49870;
  uStack_435f0 = uStack_497f8;
  uStack_43308 = uStack_49780;
  uStack_43020 = uStack_49708;
  uStack_42768 = uStack_49690;
  uStack_42480 = uStack_49618;
  uStack_41bc8 = uStack_495a0;
  uStack_40a58 = uStack_49528;
  uStack_40770 = uStack_494b0;
  uStack_40488 = uStack_49438;
  uStack_401a0 = uStack_493c0;
  uStack_3feb8 = uStack_49348;
  uStack_3fbd0 = uStack_492d0;
  uStack_3f318 = uStack_49258;
  uStack_3f030 = uStack_491e0;
  uStack_3ed48 = uStack_49168;
  uStack_3ea60 = uStack_490f0;
  uStack_3e778 = uStack_49078;
  uStack_3dec0 = uStack_49000;
  uStack_3dbd8 = uStack_48f88;
  uStack_3d8f0 = uStack_48f10;
  uStack_3d608 = uStack_48e98;
  uStack_3cd50 = uStack_48e20;
  uStack_3ca68 = uStack_48da8;
  uStack_3c780 = uStack_48d30;
  uStack_3bec8 = uStack_48cb8;
  uStack_3bbe0 = uStack_48c40;
  uStack_3b328 = uStack_48bc8;
  uStack_3a4a0 = uStack_48b50;
  uStack_3a1b8 = uStack_48ad8;
  uStack_39ed0 = uStack_48a60;
  uStack_39be8 = uStack_489e8;
  uStack_39900 = uStack_48970;
  uStack_39048 = uStack_488f8;
  uStack_38d60 = uStack_48880;
  uStack_38a78 = uStack_48808;
  uStack_38790 = uStack_48790;
  uStack_37ed8 = uStack_48718;
  uStack_37bf0 = uStack_486a0;
  uStack_361c8 = uStack_484c0;
  uStack_35058 = uStack_48448;
  uStack_34d70 = uStack_483d0;
  uStack_34a88 = uStack_48358;
  uStack_347a0 = uStack_482e0;
  uStack_33ee8 = uStack_48268;
  uStack_33c00 = uStack_481f0;
  uStack_33918 = uStack_48178;
  uStack_33060 = uStack_48100;
  uStack_32d78 = uStack_48088;
  uStack_324c0 = uStack_48010;
  uStack_31350 = uStack_47f98;
  uStack_31068 = uStack_47f20;
  uStack_30d80 = uStack_47ea8;
  uStack_304c8 = uStack_47e30;
  uStack_301e0 = uStack_47db8;
  uStack_2f928 = uStack_47d40;
  uStack_2e7b8 = uStack_47cc8;
  uStack_2e4d0 = uStack_47c50;
  uStack_2dc18 = uStack_47bd8;
  uStack_2caa8 = uStack_47b60;
  uStack_472f0 = uStack_4a060;
  uStack_45010 = uStack_49a48;
  uStack_44758 = uStack_499d0;
  uStack_44470 = uStack_49958;
  uStack_44188 = uStack_498e0;
  uStack_43ea0 = uStack_49868;
  uStack_435e8 = uStack_497f0;
  uStack_43300 = uStack_49778;
  uStack_43018 = uStack_49700;
  uStack_42760 = uStack_49688;
  uStack_42478 = uStack_49610;
  uStack_41bc0 = uStack_49598;
  uStack_40a50 = uStack_49520;
  uStack_40768 = uStack_494a8;
  uStack_40480 = uStack_49430;
  uStack_40198 = uStack_493b8;
  uStack_3feb0 = uStack_49340;
  uStack_3fbc8 = uStack_492c8;
  uStack_3f310 = uStack_49250;
  uStack_3f028 = uStack_491d8;
  uStack_3ed40 = uStack_49160;
  uStack_3ea58 = uStack_490e8;
  uStack_3e770 = uStack_49070;
  uStack_3deb8 = uStack_48ff8;
  uStack_3dbd0 = uStack_48f80;
  uStack_3d8e8 = uStack_48f08;
  uStack_3d600 = uStack_48e90;
  uStack_3cd48 = uStack_48e18;
  uStack_3ca60 = uStack_48da0;
  uStack_3c778 = uStack_48d28;
  uStack_3bec0 = uStack_48cb0;
  uStack_3bbd8 = uStack_48c38;
  uStack_3b320 = uStack_48bc0;
  uStack_3a498 = uStack_48b48;
  uStack_3a1b0 = uStack_48ad0;
  uStack_39ec8 = uStack_48a58;
  uStack_39be0 = uStack_489e0;
  uStack_398f8 = uStack_48968;
  uStack_39040 = uStack_488f0;
  uStack_38d58 = uStack_48878;
  uStack_38a70 = uStack_48800;
  uStack_38788 = uStack_48788;
  uStack_37ed0 = uStack_48710;
  uStack_37be8 = uStack_48698;
  uStack_361c0 = uStack_484b8;
  uStack_35050 = uStack_48440;
  uStack_34d68 = uStack_483c8;
  uStack_34a80 = uStack_48350;
  uStack_34798 = uStack_482d8;
  uStack_33ee0 = uStack_48260;
  uStack_33bf8 = uStack_481e8;
  uStack_33910 = uStack_48170;
  uStack_33058 = uStack_480f8;
  uStack_32d70 = uStack_48080;
  uStack_324b8 = uStack_48008;
  uStack_31348 = uStack_47f90;
  uStack_31060 = uStack_47f18;
  uStack_30d78 = uStack_47ea0;
  uStack_304c0 = uStack_47e28;
  uStack_301d8 = uStack_47db0;
  uStack_2f920 = uStack_47d38;
  uStack_2e7b0 = uStack_47cc0;
  uStack_2e4c8 = uStack_47c48;
  uStack_2dc10 = uStack_47bd0;
  uStack_2caa0 = uStack_47b58;
  uStack_47000 = uStack_49fe0;
  uStack_455e0 = uStack_49b38;
  uStack_455d8 = uStack_49b30;
  uStack_452f8 = uStack_49ac0;
  uStack_452f0 = uStack_49ab8;
  uStack_45008 = uStack_49a40;
  uStack_44750 = uStack_499c8;
  uStack_44468 = uStack_49950;
  uStack_44180 = uStack_498d8;
  uStack_43e98 = uStack_49860;
  uStack_435e0 = uStack_497e8;
  uStack_432f8 = uStack_49770;
  uStack_43010 = uStack_496f8;
  uStack_42758 = uStack_49680;
  uStack_42470 = uStack_49608;
  uStack_41bb8 = uStack_49590;
  uStack_40a48 = uStack_49518;
  uStack_40760 = uStack_494a0;
  uStack_40478 = uStack_49428;
  uStack_40190 = uStack_493b0;
  uStack_3fea8 = uStack_49338;
  uStack_3fbc0 = uStack_492c0;
  uStack_3f308 = uStack_49248;
  uStack_3f020 = uStack_491d0;
  uStack_3ed38 = uStack_49158;
  uStack_3ea50 = uStack_490e0;
  uStack_3e768 = uStack_49068;
  uStack_3deb0 = uStack_48ff0;
  uStack_3dbc8 = uStack_48f78;
  uStack_3d8e0 = uStack_48f00;
  uStack_3d5f8 = uStack_48e88;
  uStack_3cd40 = uStack_48e10;
  uStack_3ca58 = uStack_48d98;
  uStack_3c770 = uStack_48d20;
  uStack_3beb8 = uStack_48ca8;
  uStack_3bbd0 = uStack_48c30;
  uStack_3b318 = uStack_48bb8;
  uStack_3a490 = uStack_48b40;
  uStack_3a1a8 = uStack_48ac8;
  uStack_39ec0 = uStack_48a50;
  uStack_39bd8 = uStack_489d8;
  uStack_398f0 = uStack_48960;
  uStack_39038 = uStack_488e8;
  uStack_38d50 = uStack_48870;
  uStack_38a68 = uStack_487f8;
  uStack_38780 = uStack_48780;
  uStack_37ec8 = uStack_48708;
  uStack_37be0 = uStack_48690;
  uStack_361b8 = uStack_484b0;
  uStack_35048 = uStack_48438;
  uStack_34d60 = uStack_483c0;
  uStack_34a78 = uStack_48348;
  uStack_34790 = uStack_482d0;
  uStack_33ed8 = uStack_48258;
  uStack_33bf0 = uStack_481e0;
  uStack_33908 = uStack_48168;
  uStack_33050 = uStack_480f0;
  uStack_32d68 = uStack_48078;
  uStack_324b0 = uStack_48000;
  uStack_31340 = uStack_47f88;
  uStack_31058 = uStack_47f10;
  uStack_30d70 = uStack_47e98;
  uStack_304b8 = uStack_47e20;
  uStack_301d0 = uStack_47da8;
  uStack_2f918 = uStack_47d30;
  uStack_2e7a8 = uStack_47cb8;
  uStack_2e4c0 = uStack_47c40;
  uStack_2dc08 = uStack_47bc8;
  uStack_2ca98 = uStack_47b50;
  uStack_46d10 = uStack_49ee0;
  uStack_45000 = uStack_49a30;
  uStack_44748 = uStack_499b8;
  uStack_44460 = uStack_49940;
  uStack_44178 = uStack_498c8;
  uStack_43e90 = uStack_49850;
  uStack_435d8 = uStack_497d8;
  uStack_432f0 = uStack_49760;
  uStack_43008 = uStack_496e8;
  uStack_42750 = uStack_49670;
  uStack_42468 = uStack_495f8;
  uStack_41bb0 = uStack_49580;
  uStack_40a40 = uStack_49508;
  uStack_40758 = uStack_49490;
  uStack_40470 = uStack_49418;
  uStack_40188 = uStack_493a0;
  uStack_3fea0 = uStack_49328;
  uStack_3fbb8 = uStack_492b0;
  uStack_3f300 = uStack_49238;
  uStack_3f018 = uStack_491c0;
  uStack_3ed30 = uStack_49148;
  uStack_3ea48 = uStack_490d0;
  uStack_3e760 = uStack_49058;
  uStack_3dea8 = uStack_48fe0;
  uStack_3dbc0 = uStack_48f68;
  uStack_3d8d8 = uStack_48ef0;
  uStack_3d5f0 = uStack_48e78;
  uStack_3cd38 = uStack_48e00;
  uStack_3ca50 = uStack_48d88;
  uStack_3c768 = uStack_48d10;
  uStack_3beb0 = uStack_48c98;
  uStack_3bbc8 = uStack_48c20;
  uStack_3b310 = uStack_48ba8;
  uStack_3a488 = uStack_48b30;
  uStack_3a1a0 = uStack_48ab8;
  uStack_39eb8 = uStack_48a40;
  uStack_39bd0 = uStack_489c8;
  uStack_398e8 = uStack_48950;
  uStack_39030 = uStack_488d8;
  uStack_38d48 = uStack_48860;
  uStack_38a60 = uStack_487e8;
  uStack_38778 = uStack_48770;
  uStack_37ec0 = uStack_486f8;
  uStack_37bd8 = uStack_48680;
  uStack_361b0 = uStack_484a0;
  uStack_35040 = uStack_48428;
  uStack_34d58 = uStack_483b0;
  uStack_34a70 = uStack_48338;
  uStack_34788 = uStack_482c0;
  uStack_33ed0 = uStack_48248;
  uStack_33be8 = uStack_481d0;
  uStack_33900 = uStack_48158;
  uStack_33048 = uStack_480e0;
  uStack_32d60 = uStack_48068;
  uStack_324a8 = uStack_47ff0;
  uStack_31338 = uStack_47f78;
  uStack_31050 = uStack_47f00;
  uStack_30d68 = uStack_47e88;
  uStack_304b0 = uStack_47e10;
  uStack_301c8 = uStack_47d98;
  uStack_2f910 = uStack_47d20;
  uStack_2e7a0 = uStack_47ca8;
  uStack_2e4b8 = uStack_47c30;
  uStack_2dc00 = uStack_47bb8;
  uStack_2ca90 = uStack_47b40;
  uStack_46a20 = uStack_49e60;
  uStack_455d0 = uStack_49b20;
  uStack_455c8 = uStack_49b18;
  uStack_452e8 = uStack_49aa8;
  uStack_452e0 = uStack_49aa0;
  uStack_44ff8 = uStack_49a28;
  uStack_44740 = uStack_499b0;
  uStack_44458 = uStack_49938;
  uStack_44170 = uStack_498c0;
  uStack_43e88 = uStack_49848;
  uStack_435d0 = uStack_497d0;
  uStack_432e8 = uStack_49758;
  uStack_43000 = uStack_496e0;
  uStack_42748 = uStack_49668;
  uStack_42460 = uStack_495f0;
  uStack_41ba8 = uStack_49578;
  uStack_40a38 = uStack_49500;
  uStack_40750 = uStack_49488;
  uStack_40468 = uStack_49410;
  uStack_40180 = uStack_49398;
  uStack_3fe98 = uStack_49320;
  uStack_3fbb0 = uStack_492a8;
  uStack_3f2f8 = uStack_49230;
  uStack_3f010 = uStack_491b8;
  uStack_3ed28 = uStack_49140;
  uStack_3ea40 = uStack_490c8;
  uStack_3e758 = uStack_49050;
  uStack_3dea0 = uStack_48fd8;
  uStack_3dbb8 = uStack_48f60;
  uStack_3d8d0 = uStack_48ee8;
  uStack_3d5e8 = uStack_48e70;
  uStack_3cd30 = uStack_48df8;
  uStack_3ca48 = uStack_48d80;
  uStack_3c760 = uStack_48d08;
  uStack_3bea8 = uStack_48c90;
  uStack_3bbc0 = uStack_48c18;
  uStack_3b308 = uStack_48ba0;
  uStack_3a480 = uStack_48b28;
  uStack_3a198 = uStack_48ab0;
  uStack_39eb0 = uStack_48a38;
  uStack_39bc8 = uStack_489c0;
  uStack_398e0 = uStack_48948;
  uStack_39028 = uStack_488d0;
  uStack_38d40 = uStack_48858;
  uStack_38a58 = uStack_487e0;
  uStack_38770 = uStack_48768;
  uStack_37eb8 = uStack_486f0;
  uStack_37bd0 = uStack_48678;
  uStack_361a8 = uStack_48498;
  uStack_35038 = uStack_48420;
  uStack_34d50 = uStack_483a8;
  uStack_34a68 = uStack_48330;
  uStack_34780 = uStack_482b8;
  uStack_33ec8 = uStack_48240;
  uStack_33be0 = uStack_481c8;
  uStack_338f8 = uStack_48150;
  uStack_33040 = uStack_480d8;
  uStack_32d58 = uStack_48060;
  uStack_324a0 = uStack_47fe8;
  uStack_31330 = uStack_47f70;
  uStack_31048 = uStack_47ef8;
  uStack_30d60 = uStack_47e80;
  uStack_304a8 = uStack_47e08;
  uStack_301c0 = uStack_47d90;
  uStack_2f908 = uStack_47d18;
  uStack_2e798 = uStack_47ca0;
  uStack_2e4b0 = uStack_47c28;
  uStack_2dbf8 = uStack_47bb0;
  uStack_2ca88 = uStack_47b38;
  uStack_46730 = uStack_49de0;
  uStack_44ff0 = uStack_49a20;
  uStack_44738 = uStack_499a8;
  uStack_44450 = uStack_49930;
  uStack_44168 = uStack_498b8;
  uStack_43e80 = uStack_49840;
  uStack_435c8 = uStack_497c8;
  uStack_432e0 = uStack_49750;
  uStack_42ff8 = uStack_496d8;
  uStack_42740 = uStack_49660;
  uStack_42458 = uStack_495e8;
  uStack_41ba0 = uStack_49570;
  uStack_40a30 = uStack_494f8;
  uStack_40748 = uStack_49480;
  uStack_40460 = uStack_49408;
  uStack_40178 = uStack_49390;
  uStack_3fe90 = uStack_49318;
  uStack_3fba8 = uStack_492a0;
  uStack_3f2f0 = uStack_49228;
  uStack_3f008 = uStack_491b0;
  uStack_3ed20 = uStack_49138;
  uStack_3ea38 = uStack_490c0;
  uStack_3e750 = uStack_49048;
  uStack_3de98 = uStack_48fd0;
  uStack_3dbb0 = uStack_48f58;
  uStack_3d8c8 = uStack_48ee0;
  uStack_3d5e0 = uStack_48e68;
  uStack_3cd28 = uStack_48df0;
  uStack_3ca40 = uStack_48d78;
  uStack_3c758 = uStack_48d00;
  uStack_3bea0 = uStack_48c88;
  uStack_3bbb8 = uStack_48c10;
  uStack_3b300 = uStack_48b98;
  uStack_3a478 = uStack_48b20;
  uStack_3a190 = uStack_48aa8;
  uStack_39ea8 = uStack_48a30;
  uStack_39bc0 = uStack_489b8;
  uStack_398d8 = uStack_48940;
  uStack_39020 = uStack_488c8;
  uStack_38d38 = uStack_48850;
  uStack_38a50 = uStack_487d8;
  uStack_38768 = uStack_48760;
  uStack_37eb0 = uStack_486e8;
  uStack_37bc8 = uStack_48670;
  uStack_361a0 = uStack_48490;
  uStack_35030 = uStack_48418;
  uStack_34d48 = uStack_483a0;
  uStack_34a60 = uStack_48328;
  uStack_34778 = uStack_482b0;
  uStack_33ec0 = uStack_48238;
  uStack_33bd8 = uStack_481c0;
  uStack_338f0 = uStack_48148;
  uStack_33038 = uStack_480d0;
  uStack_32d50 = uStack_48058;
  uStack_32498 = uStack_47fe0;
  uStack_31328 = uStack_47f68;
  uStack_31040 = uStack_47ef0;
  uStack_30d58 = uStack_47e78;
  uStack_304a0 = uStack_47e00;
  uStack_301b8 = uStack_47d88;
  uStack_2f900 = uStack_47d10;
  uStack_2e790 = uStack_47c98;
  uStack_2e4a8 = uStack_47c20;
  uStack_2dbf0 = uStack_47ba8;
  uStack_2ca80 = uStack_47b30;
  uStack_46440 = uStack_49d60;
  uStack_455c0 = uStack_49b10;
  uStack_455b8 = uStack_49b08;
  uStack_452d8 = uStack_49a98;
  uStack_452d0 = uStack_49a90;
  uStack_44fe8 = uStack_49a18;
  uStack_44730 = uStack_499a0;
  uStack_44448 = uStack_49928;
  uStack_44160 = uStack_498b0;
  uStack_43e78 = uStack_49838;
  uStack_435c0 = uStack_497c0;
  uStack_432d8 = uStack_49748;
  uStack_42ff0 = uStack_496d0;
  uStack_42738 = uStack_49658;
  uStack_42450 = uStack_495e0;
  uStack_41b98 = uStack_49568;
  uStack_40a28 = uStack_494f0;
  uStack_40740 = uStack_49478;
  uStack_40458 = uStack_49400;
  uStack_40170 = uStack_49388;
  uStack_3fe88 = uStack_49310;
  uStack_3fba0 = uStack_49298;
  uStack_3f2e8 = uStack_49220;
  uStack_3f000 = uStack_491a8;
  uStack_3ed18 = uStack_49130;
  uStack_3ea30 = uStack_490b8;
  uStack_3e748 = uStack_49040;
  uStack_3de90 = uStack_48fc8;
  uStack_3dba8 = uStack_48f50;
  uStack_3d8c0 = uStack_48ed8;
  uStack_3d5d8 = uStack_48e60;
  uStack_3cd20 = uStack_48de8;
  uStack_3ca38 = uStack_48d70;
  uStack_3c750 = uStack_48cf8;
  uStack_3be98 = uStack_48c80;
  uStack_3bbb0 = uStack_48c08;
  uStack_3b2f8 = uStack_48b90;
  uStack_3a470 = uStack_48b18;
  uStack_3a188 = uStack_48aa0;
  uStack_39ea0 = uStack_48a28;
  uStack_39bb8 = uStack_489b0;
  uStack_398d0 = uStack_48938;
  uStack_39018 = uStack_488c0;
  uStack_38d30 = uStack_48848;
  uStack_38a48 = uStack_487d0;
  uStack_38760 = uStack_48758;
  uStack_37ea8 = uStack_486e0;
  uStack_37bc0 = uStack_48668;
  uStack_36198 = uStack_48488;
  uStack_35028 = uStack_48410;
  uStack_34d40 = uStack_48398;
  uStack_34a58 = uStack_48320;
  uStack_34770 = uStack_482a8;
  uStack_33eb8 = uStack_48230;
  uStack_33bd0 = uStack_481b8;
  uStack_338e8 = uStack_48140;
  uStack_33030 = uStack_480c8;
  uStack_32d48 = uStack_48050;
  uStack_32490 = uStack_47fd8;
  uStack_31320 = uStack_47f60;
  uStack_31038 = uStack_47ee8;
  uStack_30d50 = uStack_47e70;
  uStack_30498 = uStack_47df8;
  uStack_301b0 = uStack_47d80;
  uStack_2f8f8 = uStack_47d08;
  uStack_2e788 = uStack_47c90;
  uStack_2e4a0 = uStack_47c18;
  uStack_2dbe8 = uStack_47ba0;
  uStack_2ca78 = uStack_47b28;
  uStack_46150 = uStack_49ce0;
  uStack_44fe0 = uStack_49a10;
  uStack_44728 = uStack_49998;
  uStack_44440 = uStack_49920;
  uStack_44158 = uStack_498a8;
  uStack_43e70 = uStack_49830;
  uStack_435b8 = uStack_497b8;
  uStack_432d0 = uStack_49740;
  uStack_42fe8 = uStack_496c8;
  uStack_42730 = uStack_49650;
  uStack_42448 = uStack_495d8;
  uStack_41b90 = uStack_49560;
  uStack_40a20 = uStack_494e8;
  uStack_40738 = uStack_49470;
  uStack_40450 = uStack_493f8;
  uStack_40168 = uStack_49380;
  uStack_3fe80 = uStack_49308;
  uStack_3fb98 = uStack_49290;
  uStack_3f2e0 = uStack_49218;
  uStack_3eff8 = uStack_491a0;
  uStack_3ed10 = uStack_49128;
  uStack_3ea28 = uStack_490b0;
  uStack_3e740 = uStack_49038;
  uStack_3de88 = uStack_48fc0;
  uStack_3dba0 = uStack_48f48;
  uStack_3d8b8 = uStack_48ed0;
  uStack_3d5d0 = uStack_48e58;
  uStack_3cd18 = uStack_48de0;
  uStack_3ca30 = uStack_48d68;
  uStack_3c748 = uStack_48cf0;
  uStack_3be90 = uStack_48c78;
  uStack_3bba8 = uStack_48c00;
  uStack_3b2f0 = uStack_48b88;
  uStack_3a468 = uStack_48b10;
  uStack_3a180 = uStack_48a98;
  uStack_39e98 = uStack_48a20;
  uStack_39bb0 = uStack_489a8;
  uStack_398c8 = uStack_48930;
  uStack_39010 = uStack_488b8;
  uStack_38d28 = uStack_48840;
  uStack_38a40 = uStack_487c8;
  uStack_38758 = uStack_48750;
  uStack_37ea0 = uStack_486d8;
  uStack_37bb8 = uStack_48660;
  uStack_36190 = uStack_48480;
  uStack_35020 = uStack_48408;
  uStack_34d38 = uStack_48390;
  uStack_34a50 = uStack_48318;
  uStack_34768 = uStack_482a0;
  uStack_33eb0 = uStack_48228;
  uStack_33bc8 = uStack_481b0;
  uStack_338e0 = uStack_48138;
  uStack_33028 = uStack_480c0;
  uStack_32d40 = uStack_48048;
  uStack_32488 = uStack_47fd0;
  uStack_31318 = uStack_47f58;
  uStack_31030 = uStack_47ee0;
  uStack_30d48 = uStack_47e68;
  uStack_30490 = uStack_47df0;
  uStack_301a8 = uStack_47d78;
  uStack_2f8f0 = uStack_47d00;
  uStack_2e780 = uStack_47c88;
  uStack_2e498 = uStack_47c10;
  uStack_2dbe0 = uStack_47b98;
  uStack_2ca70 = uStack_47b20;
  uStack_45e60 = uStack_49c60;
  uStack_455b0 = uStack_49b00;
  uStack_455a8 = uStack_49af8;
  uStack_452c8 = uStack_49a88;
  uStack_452c0 = uStack_49a80;
  uStack_44fd8 = uStack_49a08;
  uStack_44720 = uStack_49990;
  uStack_44438 = uStack_49918;
  uStack_44150 = uStack_498a0;
  uStack_43e68 = uStack_49828;
  uStack_435b0 = uStack_497b0;
  uStack_432c8 = uStack_49738;
  uStack_42fe0 = uStack_496c0;
  uStack_42728 = uStack_49648;
  uStack_42440 = uStack_495d0;
  uStack_41b88 = uStack_49558;
  uStack_40a18 = uStack_494e0;
  uStack_40730 = uStack_49468;
  uStack_40448 = uStack_493f0;
  uStack_40160 = uStack_49378;
  uStack_3fe78 = uStack_49300;
  uStack_3fb90 = uStack_49288;
  uStack_3f2d8 = uStack_49210;
  uStack_3eff0 = uStack_49198;
  uStack_3ed08 = uStack_49120;
  uStack_3ea20 = uStack_490a8;
  uStack_3e738 = uStack_49030;
  uStack_3de80 = uStack_48fb8;
  uStack_3db98 = uStack_48f40;
  uStack_3d8b0 = uStack_48ec8;
  uStack_3d5c8 = uStack_48e50;
  uStack_3cd10 = uStack_48dd8;
  uStack_3ca28 = uStack_48d60;
  uStack_3c740 = uStack_48ce8;
  uStack_3be88 = uStack_48c70;
  uStack_3bba0 = uStack_48bf8;
  uStack_3b2e8 = uStack_48b80;
  uStack_3a460 = uStack_48b08;
  uStack_3a178 = uStack_48a90;
  uStack_39e90 = uStack_48a18;
  uStack_39ba8 = uStack_489a0;
  uStack_398c0 = uStack_48928;
  uStack_39008 = uStack_488b0;
  uStack_38d20 = uStack_48838;
  uStack_38a38 = uStack_487c0;
  uStack_38750 = uStack_48748;
  uStack_37e98 = uStack_486d0;
  uStack_37bb0 = uStack_48658;
  uStack_36188 = uStack_48478;
  uStack_35018 = uStack_48400;
  uStack_34d30 = uStack_48388;
  uStack_34a48 = uStack_48310;
  uStack_34760 = uStack_48298;
  uStack_33ea8 = uStack_48220;
  uStack_33bc0 = uStack_481a8;
  uStack_338d8 = uStack_48130;
  uStack_33020 = uStack_480b8;
  uStack_32d38 = uStack_48040;
  uStack_32480 = uStack_47fc8;
  uStack_31310 = uStack_47f50;
  uStack_31028 = uStack_47ed8;
  uStack_30d40 = uStack_47e60;
  uStack_30488 = uStack_47de8;
  uStack_301a0 = uStack_47d70;
  uStack_2f8e8 = uStack_47cf8;
  uStack_2e778 = uStack_47c80;
  uStack_2e490 = uStack_47c08;
  uStack_2dbd8 = uStack_47b90;
  uStack_2ca68 = uStack_47b18;
  uStack_45b70 = uStack_49be0;
  uStack_44fd0 = uStack_49a00;
  uStack_44718 = uStack_49988;
  uStack_44430 = uStack_49910;
  uStack_44148 = uStack_49898;
  uStack_43e60 = uStack_49820;
  uStack_435a8 = uStack_497a8;
  uStack_432c0 = uStack_49730;
  uStack_42fd8 = uStack_496b8;
  uStack_42720 = uStack_49640;
  uStack_42438 = uStack_495c8;
  uStack_41b80 = uStack_49550;
  uStack_40a10 = uStack_494d8;
  uStack_40728 = uStack_49460;
  uStack_40440 = uStack_493e8;
  uStack_40158 = uStack_49370;
  uStack_3fe70 = uStack_492f8;
  uStack_3fb88 = uStack_49280;
  uStack_3f2d0 = uStack_49208;
  uStack_3efe8 = uStack_49190;
  uStack_3ed00 = uStack_49118;
  uStack_3ea18 = uStack_490a0;
  uStack_3e730 = uStack_49028;
  uStack_3de78 = uStack_48fb0;
  uStack_3db90 = uStack_48f38;
  uStack_3d8a8 = uStack_48ec0;
  uStack_3d5c0 = uStack_48e48;
  uStack_3cd08 = uStack_48dd0;
  uStack_3ca20 = uStack_48d58;
  uStack_3c738 = uStack_48ce0;
  uStack_3be80 = uStack_48c68;
  uStack_3bb98 = uStack_48bf0;
  uStack_3b2e0 = uStack_48b78;
  uStack_3a458 = uStack_48b00;
  uStack_3a170 = uStack_48a88;
  uStack_39e88 = uStack_48a10;
  uStack_39ba0 = uStack_48998;
  uStack_398b8 = uStack_48920;
  uStack_39000 = uStack_488a8;
  uStack_38d18 = uStack_48830;
  uStack_38a30 = uStack_487b8;
  uStack_38748 = uStack_48740;
  uStack_37e90 = uStack_486c8;
  uStack_37ba8 = uStack_48650;
  uStack_36180 = uStack_48470;
  uStack_35010 = uStack_483f8;
  uStack_34d28 = uStack_48380;
  uStack_34a40 = uStack_48308;
  uStack_34758 = uStack_48290;
  uStack_33ea0 = uStack_48218;
  uStack_33bb8 = uStack_481a0;
  uStack_338d0 = uStack_48128;
  uStack_33018 = uStack_480b0;
  uStack_32d30 = uStack_48038;
  uStack_32478 = uStack_47fc0;
  uStack_31308 = uStack_47f48;
  uStack_31020 = uStack_47ed0;
  uStack_30d38 = uStack_47e58;
  uStack_30480 = uStack_47de0;
  uStack_30198 = uStack_47d68;
  uStack_2f8e0 = uStack_47cf0;
  uStack_2e770 = uStack_47c78;
  uStack_2e488 = uStack_47c00;
  uStack_2dbd0 = uStack_47b88;
  uStack_2ca60 = uStack_47b10;
  uStack_45880 = uStack_49b60;
  uStack_455a0 = uStack_49af0;
  uStack_45598 = uStack_49ae8;
  uStack_452b8 = uStack_49a78;
  uStack_452b0 = uStack_49a70;
  uStack_44fc8 = uStack_499f8;
  uStack_44710 = uStack_49980;
  uStack_44428 = uStack_49908;
  uStack_44140 = uStack_49890;
  uStack_43e58 = uStack_49818;
  uStack_435a0 = uStack_497a0;
  uStack_432b8 = uStack_49728;
  uStack_42fd0 = uStack_496b0;
  uStack_42718 = uStack_49638;
  uStack_42430 = uStack_495c0;
  uStack_41b78 = uStack_49548;
  uStack_40a08 = uStack_494d0;
  uStack_40720 = uStack_49458;
  uStack_40438 = uStack_493e0;
  uStack_40150 = uStack_49368;
  uStack_3fe68 = uStack_492f0;
  uStack_3fb80 = uStack_49278;
  uStack_3f2c8 = uStack_49200;
  uStack_3efe0 = uStack_49188;
  uStack_3ecf8 = uStack_49110;
  uStack_3ea10 = uStack_49098;
  uStack_3e728 = uStack_49020;
  uStack_3de70 = uStack_48fa8;
  uStack_3db88 = uStack_48f30;
  uStack_3d8a0 = uStack_48eb8;
  uStack_3d5b8 = uStack_48e40;
  uStack_3cd00 = uStack_48dc8;
  uStack_3ca18 = uStack_48d50;
  uStack_3c730 = uStack_48cd8;
  uStack_3be78 = uStack_48c60;
  uStack_3bb90 = uStack_48be8;
  uStack_3b2d8 = uStack_48b70;
  uStack_3a450 = uStack_48af8;
  uStack_3a168 = uStack_48a80;
  uStack_39e80 = uStack_48a08;
  uStack_39b98 = uStack_48990;
  uStack_398b0 = uStack_48918;
  uStack_38ff8 = uStack_488a0;
  uStack_38d10 = uStack_48828;
  uStack_38a28 = uStack_487b0;
  uStack_38740 = uStack_48738;
  uStack_37e88 = uStack_486c0;
  uStack_37ba0 = uStack_48648;
  uStack_36178 = uStack_48468;
  uStack_35008 = uStack_483f0;
  uStack_34d20 = uStack_48378;
  uStack_34a38 = uStack_48300;
  uStack_34750 = uStack_48288;
  uStack_33e98 = uStack_48210;
  uStack_33bb0 = uStack_48198;
  uStack_338c8 = uStack_48120;
  uStack_33010 = uStack_480a8;
  uStack_32d28 = uStack_48030;
  uStack_32470 = uStack_47fb8;
  uStack_31300 = uStack_47f40;
  uStack_31018 = uStack_47ec8;
  uStack_30d30 = uStack_47e50;
  uStack_30478 = uStack_47dd8;
  uStack_30190 = uStack_47d60;
  uStack_2f8d8 = uStack_47ce8;
  uStack_2e768 = uStack_47c70;
  uStack_2e480 = uStack_47bf8;
  uStack_2dbc8 = uStack_47b80;
  uStack_2ca58 = uStack_47b08;
  uStack_47870 = uStack_4a0e0;
  uStack_449f0 = uStack_499d8;
  uStack_44708 = uStack_49960;
  uStack_44420 = uStack_498e8;
  uStack_44138 = uStack_49870;
  uStack_43880 = uStack_497f8;
  uStack_43598 = uStack_49780;
  uStack_432b0 = uStack_49708;
  uStack_429f8 = uStack_49690;
  uStack_42710 = uStack_49618;
  uStack_41e58 = uStack_495a0;
  uStack_40ce8 = uStack_49528;
  uStack_40a00 = uStack_494b0;
  uStack_40718 = uStack_49438;
  uStack_40430 = uStack_493c0;
  uStack_40148 = uStack_49348;
  uStack_3fe60 = uStack_492d0;
  uStack_3f5a8 = uStack_49258;
  uStack_3f2c0 = uStack_491e0;
  uStack_3efd8 = uStack_49168;
  uStack_3ecf0 = uStack_490f0;
  uStack_3ea08 = uStack_49078;
  uStack_3e150 = uStack_49000;
  uStack_3de68 = uStack_48f88;
  uStack_3db80 = uStack_48f10;
  uStack_3d898 = uStack_48e98;
  uStack_3cfe0 = uStack_48e20;
  uStack_3ccf8 = uStack_48da8;
  uStack_3ca10 = uStack_48d30;
  uStack_3c158 = uStack_48cb8;
  uStack_3be70 = uStack_48c40;
  uStack_3b5b8 = uStack_48bc8;
  uStack_3a730 = uStack_48b50;
  uStack_3a448 = uStack_48ad8;
  uStack_3a160 = uStack_48a60;
  uStack_39e78 = uStack_489e8;
  uStack_39b90 = uStack_48970;
  uStack_392d8 = uStack_488f8;
  uStack_38ff0 = uStack_48880;
  uStack_38d08 = uStack_48808;
  uStack_38a20 = uStack_48790;
  uStack_38168 = uStack_48718;
  uStack_37e80 = uStack_486a0;
  uStack_37b98 = uStack_48628;
  uStack_36458 = uStack_484c0;
  uStack_352e8 = uStack_48448;
  uStack_35000 = uStack_483d0;
  uStack_34d18 = uStack_48358;
  uStack_34a30 = uStack_482e0;
  uStack_34178 = uStack_48268;
  uStack_33e90 = uStack_481f0;
  uStack_33ba8 = uStack_48178;
  uStack_332f0 = uStack_48100;
  uStack_33008 = uStack_48088;
  uStack_32750 = uStack_48010;
  uStack_315e0 = uStack_47f98;
  uStack_312f8 = uStack_47f20;
  uStack_31010 = uStack_47ea8;
  uStack_30758 = uStack_47e30;
  uStack_30470 = uStack_47db8;
  uStack_2fbb8 = uStack_47d40;
  uStack_2ea48 = uStack_47cc8;
  uStack_2e760 = uStack_47c50;
  uStack_2dea8 = uStack_47bd8;
  uStack_2cd38 = uStack_47b60;
  uStack_47580 = uStack_4a060;
  uStack_45878 = uStack_49b40;
  uStack_45870 = uStack_49b38;
  uStack_45590 = uStack_49ac8;
  uStack_45588 = uStack_49ac0;
  uStack_452a8 = uStack_49a50;
  uStack_452a0 = uStack_49a48;
  uStack_449e8 = uStack_499d0;
  uStack_44700 = uStack_49958;
  uStack_44418 = uStack_498e0;
  uStack_44130 = uStack_49868;
  uStack_43878 = uStack_497f0;
  uStack_43590 = uStack_49778;
  uStack_432a8 = uStack_49700;
  uStack_429f0 = uStack_49688;
  uStack_42708 = uStack_49610;
  uStack_41e50 = uStack_49598;
  uStack_40ce0 = uStack_49520;
  uStack_409f8 = uStack_494a8;
  uStack_40710 = uStack_49430;
  uStack_40428 = uStack_493b8;
  uStack_40140 = uStack_49340;
  uStack_3fe58 = uStack_492c8;
  uStack_3f5a0 = uStack_49250;
  uStack_3f2b8 = uStack_491d8;
  uStack_3efd0 = uStack_49160;
  uStack_3ece8 = uStack_490e8;
  uStack_3ea00 = uStack_49070;
  uStack_3e148 = uStack_48ff8;
  uStack_3de60 = uStack_48f80;
  uStack_3db78 = uStack_48f08;
  uStack_3d890 = uStack_48e90;
  uStack_3cfd8 = uStack_48e18;
  uStack_3ccf0 = uStack_48da0;
  uStack_3ca08 = uStack_48d28;
  uStack_3c150 = uStack_48cb0;
  uStack_3be68 = uStack_48c38;
  uStack_3b5b0 = uStack_48bc0;
  uStack_3a728 = uStack_48b48;
  uStack_3a440 = uStack_48ad0;
  uStack_3a158 = uStack_48a58;
  uStack_39e70 = uStack_489e0;
  uStack_39b88 = uStack_48968;
  uStack_392d0 = uStack_488f0;
  uStack_38fe8 = uStack_48878;
  uStack_38d00 = uStack_48800;
  uStack_38a18 = uStack_48788;
  uStack_38160 = uStack_48710;
  uStack_37e78 = uStack_48698;
  uStack_37b90 = uStack_48620;
  uStack_36450 = uStack_484b8;
  uStack_352e0 = uStack_48440;
  uStack_34ff8 = uStack_483c8;
  uStack_34d10 = uStack_48350;
  uStack_34a28 = uStack_482d8;
  uStack_34170 = uStack_48260;
  uStack_33e88 = uStack_481e8;
  uStack_33ba0 = uStack_48170;
  uStack_332e8 = uStack_480f8;
  uStack_33000 = uStack_48080;
  uStack_32748 = uStack_48008;
  uStack_315d8 = uStack_47f90;
  uStack_312f0 = uStack_47f18;
  uStack_31008 = uStack_47ea0;
  uStack_30750 = uStack_47e28;
  uStack_30468 = uStack_47db0;
  uStack_2fbb0 = uStack_47d38;
  uStack_2ea40 = uStack_47cc0;
  uStack_2e758 = uStack_47c48;
  uStack_2dea0 = uStack_47bd0;
  uStack_2cd30 = uStack_47b58;
  uStack_47290 = uStack_49fe0;
  uStack_449e0 = uStack_499c8;
  uStack_446f8 = uStack_49950;
  uStack_44410 = uStack_498d8;
  uStack_44128 = uStack_49860;
  uStack_43870 = uStack_497e8;
  uStack_43588 = uStack_49770;
  uStack_432a0 = uStack_496f8;
  uStack_429e8 = uStack_49680;
  uStack_42700 = uStack_49608;
  uStack_41e48 = uStack_49590;
  uStack_40cd8 = uStack_49518;
  uStack_409f0 = uStack_494a0;
  uStack_40708 = uStack_49428;
  uStack_40420 = uStack_493b0;
  uStack_40138 = uStack_49338;
  uStack_3fe50 = uStack_492c0;
  uStack_3f598 = uStack_49248;
  uStack_3f2b0 = uStack_491d0;
  uStack_3efc8 = uStack_49158;
  uStack_3ece0 = uStack_490e0;
  uStack_3e9f8 = uStack_49068;
  uStack_3e140 = uStack_48ff0;
  uStack_3de58 = uStack_48f78;
  uStack_3db70 = uStack_48f00;
  uStack_3d888 = uStack_48e88;
  uStack_3cfd0 = uStack_48e10;
  uStack_3cce8 = uStack_48d98;
  uStack_3ca00 = uStack_48d20;
  uStack_3c148 = uStack_48ca8;
  uStack_3be60 = uStack_48c30;
  uStack_3b5a8 = uStack_48bb8;
  uStack_3a720 = uStack_48b40;
  uStack_3a438 = uStack_48ac8;
  uStack_3a150 = uStack_48a50;
  uStack_39e68 = uStack_489d8;
  uStack_39b80 = uStack_48960;
  uStack_392c8 = uStack_488e8;
  uStack_38fe0 = uStack_48870;
  uStack_38cf8 = uStack_487f8;
  uStack_38a10 = uStack_48780;
  uStack_38158 = uStack_48708;
  uStack_37e70 = uStack_48690;
  uStack_37b88 = uStack_48618;
  uStack_36448 = uStack_484b0;
  uStack_352d8 = uStack_48438;
  uStack_34ff0 = uStack_483c0;
  uStack_34d08 = uStack_48348;
  uStack_34a20 = uStack_482d0;
  uStack_34168 = uStack_48258;
  uStack_33e80 = uStack_481e0;
  uStack_33b98 = uStack_48168;
  uStack_332e0 = uStack_480f0;
  uStack_32ff8 = uStack_48078;
  uStack_32740 = uStack_48000;
  uStack_315d0 = uStack_47f88;
  uStack_312e8 = uStack_47f10;
  uStack_31000 = uStack_47e98;
  uStack_30748 = uStack_47e20;
  uStack_30460 = uStack_47da8;
  uStack_2fba8 = uStack_47d30;
  uStack_2ea38 = uStack_47cb8;
  uStack_2e750 = uStack_47c40;
  uStack_2de98 = uStack_47bc8;
  uStack_2cd28 = uStack_47b50;
  uStack_46fa0 = uStack_49f60;
  uStack_45868 = uStack_49b30;
  uStack_45860 = uStack_49b28;
  uStack_45580 = uStack_49ab8;
  uStack_45578 = uStack_49ab0;
  uStack_45298 = uStack_49a40;
  uStack_45290 = uStack_49a38;
  uStack_449d8 = uStack_499c0;
  uStack_446f0 = uStack_49948;
  uStack_44408 = uStack_498d0;
  uStack_44120 = uStack_49858;
  uStack_43868 = uStack_497e0;
  uStack_43580 = uStack_49768;
  uStack_43298 = uStack_496f0;
  uStack_429e0 = uStack_49678;
  uStack_426f8 = uStack_49600;
  uStack_41e40 = uStack_49588;
  uStack_40cd0 = uStack_49510;
  uStack_409e8 = uStack_49498;
  uStack_40700 = uStack_49420;
  uStack_40418 = uStack_493a8;
  uStack_40130 = uStack_49330;
  uStack_3fe48 = uStack_492b8;
  uStack_3f590 = uStack_49240;
  uStack_3f2a8 = uStack_491c8;
  uStack_3efc0 = uStack_49150;
  uStack_3ecd8 = uStack_490d8;
  uStack_3e9f0 = uStack_49060;
  uStack_3e138 = uStack_48fe8;
  uStack_3de50 = uStack_48f70;
  uStack_3db68 = uStack_48ef8;
  uStack_3d880 = uStack_48e80;
  uStack_3cfc8 = uStack_48e08;
  uStack_3cce0 = uStack_48d90;
  uStack_3c9f8 = uStack_48d18;
  uStack_3c140 = uStack_48ca0;
  uStack_3be58 = uStack_48c28;
  uStack_3b5a0 = uStack_48bb0;
  uStack_3a718 = uStack_48b38;
  uStack_3a430 = uStack_48ac0;
  uStack_3a148 = uStack_48a48;
  uStack_39e60 = uStack_489d0;
  uStack_39b78 = uStack_48958;
  uStack_392c0 = uStack_488e0;
  uStack_38fd8 = uStack_48868;
  uStack_38cf0 = uStack_487f0;
  uStack_38a08 = uStack_48778;
  uStack_38150 = uStack_48700;
  uStack_37e68 = uStack_48688;
  uStack_37b80 = uStack_48610;
  uStack_36440 = uStack_484a8;
  uStack_352d0 = uStack_48430;
  uStack_34fe8 = uStack_483b8;
  uStack_34d00 = uStack_48340;
  uStack_34a18 = uStack_482c8;
  uStack_34160 = uStack_48250;
  uStack_33e78 = uStack_481d8;
  uStack_33b90 = uStack_48160;
  uStack_332d8 = uStack_480e8;
  uStack_32ff0 = uStack_48070;
  uStack_32738 = uStack_47ff8;
  uStack_315c8 = uStack_47f80;
  uStack_312e0 = uStack_47f08;
  uStack_30ff8 = uStack_47e90;
  uStack_30740 = uStack_47e18;
  uStack_30458 = uStack_47da0;
  uStack_2fba0 = uStack_47d28;
  uStack_2ea30 = uStack_47cb0;
  uStack_2e748 = uStack_47c38;
  uStack_2de90 = uStack_47bc0;
  uStack_2cd20 = uStack_47b48;
  uStack_46cb0 = uStack_49e60;
  uStack_449d0 = uStack_499b0;
  uStack_446e8 = uStack_49938;
  uStack_44400 = uStack_498c0;
  uStack_44118 = uStack_49848;
  uStack_43860 = uStack_497d0;
  uStack_43578 = uStack_49758;
  uStack_43290 = uStack_496e0;
  uStack_429d8 = uStack_49668;
  uStack_426f0 = uStack_495f0;
  uStack_41e38 = uStack_49578;
  uStack_40cc8 = uStack_49500;
  uStack_409e0 = uStack_49488;
  uStack_406f8 = uStack_49410;
  uStack_40410 = uStack_49398;
  uStack_40128 = uStack_49320;
  uStack_3fe40 = uStack_492a8;
  uStack_3f588 = uStack_49230;
  uStack_3f2a0 = uStack_491b8;
  uStack_3efb8 = uStack_49140;
  uStack_3ecd0 = uStack_490c8;
  uStack_3e9e8 = uStack_49050;
  uStack_3e130 = uStack_48fd8;
  uStack_3de48 = uStack_48f60;
  uStack_3db60 = uStack_48ee8;
  uStack_3d878 = uStack_48e70;
  uStack_3cfc0 = uStack_48df8;
  uStack_3ccd8 = uStack_48d80;
  uStack_3c9f0 = uStack_48d08;
  uStack_3c138 = uStack_48c90;
  uStack_3be50 = uStack_48c18;
  uStack_3b598 = uStack_48ba0;
  uStack_3a710 = uStack_48b28;
  uStack_3a428 = uStack_48ab0;
  uStack_3a140 = uStack_48a38;
  uStack_39e58 = uStack_489c0;
  uStack_39b70 = uStack_48948;
  uStack_392b8 = uStack_488d0;
  uStack_38fd0 = uStack_48858;
  uStack_38ce8 = uStack_487e0;
  uStack_38a00 = uStack_48768;
  uStack_38148 = uStack_486f0;
  uStack_37e60 = uStack_48678;
  uStack_37b78 = uStack_48600;
  uStack_36438 = uStack_48498;
  uStack_352c8 = uStack_48420;
  uStack_34fe0 = uStack_483a8;
  uStack_34cf8 = uStack_48330;
  uStack_34a10 = uStack_482b8;
  uStack_34158 = uStack_48240;
  uStack_33e70 = uStack_481c8;
  uStack_33b88 = uStack_48150;
  uStack_332d0 = uStack_480d8;
  uStack_32fe8 = uStack_48060;
  uStack_32730 = uStack_47fe8;
  uStack_315c0 = uStack_47f70;
  uStack_312d8 = uStack_47ef8;
  uStack_30ff0 = uStack_47e80;
  uStack_30738 = uStack_47e08;
  uStack_30450 = uStack_47d90;
  uStack_2fb98 = uStack_47d18;
  uStack_2ea28 = uStack_47ca0;
  uStack_2e740 = uStack_47c28;
  uStack_2de88 = uStack_47bb0;
  uStack_2cd18 = uStack_47b38;
  uStack_469c0 = uStack_49de0;
  uStack_45858 = uStack_49b18;
  uStack_45850 = uStack_49b10;
  uStack_45570 = uStack_49aa0;
  uStack_45568 = uStack_49a98;
  uStack_45288 = uStack_49a28;
  uStack_45280 = uStack_49a20;
  uStack_449c8 = uStack_499a8;
  uStack_446e0 = uStack_49930;
  uStack_443f8 = uStack_498b8;
  uStack_44110 = uStack_49840;
  uStack_43858 = uStack_497c8;
  uStack_43570 = uStack_49750;
  uStack_43288 = uStack_496d8;
  uStack_429d0 = uStack_49660;
  uStack_426e8 = uStack_495e8;
  uStack_41e30 = uStack_49570;
  uStack_40cc0 = uStack_494f8;
  uStack_409d8 = uStack_49480;
  uStack_406f0 = uStack_49408;
  uStack_40408 = uStack_49390;
  uStack_40120 = uStack_49318;
  uStack_3fe38 = uStack_492a0;
  uStack_3f580 = uStack_49228;
  uStack_3f298 = uStack_491b0;
  uStack_3efb0 = uStack_49138;
  uStack_3ecc8 = uStack_490c0;
  uStack_3e9e0 = uStack_49048;
  uStack_3e128 = uStack_48fd0;
  uStack_3de40 = uStack_48f58;
  uStack_3db58 = uStack_48ee0;
  uStack_3d870 = uStack_48e68;
  uStack_3cfb8 = uStack_48df0;
  uStack_3ccd0 = uStack_48d78;
  uStack_3c9e8 = uStack_48d00;
  uStack_3c130 = uStack_48c88;
  uStack_3be48 = uStack_48c10;
  uStack_3b590 = uStack_48b98;
  uStack_3a708 = uStack_48b20;
  uStack_3a420 = uStack_48aa8;
  uStack_3a138 = uStack_48a30;
  uStack_39e50 = uStack_489b8;
  uStack_39b68 = uStack_48940;
  uStack_392b0 = uStack_488c8;
  uStack_38fc8 = uStack_48850;
  uStack_38ce0 = uStack_487d8;
  uStack_389f8 = uStack_48760;
  uStack_38140 = uStack_486e8;
  uStack_37e58 = uStack_48670;
  uStack_37b70 = uStack_485f8;
  uStack_36430 = uStack_48490;
  uStack_352c0 = uStack_48418;
  uStack_34fd8 = uStack_483a0;
  uStack_34cf0 = uStack_48328;
  uStack_34a08 = uStack_482b0;
  uStack_34150 = uStack_48238;
  uStack_33e68 = uStack_481c0;
  uStack_33b80 = uStack_48148;
  uStack_332c8 = uStack_480d0;
  uStack_32fe0 = uStack_48058;
  uStack_32728 = uStack_47fe0;
  uStack_315b8 = uStack_47f68;
  uStack_312d0 = uStack_47ef0;
  uStack_30fe8 = uStack_47e78;
  uStack_30730 = uStack_47e00;
  uStack_30448 = uStack_47d88;
  uStack_2fb90 = uStack_47d10;
  uStack_2ea20 = uStack_47c98;
  uStack_2e738 = uStack_47c20;
  uStack_2de80 = uStack_47ba8;
  uStack_2cd10 = uStack_47b30;
  uStack_466d0 = uStack_49d60;
  uStack_449c0 = uStack_499a0;
  uStack_446d8 = uStack_49928;
  uStack_443f0 = uStack_498b0;
  uStack_44108 = uStack_49838;
  uStack_43850 = uStack_497c0;
  uStack_43568 = uStack_49748;
  uStack_43280 = uStack_496d0;
  uStack_429c8 = uStack_49658;
  uStack_426e0 = uStack_495e0;
  uStack_41e28 = uStack_49568;
  uStack_40cb8 = uStack_494f0;
  uStack_409d0 = uStack_49478;
  uStack_406e8 = uStack_49400;
  uStack_40400 = uStack_49388;
  uStack_40118 = uStack_49310;
  uStack_3fe30 = uStack_49298;
  uStack_3f578 = uStack_49220;
  uStack_3f290 = uStack_491a8;
  uStack_3efa8 = uStack_49130;
  uStack_3ecc0 = uStack_490b8;
  uStack_3e9d8 = uStack_49040;
  uStack_3e120 = uStack_48fc8;
  uStack_3de38 = uStack_48f50;
  uStack_3db50 = uStack_48ed8;
  uStack_3d868 = uStack_48e60;
  uStack_3cfb0 = uStack_48de8;
  uStack_3ccc8 = uStack_48d70;
  uStack_3c9e0 = uStack_48cf8;
  uStack_3c128 = uStack_48c80;
  uStack_3be40 = uStack_48c08;
  uStack_3b588 = uStack_48b90;
  uStack_3a700 = uStack_48b18;
  uStack_3a418 = uStack_48aa0;
  uStack_3a130 = uStack_48a28;
  uStack_39e48 = uStack_489b0;
  uStack_39b60 = uStack_48938;
  uStack_392a8 = uStack_488c0;
  uStack_38fc0 = uStack_48848;
  uStack_38cd8 = uStack_487d0;
  uStack_389f0 = uStack_48758;
  uStack_38138 = uStack_486e0;
  uStack_37e50 = uStack_48668;
  uStack_37b68 = uStack_485f0;
  uStack_36428 = uStack_48488;
  uStack_352b8 = uStack_48410;
  uStack_34fd0 = uStack_48398;
  uStack_34ce8 = uStack_48320;
  uStack_34a00 = uStack_482a8;
  uStack_34148 = uStack_48230;
  uStack_33e60 = uStack_481b8;
  uStack_33b78 = uStack_48140;
  uStack_332c0 = uStack_480c8;
  uStack_32fd8 = uStack_48050;
  uStack_32720 = uStack_47fd8;
  uStack_315b0 = uStack_47f60;
  uStack_312c8 = uStack_47ee8;
  uStack_30fe0 = uStack_47e70;
  uStack_30728 = uStack_47df8;
  uStack_30440 = uStack_47d80;
  uStack_2fb88 = uStack_47d08;
  uStack_2ea18 = uStack_47c90;
  uStack_2e730 = uStack_47c18;
  uStack_2de78 = uStack_47ba0;
  uStack_2cd08 = uStack_47b28;
  uStack_463e0 = uStack_49ce0;
  uStack_45848 = uStack_49b08;
  uStack_45840 = uStack_49b00;
  uStack_45560 = uStack_49a90;
  uStack_45558 = uStack_49a88;
  uStack_45278 = uStack_49a18;
  uStack_45270 = uStack_49a10;
  uStack_449b8 = uStack_49998;
  uStack_446d0 = uStack_49920;
  uStack_443e8 = uStack_498a8;
  uStack_44100 = uStack_49830;
  uStack_43848 = uStack_497b8;
  uStack_43560 = uStack_49740;
  uStack_43278 = uStack_496c8;
  uStack_429c0 = uStack_49650;
  uStack_426d8 = uStack_495d8;
  uStack_41e20 = uStack_49560;
  uStack_40cb0 = uStack_494e8;
  uStack_409c8 = uStack_49470;
  uStack_406e0 = uStack_493f8;
  uStack_403f8 = uStack_49380;
  uStack_40110 = uStack_49308;
  uStack_3fe28 = uStack_49290;
  uStack_3f570 = uStack_49218;
  uStack_3f288 = uStack_491a0;
  uStack_3efa0 = uStack_49128;
  uStack_3ecb8 = uStack_490b0;
  uStack_3e9d0 = uStack_49038;
  uStack_3e118 = uStack_48fc0;
  uStack_3de30 = uStack_48f48;
  uStack_3db48 = uStack_48ed0;
  uStack_3d860 = uStack_48e58;
  uStack_3cfa8 = uStack_48de0;
  uStack_3ccc0 = uStack_48d68;
  uStack_3c9d8 = uStack_48cf0;
  uStack_3c120 = uStack_48c78;
  uStack_3be38 = uStack_48c00;
  uStack_3b580 = uStack_48b88;
  uStack_3a6f8 = uStack_48b10;
  uStack_3a410 = uStack_48a98;
  uStack_3a128 = uStack_48a20;
  uStack_39e40 = uStack_489a8;
  uStack_39b58 = uStack_48930;
  uStack_392a0 = uStack_488b8;
  uStack_38fb8 = uStack_48840;
  uStack_38cd0 = uStack_487c8;
  uStack_389e8 = uStack_48750;
  uStack_38130 = uStack_486d8;
  uStack_37e48 = uStack_48660;
  uStack_37b60 = uStack_485e8;
  uStack_36420 = uStack_48480;
  uStack_352b0 = uStack_48408;
  uStack_34fc8 = uStack_48390;
  uStack_34ce0 = uStack_48318;
  uStack_349f8 = uStack_482a0;
  uStack_34140 = uStack_48228;
  uStack_33e58 = uStack_481b0;
  uStack_33b70 = uStack_48138;
  uStack_332b8 = uStack_480c0;
  uStack_32fd0 = uStack_48048;
  uStack_32718 = uStack_47fd0;
  uStack_315a8 = uStack_47f58;
  uStack_312c0 = uStack_47ee0;
  uStack_30fd8 = uStack_47e68;
  uStack_30720 = uStack_47df0;
  uStack_30438 = uStack_47d78;
  uStack_2fb80 = uStack_47d00;
  uStack_2ea10 = uStack_47c88;
  uStack_2e728 = uStack_47c10;
  uStack_2de70 = uStack_47b98;
  uStack_2cd00 = uStack_47b20;
  uStack_460f0 = uStack_49c60;
  uStack_45838 = uStack_49af8;
  uStack_45550 = uStack_49a80;
  uStack_45268 = uStack_49a08;
  uStack_449b0 = uStack_49990;
  uStack_446c8 = uStack_49918;
  uStack_443e0 = uStack_498a0;
  uStack_440f8 = uStack_49828;
  uStack_43840 = uStack_497b0;
  uStack_43558 = uStack_49738;
  uStack_43270 = uStack_496c0;
  uStack_429b8 = uStack_49648;
  uStack_426d0 = uStack_495d0;
  uStack_41e18 = uStack_49558;
  uStack_40ca8 = uStack_494e0;
  uStack_409c0 = uStack_49468;
  uStack_406d8 = uStack_493f0;
  uStack_403f0 = uStack_49378;
  uStack_40108 = uStack_49300;
  uStack_3fe20 = uStack_49288;
  uStack_3f568 = uStack_49210;
  uStack_3f280 = uStack_49198;
  uStack_3ef98 = uStack_49120;
  uStack_3ecb0 = uStack_490a8;
  uStack_3e9c8 = uStack_49030;
  uStack_3e110 = uStack_48fb8;
  uStack_3de28 = uStack_48f40;
  uStack_3db40 = uStack_48ec8;
  uStack_3d858 = uStack_48e50;
  uStack_3cfa0 = uStack_48dd8;
  uStack_3ccb8 = uStack_48d60;
  uStack_3c9d0 = uStack_48ce8;
  uStack_3c118 = uStack_48c70;
  uStack_3be30 = uStack_48bf8;
  uStack_3b578 = uStack_48b80;
  uStack_3a6f0 = uStack_48b08;
  uStack_3a408 = uStack_48a90;
  uStack_3a120 = uStack_48a18;
  uStack_39e38 = uStack_489a0;
  uStack_39b50 = uStack_48928;
  uStack_39298 = uStack_488b0;
  uStack_38fb0 = uStack_48838;
  uStack_38cc8 = uStack_487c0;
  uStack_389e0 = uStack_48748;
  uStack_38128 = uStack_486d0;
  uStack_37e40 = uStack_48658;
  uStack_37b58 = uStack_485e0;
  uStack_36418 = uStack_48478;
  uStack_352a8 = uStack_48400;
  uStack_34fc0 = uStack_48388;
  uStack_34cd8 = uStack_48310;
  uStack_349f0 = uStack_48298;
  uStack_34138 = uStack_48220;
  uStack_33e50 = uStack_481a8;
  uStack_33b68 = uStack_48130;
  uStack_332b0 = uStack_480b8;
  uStack_32fc8 = uStack_48040;
  uStack_32710 = uStack_47fc8;
  uStack_315a0 = uStack_47f50;
  uStack_312b8 = uStack_47ed8;
  uStack_30fd0 = uStack_47e60;
  uStack_30718 = uStack_47de8;
  uStack_30430 = uStack_47d70;
  uStack_2fb78 = uStack_47cf8;
  uStack_2ea08 = uStack_47c80;
  uStack_2e720 = uStack_47c08;
  uStack_2de68 = uStack_47b90;
  uStack_2ccf8 = uStack_47b18;
  uStack_45b18 = uStack_49b60;
  uStack_45830 = uStack_49ae8;
  uStack_45548 = uStack_49a70;
  uStack_45260 = uStack_499f8;
  uStack_449a8 = uStack_49980;
  uStack_446c0 = uStack_49908;
  uStack_443d8 = uStack_49890;
  uStack_440f0 = uStack_49818;
  uStack_43838 = uStack_497a0;
  uStack_43550 = uStack_49728;
  uStack_43268 = uStack_496b0;
  uStack_429b0 = uStack_49638;
  uStack_426c8 = uStack_495c0;
  uStack_41e10 = uStack_49548;
  uStack_40ca0 = uStack_494d0;
  uStack_409b8 = uStack_49458;
  uStack_406d0 = uStack_493e0;
  uStack_403e8 = uStack_49368;
  uStack_40100 = uStack_492f0;
  uStack_3fe18 = uStack_49278;
  uStack_3f560 = uStack_49200;
  uStack_3f278 = uStack_49188;
  uStack_3ef90 = uStack_49110;
  uStack_3eca8 = uStack_49098;
  uStack_3e9c0 = uStack_49020;
  uStack_3e108 = uStack_48fa8;
  uStack_3de20 = uStack_48f30;
  uStack_3db38 = uStack_48eb8;
  uStack_3d850 = uStack_48e40;
  uStack_3cf98 = uStack_48dc8;
  uStack_3ccb0 = uStack_48d50;
  uStack_3c9c8 = uStack_48cd8;
  uStack_3c110 = uStack_48c60;
  uStack_3be28 = uStack_48be8;
  uStack_3b570 = uStack_48b70;
  uStack_3a6e8 = uStack_48af8;
  uStack_3a400 = uStack_48a80;
  uStack_3a118 = uStack_48a08;
  uStack_39e30 = uStack_48990;
  uStack_39b48 = uStack_48918;
  uStack_39290 = uStack_488a0;
  uStack_38fa8 = uStack_48828;
  uStack_38cc0 = uStack_487b0;
  uStack_389d8 = uStack_48738;
  uStack_38120 = uStack_486c0;
  uStack_37e38 = uStack_48648;
  uStack_37b50 = uStack_485d0;
  uStack_36410 = uStack_48468;
  uStack_352a0 = uStack_483f0;
  uStack_34fb8 = uStack_48378;
  uStack_34cd0 = uStack_48300;
  uStack_349e8 = uStack_48288;
  uStack_34130 = uStack_48210;
  uStack_33e48 = uStack_48198;
  uStack_33b60 = uStack_48120;
  uStack_332a8 = uStack_480a8;
  uStack_32fc0 = uStack_48030;
  uStack_32708 = uStack_47fb8;
  uStack_31598 = uStack_47f40;
  uStack_312b0 = uStack_47ec8;
  uStack_30fc8 = uStack_47e50;
  uStack_30710 = uStack_47dd8;
  uStack_30428 = uStack_47d60;
  uStack_2fb70 = uStack_47ce8;
  uStack_2ea00 = uStack_47c70;
  uStack_2e718 = uStack_47bf8;
  uStack_2de60 = uStack_47b80;
  uStack_2ccf0 = uStack_47b08;
  uStack_3eca0 = uStack_4a0e0;
  uStack_3c9c0 = uStack_49b40;
  uStack_3c6d8 = uStack_49ac8;
  uStack_3c3f0 = uStack_49a50;
  uStack_3c108 = uStack_499d8;
  uStack_3be20 = uStack_49960;
  uStack_3bb38 = uStack_498e8;
  uStack_3b850 = uStack_49870;
  uStack_3b568 = uStack_497f8;
  uStack_3b280 = uStack_49780;
  uStack_3af98 = uStack_49708;
  uStack_3acb0 = uStack_49690;
  uStack_3a9c8 = uStack_49618;
  uStack_39288 = uStack_49528;
  uStack_38fa0 = uStack_494b0;
  uStack_38cb8 = uStack_49438;
  uStack_389d0 = uStack_493c0;
  uStack_386e8 = uStack_49348;
  uStack_38400 = uStack_492d0;
  uStack_38118 = uStack_49258;
  uStack_37e30 = uStack_491e0;
  uStack_37b48 = uStack_49168;
  uStack_369d8 = uStack_495a0;
  uStack_366f0 = uStack_48e98;
  uStack_36408 = uStack_48e20;
  uStack_36120 = uStack_48da8;
  uStack_35e38 = uStack_48d30;
  uStack_35b50 = uStack_48cb8;
  uStack_35868 = uStack_48c40;
  uStack_35580 = uStack_48bc8;
  uStack_34128 = uStack_48b50;
  uStack_33e40 = uStack_48ad8;
  uStack_33b58 = uStack_48a60;
  uStack_33870 = uStack_489e8;
  uStack_33588 = uStack_48970;
  uStack_332a0 = uStack_488f8;
  uStack_32fb8 = uStack_48880;
  uStack_32cd0 = uStack_48808;
  uStack_329e8 = uStack_48790;
  uStack_32700 = uStack_48718;
  uStack_32418 = uStack_486a0;
  uStack_32130 = uStack_48628;
  uStack_31e48 = uStack_485b0;
  uStack_31b60 = uStack_48538;
  uStack_31878 = uStack_484c0;
  uStack_30708 = uStack_48448;
  uStack_30420 = uStack_483d0;
  uStack_30138 = uStack_48358;
  uStack_2fe50 = uStack_482e0;
  uStack_2fb68 = uStack_48268;
  uStack_2f880 = uStack_481f0;
  uStack_2f598 = uStack_48178;
  uStack_2f2b0 = uStack_48100;
  uStack_2efc8 = uStack_48088;
  uStack_2ece0 = uStack_48010;
  uStack_2de58 = uStack_47f98;
  uStack_2db70 = uStack_47f20;
  uStack_2d888 = uStack_47ea8;
  uStack_2d5a0 = uStack_47e30;
  uStack_2d2b8 = uStack_47db8;
  uStack_2cfd0 = uStack_47d40;
  uStack_2c430 = uStack_47cc8;
  uStack_2c148 = uStack_47c50;
  uStack_2be60 = uStack_47bd8;
  uStack_2b5a8 = uStack_47b60;
  uStack_3e9b0 = uStack_4a060;
  uStack_3c9b8 = uStack_49b38;
  uStack_3c6d0 = uStack_49ac0;
  uStack_3c3e8 = uStack_49a48;
  uStack_3c100 = uStack_499d0;
  uStack_3be18 = uStack_49958;
  uStack_3bb30 = uStack_498e0;
  uStack_3b848 = uStack_49868;
  uStack_3b560 = uStack_497f0;
  uStack_3b278 = uStack_49778;
  uStack_3af90 = uStack_49700;
  uStack_3aca8 = uStack_49688;
  uStack_3a9c0 = uStack_49610;
  uStack_39280 = uStack_49520;
  uStack_38f98 = uStack_494a8;
  uStack_38cb0 = uStack_49430;
  uStack_389c8 = uStack_493b8;
  uStack_386e0 = uStack_49340;
  uStack_383f8 = uStack_492c8;
  uStack_38110 = uStack_49250;
  uStack_37e28 = uStack_491d8;
  uStack_37b40 = uStack_49160;
  uStack_369d0 = uStack_49598;
  uStack_366e8 = uStack_48e90;
  uStack_36400 = uStack_48e18;
  uStack_36118 = uStack_48da0;
  uStack_35e30 = uStack_48d28;
  uStack_35b48 = uStack_48cb0;
  uStack_35860 = uStack_48c38;
  uStack_35578 = uStack_48bc0;
  uStack_34120 = uStack_48b48;
  uStack_33e38 = uStack_48ad0;
  uStack_33b50 = uStack_48a58;
  uStack_33868 = uStack_489e0;
  uStack_33580 = uStack_48968;
  uStack_33298 = uStack_488f0;
  uStack_32fb0 = uStack_48878;
  uStack_32cc8 = uStack_48800;
  uStack_329e0 = uStack_48788;
  uStack_326f8 = uStack_48710;
  uStack_32410 = uStack_48698;
  uStack_32128 = uStack_48620;
  uStack_31e40 = uStack_485a8;
  uStack_31b58 = uStack_48530;
  uStack_31870 = uStack_484b8;
  uStack_30700 = uStack_48440;
  uStack_30418 = uStack_483c8;
  uStack_30130 = uStack_48350;
  uStack_2fe48 = uStack_482d8;
  uStack_2fb60 = uStack_48260;
  uStack_2f878 = uStack_481e8;
  uStack_2f590 = uStack_48170;
  uStack_2f2a8 = uStack_480f8;
  uStack_2efc0 = uStack_48080;
  uStack_2ecd8 = uStack_48008;
  uStack_2de50 = uStack_47f90;
  uStack_2db68 = uStack_47f18;
  uStack_2d880 = uStack_47ea0;
  uStack_2d598 = uStack_47e28;
  uStack_2d2b0 = uStack_47db0;
  uStack_2cfc8 = uStack_47d38;
  uStack_2c428 = uStack_47cc0;
  uStack_2c140 = uStack_47c48;
  uStack_2be58 = uStack_47bd0;
  uStack_2b5a0 = uStack_47b58;
  uStack_3e6c0 = uStack_49fe0;
  uStack_3c9b0 = uStack_49b30;
  uStack_3c6c8 = uStack_49ab8;
  uStack_3c3e0 = uStack_49a40;
  uStack_3c0f8 = uStack_499c8;
  uStack_3be10 = uStack_49950;
  uStack_3bb28 = uStack_498d8;
  uStack_3b840 = uStack_49860;
  uStack_3b558 = uStack_497e8;
  uStack_3b270 = uStack_49770;
  uStack_3af88 = uStack_496f8;
  uStack_3aca0 = uStack_49680;
  uStack_3a9b8 = uStack_49608;
  uStack_39278 = uStack_49518;
  uStack_38f90 = uStack_494a0;
  uStack_38ca8 = uStack_49428;
  uStack_389c0 = uStack_493b0;
  uStack_386d8 = uStack_49338;
  uStack_383f0 = uStack_492c0;
  uStack_38108 = uStack_49248;
  uStack_37e20 = uStack_491d0;
  uStack_37b38 = uStack_49158;
  uStack_369c8 = uStack_49590;
  uStack_366e0 = uStack_48e88;
  uStack_363f8 = uStack_48e10;
  uStack_36110 = uStack_48d98;
  uStack_35e28 = uStack_48d20;
  uStack_35b40 = uStack_48ca8;
  uStack_35858 = uStack_48c30;
  uStack_35570 = uStack_48bb8;
  uStack_34118 = uStack_48b40;
  uStack_33e30 = uStack_48ac8;
  uStack_33b48 = uStack_48a50;
  uStack_33860 = uStack_489d8;
  uStack_33578 = uStack_48960;
  uStack_33290 = uStack_488e8;
  uStack_32fa8 = uStack_48870;
  uStack_32cc0 = uStack_487f8;
  uStack_329d8 = uStack_48780;
  uStack_326f0 = uStack_48708;
  uStack_32408 = uStack_48690;
  uStack_32120 = uStack_48618;
  uStack_31e38 = uStack_485a0;
  uStack_31b50 = uStack_48528;
  uStack_31868 = uStack_484b0;
  uStack_306f8 = uStack_48438;
  uStack_30410 = uStack_483c0;
  uStack_30128 = uStack_48348;
  uStack_2fe40 = uStack_482d0;
  uStack_2fb58 = uStack_48258;
  uStack_2f870 = uStack_481e0;
  uStack_2f588 = uStack_48168;
  uStack_2f2a0 = uStack_480f0;
  uStack_2efb8 = uStack_48078;
  uStack_2ecd0 = uStack_48000;
  uStack_2de48 = uStack_47f88;
  uStack_2db60 = uStack_47f10;
  uStack_2d878 = uStack_47e98;
  uStack_2d590 = uStack_47e20;
  uStack_2d2a8 = uStack_47da8;
  uStack_2cfc0 = uStack_47d30;
  uStack_2c420 = uStack_47cb8;
  uStack_2c138 = uStack_47c40;
  uStack_2be50 = uStack_47bc8;
  uStack_2b598 = uStack_47b50;
  uStack_3e3d0 = uStack_49f60;
  uStack_3c9a8 = uStack_49b28;
  uStack_3c6c0 = uStack_49ab0;
  uStack_3c3d8 = uStack_49a38;
  uStack_3c0f0 = uStack_499c0;
  uStack_3be08 = uStack_49948;
  uStack_3bb20 = uStack_498d0;
  uStack_3b838 = uStack_49858;
  uStack_3b550 = uStack_497e0;
  uStack_3b268 = uStack_49768;
  uStack_3af80 = uStack_496f0;
  uStack_3ac98 = uStack_49678;
  uStack_3a9b0 = uStack_49600;
  uStack_39270 = uStack_49510;
  uStack_38f88 = uStack_49498;
  uStack_38ca0 = uStack_49420;
  uStack_389b8 = uStack_493a8;
  uStack_386d0 = uStack_49330;
  uStack_383e8 = uStack_492b8;
  uStack_38100 = uStack_49240;
  uStack_37e18 = uStack_491c8;
  uStack_37b30 = uStack_49150;
  uStack_369c0 = uStack_49588;
  uStack_366d8 = uStack_48e80;
  uStack_363f0 = uStack_48e08;
  uStack_36108 = uStack_48d90;
  uStack_35e20 = uStack_48d18;
  uStack_35b38 = uStack_48ca0;
  uStack_35850 = uStack_48c28;
  uStack_35568 = uStack_48bb0;
  uStack_34110 = uStack_48b38;
  uStack_33e28 = uStack_48ac0;
  uStack_33b40 = uStack_48a48;
  uStack_33858 = uStack_489d0;
  uStack_33570 = uStack_48958;
  uStack_33288 = uStack_488e0;
  uStack_32fa0 = uStack_48868;
  uStack_32cb8 = uStack_487f0;
  uStack_329d0 = uStack_48778;
  uStack_326e8 = uStack_48700;
  uStack_32400 = uStack_48688;
  uStack_32118 = uStack_48610;
  uStack_31e30 = uStack_48598;
  uStack_31b48 = uStack_48520;
  uStack_31860 = uStack_484a8;
  uStack_306f0 = uStack_48430;
  uStack_30408 = uStack_483b8;
  uStack_30120 = uStack_48340;
  uStack_2fe38 = uStack_482c8;
  uStack_2fb50 = uStack_48250;
  uStack_2f868 = uStack_481d8;
  uStack_2f580 = uStack_48160;
  uStack_2f298 = uStack_480e8;
  uStack_2efb0 = uStack_48070;
  uStack_2ecc8 = uStack_47ff8;
  uStack_2de40 = uStack_47f80;
  uStack_2db58 = uStack_47f08;
  uStack_2d870 = uStack_47e90;
  uStack_2d588 = uStack_47e18;
  uStack_2d2a0 = uStack_47da0;
  uStack_2cfb8 = uStack_47d28;
  uStack_2c418 = uStack_47cb0;
  uStack_2c130 = uStack_47c38;
  uStack_2be48 = uStack_47bc0;
  uStack_2b590 = uStack_47b48;
  uStack_3e0e0 = uStack_49ee0;
  uStack_3c9a0 = uStack_49b20;
  uStack_3c6b8 = uStack_49aa8;
  uStack_3c3d0 = uStack_49a30;
  uStack_3c0e8 = uStack_499b8;
  uStack_3be00 = uStack_49940;
  uStack_3bb18 = uStack_498c8;
  uStack_3b830 = uStack_49850;
  uStack_3b548 = uStack_497d8;
  uStack_3b260 = uStack_49760;
  uStack_3af78 = uStack_496e8;
  uStack_3ac90 = uStack_49670;
  uStack_3a9a8 = uStack_495f8;
  uStack_39268 = uStack_49508;
  uStack_38f80 = uStack_49490;
  uStack_38c98 = uStack_49418;
  uStack_389b0 = uStack_493a0;
  uStack_386c8 = uStack_49328;
  uStack_383e0 = uStack_492b0;
  uStack_380f8 = uStack_49238;
  uStack_37e10 = uStack_491c0;
  uStack_37b28 = uStack_49148;
  uStack_369b8 = uStack_49580;
  uStack_366d0 = uStack_48e78;
  uStack_363e8 = uStack_48e00;
  uStack_36100 = uStack_48d88;
  uStack_35e18 = uStack_48d10;
  uStack_35b30 = uStack_48c98;
  uStack_35848 = uStack_48c20;
  uStack_35560 = uStack_48ba8;
  uStack_34108 = uStack_48b30;
  uStack_33e20 = uStack_48ab8;
  uStack_33b38 = uStack_48a40;
  uStack_33850 = uStack_489c8;
  uStack_33568 = uStack_48950;
  uStack_33280 = uStack_488d8;
  uStack_32f98 = uStack_48860;
  uStack_32cb0 = uStack_487e8;
  uStack_329c8 = uStack_48770;
  uStack_326e0 = uStack_486f8;
  uStack_323f8 = uStack_48680;
  uStack_32110 = uStack_48608;
  uStack_31e28 = uStack_48590;
  uStack_31b40 = uStack_48518;
  uStack_31858 = uStack_484a0;
  uStack_306e8 = uStack_48428;
  uStack_30400 = uStack_483b0;
  uStack_30118 = uStack_48338;
  uStack_2fe30 = uStack_482c0;
  uStack_2fb48 = uStack_48248;
  uStack_2f860 = uStack_481d0;
  uStack_2f578 = uStack_48158;
  uStack_2f290 = uStack_480e0;
  uStack_2efa8 = uStack_48068;
  uStack_2ecc0 = uStack_47ff0;
  uStack_2de38 = uStack_47f78;
  uStack_2db50 = uStack_47f00;
  uStack_2d868 = uStack_47e88;
  uStack_2d580 = uStack_47e10;
  uStack_2d298 = uStack_47d98;
  uStack_2cfb0 = uStack_47d20;
  uStack_2c410 = uStack_47ca8;
  uStack_2c128 = uStack_47c30;
  uStack_2be40 = uStack_47bb8;
  uStack_2b588 = uStack_47b40;
  uStack_3ddf0 = uStack_49e60;
  uStack_3c998 = uStack_49b18;
  uStack_3c6b0 = uStack_49aa0;
  uStack_3c3c8 = uStack_49a28;
  uStack_3c0e0 = uStack_499b0;
  uStack_3bdf8 = uStack_49938;
  uStack_3bb10 = uStack_498c0;
  uStack_3b828 = uStack_49848;
  uStack_3b540 = uStack_497d0;
  uStack_3b258 = uStack_49758;
  uStack_3af70 = uStack_496e0;
  uStack_3ac88 = uStack_49668;
  uStack_3a9a0 = uStack_495f0;
  uStack_39260 = uStack_49500;
  uStack_38f78 = uStack_49488;
  uStack_38c90 = uStack_49410;
  uStack_389a8 = uStack_49398;
  uStack_386c0 = uStack_49320;
  uStack_383d8 = uStack_492a8;
  uStack_380f0 = uStack_49230;
  uStack_37e08 = uStack_491b8;
  uStack_37b20 = uStack_49140;
  uStack_369b0 = uStack_49578;
  uStack_366c8 = uStack_48e70;
  uStack_363e0 = uStack_48df8;
  uStack_360f8 = uStack_48d80;
  uStack_35e10 = uStack_48d08;
  uStack_35b28 = uStack_48c90;
  uStack_35840 = uStack_48c18;
  uStack_35558 = uStack_48ba0;
  uStack_34100 = uStack_48b28;
  uStack_33e18 = uStack_48ab0;
  uStack_33b30 = uStack_48a38;
  uStack_33848 = uStack_489c0;
  uStack_33560 = uStack_48948;
  uStack_33278 = uStack_488d0;
  uStack_32f90 = uStack_48858;
  uStack_32ca8 = uStack_487e0;
  uStack_329c0 = uStack_48768;
  uStack_326d8 = uStack_486f0;
  uStack_323f0 = uStack_48678;
  uStack_32108 = uStack_48600;
  uStack_31e20 = uStack_48588;
  uStack_31b38 = uStack_48510;
  uStack_31850 = uStack_48498;
  uStack_306e0 = uStack_48420;
  uStack_303f8 = uStack_483a8;
  uStack_30110 = uStack_48330;
  uStack_2fe28 = uStack_482b8;
  uStack_2fb40 = uStack_48240;
  uStack_2f858 = uStack_481c8;
  uStack_2f570 = uStack_48150;
  uStack_2f288 = uStack_480d8;
  uStack_2efa0 = uStack_48060;
  uStack_2ecb8 = uStack_47fe8;
  uStack_2de30 = uStack_47f70;
  uStack_2db48 = uStack_47ef8;
  uStack_2d860 = uStack_47e80;
  uStack_2d578 = uStack_47e08;
  uStack_2d290 = uStack_47d90;
  uStack_2cfa8 = uStack_47d18;
  uStack_2c408 = uStack_47ca0;
  uStack_2c120 = uStack_47c28;
  uStack_2be38 = uStack_47bb0;
  uStack_2b580 = uStack_47b38;
  uStack_3db00 = uStack_49de0;
  uStack_3c990 = uStack_49b10;
  uStack_3c6a8 = uStack_49a98;
  uStack_3c3c0 = uStack_49a20;
  uStack_3c0d8 = uStack_499a8;
  uStack_3bdf0 = uStack_49930;
  uStack_3bb08 = uStack_498b8;
  uStack_3b820 = uStack_49840;
  uStack_3b538 = uStack_497c8;
  uStack_3b250 = uStack_49750;
  uStack_3af68 = uStack_496d8;
  uStack_3ac80 = uStack_49660;
  uStack_3a998 = uStack_495e8;
  uStack_39258 = uStack_494f8;
  uStack_38f70 = uStack_49480;
  uStack_38c88 = uStack_49408;
  uStack_389a0 = uStack_49390;
  uStack_386b8 = uStack_49318;
  uStack_383d0 = uStack_492a0;
  uStack_380e8 = uStack_49228;
  uStack_37e00 = uStack_491b0;
  uStack_37b18 = uStack_49138;
  uStack_369a8 = uStack_49570;
  uStack_366c0 = uStack_48e68;
  uStack_363d8 = uStack_48df0;
  uStack_360f0 = uStack_48d78;
  uStack_35e08 = uStack_48d00;
  uStack_35b20 = uStack_48c88;
  uStack_35838 = uStack_48c10;
  uStack_35550 = uStack_48b98;
  uStack_340f8 = uStack_48b20;
  uStack_33e10 = uStack_48aa8;
  uStack_33b28 = uStack_48a30;
  uStack_33840 = uStack_489b8;
  uStack_33558 = uStack_48940;
  uStack_33270 = uStack_488c8;
  uStack_32f88 = uStack_48850;
  uStack_32ca0 = uStack_487d8;
  uStack_329b8 = uStack_48760;
  uStack_326d0 = uStack_486e8;
  uStack_323e8 = uStack_48670;
  uStack_32100 = uStack_485f8;
  uStack_31e18 = uStack_48580;
  uStack_31b30 = uStack_48508;
  uStack_31848 = uStack_48490;
  uStack_306d8 = uStack_48418;
  uStack_303f0 = uStack_483a0;
  uStack_30108 = uStack_48328;
  uStack_2fe20 = uStack_482b0;
  uStack_2fb38 = uStack_48238;
  uStack_2f850 = uStack_481c0;
  uStack_2f568 = uStack_48148;
  uStack_2f280 = uStack_480d0;
  uStack_2ef98 = uStack_48058;
  uStack_2ecb0 = uStack_47fe0;
  uStack_2de28 = uStack_47f68;
  uStack_2db40 = uStack_47ef0;
  uStack_2d858 = uStack_47e78;
  uStack_2d570 = uStack_47e00;
  uStack_2d288 = uStack_47d88;
  uStack_2cfa0 = uStack_47d10;
  uStack_2c400 = uStack_47c98;
  uStack_2c118 = uStack_47c20;
  uStack_2be30 = uStack_47ba8;
  uStack_2b578 = uStack_47b30;
  uStack_3d810 = uStack_49d60;
  uStack_3c988 = uStack_49b08;
  uStack_3c6a0 = uStack_49a90;
  uStack_3c3b8 = uStack_49a18;
  uStack_3c0d0 = uStack_499a0;
  uStack_3bde8 = uStack_49928;
  uStack_3bb00 = uStack_498b0;
  uStack_3b818 = uStack_49838;
  uStack_3b530 = uStack_497c0;
  uStack_3b248 = uStack_49748;
  uStack_3af60 = uStack_496d0;
  uStack_3ac78 = uStack_49658;
  uStack_3a990 = uStack_495e0;
  uStack_39250 = uStack_494f0;
  uStack_38f68 = uStack_49478;
  uStack_38c80 = uStack_49400;
  uStack_38998 = uStack_49388;
  uStack_386b0 = uStack_49310;
  uStack_383c8 = uStack_49298;
  uStack_380e0 = uStack_49220;
  uStack_37df8 = uStack_491a8;
  uStack_37b10 = uStack_49130;
  uStack_369a0 = uStack_49568;
  uStack_366b8 = uStack_48e60;
  uStack_363d0 = uStack_48de8;
  uStack_360e8 = uStack_48d70;
  uStack_35e00 = uStack_48cf8;
  uStack_35b18 = uStack_48c80;
  uStack_35830 = uStack_48c08;
  uStack_35548 = uStack_48b90;
  uStack_340f0 = uStack_48b18;
  uStack_33e08 = uStack_48aa0;
  uStack_33b20 = uStack_48a28;
  uStack_33838 = uStack_489b0;
  uStack_33550 = uStack_48938;
  uStack_33268 = uStack_488c0;
  uStack_32f80 = uStack_48848;
  uStack_32c98 = uStack_487d0;
  uStack_329b0 = uStack_48758;
  uStack_326c8 = uStack_486e0;
  uStack_323e0 = uStack_48668;
  uStack_320f8 = uStack_485f0;
  uStack_31e10 = uStack_48578;
  uStack_31b28 = uStack_48500;
  uStack_31840 = uStack_48488;
  uStack_306d0 = uStack_48410;
  uStack_303e8 = uStack_48398;
  uStack_30100 = uStack_48320;
  uStack_2fe18 = uStack_482a8;
  uStack_2fb30 = uStack_48230;
  uStack_2f848 = uStack_481b8;
  uStack_2f560 = uStack_48140;
  uStack_2f278 = uStack_480c8;
  uStack_2ef90 = uStack_48050;
  uStack_2eca8 = uStack_47fd8;
  uStack_2de20 = uStack_47f60;
  uStack_2db38 = uStack_47ee8;
  uStack_2d850 = uStack_47e70;
  uStack_2d568 = uStack_47df8;
  uStack_2d280 = uStack_47d80;
  uStack_2cf98 = uStack_47d08;
  uStack_2c3f8 = uStack_47c90;
  uStack_2c110 = uStack_47c18;
  uStack_2be28 = uStack_47ba0;
  uStack_2b570 = uStack_47b28;
  uStack_3d520 = uStack_49ce0;
  uStack_3c980 = uStack_49b00;
  uStack_3c698 = uStack_49a88;
  uStack_3c3b0 = uStack_49a10;
  uStack_3c0c8 = uStack_49998;
  uStack_3bde0 = uStack_49920;
  uStack_3baf8 = uStack_498a8;
  uStack_3b810 = uStack_49830;
  uStack_3b528 = uStack_497b8;
  uStack_3b240 = uStack_49740;
  uStack_3af58 = uStack_496c8;
  uStack_3ac70 = uStack_49650;
  uStack_3a988 = uStack_495d8;
  uStack_39248 = uStack_494e8;
  uStack_38f60 = uStack_49470;
  uStack_38c78 = uStack_493f8;
  uStack_38990 = uStack_49380;
  uStack_386a8 = uStack_49308;
  uStack_383c0 = uStack_49290;
  uStack_380d8 = uStack_49218;
  uStack_37df0 = uStack_491a0;
  uStack_37b08 = uStack_49128;
  uStack_36998 = uStack_49560;
  uStack_366b0 = uStack_48e58;
  uStack_363c8 = uStack_48de0;
  uStack_360e0 = uStack_48d68;
  uStack_35df8 = uStack_48cf0;
  uStack_35b10 = uStack_48c78;
  uStack_35828 = uStack_48c00;
  uStack_35540 = uStack_48b88;
  uStack_340e8 = uStack_48b10;
  uStack_33e00 = uStack_48a98;
  uStack_33b18 = uStack_48a20;
  uStack_33830 = uStack_489a8;
  uStack_33548 = uStack_48930;
  uStack_33260 = uStack_488b8;
  uStack_32f78 = uStack_48840;
  uStack_32c90 = uStack_487c8;
  uStack_329a8 = uStack_48750;
  uStack_326c0 = uStack_486d8;
  uStack_323d8 = uStack_48660;
  uStack_320f0 = uStack_485e8;
  uStack_31e08 = uStack_48570;
  uStack_31b20 = uStack_484f8;
  uStack_31838 = uStack_48480;
  uStack_306c8 = uStack_48408;
  uStack_303e0 = uStack_48390;
  uStack_300f8 = uStack_48318;
  uStack_2fe10 = uStack_482a0;
  uStack_2fb28 = uStack_48228;
  uStack_2f840 = uStack_481b0;
  uStack_2f558 = uStack_48138;
  uStack_2f270 = uStack_480c0;
  uStack_2ef88 = uStack_48048;
  uStack_2eca0 = uStack_47fd0;
  uStack_2de18 = uStack_47f58;
  uStack_2db30 = uStack_47ee0;
  uStack_2d848 = uStack_47e68;
  uStack_2d560 = uStack_47df0;
  uStack_2d278 = uStack_47d78;
  uStack_2cf90 = uStack_47d00;
  uStack_2c3f0 = uStack_47c88;
  uStack_2c108 = uStack_47c10;
  uStack_2be20 = uStack_47b98;
  uStack_2b568 = uStack_47b20;
  uStack_3d230 = uStack_49c60;
  uStack_3c978 = uStack_49af8;
  uStack_3c690 = uStack_49a80;
  uStack_3c3a8 = uStack_49a08;
  uStack_3c0c0 = uStack_49990;
  uStack_3bdd8 = uStack_49918;
  uStack_3baf0 = uStack_498a0;
  uStack_3b808 = uStack_49828;
  uStack_3b520 = uStack_497b0;
  uStack_3b238 = uStack_49738;
  uStack_3af50 = uStack_496c0;
  uStack_3ac68 = uStack_49648;
  uStack_3a980 = uStack_495d0;
  uStack_39240 = uStack_494e0;
  uStack_38f58 = uStack_49468;
  uStack_38c70 = uStack_493f0;
  uStack_38988 = uStack_49378;
  uStack_386a0 = uStack_49300;
  uStack_383b8 = uStack_49288;
  uStack_380d0 = uStack_49210;
  uStack_37de8 = uStack_49198;
  uStack_37b00 = uStack_49120;
  uStack_36990 = uStack_49558;
  uStack_366a8 = uStack_48e50;
  uStack_363c0 = uStack_48dd8;
  uStack_360d8 = uStack_48d60;
  uStack_35df0 = uStack_48ce8;
  uStack_35b08 = uStack_48c70;
  uStack_35820 = uStack_48bf8;
  uStack_35538 = uStack_48b80;
  uStack_340e0 = uStack_48b08;
  uStack_33df8 = uStack_48a90;
  uStack_33b10 = uStack_48a18;
  uStack_33828 = uStack_489a0;
  uStack_33540 = uStack_48928;
  uStack_33258 = uStack_488b0;
  uStack_32f70 = uStack_48838;
  uStack_32c88 = uStack_487c0;
  uStack_329a0 = uStack_48748;
  uStack_326b8 = uStack_486d0;
  uStack_323d0 = uStack_48658;
  uStack_320e8 = uStack_485e0;
  uStack_31e00 = uStack_48568;
  uStack_31b18 = uStack_484f0;
  uStack_31830 = uStack_48478;
  uStack_306c0 = uStack_48400;
  uStack_303d8 = uStack_48388;
  uStack_300f0 = uStack_48310;
  uStack_2fe08 = uStack_48298;
  uStack_2fb20 = uStack_48220;
  uStack_2f838 = uStack_481a8;
  uStack_2f550 = uStack_48130;
  uStack_2f268 = uStack_480b8;
  uStack_2ef80 = uStack_48040;
  uStack_2ec98 = uStack_47fc8;
  uStack_2de10 = uStack_47f50;
  uStack_2db28 = uStack_47ed8;
  uStack_2d840 = uStack_47e60;
  uStack_2d558 = uStack_47de8;
  uStack_2d270 = uStack_47d70;
  uStack_2cf88 = uStack_47cf8;
  uStack_2c3e8 = uStack_47c80;
  uStack_2c100 = uStack_47c08;
  uStack_2be18 = uStack_47b90;
  uStack_2b560 = uStack_47b18;
  uStack_3cf40 = uStack_49be0;
  uStack_3c970 = uStack_49af0;
  uStack_3c688 = uStack_49a78;
  uStack_3c3a0 = uStack_49a00;
  uStack_3c0b8 = uStack_49988;
  uStack_3bdd0 = uStack_49910;
  uStack_3bae8 = uStack_49898;
  uStack_3b800 = uStack_49820;
  uStack_3b518 = uStack_497a8;
  uStack_3b230 = uStack_49730;
  uStack_3af48 = uStack_496b8;
  uStack_3ac60 = uStack_49640;
  uStack_3a978 = uStack_495c8;
  uStack_39238 = uStack_494d8;
  uStack_38f50 = uStack_49460;
  uStack_38c68 = uStack_493e8;
  uStack_38980 = uStack_49370;
  uStack_38698 = uStack_492f8;
  uStack_383b0 = uStack_49280;
  uStack_380c8 = uStack_49208;
  uStack_37de0 = uStack_49190;
  uStack_37af8 = uStack_49118;
  uStack_36988 = uStack_49550;
  uStack_366a0 = uStack_48e48;
  uStack_363b8 = uStack_48dd0;
  uStack_360d0 = uStack_48d58;
  uStack_35de8 = uStack_48ce0;
  uStack_35b00 = uStack_48c68;
  uStack_35818 = uStack_48bf0;
  uStack_35530 = uStack_48b78;
  uStack_340d8 = uStack_48b00;
  uStack_33df0 = uStack_48a88;
  uStack_33b08 = uStack_48a10;
  uStack_33820 = uStack_48998;
  uStack_33538 = uStack_48920;
  uStack_33250 = uStack_488a8;
  uStack_32f68 = uStack_48830;
  uStack_32c80 = uStack_487b8;
  uStack_32998 = uStack_48740;
  uStack_326b0 = uStack_486c8;
  uStack_323c8 = uStack_48650;
  uStack_320e0 = uStack_485d8;
  uStack_31df8 = uStack_48560;
  uStack_31b10 = uStack_484e8;
  uStack_31828 = uStack_48470;
  uStack_306b8 = uStack_483f8;
  uStack_303d0 = uStack_48380;
  uStack_300e8 = uStack_48308;
  uStack_2fe00 = uStack_48290;
  uStack_2fb18 = uStack_48218;
  uStack_2f830 = uStack_481a0;
  uStack_2f548 = uStack_48128;
  uStack_2f260 = uStack_480b0;
  uStack_2ef78 = uStack_48038;
  uStack_2ec90 = uStack_47fc0;
  uStack_2de08 = uStack_47f48;
  uStack_2db20 = uStack_47ed0;
  uStack_2d838 = uStack_47e58;
  uStack_2d550 = uStack_47de0;
  uStack_2d268 = uStack_47d68;
  uStack_2cf80 = uStack_47cf0;
  uStack_2c3e0 = uStack_47c78;
  uStack_2c0f8 = uStack_47c00;
  uStack_2be10 = uStack_47b88;
  uStack_2b558 = uStack_47b10;
  uStack_3cc50 = uStack_49b60;
  uStack_3c968 = uStack_49ae8;
  uStack_3c680 = uStack_49a70;
  uStack_3c398 = uStack_499f8;
  uStack_3c0b0 = uStack_49980;
  uStack_3bdc8 = uStack_49908;
  uStack_3bae0 = uStack_49890;
  uStack_3b7f8 = uStack_49818;
  uStack_3b510 = uStack_497a0;
  uStack_3b228 = uStack_49728;
  uStack_3af40 = uStack_496b0;
  uStack_3ac58 = uStack_49638;
  uStack_3a970 = uStack_495c0;
  uStack_39230 = uStack_494d0;
  uStack_38f48 = uStack_49458;
  uStack_38c60 = uStack_493e0;
  uStack_38978 = uStack_49368;
  uStack_38690 = uStack_492f0;
  uStack_383a8 = uStack_49278;
  uStack_380c0 = uStack_49200;
  uStack_37dd8 = uStack_49188;
  uStack_37af0 = uStack_49110;
  uStack_36980 = uStack_49548;
  uStack_36698 = uStack_48e40;
  uStack_363b0 = uStack_48dc8;
  uStack_360c8 = uStack_48d50;
  uStack_35de0 = uStack_48cd8;
  uStack_35af8 = uStack_48c60;
  uStack_35810 = uStack_48be8;
  uStack_35528 = uStack_48b70;
  uStack_340d0 = uStack_48af8;
  uStack_33de8 = uStack_48a80;
  uStack_33b00 = uStack_48a08;
  uStack_33818 = uStack_48990;
  uStack_33530 = uStack_48918;
  uStack_33248 = uStack_488a0;
  uStack_32f60 = uStack_48828;
  uStack_32c78 = uStack_487b0;
  uStack_32990 = uStack_48738;
  uStack_326a8 = uStack_486c0;
  uStack_323c0 = uStack_48648;
  uStack_320d8 = uStack_485d0;
  uStack_31df0 = uStack_48558;
  uStack_31b08 = uStack_484e0;
  uStack_31820 = uStack_48468;
  uStack_306b0 = uStack_483f0;
  uStack_303c8 = uStack_48378;
  uStack_300e0 = uStack_48300;
  uStack_2fdf8 = uStack_48288;
  uStack_2fb10 = uStack_48210;
  uStack_2f828 = uStack_48198;
  uStack_2f540 = uStack_48120;
  uStack_2f258 = uStack_480a8;
  uStack_2ef70 = uStack_48030;
  uStack_2ec88 = uStack_47fb8;
  uStack_2de00 = uStack_47f40;
  uStack_2db18 = uStack_47ec8;
  uStack_2d830 = uStack_47e50;
  uStack_2d548 = uStack_47dd8;
  uStack_2d260 = uStack_47d60;
  uStack_2cf78 = uStack_47ce8;
  uStack_2c3d8 = uStack_47c70;
  uStack_2c0f0 = uStack_47bf8;
  uStack_2be08 = uStack_47b80;
  uStack_2b550 = uStack_47b08;
  uStack_40668 = uStack_4a1e0;
  uStack_3d7e8 = uStack_49b50;
  uStack_3d500 = uStack_49ad8;
  uStack_3d218 = uStack_49a60;
  uStack_3cc48 = uStack_499e8;
  uStack_3c960 = uStack_49970;
  uStack_3c678 = uStack_498f8;
  uStack_3c390 = uStack_49880;
  uStack_3bdc0 = uStack_49808;
  uStack_3bad8 = uStack_49790;
  uStack_3b7f0 = uStack_49718;
  uStack_3b220 = uStack_496a0;
  uStack_3af38 = uStack_49628;
  uStack_3a968 = uStack_495b0;
  uStack_3a398 = uStack_49538;
  uStack_3a0b0 = uStack_494c0;
  uStack_39dc8 = uStack_49448;
  uStack_39ae0 = uStack_493d0;
  uStack_397f8 = uStack_49358;
  uStack_39510 = uStack_492e0;
  uStack_38f40 = uStack_49268;
  uStack_38c58 = uStack_491f0;
  uStack_38970 = uStack_49178;
  uStack_38688 = uStack_49100;
  uStack_383a0 = uStack_49088;
  uStack_37dd0 = uStack_49010;
  uStack_37ae8 = uStack_48f98;
  uStack_36690 = uStack_48d40;
  uStack_360c0 = uStack_48cc8;
  uStack_35dd8 = uStack_48c50;
  uStack_35808 = uStack_48bd8;
  uStack_34f50 = uStack_48b60;
  uStack_34c68 = uStack_48ae8;
  uStack_34980 = uStack_48a70;
  uStack_34698 = uStack_489f8;
  uStack_343b0 = uStack_48980;
  uStack_33de0 = uStack_48908;
  uStack_33af8 = uStack_48890;
  uStack_33810 = uStack_48818;
  uStack_33528 = uStack_487a0;
  uStack_32f58 = uStack_48728;
  uStack_32c70 = uStack_486b0;
  uStack_32988 = uStack_48638;
  uStack_323b8 = uStack_485c0;
  uStack_320d0 = uStack_48548;
  uStack_31b00 = uStack_484d0;
  uStack_31248 = uStack_48458;
  uStack_30f60 = uStack_483e0;
  uStack_30c78 = uStack_48368;
  uStack_30990 = uStack_482f0;
  uStack_303c0 = uStack_48278;
  uStack_300d8 = uStack_48200;
  uStack_2fdf0 = uStack_48188;
  uStack_2f820 = uStack_48110;
  uStack_2f538 = uStack_48098;
  uStack_2ef68 = uStack_48020;
  uStack_2e6b0 = uStack_47fa8;
  uStack_2e3c8 = uStack_47f30;
  uStack_2e0e0 = uStack_47eb8;
  uStack_2db10 = uStack_47e40;
  uStack_2d828 = uStack_47dc8;
  uStack_2d258 = uStack_47d50;
  uStack_2c9a0 = uStack_47cd8;
  uStack_2c6b8 = uStack_47c60;
  uStack_2c0e8 = uStack_47be8;
  uStack_2b830 = uStack_47b70;
  uStack_40378 = uStack_4a160;
  uStack_3d7e0 = uStack_49b48;
  uStack_3d4f8 = uStack_49ad0;
  uStack_3d210 = uStack_49a58;
  uStack_3cc40 = uStack_499e0;
  uStack_3c958 = uStack_49968;
  uStack_3c670 = uStack_498f0;
  uStack_3c388 = uStack_49878;
  uStack_3bdb8 = uStack_49800;
  uStack_3bad0 = uStack_49788;
  uStack_3b7e8 = uStack_49710;
  uStack_3b218 = uStack_49698;
  uStack_3af30 = uStack_49620;
  uStack_3a960 = uStack_495a8;
  uStack_3a390 = uStack_49530;
  uStack_3a0a8 = uStack_494b8;
  uStack_39dc0 = uStack_49440;
  uStack_39ad8 = uStack_493c8;
  uStack_397f0 = uStack_49350;
  uStack_39508 = uStack_492d8;
  uStack_38f38 = uStack_49260;
  uStack_38c50 = uStack_491e8;
  uStack_38968 = uStack_49170;
  uStack_38680 = uStack_490f8;
  uStack_38398 = uStack_49080;
  uStack_37dc8 = uStack_49008;
  uStack_37ae0 = uStack_48f90;
  uStack_36688 = uStack_48d38;
  uStack_360b8 = uStack_48cc0;
  uStack_35dd0 = uStack_48c48;
  uStack_35800 = uStack_48bd0;
  uStack_34f48 = uStack_48b58;
  uStack_34c60 = uStack_48ae0;
  uStack_34978 = uStack_48a68;
  uStack_34690 = uStack_489f0;
  uStack_343a8 = uStack_48978;
  uStack_33dd8 = uStack_48900;
  uStack_33af0 = uStack_48888;
  uStack_33808 = uStack_48810;
  uStack_33520 = uStack_48798;
  uStack_32f50 = uStack_48720;
  uStack_32c68 = uStack_486a8;
  uStack_32980 = uStack_48630;
  uStack_323b0 = uStack_485b8;
  uStack_320c8 = uStack_48540;
  uStack_31af8 = uStack_484c8;
  uStack_31240 = uStack_48450;
  uStack_30f58 = uStack_483d8;
  uStack_30c70 = uStack_48360;
  uStack_30988 = uStack_482e8;
  uStack_303b8 = uStack_48270;
  uStack_300d0 = uStack_481f8;
  uStack_2fde8 = uStack_48180;
  uStack_2f818 = uStack_48108;
  uStack_2f530 = uStack_48090;
  uStack_2ef60 = uStack_48018;
  uStack_2e6a8 = uStack_47fa0;
  uStack_2e3c0 = uStack_47f28;
  uStack_2e0d8 = uStack_47eb0;
  uStack_2db08 = uStack_47e38;
  uStack_2d820 = uStack_47dc0;
  uStack_2d250 = uStack_47d48;
  uStack_2c998 = uStack_47cd0;
  uStack_2c6b0 = uStack_47c58;
  uStack_2c0e0 = uStack_47be0;
  uStack_2b828 = uStack_47b68;
  uStack_40088 = uStack_4a0e0;
  uStack_3d7d8 = uStack_49b40;
  uStack_3d4f0 = uStack_49ac8;
  uStack_3d208 = uStack_49a50;
  uStack_3cc38 = uStack_499d8;
  uStack_3c950 = uStack_49960;
  uStack_3c668 = uStack_498e8;
  uStack_3c380 = uStack_49870;
  uStack_3bdb0 = uStack_497f8;
  uStack_3bac8 = uStack_49780;
  uStack_3b7e0 = uStack_49708;
  uStack_3b210 = uStack_49690;
  uStack_3af28 = uStack_49618;
  uStack_3a958 = uStack_495a0;
  uStack_3a388 = uStack_49528;
  uStack_3a0a0 = uStack_494b0;
  uStack_39db8 = uStack_49438;
  uStack_39ad0 = uStack_493c0;
  uStack_397e8 = uStack_49348;
  uStack_39500 = uStack_492d0;
  uStack_38f30 = uStack_49258;
  uStack_38c48 = uStack_491e0;
  uStack_38960 = uStack_49168;
  uStack_38678 = uStack_490f0;
  uStack_38390 = uStack_49078;
  uStack_37dc0 = uStack_49000;
  uStack_37ad8 = uStack_48f88;
  uStack_36680 = uStack_48d30;
  uStack_360b0 = uStack_48cb8;
  uStack_35dc8 = uStack_48c40;
  uStack_357f8 = uStack_48bc8;
  uStack_34f40 = uStack_48b50;
  uStack_34c58 = uStack_48ad8;
  uStack_34970 = uStack_48a60;
  uStack_34688 = uStack_489e8;
  uStack_343a0 = uStack_48970;
  uStack_33dd0 = uStack_488f8;
  uStack_33ae8 = uStack_48880;
  uStack_33800 = uStack_48808;
  uStack_33518 = uStack_48790;
  uStack_32f48 = uStack_48718;
  uStack_32c60 = uStack_486a0;
  uStack_32978 = uStack_48628;
  uStack_323a8 = uStack_485b0;
  uStack_320c0 = uStack_48538;
  uStack_31af0 = uStack_484c0;
  uStack_31238 = uStack_48448;
  uStack_30f50 = uStack_483d0;
  uStack_30c68 = uStack_48358;
  uStack_30980 = uStack_482e0;
  uStack_303b0 = uStack_48268;
  uStack_300c8 = uStack_481f0;
  uStack_2fde0 = uStack_48178;
  uStack_2f810 = uStack_48100;
  uStack_2f528 = uStack_48088;
  uStack_2ef58 = uStack_48010;
  uStack_2e6a0 = uStack_47f98;
  uStack_2e3b8 = uStack_47f20;
  uStack_2e0d0 = uStack_47ea8;
  uStack_2db00 = uStack_47e30;
  uStack_2d818 = uStack_47db8;
  uStack_2d248 = uStack_47d40;
  uStack_2c990 = uStack_47cc8;
  uStack_2c6a8 = uStack_47c50;
  uStack_2c0d8 = uStack_47bd8;
  uStack_2b820 = uStack_47b60;
  uStack_3fd98 = uStack_4a060;
  uStack_3d7d0 = uStack_49b38;
  uStack_3d4e8 = uStack_49ac0;
  uStack_3d200 = uStack_49a48;
  uStack_3cc30 = uStack_499d0;
  uStack_3c948 = uStack_49958;
  uStack_3c660 = uStack_498e0;
  uStack_3c378 = uStack_49868;
  uStack_3bda8 = uStack_497f0;
  uStack_3bac0 = uStack_49778;
  uStack_3b7d8 = uStack_49700;
  uStack_3b208 = uStack_49688;
  uStack_3af20 = uStack_49610;
  uStack_3a950 = uStack_49598;
  uStack_3a380 = uStack_49520;
  uStack_3a098 = uStack_494a8;
  uStack_39db0 = uStack_49430;
  uStack_39ac8 = uStack_493b8;
  uStack_397e0 = uStack_49340;
  uStack_394f8 = uStack_492c8;
  uStack_38f28 = uStack_49250;
  uStack_38c40 = uStack_491d8;
  uStack_38958 = uStack_49160;
  uStack_38670 = uStack_490e8;
  uStack_38388 = uStack_49070;
  uStack_37db8 = uStack_48ff8;
  uStack_37ad0 = uStack_48f80;
  uStack_36678 = uStack_48d28;
  uStack_360a8 = uStack_48cb0;
  uStack_35dc0 = uStack_48c38;
  uStack_357f0 = uStack_48bc0;
  uStack_34f38 = uStack_48b48;
  uStack_34c50 = uStack_48ad0;
  uStack_34968 = uStack_48a58;
  uStack_34680 = uStack_489e0;
  uStack_34398 = uStack_48968;
  uStack_33dc8 = uStack_488f0;
  uStack_33ae0 = uStack_48878;
  uStack_337f8 = uStack_48800;
  uStack_33510 = uStack_48788;
  uStack_32f40 = uStack_48710;
  uStack_32c58 = uStack_48698;
  uStack_32970 = uStack_48620;
  uStack_323a0 = uStack_485a8;
  uStack_320b8 = uStack_48530;
  uStack_31ae8 = uStack_484b8;
  uStack_31230 = uStack_48440;
  uStack_30f48 = uStack_483c8;
  uStack_30c60 = uStack_48350;
  uStack_30978 = uStack_482d8;
  uStack_303a8 = uStack_48260;
  uStack_300c0 = uStack_481e8;
  uStack_2fdd8 = uStack_48170;
  uStack_2f808 = uStack_480f8;
  uStack_2f520 = uStack_48080;
  uStack_2ef50 = uStack_48008;
  uStack_2e698 = uStack_47f90;
  uStack_2e3b0 = uStack_47f18;
  uStack_2e0c8 = uStack_47ea0;
  uStack_2daf8 = uStack_47e28;
  uStack_2d810 = uStack_47db0;
  uStack_2d240 = uStack_47d38;
  uStack_2c988 = uStack_47cc0;
  uStack_2c6a0 = uStack_47c48;
  uStack_2c0d0 = uStack_47bd0;
  uStack_2b818 = uStack_47b58;
  uStack_3faa8 = uStack_49fe0;
  uStack_3d7c8 = uStack_49b30;
  uStack_3d4e0 = uStack_49ab8;
  uStack_3d1f8 = uStack_49a40;
  uStack_3cc28 = uStack_499c8;
  uStack_3c940 = uStack_49950;
  uStack_3c658 = uStack_498d8;
  uStack_3c370 = uStack_49860;
  uStack_3bda0 = uStack_497e8;
  uStack_3bab8 = uStack_49770;
  uStack_3b7d0 = uStack_496f8;
  uStack_3b200 = uStack_49680;
  uStack_3af18 = uStack_49608;
  uStack_3a948 = uStack_49590;
  uStack_3a378 = uStack_49518;
  uStack_3a090 = uStack_494a0;
  uStack_39da8 = uStack_49428;
  uStack_39ac0 = uStack_493b0;
  uStack_397d8 = uStack_49338;
  uStack_394f0 = uStack_492c0;
  uStack_38f20 = uStack_49248;
  uStack_38c38 = uStack_491d0;
  uStack_38950 = uStack_49158;
  uStack_38668 = uStack_490e0;
  uStack_38380 = uStack_49068;
  uStack_37db0 = uStack_48ff0;
  uStack_37ac8 = uStack_48f78;
  uStack_36670 = uStack_48d20;
  uStack_360a0 = uStack_48ca8;
  uStack_35db8 = uStack_48c30;
  uStack_357e8 = uStack_48bb8;
  uStack_34f30 = uStack_48b40;
  uStack_34c48 = uStack_48ac8;
  uStack_34960 = uStack_48a50;
  uStack_34678 = uStack_489d8;
  uStack_34390 = uStack_48960;
  uStack_33dc0 = uStack_488e8;
  uStack_33ad8 = uStack_48870;
  uStack_337f0 = uStack_487f8;
  uStack_33508 = uStack_48780;
  uStack_32f38 = uStack_48708;
  uStack_32c50 = uStack_48690;
  uStack_32968 = uStack_48618;
  uStack_32398 = uStack_485a0;
  uStack_320b0 = uStack_48528;
  uStack_31ae0 = uStack_484b0;
  uStack_31228 = uStack_48438;
  uStack_30f40 = uStack_483c0;
  uStack_30c58 = uStack_48348;
  uStack_30970 = uStack_482d0;
  uStack_303a0 = uStack_48258;
  uStack_300b8 = uStack_481e0;
  uStack_2fdd0 = uStack_48168;
  uStack_2f800 = uStack_480f0;
  uStack_2f518 = uStack_48078;
  uStack_2ef48 = uStack_48000;
  uStack_2e690 = uStack_47f88;
  uStack_2e3a8 = uStack_47f10;
  uStack_2e0c0 = uStack_47e98;
  uStack_2daf0 = uStack_47e20;
  uStack_2d808 = uStack_47da8;
  uStack_2d238 = uStack_47d30;
  uStack_2c980 = uStack_47cb8;
  uStack_2c698 = uStack_47c40;
  uStack_2c0c8 = uStack_47bc8;
  uStack_2b810 = uStack_47b50;
  uStack_3f7b8 = uStack_49f60;
  uStack_3d7c0 = uStack_49b28;
  uStack_3d4d8 = uStack_49ab0;
  uStack_3d1f0 = uStack_49a38;
  uStack_3cc20 = uStack_499c0;
  uStack_3c938 = uStack_49948;
  uStack_3c650 = uStack_498d0;
  uStack_3c368 = uStack_49858;
  uStack_3bd98 = uStack_497e0;
  uStack_3bab0 = uStack_49768;
  uStack_3b7c8 = uStack_496f0;
  uStack_3b1f8 = uStack_49678;
  uStack_3af10 = uStack_49600;
  uStack_3a940 = uStack_49588;
  uStack_3a370 = uStack_49510;
  uStack_3a088 = uStack_49498;
  uStack_39da0 = uStack_49420;
  uStack_39ab8 = uStack_493a8;
  uStack_397d0 = uStack_49330;
  uStack_394e8 = uStack_492b8;
  uStack_38f18 = uStack_49240;
  uStack_38c30 = uStack_491c8;
  uStack_38948 = uStack_49150;
  uStack_38660 = uStack_490d8;
  uStack_38378 = uStack_49060;
  uStack_37da8 = uStack_48fe8;
  uStack_37ac0 = uStack_48f70;
  uStack_36668 = uStack_48d18;
  uStack_36098 = uStack_48ca0;
  uStack_35db0 = uStack_48c28;
  uStack_357e0 = uStack_48bb0;
  uStack_34f28 = uStack_48b38;
  uStack_34c40 = uStack_48ac0;
  uStack_34958 = uStack_48a48;
  uStack_34670 = uStack_489d0;
  uStack_34388 = uStack_48958;
  uStack_33db8 = uStack_488e0;
  uStack_33ad0 = uStack_48868;
  uStack_337e8 = uStack_487f0;
  uStack_33500 = uStack_48778;
  uStack_32f30 = uStack_48700;
  uStack_32c48 = uStack_48688;
  uStack_32960 = uStack_48610;
  uStack_32390 = uStack_48598;
  uStack_320a8 = uStack_48520;
  uStack_31ad8 = uStack_484a8;
  uStack_31220 = uStack_48430;
  uStack_30f38 = uStack_483b8;
  uStack_30c50 = uStack_48340;
  uStack_30968 = uStack_482c8;
  uStack_30398 = uStack_48250;
  uStack_300b0 = uStack_481d8;
  uStack_2fdc8 = uStack_48160;
  uStack_2f7f8 = uStack_480e8;
  uStack_2f510 = uStack_48070;
  uStack_2ef40 = uStack_47ff8;
  uStack_2e688 = uStack_47f80;
  uStack_2e3a0 = uStack_47f08;
  uStack_2e0b8 = uStack_47e90;
  uStack_2dae8 = uStack_47e18;
  uStack_2d800 = uStack_47da0;
  uStack_2d230 = uStack_47d28;
  uStack_2c978 = uStack_47cb0;
  uStack_2c690 = uStack_47c38;
  uStack_2c0c0 = uStack_47bc0;
  uStack_2b808 = uStack_47b48;
  uStack_3f1e0 = uStack_49ee0;
  uStack_3d7b8 = uStack_49b20;
  uStack_3d4d0 = uStack_49aa8;
  uStack_3d1e8 = uStack_49a30;
  uStack_3cc18 = uStack_499b8;
  uStack_3c930 = uStack_49940;
  uStack_3c648 = uStack_498c8;
  uStack_3c360 = uStack_49850;
  uStack_3bd90 = uStack_497d8;
  uStack_3baa8 = uStack_49760;
  uStack_3b7c0 = uStack_496e8;
  uStack_3b1f0 = uStack_49670;
  uStack_3af08 = uStack_495f8;
  uStack_3a938 = uStack_49580;
  uStack_3a368 = uStack_49508;
  uStack_3a080 = uStack_49490;
  uStack_39d98 = uStack_49418;
  uStack_39ab0 = uStack_493a0;
  uStack_397c8 = uStack_49328;
  uStack_394e0 = uStack_492b0;
  uStack_38f10 = uStack_49238;
  uStack_38c28 = uStack_491c0;
  uStack_38940 = uStack_49148;
  uStack_38658 = uStack_490d0;
  uStack_38370 = uStack_49058;
  uStack_37da0 = uStack_48fe0;
  uStack_37ab8 = uStack_48f68;
  uStack_36660 = uStack_48d10;
  uStack_36090 = uStack_48c98;
  uStack_35da8 = uStack_48c20;
  uStack_357d8 = uStack_48ba8;
  uStack_34f20 = uStack_48b30;
  uStack_34c38 = uStack_48ab8;
  uStack_34950 = uStack_48a40;
  uStack_34668 = uStack_489c8;
  uStack_34380 = uStack_48950;
  uStack_33db0 = uStack_488d8;
  uStack_33ac8 = uStack_48860;
  uStack_337e0 = uStack_487e8;
  uStack_334f8 = uStack_48770;
  uStack_32f28 = uStack_486f8;
  uStack_32c40 = uStack_48680;
  uStack_32958 = uStack_48608;
  uStack_32388 = uStack_48590;
  uStack_320a0 = uStack_48518;
  uStack_31ad0 = uStack_484a0;
  uStack_31218 = uStack_48428;
  uStack_30f30 = uStack_483b0;
  uStack_30c48 = uStack_48338;
  uStack_30960 = uStack_482c0;
  uStack_30390 = uStack_48248;
  uStack_300a8 = uStack_481d0;
  uStack_2fdc0 = uStack_48158;
  uStack_2f7f0 = uStack_480e0;
  uStack_2f508 = uStack_48068;
  uStack_2ef38 = uStack_47ff0;
  uStack_2e680 = uStack_47f78;
  uStack_2e398 = uStack_47f00;
  uStack_2e0b0 = uStack_47e88;
  uStack_2dae0 = uStack_47e10;
  uStack_2d7f8 = uStack_47d98;
  uStack_2d228 = uStack_47d20;
  uStack_2c970 = uStack_47ca8;
  uStack_2c688 = uStack_47c30;
  uStack_2c0b8 = uStack_47bb8;
  uStack_2b800 = uStack_47b40;
  uStack_3eef0 = uStack_49e60;
  uStack_3d7b0 = uStack_49b18;
  uStack_3d4c8 = uStack_49aa0;
  uStack_3d1e0 = uStack_49a28;
  uStack_3cc10 = uStack_499b0;
  uStack_3c928 = uStack_49938;
  uStack_3c640 = uStack_498c0;
  uStack_3c358 = uStack_49848;
  uStack_3bd88 = uStack_497d0;
  uStack_3baa0 = uStack_49758;
  uStack_3b7b8 = uStack_496e0;
  uStack_3b1e8 = uStack_49668;
  uStack_3af00 = uStack_495f0;
  uStack_3a930 = uStack_49578;
  uStack_3a360 = uStack_49500;
  uStack_3a078 = uStack_49488;
  uStack_39d90 = uStack_49410;
  uStack_39aa8 = uStack_49398;
  uStack_397c0 = uStack_49320;
  uStack_394d8 = uStack_492a8;
  uStack_38f08 = uStack_49230;
  uStack_38c20 = uStack_491b8;
  uStack_38938 = uStack_49140;
  uStack_38650 = uStack_490c8;
  uStack_38368 = uStack_49050;
  uStack_37d98 = uStack_48fd8;
  uStack_37ab0 = uStack_48f60;
  uStack_36658 = uStack_48d08;
  uStack_36088 = uStack_48c90;
  uStack_35da0 = uStack_48c18;
  uStack_357d0 = uStack_48ba0;
  uStack_34f18 = uStack_48b28;
  uStack_34c30 = uStack_48ab0;
  uStack_34948 = uStack_48a38;
  uStack_34660 = uStack_489c0;
  uStack_34378 = uStack_48948;
  uStack_33da8 = uStack_488d0;
  uStack_33ac0 = uStack_48858;
  uStack_337d8 = uStack_487e0;
  uStack_334f0 = uStack_48768;
  uStack_32f20 = uStack_486f0;
  uStack_32c38 = uStack_48678;
  uStack_32950 = uStack_48600;
  uStack_32380 = uStack_48588;
  uStack_32098 = uStack_48510;
  uStack_31ac8 = uStack_48498;
  uStack_31210 = uStack_48420;
  uStack_30f28 = uStack_483a8;
  uStack_30c40 = uStack_48330;
  uStack_30958 = uStack_482b8;
  uStack_30388 = uStack_48240;
  uStack_300a0 = uStack_481c8;
  uStack_2fdb8 = uStack_48150;
  uStack_2f7e8 = uStack_480d8;
  uStack_2f500 = uStack_48060;
  uStack_2ef30 = uStack_47fe8;
  uStack_2e678 = uStack_47f70;
  uStack_2e390 = uStack_47ef8;
  uStack_2e0a8 = uStack_47e80;
  uStack_2dad8 = uStack_47e08;
  uStack_2d7f0 = uStack_47d90;
  uStack_2d220 = uStack_47d18;
  uStack_2c968 = uStack_47ca0;
  uStack_2c680 = uStack_47c28;
  uStack_2c0b0 = uStack_47bb0;
  uStack_2b7f8 = uStack_47b38;
  uStack_3ec00 = uStack_49de0;
  uStack_3d7a8 = uStack_49b10;
  uStack_3d4c0 = uStack_49a98;
  uStack_3d1d8 = uStack_49a20;
  uStack_3cc08 = uStack_499a8;
  uStack_3c920 = uStack_49930;
  uStack_3c638 = uStack_498b8;
  uStack_3c350 = uStack_49840;
  uStack_3bd80 = uStack_497c8;
  uStack_3ba98 = uStack_49750;
  uStack_3b7b0 = uStack_496d8;
  uStack_3b1e0 = uStack_49660;
  uStack_3aef8 = uStack_495e8;
  uStack_3a928 = uStack_49570;
  uStack_3a358 = uStack_494f8;
  uStack_3a070 = uStack_49480;
  uStack_39d88 = uStack_49408;
  uStack_39aa0 = uStack_49390;
  uStack_397b8 = uStack_49318;
  uStack_394d0 = uStack_492a0;
  uStack_38f00 = uStack_49228;
  uStack_38c18 = uStack_491b0;
  uStack_38930 = uStack_49138;
  uStack_38648 = uStack_490c0;
  uStack_38360 = uStack_49048;
  uStack_37d90 = uStack_48fd0;
  uStack_37aa8 = uStack_48f58;
  uStack_36650 = uStack_48d00;
  uStack_36080 = uStack_48c88;
  uStack_35d98 = uStack_48c10;
  uStack_357c8 = uStack_48b98;
  uStack_34f10 = uStack_48b20;
  uStack_34c28 = uStack_48aa8;
  uStack_34940 = uStack_48a30;
  uStack_34658 = uStack_489b8;
  uStack_34370 = uStack_48940;
  uStack_33da0 = uStack_488c8;
  uStack_33ab8 = uStack_48850;
  uStack_337d0 = uStack_487d8;
  uStack_334e8 = uStack_48760;
  uStack_32f18 = uStack_486e8;
  uStack_32c30 = uStack_48670;
  uStack_32948 = uStack_485f8;
  uStack_32378 = uStack_48580;
  uStack_32090 = uStack_48508;
  uStack_31ac0 = uStack_48490;
  uStack_31208 = uStack_48418;
  uStack_30f20 = uStack_483a0;
  uStack_30c38 = uStack_48328;
  uStack_30950 = uStack_482b0;
  uStack_30380 = uStack_48238;
  uStack_30098 = uStack_481c0;
  uStack_2fdb0 = uStack_48148;
  uStack_2f7e0 = uStack_480d0;
  uStack_2f4f8 = uStack_48058;
  uStack_2ef28 = uStack_47fe0;
  uStack_2e670 = uStack_47f68;
  uStack_2e388 = uStack_47ef0;
  uStack_2e0a0 = uStack_47e78;
  uStack_2dad0 = uStack_47e00;
  uStack_2d7e8 = uStack_47d88;
  uStack_2d218 = uStack_47d10;
  uStack_2c960 = uStack_47c98;
  uStack_2c678 = uStack_47c20;
  uStack_2c0a8 = uStack_47ba8;
  uStack_2b7f0 = uStack_47b30;
  uStack_3e910 = uStack_49d60;
  uStack_3d7a0 = uStack_49b08;
  uStack_3d4b8 = uStack_49a90;
  uStack_3d1d0 = uStack_49a18;
  uStack_3cc00 = uStack_499a0;
  uStack_3c918 = uStack_49928;
  uStack_3c630 = uStack_498b0;
  uStack_3c348 = uStack_49838;
  uStack_3bd78 = uStack_497c0;
  uStack_3ba90 = uStack_49748;
  uStack_3b7a8 = uStack_496d0;
  uStack_3b1d8 = uStack_49658;
  uStack_3aef0 = uStack_495e0;
  uStack_3a920 = uStack_49568;
  uStack_3a350 = uStack_494f0;
  uStack_3a068 = uStack_49478;
  uStack_39d80 = uStack_49400;
  uStack_39a98 = uStack_49388;
  uStack_397b0 = uStack_49310;
  uStack_394c8 = uStack_49298;
  uStack_38ef8 = uStack_49220;
  uStack_38c10 = uStack_491a8;
  uStack_38928 = uStack_49130;
  uStack_38640 = uStack_490b8;
  uStack_38358 = uStack_49040;
  uStack_37d88 = uStack_48fc8;
  uStack_37aa0 = uStack_48f50;
  uStack_36648 = uStack_48cf8;
  uStack_36078 = uStack_48c80;
  uStack_35d90 = uStack_48c08;
  uStack_357c0 = uStack_48b90;
  uStack_34f08 = uStack_48b18;
  uStack_34c20 = uStack_48aa0;
  uStack_34938 = uStack_48a28;
  uStack_34650 = uStack_489b0;
  uStack_34368 = uStack_48938;
  uStack_33d98 = uStack_488c0;
  uStack_33ab0 = uStack_48848;
  uStack_337c8 = uStack_487d0;
  uStack_334e0 = uStack_48758;
  uStack_32f10 = uStack_486e0;
  uStack_32c28 = uStack_48668;
  uStack_32940 = uStack_485f0;
  uStack_32370 = uStack_48578;
  uStack_32088 = uStack_48500;
  uStack_31ab8 = uStack_48488;
  uStack_31200 = uStack_48410;
  uStack_30f18 = uStack_48398;
  uStack_30c30 = uStack_48320;
  uStack_30948 = uStack_482a8;
  uStack_30378 = uStack_48230;
  uStack_30090 = uStack_481b8;
  uStack_2fda8 = uStack_48140;
  uStack_2f7d8 = uStack_480c8;
  uStack_2f4f0 = uStack_48050;
  uStack_2ef20 = uStack_47fd8;
  uStack_2e668 = uStack_47f60;
  uStack_2e380 = uStack_47ee8;
  uStack_2e098 = uStack_47e70;
  uStack_2dac8 = uStack_47df8;
  uStack_2d7e0 = uStack_47d80;
  uStack_2d210 = uStack_47d08;
  uStack_2c958 = uStack_47c90;
  uStack_2c670 = uStack_47c18;
  uStack_2c0a0 = uStack_47ba0;
  uStack_2b7e8 = uStack_47b28;
  uStack_3e620 = uStack_49ce0;
  uStack_3d798 = uStack_49b00;
  uStack_3d4b0 = uStack_49a88;
  uStack_3d1c8 = uStack_49a10;
  uStack_3cbf8 = uStack_49998;
  uStack_3c910 = uStack_49920;
  uStack_3c628 = uStack_498a8;
  uStack_3c340 = uStack_49830;
  uStack_3bd70 = uStack_497b8;
  uStack_3ba88 = uStack_49740;
  uStack_3b7a0 = uStack_496c8;
  uStack_3b1d0 = uStack_49650;
  uStack_3aee8 = uStack_495d8;
  uStack_3a918 = uStack_49560;
  uStack_3a348 = uStack_494e8;
  uStack_3a060 = uStack_49470;
  uStack_39d78 = uStack_493f8;
  uStack_39a90 = uStack_49380;
  uStack_397a8 = uStack_49308;
  uStack_394c0 = uStack_49290;
  uStack_38ef0 = uStack_49218;
  uStack_38c08 = uStack_491a0;
  uStack_38920 = uStack_49128;
  uStack_38638 = uStack_490b0;
  uStack_38350 = uStack_49038;
  uStack_37d80 = uStack_48fc0;
  uStack_37a98 = uStack_48f48;
  uStack_36640 = uStack_48cf0;
  uStack_36070 = uStack_48c78;
  uStack_35d88 = uStack_48c00;
  uStack_357b8 = uStack_48b88;
  uStack_34f00 = uStack_48b10;
  uStack_34c18 = uStack_48a98;
  uStack_34930 = uStack_48a20;
  uStack_34648 = uStack_489a8;
  uStack_34360 = uStack_48930;
  uStack_33d90 = uStack_488b8;
  uStack_33aa8 = uStack_48840;
  uStack_337c0 = uStack_487c8;
  uStack_334d8 = uStack_48750;
  uStack_32f08 = uStack_486d8;
  uStack_32c20 = uStack_48660;
  uStack_32938 = uStack_485e8;
  uStack_32368 = uStack_48570;
  uStack_32080 = uStack_484f8;
  uStack_31ab0 = uStack_48480;
  uStack_311f8 = uStack_48408;
  uStack_30f10 = uStack_48390;
  uStack_30c28 = uStack_48318;
  uStack_30940 = uStack_482a0;
  uStack_30370 = uStack_48228;
  uStack_30088 = uStack_481b0;
  uStack_2fda0 = uStack_48138;
  uStack_2f7d0 = uStack_480c0;
  uStack_2f4e8 = uStack_48048;
  uStack_2ef18 = uStack_47fd0;
  uStack_2e660 = uStack_47f58;
  uStack_2e378 = uStack_47ee0;
  uStack_2e090 = uStack_47e68;
  uStack_2dac0 = uStack_47df0;
  uStack_2d7d8 = uStack_47d78;
  uStack_2d208 = uStack_47d00;
  uStack_2c950 = uStack_47c88;
  uStack_2c668 = uStack_47c10;
  uStack_2c098 = uStack_47b98;
  uStack_2b7e0 = uStack_47b20;
  uStack_3e330 = uStack_49c60;
  uStack_3d790 = uStack_49af8;
  uStack_3d4a8 = uStack_49a80;
  uStack_3d1c0 = uStack_49a08;
  uStack_3cbf0 = uStack_49990;
  uStack_3c908 = uStack_49918;
  uStack_3c620 = uStack_498a0;
  uStack_3c338 = uStack_49828;
  uStack_3bd68 = uStack_497b0;
  uStack_3ba80 = uStack_49738;
  uStack_3b798 = uStack_496c0;
  uStack_3b1c8 = uStack_49648;
  uStack_3aee0 = uStack_495d0;
  uStack_3a910 = uStack_49558;
  uStack_3a340 = uStack_494e0;
  uStack_3a058 = uStack_49468;
  uStack_39d70 = uStack_493f0;
  uStack_39a88 = uStack_49378;
  uStack_397a0 = uStack_49300;
  uStack_394b8 = uStack_49288;
  uStack_38ee8 = uStack_49210;
  uStack_38c00 = uStack_49198;
  uStack_38918 = uStack_49120;
  uStack_38630 = uStack_490a8;
  uStack_38348 = uStack_49030;
  uStack_37d78 = uStack_48fb8;
  uStack_37a90 = uStack_48f40;
  uStack_36638 = uStack_48ce8;
  uStack_36068 = uStack_48c70;
  uStack_35d80 = uStack_48bf8;
  uStack_357b0 = uStack_48b80;
  uStack_34ef8 = uStack_48b08;
  uStack_34c10 = uStack_48a90;
  uStack_34928 = uStack_48a18;
  uStack_34640 = uStack_489a0;
  uStack_34358 = uStack_48928;
  uStack_33d88 = uStack_488b0;
  uStack_33aa0 = uStack_48838;
  uStack_337b8 = uStack_487c0;
  uStack_334d0 = uStack_48748;
  uStack_32f00 = uStack_486d0;
  uStack_32c18 = uStack_48658;
  uStack_32930 = uStack_485e0;
  uStack_32360 = uStack_48568;
  uStack_32078 = uStack_484f0;
  uStack_31aa8 = uStack_48478;
  uStack_311f0 = uStack_48400;
  uStack_30f08 = uStack_48388;
  uStack_30c20 = uStack_48310;
  uStack_30938 = uStack_48298;
  uStack_30368 = uStack_48220;
  uStack_30080 = uStack_481a8;
  uStack_2fd98 = uStack_48130;
  uStack_2f7c8 = uStack_480b8;
  uStack_2f4e0 = uStack_48040;
  uStack_2ef10 = uStack_47fc8;
  uStack_2e658 = uStack_47f50;
  uStack_2e370 = uStack_47ed8;
  uStack_2e088 = uStack_47e60;
  uStack_2dab8 = uStack_47de8;
  uStack_2d7d0 = uStack_47d70;
  uStack_2d200 = uStack_47cf8;
  uStack_2c948 = uStack_47c80;
  uStack_2c660 = uStack_47c08;
  uStack_2c090 = uStack_47b90;
  uStack_2b7d8 = uStack_47b18;
  uStack_3dd58 = uStack_49be0;
  uStack_3d788 = uStack_49af0;
  uStack_3d4a0 = uStack_49a78;
  uStack_3d1b8 = uStack_49a00;
  uStack_3cbe8 = uStack_49988;
  uStack_3c900 = uStack_49910;
  uStack_3c618 = uStack_49898;
  uStack_3c330 = uStack_49820;
  uStack_3bd60 = uStack_497a8;
  uStack_3ba78 = uStack_49730;
  uStack_3b790 = uStack_496b8;
  uStack_3b1c0 = uStack_49640;
  uStack_3aed8 = uStack_495c8;
  uStack_3a908 = uStack_49550;
  uStack_3a338 = uStack_494d8;
  uStack_3a050 = uStack_49460;
  uStack_39d68 = uStack_493e8;
  uStack_39a80 = uStack_49370;
  uStack_39798 = uStack_492f8;
  uStack_394b0 = uStack_49280;
  uStack_38ee0 = uStack_49208;
  uStack_38bf8 = uStack_49190;
  uStack_38910 = uStack_49118;
  uStack_38628 = uStack_490a0;
  uStack_38340 = uStack_49028;
  uStack_37d70 = uStack_48fb0;
  uStack_37a88 = uStack_48f38;
  uStack_36630 = uStack_48ce0;
  uStack_36060 = uStack_48c68;
  uStack_35d78 = uStack_48bf0;
  uStack_357a8 = uStack_48b78;
  uStack_34ef0 = uStack_48b00;
  uStack_34c08 = uStack_48a88;
  uStack_34920 = uStack_48a10;
  uStack_34638 = uStack_48998;
  uStack_34350 = uStack_48920;
  uStack_33d80 = uStack_488a8;
  uStack_33a98 = uStack_48830;
  uStack_337b0 = uStack_487b8;
  uStack_334c8 = uStack_48740;
  uStack_32ef8 = uStack_486c8;
  uStack_32c10 = uStack_48650;
  uStack_32928 = uStack_485d8;
  uStack_32358 = uStack_48560;
  uStack_32070 = uStack_484e8;
  uStack_31aa0 = uStack_48470;
  uStack_311e8 = uStack_483f8;
  uStack_30f00 = uStack_48380;
  uStack_30c18 = uStack_48308;
  uStack_30930 = uStack_48290;
  uStack_30360 = uStack_48218;
  uStack_30078 = uStack_481a0;
  uStack_2fd90 = uStack_48128;
  uStack_2f7c0 = uStack_480b0;
  uStack_2f4d8 = uStack_48038;
  uStack_2ef08 = uStack_47fc0;
  uStack_2e650 = uStack_47f48;
  uStack_2e368 = uStack_47ed0;
  uStack_2e080 = uStack_47e58;
  uStack_2dab0 = uStack_47de0;
  uStack_2d7c8 = uStack_47d68;
  uStack_2d1f8 = uStack_47cf0;
  uStack_2c940 = uStack_47c78;
  uStack_2c658 = uStack_47c00;
  uStack_2c088 = uStack_47b88;
  uStack_2b7d0 = uStack_47b10;
  uStack_3da68 = uStack_49b60;
  uStack_3d780 = uStack_49ae8;
  uStack_3d498 = uStack_49a70;
  uStack_3d1b0 = uStack_499f8;
  uStack_3cbe0 = uStack_49980;
  uStack_3c8f8 = uStack_49908;
  uStack_3c610 = uStack_49890;
  uStack_3c328 = uStack_49818;
  uStack_3bd58 = uStack_497a0;
  uStack_3ba70 = uStack_49728;
  uStack_3b788 = uStack_496b0;
  uStack_3b1b8 = uStack_49638;
  uStack_3aed0 = uStack_495c0;
  uStack_3a900 = uStack_49548;
  uStack_3a330 = uStack_494d0;
  uStack_3a048 = uStack_49458;
  uStack_39d60 = uStack_493e0;
  uStack_39a78 = uStack_49368;
  uStack_39790 = uStack_492f0;
  uStack_394a8 = uStack_49278;
  uStack_38ed8 = uStack_49200;
  uStack_38bf0 = uStack_49188;
  uStack_38908 = uStack_49110;
  uStack_38620 = uStack_49098;
  uStack_38338 = uStack_49020;
  uStack_37d68 = uStack_48fa8;
  uStack_37a80 = uStack_48f30;
  uStack_36628 = uStack_48cd8;
  uStack_36058 = uStack_48c60;
  uStack_35d70 = uStack_48be8;
  uStack_357a0 = uStack_48b70;
  uStack_34ee8 = uStack_48af8;
  uStack_34c00 = uStack_48a80;
  uStack_34918 = uStack_48a08;
  uStack_34630 = uStack_48990;
  uStack_34348 = uStack_48918;
  uStack_33d78 = uStack_488a0;
  uStack_33a90 = uStack_48828;
  uStack_337a8 = uStack_487b0;
  uStack_334c0 = uStack_48738;
  uStack_32ef0 = uStack_486c0;
  uStack_32c08 = uStack_48648;
  uStack_32920 = uStack_485d0;
  uStack_32350 = uStack_48558;
  uStack_32068 = uStack_484e0;
  uStack_31a98 = uStack_48468;
  uStack_311e0 = uStack_483f0;
  uStack_30ef8 = uStack_48378;
  uStack_30c10 = uStack_48300;
  uStack_30928 = uStack_48288;
  uStack_30358 = uStack_48210;
  uStack_30070 = uStack_48198;
  uStack_2fd88 = uStack_48120;
  uStack_2f7b8 = uStack_480a8;
  uStack_2f4d0 = uStack_48030;
  uStack_2ef00 = uStack_47fb8;
  uStack_2e648 = uStack_47f40;
  uStack_2e360 = uStack_47ec8;
  uStack_2e078 = uStack_47e50;
  uStack_2daa8 = uStack_47dd8;
  uStack_2d7c0 = uStack_47d60;
  uStack_2d1f0 = uStack_47ce8;
  uStack_2c938 = uStack_47c70;
  uStack_2c650 = uStack_47bf8;
  uStack_2c080 = uStack_47b80;
  uStack_2b7c8 = uStack_47b08;
  uStack_40bc8 = auStack_4a260[0];
  uStack_3da60 = uStack_49b58;
  uStack_3d778 = uStack_49ae0;
  uStack_3d490 = uStack_49a68;
  uStack_3cec0 = uStack_499f0;
  uStack_3cbd8 = uStack_49978;
  uStack_3c8f0 = uStack_49900;
  uStack_3c608 = uStack_49888;
  uStack_3c038 = uStack_49810;
  uStack_3bd50 = uStack_49798;
  uStack_3ba68 = uStack_49720;
  uStack_3b498 = uStack_496a8;
  uStack_3b1b0 = uStack_49630;
  uStack_3abe0 = uStack_495b8;
  uStack_3a610 = uStack_49540;
  uStack_3a328 = uStack_494c8;
  uStack_3a040 = uStack_49450;
  uStack_39d58 = uStack_493d8;
  uStack_39a70 = uStack_49360;
  uStack_39788 = uStack_492e8;
  uStack_391b8 = uStack_49270;
  uStack_38ed0 = uStack_491f8;
  uStack_38be8 = uStack_49180;
  uStack_38900 = uStack_49108;
  uStack_38618 = uStack_49090;
  uStack_38048 = uStack_49018;
  uStack_37d60 = uStack_48fa0;
  uStack_37a78 = uStack_48f28;
  uStack_36338 = uStack_48cd0;
  uStack_36050 = uStack_48c58;
  uStack_35a80 = uStack_48be0;
  uStack_351c8 = uStack_48b68;
  uStack_34ee0 = uStack_48af0;
  uStack_34bf8 = uStack_48a78;
  uStack_34910 = uStack_48a00;
  uStack_34628 = uStack_48988;
  uStack_34058 = uStack_48910;
  uStack_33d70 = uStack_48898;
  uStack_33a88 = uStack_48820;
  uStack_337a0 = uStack_487a8;
  uStack_331d0 = uStack_48730;
  uStack_32ee8 = uStack_486b8;
  uStack_32c00 = uStack_48640;
  uStack_32630 = uStack_485c8;
  uStack_32348 = uStack_48550;
  uStack_31d78 = uStack_484d8;
  uStack_314c0 = uStack_48460;
  uStack_311d8 = uStack_483e8;
  uStack_30ef0 = uStack_48370;
  uStack_30c08 = uStack_482f8;
  uStack_30638 = uStack_48280;
  uStack_30350 = uStack_48208;
  uStack_30068 = uStack_48190;
  uStack_2fa98 = uStack_48118;
  uStack_2f7b0 = uStack_480a0;
  uStack_2f1e0 = uStack_48028;
  uStack_2e928 = uStack_47fb0;
  uStack_2e640 = uStack_47f38;
  uStack_2e358 = uStack_47ec0;
  uStack_2dd88 = uStack_47e48;
  uStack_2daa0 = uStack_47dd0;
  uStack_2d4d0 = uStack_47d58;
  uStack_2cc18 = uStack_47ce0;
  uStack_2c930 = uStack_47c68;
  uStack_2c360 = uStack_47bf0;
  uStack_2baa8 = uStack_47b78;
  uStack_408d8 = uStack_4a1e0;
  uStack_3da58 = uStack_49b50;
  uStack_3d770 = uStack_49ad8;
  uStack_3d488 = uStack_49a60;
  uStack_3ceb8 = uStack_499e8;
  uStack_3cbd0 = uStack_49970;
  uStack_3c8e8 = uStack_498f8;
  uStack_3c600 = uStack_49880;
  uStack_3c030 = uStack_49808;
  uStack_3bd48 = uStack_49790;
  uStack_3ba60 = uStack_49718;
  uStack_3b490 = uStack_496a0;
  uStack_3b1a8 = uStack_49628;
  uStack_3abd8 = uStack_495b0;
  uStack_3a608 = uStack_49538;
  uStack_3a320 = uStack_494c0;
  uStack_3a038 = uStack_49448;
  uStack_39d50 = uStack_493d0;
  uStack_39a68 = uStack_49358;
  uStack_39780 = uStack_492e0;
  uStack_391b0 = uStack_49268;
  uStack_38ec8 = uStack_491f0;
  uStack_38be0 = uStack_49178;
  uStack_388f8 = uStack_49100;
  uStack_38610 = uStack_49088;
  uStack_38040 = uStack_49010;
  uStack_37d58 = uStack_48f98;
  uStack_37a70 = uStack_48f20;
  uStack_36330 = uStack_48cc8;
  uStack_36048 = uStack_48c50;
  uStack_35a78 = uStack_48bd8;
  uStack_351c0 = uStack_48b60;
  uStack_34ed8 = uStack_48ae8;
  uStack_34bf0 = uStack_48a70;
  uStack_34908 = uStack_489f8;
  uStack_34620 = uStack_48980;
  uStack_34050 = uStack_48908;
  uStack_33d68 = uStack_48890;
  uStack_33a80 = uStack_48818;
  uStack_33798 = uStack_487a0;
  uStack_331c8 = uStack_48728;
  uStack_32ee0 = uStack_486b0;
  uStack_32bf8 = uStack_48638;
  uStack_32628 = uStack_485c0;
  uStack_32340 = uStack_48548;
  uStack_31d70 = uStack_484d0;
  uStack_314b8 = uStack_48458;
  uStack_311d0 = uStack_483e0;
  uStack_30ee8 = uStack_48368;
  uStack_30c00 = uStack_482f0;
  uStack_30630 = uStack_48278;
  uStack_30348 = uStack_48200;
  uStack_30060 = uStack_48188;
  uStack_2fa90 = uStack_48110;
  uStack_2f7a8 = uStack_48098;
  uStack_2f1d8 = uStack_48020;
  uStack_2e920 = uStack_47fa8;
  uStack_2e638 = uStack_47f30;
  uStack_2e350 = uStack_47eb8;
  uStack_2dd80 = uStack_47e40;
  uStack_2da98 = uStack_47dc8;
  uStack_2d4c8 = uStack_47d50;
  uStack_2cc10 = uStack_47cd8;
  uStack_2c928 = uStack_47c60;
  uStack_2c358 = uStack_47be8;
  uStack_2baa0 = uStack_47b70;
  uStack_405e8 = uStack_4a160;
  uStack_3da50 = uStack_49b48;
  uStack_3d768 = uStack_49ad0;
  uStack_3d480 = uStack_49a58;
  uStack_3ceb0 = uStack_499e0;
  uStack_3cbc8 = uStack_49968;
  uStack_3c8e0 = uStack_498f0;
  uStack_3c5f8 = uStack_49878;
  uStack_3c028 = uStack_49800;
  uStack_3bd40 = uStack_49788;
  uStack_3ba58 = uStack_49710;
  uStack_3b488 = uStack_49698;
  uStack_3b1a0 = uStack_49620;
  uStack_3abd0 = uStack_495a8;
  uStack_3a600 = uStack_49530;
  uStack_3a318 = uStack_494b8;
  uStack_3a030 = uStack_49440;
  uStack_39d48 = uStack_493c8;
  uStack_39a60 = uStack_49350;
  uStack_39778 = uStack_492d8;
  uStack_391a8 = uStack_49260;
  uStack_38ec0 = uStack_491e8;
  uStack_38bd8 = uStack_49170;
  uStack_388f0 = uStack_490f8;
  uStack_38608 = uStack_49080;
  uStack_38038 = uStack_49008;
  uStack_37d50 = uStack_48f90;
  uStack_37a68 = uStack_48f18;
  uStack_36328 = uStack_48cc0;
  uStack_36040 = uStack_48c48;
  uStack_35a70 = uStack_48bd0;
  uStack_351b8 = uStack_48b58;
  uStack_34ed0 = uStack_48ae0;
  uStack_34be8 = uStack_48a68;
  uStack_34900 = uStack_489f0;
  uStack_34618 = uStack_48978;
  uStack_34048 = uStack_48900;
  uStack_33d60 = uStack_48888;
  uStack_33a78 = uStack_48810;
  uStack_33790 = uStack_48798;
  uStack_331c0 = uStack_48720;
  uStack_32ed8 = uStack_486a8;
  uStack_32bf0 = uStack_48630;
  uStack_32620 = uStack_485b8;
  uStack_32338 = uStack_48540;
  uStack_31d68 = uStack_484c8;
  uStack_314b0 = uStack_48450;
  uStack_311c8 = uStack_483d8;
  uStack_30ee0 = uStack_48360;
  uStack_30bf8 = uStack_482e8;
  uStack_30628 = uStack_48270;
  uStack_30340 = uStack_481f8;
  uStack_30058 = uStack_48180;
  uStack_2fa88 = uStack_48108;
  uStack_2f7a0 = uStack_48090;
  uStack_2f1d0 = uStack_48018;
  uStack_2e918 = uStack_47fa0;
  uStack_2e630 = uStack_47f28;
  uStack_2e348 = uStack_47eb0;
  uStack_2dd78 = uStack_47e38;
  uStack_2da90 = uStack_47dc0;
  uStack_2d4c0 = uStack_47d48;
  uStack_2cc08 = uStack_47cd0;
  uStack_2c920 = uStack_47c58;
  uStack_2c350 = uStack_47be0;
  uStack_2ba98 = uStack_47b68;
  uStack_402f8 = uStack_4a0e0;
  uStack_3da48 = uStack_49b40;
  uStack_3d760 = uStack_49ac8;
  uStack_3d478 = uStack_49a50;
  uStack_3cea8 = uStack_499d8;
  uStack_3cbc0 = uStack_49960;
  uStack_3c8d8 = uStack_498e8;
  uStack_3c5f0 = uStack_49870;
  uStack_3c020 = uStack_497f8;
  uStack_3bd38 = uStack_49780;
  uStack_3ba50 = uStack_49708;
  uStack_3b480 = uStack_49690;
  uStack_3b198 = uStack_49618;
  uStack_3abc8 = uStack_495a0;
  uStack_3a5f8 = uStack_49528;
  uStack_3a310 = uStack_494b0;
  uStack_3a028 = uStack_49438;
  uStack_39d40 = uStack_493c0;
  uStack_39a58 = uStack_49348;
  uStack_39770 = uStack_492d0;
  uStack_391a0 = uStack_49258;
  uStack_38eb8 = uStack_491e0;
  uStack_38bd0 = uStack_49168;
  uStack_388e8 = uStack_490f0;
  uStack_38600 = uStack_49078;
  uStack_38030 = uStack_49000;
  uStack_37d48 = uStack_48f88;
  uStack_37a60 = uStack_48f10;
  uStack_36320 = uStack_48cb8;
  uStack_36038 = uStack_48c40;
  uStack_35a68 = uStack_48bc8;
  uStack_351b0 = uStack_48b50;
  uStack_34ec8 = uStack_48ad8;
  uStack_34be0 = uStack_48a60;
  uStack_348f8 = uStack_489e8;
  uStack_34610 = uStack_48970;
  uStack_34040 = uStack_488f8;
  uStack_33d58 = uStack_48880;
  uStack_33a70 = uStack_48808;
  uStack_33788 = uStack_48790;
  uStack_331b8 = uStack_48718;
  uStack_32ed0 = uStack_486a0;
  uStack_32be8 = uStack_48628;
  uStack_32618 = uStack_485b0;
  uStack_32330 = uStack_48538;
  uStack_31d60 = uStack_484c0;
  uStack_314a8 = uStack_48448;
  uStack_311c0 = uStack_483d0;
  uStack_30ed8 = uStack_48358;
  uStack_30bf0 = uStack_482e0;
  uStack_30620 = uStack_48268;
  uStack_30338 = uStack_481f0;
  uStack_30050 = uStack_48178;
  uStack_2fa80 = uStack_48100;
  uStack_2f798 = uStack_48088;
  uStack_2f1c8 = uStack_48010;
  uStack_2e910 = uStack_47f98;
  uStack_2e628 = uStack_47f20;
  uStack_2e340 = uStack_47ea8;
  uStack_2dd70 = uStack_47e30;
  uStack_2da88 = uStack_47db8;
  uStack_2d4b8 = uStack_47d40;
  uStack_2cc00 = uStack_47cc8;
  uStack_2c918 = uStack_47c50;
  uStack_2c348 = uStack_47bd8;
  uStack_2ba90 = uStack_47b60;
  uStack_40008 = uStack_4a060;
  uStack_3da40 = uStack_49b38;
  uStack_3d758 = uStack_49ac0;
  uStack_3d470 = uStack_49a48;
  uStack_3cea0 = uStack_499d0;
  uStack_3cbb8 = uStack_49958;
  uStack_3c8d0 = uStack_498e0;
  uStack_3c5e8 = uStack_49868;
  uStack_3c018 = uStack_497f0;
  uStack_3bd30 = uStack_49778;
  uStack_3ba48 = uStack_49700;
  uStack_3b478 = uStack_49688;
  uStack_3b190 = uStack_49610;
  uStack_3abc0 = uStack_49598;
  uStack_3a5f0 = uStack_49520;
  uStack_3a308 = uStack_494a8;
  uStack_3a020 = uStack_49430;
  uStack_39d38 = uStack_493b8;
  uStack_39a50 = uStack_49340;
  uStack_39768 = uStack_492c8;
  uStack_39198 = uStack_49250;
  uStack_38eb0 = uStack_491d8;
  uStack_38bc8 = uStack_49160;
  uStack_388e0 = uStack_490e8;
  uStack_385f8 = uStack_49070;
  uStack_38028 = uStack_48ff8;
  uStack_37d40 = uStack_48f80;
  uStack_37a58 = uStack_48f08;
  uStack_36318 = uStack_48cb0;
  uStack_36030 = uStack_48c38;
  uStack_35a60 = uStack_48bc0;
  uStack_351a8 = uStack_48b48;
  uStack_34ec0 = uStack_48ad0;
  uStack_34bd8 = uStack_48a58;
  uStack_348f0 = uStack_489e0;
  uStack_34608 = uStack_48968;
  uStack_34038 = uStack_488f0;
  uStack_33d50 = uStack_48878;
  uStack_33a68 = uStack_48800;
  uStack_33780 = uStack_48788;
  uStack_331b0 = uStack_48710;
  uStack_32ec8 = uStack_48698;
  uStack_32be0 = uStack_48620;
  uStack_32610 = uStack_485a8;
  uStack_32328 = uStack_48530;
  uStack_31d58 = uStack_484b8;
  uStack_314a0 = uStack_48440;
  uStack_311b8 = uStack_483c8;
  uStack_30ed0 = uStack_48350;
  uStack_30be8 = uStack_482d8;
  uStack_30618 = uStack_48260;
  uStack_30330 = uStack_481e8;
  uStack_30048 = uStack_48170;
  uStack_2fa78 = uStack_480f8;
  uStack_2f790 = uStack_48080;
  uStack_2f1c0 = uStack_48008;
  uStack_2e908 = uStack_47f90;
  uStack_2e620 = uStack_47f18;
  uStack_2e338 = uStack_47ea0;
  uStack_2dd68 = uStack_47e28;
  uStack_2da80 = uStack_47db0;
  uStack_2d4b0 = uStack_47d38;
  uStack_2cbf8 = uStack_47cc0;
  uStack_2c910 = uStack_47c48;
  uStack_2c340 = uStack_47bd0;
  uStack_2ba88 = uStack_47b58;
  uStack_3fd18 = uStack_49fe0;
  uStack_3da38 = uStack_49b30;
  uStack_3d750 = uStack_49ab8;
  uStack_3d468 = uStack_49a40;
  uStack_3ce98 = uStack_499c8;
  uStack_3cbb0 = uStack_49950;
  uStack_3c8c8 = uStack_498d8;
  uStack_3c5e0 = uStack_49860;
  uStack_3c010 = uStack_497e8;
  uStack_3bd28 = uStack_49770;
  uStack_3ba40 = uStack_496f8;
  uStack_3b470 = uStack_49680;
  uStack_3b188 = uStack_49608;
  uStack_3abb8 = uStack_49590;
  uStack_3a5e8 = uStack_49518;
  uStack_3a300 = uStack_494a0;
  uStack_3a018 = uStack_49428;
  uStack_39d30 = uStack_493b0;
  uStack_39a48 = uStack_49338;
  uStack_39760 = uStack_492c0;
  uStack_39190 = uStack_49248;
  uStack_38ea8 = uStack_491d0;
  uStack_38bc0 = uStack_49158;
  uStack_388d8 = uStack_490e0;
  uStack_385f0 = uStack_49068;
  uStack_38020 = uStack_48ff0;
  uStack_37d38 = uStack_48f78;
  uStack_37a50 = uStack_48f00;
  uStack_36310 = uStack_48ca8;
  uStack_36028 = uStack_48c30;
  uStack_35a58 = uStack_48bb8;
  uStack_351a0 = uStack_48b40;
  uStack_34eb8 = uStack_48ac8;
  uStack_34bd0 = uStack_48a50;
  uStack_348e8 = uStack_489d8;
  uStack_34600 = uStack_48960;
  uStack_34030 = uStack_488e8;
  uStack_33d48 = uStack_48870;
  uStack_33a60 = uStack_487f8;
  uStack_33778 = uStack_48780;
  uStack_331a8 = uStack_48708;
  uStack_32ec0 = uStack_48690;
  uStack_32bd8 = uStack_48618;
  uStack_32608 = uStack_485a0;
  uStack_32320 = uStack_48528;
  uStack_31d50 = uStack_484b0;
  uStack_31498 = uStack_48438;
  uStack_311b0 = uStack_483c0;
  uStack_30ec8 = uStack_48348;
  uStack_30be0 = uStack_482d0;
  uStack_30610 = uStack_48258;
  uStack_30328 = uStack_481e0;
  uStack_30040 = uStack_48168;
  uStack_2fa70 = uStack_480f0;
  uStack_2f788 = uStack_48078;
  uStack_2f1b8 = uStack_48000;
  uStack_2e900 = uStack_47f88;
  uStack_2e618 = uStack_47f10;
  uStack_2e330 = uStack_47e98;
  uStack_2dd60 = uStack_47e20;
  uStack_2da78 = uStack_47da8;
  uStack_2d4a8 = uStack_47d30;
  uStack_2cbf0 = uStack_47cb8;
  uStack_2c908 = uStack_47c40;
  uStack_2c338 = uStack_47bc8;
  uStack_2ba80 = uStack_47b50;
  uStack_3fa28 = uStack_49f60;
  uStack_3da30 = uStack_49b28;
  uStack_3d748 = uStack_49ab0;
  uStack_3d460 = uStack_49a38;
  uStack_3ce90 = uStack_499c0;
  uStack_3cba8 = uStack_49948;
  uStack_3c8c0 = uStack_498d0;
  uStack_3c5d8 = uStack_49858;
  uStack_3c008 = uStack_497e0;
  uStack_3bd20 = uStack_49768;
  uStack_3ba38 = uStack_496f0;
  uStack_3b468 = uStack_49678;
  uStack_3b180 = uStack_49600;
  uStack_3abb0 = uStack_49588;
  uStack_3a5e0 = uStack_49510;
  uStack_3a2f8 = uStack_49498;
  uStack_3a010 = uStack_49420;
  uStack_39d28 = uStack_493a8;
  uStack_39a40 = uStack_49330;
  uStack_39758 = uStack_492b8;
  uStack_39188 = uStack_49240;
  uStack_38ea0 = uStack_491c8;
  uStack_38bb8 = uStack_49150;
  uStack_388d0 = uStack_490d8;
  uStack_385e8 = uStack_49060;
  uStack_38018 = uStack_48fe8;
  uStack_37d30 = uStack_48f70;
  uStack_37a48 = uStack_48ef8;
  uStack_36308 = uStack_48ca0;
  uStack_36020 = uStack_48c28;
  uStack_35a50 = uStack_48bb0;
  uStack_35198 = uStack_48b38;
  uStack_34eb0 = uStack_48ac0;
  uStack_34bc8 = uStack_48a48;
  uStack_348e0 = uStack_489d0;
  uStack_345f8 = uStack_48958;
  uStack_34028 = uStack_488e0;
  uStack_33d40 = uStack_48868;
  uStack_33a58 = uStack_487f0;
  uStack_33770 = uStack_48778;
  uStack_331a0 = uStack_48700;
  uStack_32eb8 = uStack_48688;
  uStack_32bd0 = uStack_48610;
  uStack_32600 = uStack_48598;
  uStack_32318 = uStack_48520;
  uStack_31d48 = uStack_484a8;
  uStack_31490 = uStack_48430;
  uStack_311a8 = uStack_483b8;
  uStack_30ec0 = uStack_48340;
  uStack_30bd8 = uStack_482c8;
  uStack_30608 = uStack_48250;
  uStack_30320 = uStack_481d8;
  uStack_30038 = uStack_48160;
  uStack_2fa68 = uStack_480e8;
  uStack_2f780 = uStack_48070;
  uStack_2f1b0 = uStack_47ff8;
  uStack_2e8f8 = uStack_47f80;
  uStack_2e610 = uStack_47f08;
  uStack_2e328 = uStack_47e90;
  uStack_2dd58 = uStack_47e18;
  uStack_2da70 = uStack_47da0;
  uStack_2d4a0 = uStack_47d28;
  uStack_2cbe8 = uStack_47cb0;
  uStack_2c900 = uStack_47c38;
  uStack_2c330 = uStack_47bc0;
  uStack_2ba78 = uStack_47b48;
  uStack_3f450 = uStack_49ee0;
  uStack_3da28 = uStack_49b20;
  uStack_3d740 = uStack_49aa8;
  uStack_3d458 = uStack_49a30;
  uStack_3ce88 = uStack_499b8;
  uStack_3cba0 = uStack_49940;
  uStack_3c8b8 = uStack_498c8;
  uStack_3c5d0 = uStack_49850;
  uStack_3c000 = uStack_497d8;
  uStack_3bd18 = uStack_49760;
  uStack_3ba30 = uStack_496e8;
  uStack_3b460 = uStack_49670;
  uStack_3b178 = uStack_495f8;
  uStack_3aba8 = uStack_49580;
  uStack_3a5d8 = uStack_49508;
  uStack_3a2f0 = uStack_49490;
  uStack_3a008 = uStack_49418;
  uStack_39d20 = uStack_493a0;
  uStack_39a38 = uStack_49328;
  uStack_39750 = uStack_492b0;
  uStack_39180 = uStack_49238;
  uStack_38e98 = uStack_491c0;
  uStack_38bb0 = uStack_49148;
  uStack_388c8 = uStack_490d0;
  uStack_385e0 = uStack_49058;
  uStack_38010 = uStack_48fe0;
  uStack_37d28 = uStack_48f68;
  uStack_37a40 = uStack_48ef0;
  uStack_36300 = uStack_48c98;
  uStack_36018 = uStack_48c20;
  uStack_35a48 = uStack_48ba8;
  uStack_35190 = uStack_48b30;
  uStack_34ea8 = uStack_48ab8;
  uStack_34bc0 = uStack_48a40;
  uStack_348d8 = uStack_489c8;
  uStack_345f0 = uStack_48950;
  uStack_34020 = uStack_488d8;
  uStack_33d38 = uStack_48860;
  uStack_33a50 = uStack_487e8;
  uStack_33768 = uStack_48770;
  uStack_33198 = uStack_486f8;
  uStack_32eb0 = uStack_48680;
  uStack_32bc8 = uStack_48608;
  uStack_325f8 = uStack_48590;
  uStack_32310 = uStack_48518;
  uStack_31d40 = uStack_484a0;
  uStack_31488 = uStack_48428;
  uStack_311a0 = uStack_483b0;
  uStack_30eb8 = uStack_48338;
  uStack_30bd0 = uStack_482c0;
  uStack_30600 = uStack_48248;
  uStack_30318 = uStack_481d0;
  uStack_30030 = uStack_48158;
  uStack_2fa60 = uStack_480e0;
  uStack_2f778 = uStack_48068;
  uStack_2f1a8 = uStack_47ff0;
  uStack_2e8f0 = uStack_47f78;
  uStack_2e608 = uStack_47f00;
  uStack_2e320 = uStack_47e88;
  uStack_2dd50 = uStack_47e10;
  uStack_2da68 = uStack_47d98;
  uStack_2d498 = uStack_47d20;
  uStack_2cbe0 = uStack_47ca8;
  uStack_2c8f8 = uStack_47c30;
  uStack_2c328 = uStack_47bb8;
  uStack_2ba70 = uStack_47b40;
  uStack_3f160 = uStack_49e60;
  uStack_3da20 = uStack_49b18;
  uStack_3d738 = uStack_49aa0;
  uStack_3d450 = uStack_49a28;
  uStack_3ce80 = uStack_499b0;
  uStack_3cb98 = uStack_49938;
  uStack_3c8b0 = uStack_498c0;
  uStack_3c5c8 = uStack_49848;
  uStack_3bff8 = uStack_497d0;
  uStack_3bd10 = uStack_49758;
  uStack_3ba28 = uStack_496e0;
  uStack_3b458 = uStack_49668;
  uStack_3b170 = uStack_495f0;
  uStack_3aba0 = uStack_49578;
  uStack_3a5d0 = uStack_49500;
  uStack_3a2e8 = uStack_49488;
  uStack_3a000 = uStack_49410;
  uStack_39d18 = uStack_49398;
  uStack_39a30 = uStack_49320;
  uStack_39748 = uStack_492a8;
  uStack_39178 = uStack_49230;
  uStack_38e90 = uStack_491b8;
  uStack_38ba8 = uStack_49140;
  uStack_388c0 = uStack_490c8;
  uStack_385d8 = uStack_49050;
  uStack_38008 = uStack_48fd8;
  uStack_37d20 = uStack_48f60;
  uStack_37a38 = uStack_48ee8;
  uStack_362f8 = uStack_48c90;
  uStack_36010 = uStack_48c18;
  uStack_35a40 = uStack_48ba0;
  uStack_35188 = uStack_48b28;
  uStack_34ea0 = uStack_48ab0;
  uStack_34bb8 = uStack_48a38;
  uStack_348d0 = uStack_489c0;
  uStack_345e8 = uStack_48948;
  uStack_34018 = uStack_488d0;
  uStack_33d30 = uStack_48858;
  uStack_33a48 = uStack_487e0;
  uStack_33760 = uStack_48768;
  uStack_33190 = uStack_486f0;
  uStack_32ea8 = uStack_48678;
  uStack_32bc0 = uStack_48600;
  uStack_325f0 = uStack_48588;
  uStack_32308 = uStack_48510;
  uStack_31d38 = uStack_48498;
  uStack_31480 = uStack_48420;
  uStack_31198 = uStack_483a8;
  uStack_30eb0 = uStack_48330;
  uStack_30bc8 = uStack_482b8;
  uStack_305f8 = uStack_48240;
  uStack_30310 = uStack_481c8;
  uStack_30028 = uStack_48150;
  uStack_2fa58 = uStack_480d8;
  uStack_2f770 = uStack_48060;
  uStack_2f1a0 = uStack_47fe8;
  uStack_2e8e8 = uStack_47f70;
  uStack_2e600 = uStack_47ef8;
  uStack_2e318 = uStack_47e80;
  uStack_2dd48 = uStack_47e08;
  uStack_2da60 = uStack_47d90;
  uStack_2d490 = uStack_47d18;
  uStack_2cbd8 = uStack_47ca0;
  uStack_2c8f0 = uStack_47c28;
  uStack_2c320 = uStack_47bb0;
  uStack_2ba68 = uStack_47b38;
  uStack_3ee70 = uStack_49de0;
  uStack_3da18 = uStack_49b10;
  uStack_3d730 = uStack_49a98;
  uStack_3d448 = uStack_49a20;
  uStack_3ce78 = uStack_499a8;
  uStack_3cb90 = uStack_49930;
  uStack_3c8a8 = uStack_498b8;
  uStack_3c5c0 = uStack_49840;
  uStack_3bff0 = uStack_497c8;
  uStack_3bd08 = uStack_49750;
  uStack_3ba20 = uStack_496d8;
  uStack_3b450 = uStack_49660;
  uStack_3b168 = uStack_495e8;
  uStack_3ab98 = uStack_49570;
  uStack_3a5c8 = uStack_494f8;
  uStack_3a2e0 = uStack_49480;
  uStack_39ff8 = uStack_49408;
  uStack_39d10 = uStack_49390;
  uStack_39a28 = uStack_49318;
  uStack_39740 = uStack_492a0;
  uStack_39170 = uStack_49228;
  uStack_38e88 = uStack_491b0;
  uStack_38ba0 = uStack_49138;
  uStack_388b8 = uStack_490c0;
  uStack_385d0 = uStack_49048;
  uStack_38000 = uStack_48fd0;
  uStack_37d18 = uStack_48f58;
  uStack_37a30 = uStack_48ee0;
  uStack_362f0 = uStack_48c88;
  uStack_36008 = uStack_48c10;
  uStack_35a38 = uStack_48b98;
  uStack_35180 = uStack_48b20;
  uStack_34e98 = uStack_48aa8;
  uStack_34bb0 = uStack_48a30;
  uStack_348c8 = uStack_489b8;
  uStack_345e0 = uStack_48940;
  uStack_34010 = uStack_488c8;
  uStack_33d28 = uStack_48850;
  uStack_33a40 = uStack_487d8;
  uStack_33758 = uStack_48760;
  uStack_33188 = uStack_486e8;
  uStack_32ea0 = uStack_48670;
  uStack_32bb8 = uStack_485f8;
  uStack_325e8 = uStack_48580;
  uStack_32300 = uStack_48508;
  uStack_31d30 = uStack_48490;
  uStack_31478 = uStack_48418;
  uStack_31190 = uStack_483a0;
  uStack_30ea8 = uStack_48328;
  uStack_30bc0 = uStack_482b0;
  uStack_305f0 = uStack_48238;
  uStack_30308 = uStack_481c0;
  uStack_30020 = uStack_48148;
  uStack_2fa50 = uStack_480d0;
  uStack_2f768 = uStack_48058;
  uStack_2f198 = uStack_47fe0;
  uStack_2e8e0 = uStack_47f68;
  uStack_2e5f8 = uStack_47ef0;
  uStack_2e310 = uStack_47e78;
  uStack_2dd40 = uStack_47e00;
  uStack_2da58 = uStack_47d88;
  uStack_2d488 = uStack_47d10;
  uStack_2cbd0 = uStack_47c98;
  uStack_2c8e8 = uStack_47c20;
  uStack_2c318 = uStack_47ba8;
  uStack_2ba60 = uStack_47b30;
  uStack_3eb80 = uStack_49d60;
  uStack_3da10 = uStack_49b08;
  uStack_3d728 = uStack_49a90;
  uStack_3d440 = uStack_49a18;
  uStack_3ce70 = uStack_499a0;
  uStack_3cb88 = uStack_49928;
  uStack_3c8a0 = uStack_498b0;
  uStack_3c5b8 = uStack_49838;
  uStack_3bfe8 = uStack_497c0;
  uStack_3bd00 = uStack_49748;
  uStack_3ba18 = uStack_496d0;
  uStack_3b448 = uStack_49658;
  uStack_3b160 = uStack_495e0;
  uStack_3ab90 = uStack_49568;
  uStack_3a5c0 = uStack_494f0;
  uStack_3a2d8 = uStack_49478;
  uStack_39ff0 = uStack_49400;
  uStack_39d08 = uStack_49388;
  uStack_39a20 = uStack_49310;
  uStack_39738 = uStack_49298;
  uStack_39168 = uStack_49220;
  uStack_38e80 = uStack_491a8;
  uStack_38b98 = uStack_49130;
  uStack_388b0 = uStack_490b8;
  uStack_385c8 = uStack_49040;
  uStack_37ff8 = uStack_48fc8;
  uStack_37d10 = uStack_48f50;
  uStack_37a28 = uStack_48ed8;
  uStack_362e8 = uStack_48c80;
  uStack_36000 = uStack_48c08;
  uStack_35a30 = uStack_48b90;
  uStack_35178 = uStack_48b18;
  uStack_34e90 = uStack_48aa0;
  uStack_34ba8 = uStack_48a28;
  uStack_348c0 = uStack_489b0;
  uStack_345d8 = uStack_48938;
  uStack_34008 = uStack_488c0;
  uStack_33d20 = uStack_48848;
  uStack_33a38 = uStack_487d0;
  uStack_33750 = uStack_48758;
  uStack_33180 = uStack_486e0;
  uStack_32e98 = uStack_48668;
  uStack_32bb0 = uStack_485f0;
  uStack_325e0 = uStack_48578;
  uStack_322f8 = uStack_48500;
  uStack_31d28 = uStack_48488;
  uStack_31470 = uStack_48410;
  uStack_31188 = uStack_48398;
  uStack_30ea0 = uStack_48320;
  uStack_30bb8 = uStack_482a8;
  uStack_305e8 = uStack_48230;
  uStack_30300 = uStack_481b8;
  uStack_30018 = uStack_48140;
  uStack_2fa48 = uStack_480c8;
  uStack_2f760 = uStack_48050;
  uStack_2f190 = uStack_47fd8;
  uStack_2e8d8 = uStack_47f60;
  uStack_2e5f0 = uStack_47ee8;
  uStack_2e308 = uStack_47e70;
  uStack_2dd38 = uStack_47df8;
  uStack_2da50 = uStack_47d80;
  uStack_2d480 = uStack_47d08;
  uStack_2cbc8 = uStack_47c90;
  uStack_2c8e0 = uStack_47c18;
  uStack_2c310 = uStack_47ba0;
  uStack_2ba58 = uStack_47b28;
  uStack_3e890 = uStack_49ce0;
  uStack_3da08 = uStack_49b00;
  uStack_3d720 = uStack_49a88;
  uStack_3d438 = uStack_49a10;
  uStack_3ce68 = uStack_49998;
  uStack_3cb80 = uStack_49920;
  uStack_3c898 = uStack_498a8;
  uStack_3c5b0 = uStack_49830;
  uStack_3bfe0 = uStack_497b8;
  uStack_3bcf8 = uStack_49740;
  uStack_3ba10 = uStack_496c8;
  uStack_3b440 = uStack_49650;
  uStack_3b158 = uStack_495d8;
  uStack_3ab88 = uStack_49560;
  uStack_3a5b8 = uStack_494e8;
  uStack_3a2d0 = uStack_49470;
  uStack_39fe8 = uStack_493f8;
  uStack_39d00 = uStack_49380;
  uStack_39a18 = uStack_49308;
  uStack_39730 = uStack_49290;
  uStack_39160 = uStack_49218;
  uStack_38e78 = uStack_491a0;
  uStack_38b90 = uStack_49128;
  uStack_388a8 = uStack_490b0;
  uStack_385c0 = uStack_49038;
  uStack_37ff0 = uStack_48fc0;
  uStack_37d08 = uStack_48f48;
  uStack_37a20 = uStack_48ed0;
  uStack_362e0 = uStack_48c78;
  uStack_35ff8 = uStack_48c00;
  uStack_35a28 = uStack_48b88;
  uStack_35170 = uStack_48b10;
  uStack_34e88 = uStack_48a98;
  uStack_34ba0 = uStack_48a20;
  uStack_348b8 = uStack_489a8;
  uStack_345d0 = uStack_48930;
  uStack_34000 = uStack_488b8;
  uStack_33d18 = uStack_48840;
  uStack_33a30 = uStack_487c8;
  uStack_33748 = uStack_48750;
  uStack_33178 = uStack_486d8;
  uStack_32e90 = uStack_48660;
  uStack_32ba8 = uStack_485e8;
  uStack_325d8 = uStack_48570;
  uStack_322f0 = uStack_484f8;
  uStack_31d20 = uStack_48480;
  uStack_31468 = uStack_48408;
  uStack_31180 = uStack_48390;
  uStack_30e98 = uStack_48318;
  uStack_30bb0 = uStack_482a0;
  uStack_305e0 = uStack_48228;
  uStack_302f8 = uStack_481b0;
  uStack_30010 = uStack_48138;
  uStack_2fa40 = uStack_480c0;
  uStack_2f758 = uStack_48048;
  uStack_2f188 = uStack_47fd0;
  uStack_2e8d0 = uStack_47f58;
  uStack_2e5e8 = uStack_47ee0;
  uStack_2e300 = uStack_47e68;
  uStack_2dd30 = uStack_47df0;
  uStack_2da48 = uStack_47d78;
  uStack_2d478 = uStack_47d00;
  uStack_2cbc0 = uStack_47c88;
  uStack_2c8d8 = uStack_47c10;
  uStack_2c308 = uStack_47b98;
  uStack_2ba50 = uStack_47b20;
  uStack_3e5a0 = uStack_49c60;
  uStack_3da00 = uStack_49af8;
  uStack_3d718 = uStack_49a80;
  uStack_3d430 = uStack_49a08;
  uStack_3ce60 = uStack_49990;
  uStack_3cb78 = uStack_49918;
  uStack_3c890 = uStack_498a0;
  uStack_3c5a8 = uStack_49828;
  uStack_3bfd8 = uStack_497b0;
  uStack_3bcf0 = uStack_49738;
  uStack_3ba08 = uStack_496c0;
  uStack_3b438 = uStack_49648;
  uStack_3b150 = uStack_495d0;
  uStack_3ab80 = uStack_49558;
  uStack_3a5b0 = uStack_494e0;
  uStack_3a2c8 = uStack_49468;
  uStack_39fe0 = uStack_493f0;
  uStack_39cf8 = uStack_49378;
  uStack_39a10 = uStack_49300;
  uStack_39728 = uStack_49288;
  uStack_39158 = uStack_49210;
  uStack_38e70 = uStack_49198;
  uStack_38b88 = uStack_49120;
  uStack_388a0 = uStack_490a8;
  uStack_385b8 = uStack_49030;
  uStack_37fe8 = uStack_48fb8;
  uStack_37d00 = uStack_48f40;
  uStack_37a18 = uStack_48ec8;
  uStack_362d8 = uStack_48c70;
  uStack_35ff0 = uStack_48bf8;
  uStack_35a20 = uStack_48b80;
  uStack_35168 = uStack_48b08;
  uStack_34e80 = uStack_48a90;
  uStack_34b98 = uStack_48a18;
  uStack_348b0 = uStack_489a0;
  uStack_345c8 = uStack_48928;
  uStack_33ff8 = uStack_488b0;
  uStack_33d10 = uStack_48838;
  uStack_33a28 = uStack_487c0;
  uStack_33740 = uStack_48748;
  uStack_33170 = uStack_486d0;
  uStack_32e88 = uStack_48658;
  uStack_32ba0 = uStack_485e0;
  uStack_325d0 = uStack_48568;
  uStack_322e8 = uStack_484f0;
  uStack_31d18 = uStack_48478;
  uStack_31460 = uStack_48400;
  uStack_31178 = uStack_48388;
  uStack_30e90 = uStack_48310;
  uStack_30ba8 = uStack_48298;
  uStack_305d8 = uStack_48220;
  uStack_302f0 = uStack_481a8;
  uStack_30008 = uStack_48130;
  uStack_2fa38 = uStack_480b8;
  uStack_2f750 = uStack_48040;
  uStack_2f180 = uStack_47fc8;
  uStack_2e8c8 = uStack_47f50;
  uStack_2e5e0 = uStack_47ed8;
  uStack_2e2f8 = uStack_47e60;
  uStack_2dd28 = uStack_47de8;
  uStack_2da40 = uStack_47d70;
  uStack_2d470 = uStack_47cf8;
  uStack_2cbb8 = uStack_47c80;
  uStack_2c8d0 = uStack_47c08;
  uStack_2c300 = uStack_47b90;
  uStack_2ba48 = uStack_47b18;
  uStack_3dfc8 = uStack_49be0;
  uStack_3d9f8 = uStack_49af0;
  uStack_3d710 = uStack_49a78;
  uStack_3d428 = uStack_49a00;
  uStack_3ce58 = uStack_49988;
  uStack_3cb70 = uStack_49910;
  uStack_3c888 = uStack_49898;
  uStack_3c5a0 = uStack_49820;
  uStack_3bfd0 = uStack_497a8;
  uStack_3bce8 = uStack_49730;
  uStack_3ba00 = uStack_496b8;
  uStack_3b430 = uStack_49640;
  uStack_3b148 = uStack_495c8;
  uStack_3ab78 = uStack_49550;
  uStack_3a5a8 = uStack_494d8;
  uStack_3a2c0 = uStack_49460;
  uStack_39fd8 = uStack_493e8;
  uStack_39cf0 = uStack_49370;
  uStack_39a08 = uStack_492f8;
  uStack_39720 = uStack_49280;
  uStack_39150 = uStack_49208;
  uStack_38e68 = uStack_49190;
  uStack_38b80 = uStack_49118;
  uStack_38898 = uStack_490a0;
  uStack_385b0 = uStack_49028;
  uStack_37fe0 = uStack_48fb0;
  uStack_37cf8 = uStack_48f38;
  uStack_37a10 = uStack_48ec0;
  uStack_362d0 = uStack_48c68;
  uStack_35fe8 = uStack_48bf0;
  uStack_35a18 = uStack_48b78;
  uStack_35160 = uStack_48b00;
  uStack_34e78 = uStack_48a88;
  uStack_34b90 = uStack_48a10;
  uStack_348a8 = uStack_48998;
  uStack_345c0 = uStack_48920;
  uStack_33ff0 = uStack_488a8;
  uStack_33d08 = uStack_48830;
  uStack_33a20 = uStack_487b8;
  uStack_33738 = uStack_48740;
  uStack_33168 = uStack_486c8;
  uStack_32e80 = uStack_48650;
  uStack_32b98 = uStack_485d8;
  uStack_325c8 = uStack_48560;
  uStack_322e0 = uStack_484e8;
  uStack_31d10 = uStack_48470;
  uStack_31458 = uStack_483f8;
  uStack_31170 = uStack_48380;
  uStack_30e88 = uStack_48308;
  uStack_30ba0 = uStack_48290;
  uStack_305d0 = uStack_48218;
  uStack_302e8 = uStack_481a0;
  uStack_30000 = uStack_48128;
  uStack_2fa30 = uStack_480b0;
  uStack_2f748 = uStack_48038;
  uStack_2f178 = uStack_47fc0;
  uStack_2e8c0 = uStack_47f48;
  uStack_2e5d8 = uStack_47ed0;
  uStack_2e2f0 = uStack_47e58;
  uStack_2dd20 = uStack_47de0;
  uStack_2da38 = uStack_47d68;
  uStack_2d468 = uStack_47cf0;
  uStack_2cbb0 = uStack_47c78;
  uStack_2c8c8 = uStack_47c00;
  uStack_2c2f8 = uStack_47b88;
  uStack_2ba40 = uStack_47b10;
  uStack_3dcd8 = uStack_49b60;
  uStack_3d9f0 = uStack_49ae8;
  uStack_3d708 = uStack_49a70;
  uStack_3d420 = uStack_499f8;
  uStack_3ce50 = uStack_49980;
  uStack_3cb68 = uStack_49908;
  uStack_3c880 = uStack_49890;
  uStack_3c598 = uStack_49818;
  uStack_3bfc8 = uStack_497a0;
  uStack_3bce0 = uStack_49728;
  uStack_3b9f8 = uStack_496b0;
  uStack_3b428 = uStack_49638;
  uStack_3b140 = uStack_495c0;
  uStack_3ab70 = uStack_49548;
  uStack_3a5a0 = uStack_494d0;
  uStack_3a2b8 = uStack_49458;
  uStack_39fd0 = uStack_493e0;
  uStack_39ce8 = uStack_49368;
  uStack_39a00 = uStack_492f0;
  uStack_39718 = uStack_49278;
  uStack_39148 = uStack_49200;
  uStack_38e60 = uStack_49188;
  uStack_38b78 = uStack_49110;
  uStack_38890 = uStack_49098;
  uStack_385a8 = uStack_49020;
  uStack_37fd8 = uStack_48fa8;
  uStack_37cf0 = uStack_48f30;
  uStack_37a08 = uStack_48eb8;
  uStack_362c8 = uStack_48c60;
  uStack_35fe0 = uStack_48be8;
  uStack_35a10 = uStack_48b70;
  uStack_35158 = uStack_48af8;
  uStack_34e70 = uStack_48a80;
  uStack_34b88 = uStack_48a08;
  uStack_348a0 = uStack_48990;
  uStack_345b8 = uStack_48918;
  uStack_33fe8 = uStack_488a0;
  uStack_33d00 = uStack_48828;
  uStack_33a18 = uStack_487b0;
  uStack_33730 = uStack_48738;
  uStack_33160 = uStack_486c0;
  uStack_32e78 = uStack_48648;
  uStack_32b90 = uStack_485d0;
  uStack_325c0 = uStack_48558;
  uStack_322d8 = uStack_484e0;
  uStack_31d08 = uStack_48468;
  uStack_31450 = uStack_483f0;
  uStack_31168 = uStack_48378;
  uStack_30e80 = uStack_48300;
  uStack_30b98 = uStack_48288;
  uStack_305c8 = uStack_48210;
  uStack_302e0 = uStack_48198;
  uStack_2fff8 = uStack_48120;
  uStack_2fa28 = uStack_480a8;
  uStack_2f740 = uStack_48030;
  uStack_2f170 = uStack_47fb8;
  uStack_2e8b8 = uStack_47f40;
  uStack_2e5d0 = uStack_47ec8;
  uStack_2e2e8 = uStack_47e50;
  uStack_2dd18 = uStack_47dd8;
  uStack_2da30 = uStack_47d60;
  uStack_2d460 = uStack_47ce8;
  uStack_2cba8 = uStack_47c70;
  uStack_2c8c0 = uStack_47bf8;
  uStack_2c2f0 = uStack_47b80;
  uStack_2ba38 = uStack_47b08;
  uStack_3a598 = auStack_4a260[0];
  uStack_37a00 = uStack_49b58;
  uStack_365a8 = uStack_49888;
  uStack_362c0 = uStack_49810;
  uStack_35fd8 = uStack_49798;
  uStack_35cf0 = uStack_49720;
  uStack_35a08 = uStack_496a8;
  uStack_35720 = uStack_49630;
  uStack_35438 = uStack_495b8;
  uStack_35150 = uStack_49540;
  uStack_34e68 = uStack_494c8;
  uStack_34b80 = uStack_49450;
  uStack_34898 = uStack_493d8;
  uStack_345b0 = uStack_49360;
  uStack_342c8 = uStack_492e8;
  uStack_33fe0 = uStack_49270;
  uStack_33cf8 = uStack_491f8;
  uStack_33a10 = uStack_49180;
  uStack_33728 = uStack_49108;
  uStack_33440 = uStack_49090;
  uStack_33158 = uStack_49018;
  uStack_32e70 = uStack_48fa0;
  uStack_32b88 = uStack_48f28;
  uStack_328a0 = uStack_48eb0;
  uStack_325b8 = uStack_48e38;
  uStack_322d0 = uStack_48dc0;
  uStack_31fe8 = uStack_48d48;
  uStack_31d00 = uStack_48cd0;
  uStack_31a18 = uStack_48c58;
  uStack_31730 = uStack_48be0;
  uStack_31448 = uStack_48b68;
  uStack_31160 = uStack_48af0;
  uStack_30e78 = uStack_48a78;
  uStack_30b90 = uStack_48a00;
  uStack_308a8 = uStack_48988;
  uStack_305c0 = uStack_48910;
  uStack_302d8 = uStack_48898;
  uStack_2fff0 = uStack_48820;
  uStack_2fd08 = uStack_487a8;
  uStack_2fa20 = uStack_48730;
  uStack_2f738 = uStack_486b8;
  uStack_2f450 = uStack_48640;
  uStack_2f168 = uStack_485c8;
  uStack_2ee80 = uStack_48550;
  uStack_2eb98 = uStack_484d8;
  uStack_2e8b0 = uStack_48460;
  uStack_2e5c8 = uStack_483e8;
  uStack_2e2e0 = uStack_48370;
  uStack_2dff8 = uStack_482f8;
  uStack_2dd10 = uStack_48280;
  uStack_2da28 = uStack_48208;
  uStack_2d740 = uStack_48190;
  uStack_2d458 = uStack_48118;
  uStack_2d170 = uStack_480a0;
  uStack_2ce88 = uStack_48028;
  uStack_2cba0 = uStack_47fb0;
  uStack_2c8b8 = uStack_47f38;
  uStack_2c5d0 = uStack_47ec0;
  uStack_2c2e8 = uStack_47e48;
  uStack_2c000 = uStack_47dd0;
  uStack_2bd18 = uStack_47d58;
  uStack_2ba30 = uStack_47ce0;
  uStack_2b748 = uStack_47c68;
  uStack_2b460 = uStack_47bf0;
  uStack_2b178 = uStack_47b78;
  uStack_3a2a8 = uStack_4a1e0;
  uStack_379f8 = uStack_49b50;
  uStack_365a0 = uStack_49880;
  uStack_362b8 = uStack_49808;
  uStack_35fd0 = uStack_49790;
  uStack_35ce8 = uStack_49718;
  uStack_35a00 = uStack_496a0;
  uStack_35718 = uStack_49628;
  uStack_35430 = uStack_495b0;
  uStack_35148 = uStack_49538;
  uStack_34e60 = uStack_494c0;
  uStack_34b78 = uStack_49448;
  uStack_34890 = uStack_493d0;
  uStack_345a8 = uStack_49358;
  uStack_342c0 = uStack_492e0;
  uStack_33fd8 = uStack_49268;
  uStack_33cf0 = uStack_491f0;
  uStack_33a08 = uStack_49178;
  uStack_33720 = uStack_49100;
  uStack_33438 = uStack_49088;
  uStack_33150 = uStack_49010;
  uStack_32e68 = uStack_48f98;
  uStack_32b80 = uStack_48f20;
  uStack_32898 = uStack_48ea8;
  uStack_325b0 = uStack_48e30;
  uStack_322c8 = uStack_48db8;
  uStack_31fe0 = uStack_48d40;
  uStack_31cf8 = uStack_48cc8;
  uStack_31a10 = uStack_48c50;
  uStack_31728 = uStack_48bd8;
  uStack_31440 = uStack_48b60;
  uStack_31158 = uStack_48ae8;
  uStack_30e70 = uStack_48a70;
  uStack_30b88 = uStack_489f8;
  uStack_308a0 = uStack_48980;
  uStack_305b8 = uStack_48908;
  uStack_302d0 = uStack_48890;
  uStack_2ffe8 = uStack_48818;
  uStack_2fd00 = uStack_487a0;
  uStack_2fa18 = uStack_48728;
  uStack_2f730 = uStack_486b0;
  uStack_2f448 = uStack_48638;
  uStack_2f160 = uStack_485c0;
  uStack_2ee78 = uStack_48548;
  uStack_2eb90 = uStack_484d0;
  uStack_2e8a8 = uStack_48458;
  uStack_2e5c0 = uStack_483e0;
  uStack_2e2d8 = uStack_48368;
  uStack_2dff0 = uStack_482f0;
  uStack_2dd08 = uStack_48278;
  uStack_2da20 = uStack_48200;
  uStack_2d738 = uStack_48188;
  uStack_2d450 = uStack_48110;
  uStack_2d168 = uStack_48098;
  uStack_2ce80 = uStack_48020;
  uStack_2cb98 = uStack_47fa8;
  uStack_2c8b0 = uStack_47f30;
  uStack_2c5c8 = uStack_47eb8;
  uStack_2c2e0 = uStack_47e40;
  uStack_2bff8 = uStack_47dc8;
  uStack_2bd10 = uStack_47d50;
  uStack_2ba28 = uStack_47cd8;
  uStack_2b740 = uStack_47c60;
  uStack_2b458 = uStack_47be8;
  uStack_2b170 = uStack_47b70;
  uStack_39fb8 = uStack_4a160;
  uStack_379f0 = uStack_49b48;
  uStack_36598 = uStack_49878;
  uStack_362b0 = uStack_49800;
  uStack_35fc8 = uStack_49788;
  uStack_35ce0 = uStack_49710;
  uStack_359f8 = uStack_49698;
  uStack_35710 = uStack_49620;
  uStack_35428 = uStack_495a8;
  uStack_35140 = uStack_49530;
  uStack_34e58 = uStack_494b8;
  uStack_34b70 = uStack_49440;
  uStack_34888 = uStack_493c8;
  uStack_345a0 = uStack_49350;
  uStack_342b8 = uStack_492d8;
  uStack_33fd0 = uStack_49260;
  uStack_33ce8 = uStack_491e8;
  uStack_33a00 = uStack_49170;
  uStack_33718 = uStack_490f8;
  uStack_33430 = uStack_49080;
  uStack_33148 = uStack_49008;
  uStack_32e60 = uStack_48f90;
  uStack_32b78 = uStack_48f18;
  uStack_32890 = uStack_48ea0;
  uStack_325a8 = uStack_48e28;
  uStack_322c0 = uStack_48db0;
  uStack_31fd8 = uStack_48d38;
  uStack_31cf0 = uStack_48cc0;
  uStack_31a08 = uStack_48c48;
  uStack_31720 = uStack_48bd0;
  uStack_31438 = uStack_48b58;
  uStack_31150 = uStack_48ae0;
  uStack_30e68 = uStack_48a68;
  uStack_30b80 = uStack_489f0;
  uStack_30898 = uStack_48978;
  uStack_305b0 = uStack_48900;
  uStack_302c8 = uStack_48888;
  uStack_2ffe0 = uStack_48810;
  uStack_2fcf8 = uStack_48798;
  uStack_2fa10 = uStack_48720;
  uStack_2f728 = uStack_486a8;
  uStack_2f440 = uStack_48630;
  uStack_2f158 = uStack_485b8;
  uStack_2ee70 = uStack_48540;
  uStack_2eb88 = uStack_484c8;
  uStack_2e8a0 = uStack_48450;
  uStack_2e5b8 = uStack_483d8;
  uStack_2e2d0 = uStack_48360;
  uStack_2dfe8 = uStack_482e8;
  uStack_2dd00 = uStack_48270;
  uStack_2da18 = uStack_481f8;
  uStack_2d730 = uStack_48180;
  uStack_2d448 = uStack_48108;
  uStack_2d160 = uStack_48090;
  uStack_2ce78 = uStack_48018;
  uStack_2cb90 = uStack_47fa0;
  uStack_2c8a8 = uStack_47f28;
  uStack_2c5c0 = uStack_47eb0;
  uStack_2c2d8 = uStack_47e38;
  uStack_2bff0 = uStack_47dc0;
  uStack_2bd08 = uStack_47d48;
  uStack_2ba20 = uStack_47cd0;
  uStack_2b738 = uStack_47c58;
  uStack_2b450 = uStack_47be0;
  uStack_2b168 = uStack_47b68;
  uStack_39cc8 = uStack_4a0e0;
  uStack_379e8 = uStack_49b40;
  uStack_36590 = uStack_49870;
  uStack_362a8 = uStack_497f8;
  uStack_35fc0 = uStack_49780;
  uStack_35cd8 = uStack_49708;
  uStack_359f0 = uStack_49690;
  uStack_35708 = uStack_49618;
  uStack_35420 = uStack_495a0;
  uStack_35138 = uStack_49528;
  uStack_34e50 = uStack_494b0;
  uStack_34b68 = uStack_49438;
  uStack_34880 = uStack_493c0;
  uStack_34598 = uStack_49348;
  uStack_342b0 = uStack_492d0;
  uStack_33fc8 = uStack_49258;
  uStack_33ce0 = uStack_491e0;
  uStack_339f8 = uStack_49168;
  uStack_33710 = uStack_490f0;
  uStack_33428 = uStack_49078;
  uStack_33140 = uStack_49000;
  uStack_32e58 = uStack_48f88;
  uStack_32b70 = uStack_48f10;
  uStack_32888 = uStack_48e98;
  uStack_325a0 = uStack_48e20;
  uStack_322b8 = uStack_48da8;
  uStack_31fd0 = uStack_48d30;
  uStack_31ce8 = uStack_48cb8;
  uStack_31a00 = uStack_48c40;
  uStack_31718 = uStack_48bc8;
  uStack_31430 = uStack_48b50;
  uStack_31148 = uStack_48ad8;
  uStack_30e60 = uStack_48a60;
  uStack_30b78 = uStack_489e8;
  uStack_30890 = uStack_48970;
  uStack_305a8 = uStack_488f8;
  uStack_302c0 = uStack_48880;
  uStack_2ffd8 = uStack_48808;
  uStack_2fcf0 = uStack_48790;
  uStack_2fa08 = uStack_48718;
  uStack_2f720 = uStack_486a0;
  uStack_2f438 = uStack_48628;
  uStack_2f150 = uStack_485b0;
  uStack_2ee68 = uStack_48538;
  uStack_2eb80 = uStack_484c0;
  uStack_2e898 = uStack_48448;
  uStack_2e5b0 = uStack_483d0;
  uStack_2e2c8 = uStack_48358;
  uStack_2dfe0 = uStack_482e0;
  uStack_2dcf8 = uStack_48268;
  uStack_2da10 = uStack_481f0;
  uStack_2d728 = uStack_48178;
  uStack_2d440 = uStack_48100;
  uStack_2d158 = uStack_48088;
  uStack_2ce70 = uStack_48010;
  uStack_2cb88 = uStack_47f98;
  uStack_2c8a0 = uStack_47f20;
  uStack_2c5b8 = uStack_47ea8;
  uStack_2c2d0 = uStack_47e30;
  uStack_2bfe8 = uStack_47db8;
  uStack_2bd00 = uStack_47d40;
  uStack_2ba18 = uStack_47cc8;
  uStack_2b730 = uStack_47c50;
  uStack_2b448 = uStack_47bd8;
  uStack_2b160 = uStack_47b60;
  uStack_399d8 = uStack_4a060;
  uStack_379e0 = uStack_49b38;
  uStack_36588 = uStack_49868;
  uStack_362a0 = uStack_497f0;
  uStack_35fb8 = uStack_49778;
  uStack_35cd0 = uStack_49700;
  uStack_359e8 = uStack_49688;
  uStack_35700 = uStack_49610;
  uStack_35418 = uStack_49598;
  uStack_35130 = uStack_49520;
  uStack_34e48 = uStack_494a8;
  uStack_34b60 = uStack_49430;
  uStack_34878 = uStack_493b8;
  uStack_34590 = uStack_49340;
  uStack_342a8 = uStack_492c8;
  uStack_33fc0 = uStack_49250;
  uStack_33cd8 = uStack_491d8;
  uStack_339f0 = uStack_49160;
  uStack_33708 = uStack_490e8;
  uStack_33420 = uStack_49070;
  uStack_33138 = uStack_48ff8;
  uStack_32e50 = uStack_48f80;
  uStack_32b68 = uStack_48f08;
  uStack_32880 = uStack_48e90;
  uStack_32598 = uStack_48e18;
  uStack_322b0 = uStack_48da0;
  uStack_31fc8 = uStack_48d28;
  uStack_31ce0 = uStack_48cb0;
  uStack_319f8 = uStack_48c38;
  uStack_31710 = uStack_48bc0;
  uStack_31428 = uStack_48b48;
  uStack_31140 = uStack_48ad0;
  uStack_30e58 = uStack_48a58;
  uStack_30b70 = uStack_489e0;
  uStack_30888 = uStack_48968;
  uStack_305a0 = uStack_488f0;
  uStack_302b8 = uStack_48878;
  uStack_2ffd0 = uStack_48800;
  uStack_2fce8 = uStack_48788;
  uStack_2fa00 = uStack_48710;
  uStack_2f718 = uStack_48698;
  uStack_2f430 = uStack_48620;
  uStack_2f148 = uStack_485a8;
  uStack_2ee60 = uStack_48530;
  uStack_2eb78 = uStack_484b8;
  uStack_2e890 = uStack_48440;
  uStack_2e5a8 = uStack_483c8;
  uStack_2e2c0 = uStack_48350;
  uStack_2dfd8 = uStack_482d8;
  uStack_2dcf0 = uStack_48260;
  uStack_2da08 = uStack_481e8;
  uStack_2d720 = uStack_48170;
  uStack_2d438 = uStack_480f8;
  uStack_2d150 = uStack_48080;
  uStack_2ce68 = uStack_48008;
  uStack_2cb80 = uStack_47f90;
  uStack_2c898 = uStack_47f18;
  uStack_2c5b0 = uStack_47ea0;
  uStack_2c2c8 = uStack_47e28;
  uStack_2bfe0 = uStack_47db0;
  uStack_2bcf8 = uStack_47d38;
  uStack_2ba10 = uStack_47cc0;
  uStack_2b728 = uStack_47c48;
  uStack_2b440 = uStack_47bd0;
  uStack_2b158 = uStack_47b58;
  uStack_396e8 = uStack_49fe0;
  uStack_379d8 = uStack_49b30;
  uStack_36580 = uStack_49860;
  uStack_36298 = uStack_497e8;
  uStack_35fb0 = uStack_49770;
  uStack_35cc8 = uStack_496f8;
  uStack_359e0 = uStack_49680;
  uStack_356f8 = uStack_49608;
  uStack_35410 = uStack_49590;
  uStack_35128 = uStack_49518;
  uStack_34e40 = uStack_494a0;
  uStack_34b58 = uStack_49428;
  uStack_34870 = uStack_493b0;
  uStack_34588 = uStack_49338;
  uStack_342a0 = uStack_492c0;
  uStack_33fb8 = uStack_49248;
  uStack_33cd0 = uStack_491d0;
  uStack_339e8 = uStack_49158;
  uStack_33700 = uStack_490e0;
  uStack_33418 = uStack_49068;
  uStack_33130 = uStack_48ff0;
  uStack_32e48 = uStack_48f78;
  uStack_32b60 = uStack_48f00;
  uStack_32878 = uStack_48e88;
  uStack_32590 = uStack_48e10;
  uStack_322a8 = uStack_48d98;
  uStack_31fc0 = uStack_48d20;
  uStack_31cd8 = uStack_48ca8;
  uStack_319f0 = uStack_48c30;
  uStack_31708 = uStack_48bb8;
  uStack_31420 = uStack_48b40;
  uStack_31138 = uStack_48ac8;
  uStack_30e50 = uStack_48a50;
  uStack_30b68 = uStack_489d8;
  uStack_30880 = uStack_48960;
  uStack_30598 = uStack_488e8;
  uStack_302b0 = uStack_48870;
  uStack_2ffc8 = uStack_487f8;
  uStack_2fce0 = uStack_48780;
  uStack_2f9f8 = uStack_48708;
  uStack_2f710 = uStack_48690;
  uStack_2f428 = uStack_48618;
  uStack_2f140 = uStack_485a0;
  uStack_2ee58 = uStack_48528;
  uStack_2eb70 = uStack_484b0;
  uStack_2e888 = uStack_48438;
  uStack_2e5a0 = uStack_483c0;
  uStack_2e2b8 = uStack_48348;
  uStack_2dfd0 = uStack_482d0;
  uStack_2dce8 = uStack_48258;
  uStack_2da00 = uStack_481e0;
  uStack_2d718 = uStack_48168;
  uStack_2d430 = uStack_480f0;
  uStack_2d148 = uStack_48078;
  uStack_2ce60 = uStack_48000;
  uStack_2cb78 = uStack_47f88;
  uStack_2c890 = uStack_47f10;
  uStack_2c5a8 = uStack_47e98;
  uStack_2c2c0 = uStack_47e20;
  uStack_2bfd8 = uStack_47da8;
  uStack_2bcf0 = uStack_47d30;
  uStack_2ba08 = uStack_47cb8;
  uStack_2b720 = uStack_47c40;
  uStack_2b438 = uStack_47bc8;
  uStack_2b150 = uStack_47b50;
  uStack_393f8 = uStack_49f60;
  uStack_379d0 = uStack_49b28;
  uStack_36578 = uStack_49858;
  uStack_36290 = uStack_497e0;
  uStack_35fa8 = uStack_49768;
  uStack_35cc0 = uStack_496f0;
  uStack_359d8 = uStack_49678;
  uStack_356f0 = uStack_49600;
  uStack_35408 = uStack_49588;
  uStack_35120 = uStack_49510;
  uStack_34e38 = uStack_49498;
  uStack_34b50 = uStack_49420;
  uStack_34868 = uStack_493a8;
  uStack_34580 = uStack_49330;
  uStack_34298 = uStack_492b8;
  uStack_33fb0 = uStack_49240;
  uStack_33cc8 = uStack_491c8;
  uStack_339e0 = uStack_49150;
  uStack_336f8 = uStack_490d8;
  uStack_33410 = uStack_49060;
  uStack_33128 = uStack_48fe8;
  uStack_32e40 = uStack_48f70;
  uStack_32b58 = uStack_48ef8;
  uStack_32870 = uStack_48e80;
  uStack_32588 = uStack_48e08;
  uStack_322a0 = uStack_48d90;
  uStack_31fb8 = uStack_48d18;
  uStack_31cd0 = uStack_48ca0;
  uStack_319e8 = uStack_48c28;
  uStack_31700 = uStack_48bb0;
  uStack_31418 = uStack_48b38;
  uStack_31130 = uStack_48ac0;
  uStack_30e48 = uStack_48a48;
  uStack_30b60 = uStack_489d0;
  uStack_30878 = uStack_48958;
  uStack_30590 = uStack_488e0;
  uStack_302a8 = uStack_48868;
  uStack_2ffc0 = uStack_487f0;
  uStack_2fcd8 = uStack_48778;
  uStack_2f9f0 = uStack_48700;
  uStack_2f708 = uStack_48688;
  uStack_2f420 = uStack_48610;
  uStack_2f138 = uStack_48598;
  uStack_2ee50 = uStack_48520;
  uStack_2eb68 = uStack_484a8;
  uStack_2e880 = uStack_48430;
  uStack_2e598 = uStack_483b8;
  uStack_2e2b0 = uStack_48340;
  uStack_2dfc8 = uStack_482c8;
  uStack_2dce0 = uStack_48250;
  uStack_2d9f8 = uStack_481d8;
  uStack_2d710 = uStack_48160;
  uStack_2d428 = uStack_480e8;
  uStack_2d140 = uStack_48070;
  uStack_2ce58 = uStack_47ff8;
  uStack_2cb70 = uStack_47f80;
  uStack_2c888 = uStack_47f08;
  uStack_2c5a0 = uStack_47e90;
  uStack_2c2b8 = uStack_47e18;
  uStack_2bfd0 = uStack_47da0;
  uStack_2bce8 = uStack_47d28;
  uStack_2ba00 = uStack_47cb0;
  uStack_2b718 = uStack_47c38;
  uStack_2b430 = uStack_47bc0;
  uStack_2b148 = uStack_47b48;
  uStack_39108 = uStack_49ee0;
  uStack_379c8 = uStack_49b20;
  uStack_36570 = uStack_49850;
  uStack_36288 = uStack_497d8;
  uStack_35fa0 = uStack_49760;
  uStack_35cb8 = uStack_496e8;
  uStack_359d0 = uStack_49670;
  uStack_356e8 = uStack_495f8;
  uStack_35400 = uStack_49580;
  uStack_35118 = uStack_49508;
  uStack_34e30 = uStack_49490;
  uStack_34b48 = uStack_49418;
  uStack_34860 = uStack_493a0;
  uStack_34578 = uStack_49328;
  uStack_34290 = uStack_492b0;
  uStack_33fa8 = uStack_49238;
  uStack_33cc0 = uStack_491c0;
  uStack_339d8 = uStack_49148;
  uStack_336f0 = uStack_490d0;
  uStack_33408 = uStack_49058;
  uStack_33120 = uStack_48fe0;
  uStack_32e38 = uStack_48f68;
  uStack_32b50 = uStack_48ef0;
  uStack_32868 = uStack_48e78;
  uStack_32580 = uStack_48e00;
  uStack_32298 = uStack_48d88;
  uStack_31fb0 = uStack_48d10;
  uStack_31cc8 = uStack_48c98;
  uStack_319e0 = uStack_48c20;
  uStack_316f8 = uStack_48ba8;
  uStack_31410 = uStack_48b30;
  uStack_31128 = uStack_48ab8;
  uStack_30e40 = uStack_48a40;
  uStack_30b58 = uStack_489c8;
  uStack_30870 = uStack_48950;
  uStack_30588 = uStack_488d8;
  uStack_302a0 = uStack_48860;
  uStack_2ffb8 = uStack_487e8;
  uStack_2fcd0 = uStack_48770;
  uStack_2f9e8 = uStack_486f8;
  uStack_2f700 = uStack_48680;
  uStack_2f418 = uStack_48608;
  uStack_2f130 = uStack_48590;
  uStack_2ee48 = uStack_48518;
  uStack_2eb60 = uStack_484a0;
  uStack_2e878 = uStack_48428;
  uStack_2e590 = uStack_483b0;
  uStack_2e2a8 = uStack_48338;
  uStack_2dfc0 = uStack_482c0;
  uStack_2dcd8 = uStack_48248;
  uStack_2d9f0 = uStack_481d0;
  uStack_2d708 = uStack_48158;
  uStack_2d420 = uStack_480e0;
  uStack_2d138 = uStack_48068;
  uStack_2ce50 = uStack_47ff0;
  uStack_2cb68 = uStack_47f78;
  uStack_2c880 = uStack_47f00;
  uStack_2c598 = uStack_47e88;
  uStack_2c2b0 = uStack_47e10;
  uStack_2bfc8 = uStack_47d98;
  uStack_2bce0 = uStack_47d20;
  uStack_2b9f8 = uStack_47ca8;
  uStack_2b710 = uStack_47c30;
  uStack_2b428 = uStack_47bb8;
  uStack_2b140 = uStack_47b40;
  uStack_38e18 = uStack_49e60;
  uStack_379c0 = uStack_49b18;
  uStack_36568 = uStack_49848;
  uStack_36280 = uStack_497d0;
  uStack_35f98 = uStack_49758;
  uStack_35cb0 = uStack_496e0;
  uStack_359c8 = uStack_49668;
  uStack_356e0 = uStack_495f0;
  uStack_353f8 = uStack_49578;
  uStack_35110 = uStack_49500;
  uStack_34e28 = uStack_49488;
  uStack_34b40 = uStack_49410;
  uStack_34858 = uStack_49398;
  uStack_34570 = uStack_49320;
  uStack_34288 = uStack_492a8;
  uStack_33fa0 = uStack_49230;
  uStack_33cb8 = uStack_491b8;
  uStack_339d0 = uStack_49140;
  uStack_336e8 = uStack_490c8;
  uStack_33400 = uStack_49050;
  uStack_33118 = uStack_48fd8;
  uStack_32e30 = uStack_48f60;
  uStack_32b48 = uStack_48ee8;
  uStack_32860 = uStack_48e70;
  uStack_32578 = uStack_48df8;
  uStack_32290 = uStack_48d80;
  uStack_31fa8 = uStack_48d08;
  uStack_31cc0 = uStack_48c90;
  uStack_319d8 = uStack_48c18;
  uStack_316f0 = uStack_48ba0;
  uStack_31408 = uStack_48b28;
  uStack_31120 = uStack_48ab0;
  uStack_30e38 = uStack_48a38;
  uStack_30b50 = uStack_489c0;
  uStack_30868 = uStack_48948;
  uStack_30580 = uStack_488d0;
  uStack_30298 = uStack_48858;
  uStack_2ffb0 = uStack_487e0;
  uStack_2fcc8 = uStack_48768;
  uStack_2f9e0 = uStack_486f0;
  uStack_2f6f8 = uStack_48678;
  uStack_2f410 = uStack_48600;
  uStack_2f128 = uStack_48588;
  uStack_2ee40 = uStack_48510;
  uStack_2eb58 = uStack_48498;
  uStack_2e870 = uStack_48420;
  uStack_2e588 = uStack_483a8;
  uStack_2e2a0 = uStack_48330;
  uStack_2dfb8 = uStack_482b8;
  uStack_2dcd0 = uStack_48240;
  uStack_2d9e8 = uStack_481c8;
  uStack_2d700 = uStack_48150;
  uStack_2d418 = uStack_480d8;
  uStack_2d130 = uStack_48060;
  uStack_2ce48 = uStack_47fe8;
  uStack_2cb60 = uStack_47f70;
  uStack_2c878 = uStack_47ef8;
  uStack_2c590 = uStack_47e80;
  uStack_2c2a8 = uStack_47e08;
  uStack_2bfc0 = uStack_47d90;
  uStack_2bcd8 = uStack_47d18;
  uStack_2b9f0 = uStack_47ca0;
  uStack_2b708 = uStack_47c28;
  uStack_2b420 = uStack_47bb0;
  uStack_2b138 = uStack_47b38;
  uStack_38b28 = uStack_49de0;
  uStack_379b8 = uStack_49b10;
  uStack_36560 = uStack_49840;
  uStack_36278 = uStack_497c8;
  uStack_35f90 = uStack_49750;
  uStack_35ca8 = uStack_496d8;
  uStack_359c0 = uStack_49660;
  uStack_356d8 = uStack_495e8;
  uStack_353f0 = uStack_49570;
  uStack_35108 = uStack_494f8;
  uStack_34e20 = uStack_49480;
  uStack_34b38 = uStack_49408;
  uStack_34850 = uStack_49390;
  uStack_34568 = uStack_49318;
  uStack_34280 = uStack_492a0;
  uStack_33f98 = uStack_49228;
  uStack_33cb0 = uStack_491b0;
  uStack_339c8 = uStack_49138;
  uStack_336e0 = uStack_490c0;
  uStack_333f8 = uStack_49048;
  uStack_33110 = uStack_48fd0;
  uStack_32e28 = uStack_48f58;
  uStack_32b40 = uStack_48ee0;
  uStack_32858 = uStack_48e68;
  uStack_32570 = uStack_48df0;
  uStack_32288 = uStack_48d78;
  uStack_31fa0 = uStack_48d00;
  uStack_31cb8 = uStack_48c88;
  uStack_319d0 = uStack_48c10;
  uStack_316e8 = uStack_48b98;
  uStack_31400 = uStack_48b20;
  uStack_31118 = uStack_48aa8;
  uStack_30e30 = uStack_48a30;
  uStack_30b48 = uStack_489b8;
  uStack_30860 = uStack_48940;
  uStack_30578 = uStack_488c8;
  uStack_30290 = uStack_48850;
  uStack_2ffa8 = uStack_487d8;
  uStack_2fcc0 = uStack_48760;
  uStack_2f9d8 = uStack_486e8;
  uStack_2f6f0 = uStack_48670;
  uStack_2f408 = uStack_485f8;
  uStack_2f120 = uStack_48580;
  uStack_2ee38 = uStack_48508;
  uStack_2eb50 = uStack_48490;
  uStack_2e868 = uStack_48418;
  uStack_2e580 = uStack_483a0;
  uStack_2e298 = uStack_48328;
  uStack_2dfb0 = uStack_482b0;
  uStack_2dcc8 = uStack_48238;
  uStack_2d9e0 = uStack_481c0;
  uStack_2d6f8 = uStack_48148;
  uStack_2d410 = uStack_480d0;
  uStack_2d128 = uStack_48058;
  uStack_2ce40 = uStack_47fe0;
  uStack_2cb58 = uStack_47f68;
  uStack_2c870 = uStack_47ef0;
  uStack_2c588 = uStack_47e78;
  uStack_2c2a0 = uStack_47e00;
  uStack_2bfb8 = uStack_47d88;
  uStack_2bcd0 = uStack_47d10;
  uStack_2b9e8 = uStack_47c98;
  uStack_2b700 = uStack_47c20;
  uStack_2b418 = uStack_47ba8;
  uStack_2b130 = uStack_47b30;
  uStack_38838 = uStack_49d60;
  uStack_379b0 = uStack_49b08;
  uStack_36558 = uStack_49838;
  uStack_36270 = uStack_497c0;
  uStack_35f88 = uStack_49748;
  uStack_35ca0 = uStack_496d0;
  uStack_359b8 = uStack_49658;
  uStack_356d0 = uStack_495e0;
  uStack_353e8 = uStack_49568;
  uStack_35100 = uStack_494f0;
  uStack_34e18 = uStack_49478;
  uStack_34b30 = uStack_49400;
  uStack_34848 = uStack_49388;
  uStack_34560 = uStack_49310;
  uStack_34278 = uStack_49298;
  uStack_33f90 = uStack_49220;
  uStack_33ca8 = uStack_491a8;
  uStack_339c0 = uStack_49130;
  uStack_336d8 = uStack_490b8;
  uStack_333f0 = uStack_49040;
  uStack_33108 = uStack_48fc8;
  uStack_32e20 = uStack_48f50;
  uStack_32b38 = uStack_48ed8;
  uStack_32850 = uStack_48e60;
  uStack_32568 = uStack_48de8;
  uStack_32280 = uStack_48d70;
  uStack_31f98 = uStack_48cf8;
  uStack_31cb0 = uStack_48c80;
  uStack_319c8 = uStack_48c08;
  uStack_316e0 = uStack_48b90;
  uStack_313f8 = uStack_48b18;
  uStack_31110 = uStack_48aa0;
  uStack_30e28 = uStack_48a28;
  uStack_30b40 = uStack_489b0;
  uStack_30858 = uStack_48938;
  uStack_30570 = uStack_488c0;
  uStack_30288 = uStack_48848;
  uStack_2ffa0 = uStack_487d0;
  uStack_2fcb8 = uStack_48758;
  uStack_2f9d0 = uStack_486e0;
  uStack_2f6e8 = uStack_48668;
  uStack_2f400 = uStack_485f0;
  uStack_2f118 = uStack_48578;
  uStack_2ee30 = uStack_48500;
  uStack_2eb48 = uStack_48488;
  uStack_2e860 = uStack_48410;
  uStack_2e578 = uStack_48398;
  uStack_2e290 = uStack_48320;
  uStack_2dfa8 = uStack_482a8;
  uStack_2dcc0 = uStack_48230;
  uStack_2d9d8 = uStack_481b8;
  uStack_2d6f0 = uStack_48140;
  uStack_2d408 = uStack_480c8;
  uStack_2d120 = uStack_48050;
  uStack_2ce38 = uStack_47fd8;
  uStack_2cb50 = uStack_47f60;
  uStack_2c868 = uStack_47ee8;
  uStack_2c580 = uStack_47e70;
  uStack_2c298 = uStack_47df8;
  uStack_2bfb0 = uStack_47d80;
  uStack_2bcc8 = uStack_47d08;
  uStack_2b9e0 = uStack_47c90;
  uStack_2b6f8 = uStack_47c18;
  uStack_2b410 = uStack_47ba0;
  uStack_2b128 = uStack_47b28;
  uStack_38548 = uStack_49ce0;
  uStack_379a8 = uStack_49b00;
  uStack_36550 = uStack_49830;
  uStack_36268 = uStack_497b8;
  uStack_35f80 = uStack_49740;
  uStack_35c98 = uStack_496c8;
  uStack_359b0 = uStack_49650;
  uStack_356c8 = uStack_495d8;
  uStack_353e0 = uStack_49560;
  uStack_350f8 = uStack_494e8;
  uStack_34e10 = uStack_49470;
  uStack_34b28 = uStack_493f8;
  uStack_34840 = uStack_49380;
  uStack_34558 = uStack_49308;
  uStack_34270 = uStack_49290;
  uStack_33f88 = uStack_49218;
  uStack_33ca0 = uStack_491a0;
  uStack_339b8 = uStack_49128;
  uStack_336d0 = uStack_490b0;
  uStack_333e8 = uStack_49038;
  uStack_33100 = uStack_48fc0;
  uStack_32e18 = uStack_48f48;
  uStack_32b30 = uStack_48ed0;
  uStack_32848 = uStack_48e58;
  uStack_32560 = uStack_48de0;
  uStack_32278 = uStack_48d68;
  uStack_31f90 = uStack_48cf0;
  uStack_31ca8 = uStack_48c78;
  uStack_319c0 = uStack_48c00;
  uStack_316d8 = uStack_48b88;
  uStack_313f0 = uStack_48b10;
  uStack_31108 = uStack_48a98;
  uStack_30e20 = uStack_48a20;
  uStack_30b38 = uStack_489a8;
  uStack_30850 = uStack_48930;
  uStack_30568 = uStack_488b8;
  uStack_30280 = uStack_48840;
  uStack_2ff98 = uStack_487c8;
  uStack_2fcb0 = uStack_48750;
  uStack_2f9c8 = uStack_486d8;
  uStack_2f6e0 = uStack_48660;
  uStack_2f3f8 = uStack_485e8;
  uStack_2f110 = uStack_48570;
  uStack_2ee28 = uStack_484f8;
  uStack_2eb40 = uStack_48480;
  uStack_2e858 = uStack_48408;
  uStack_2e570 = uStack_48390;
  uStack_2e288 = uStack_48318;
  uStack_2dfa0 = uStack_482a0;
  uStack_2dcb8 = uStack_48228;
  uStack_2d9d0 = uStack_481b0;
  uStack_2d6e8 = uStack_48138;
  uStack_2d400 = uStack_480c0;
  uStack_2d118 = uStack_48048;
  uStack_2ce30 = uStack_47fd0;
  uStack_2cb48 = uStack_47f58;
  uStack_2c860 = uStack_47ee0;
  uStack_2c578 = uStack_47e68;
  uStack_2c290 = uStack_47df0;
  uStack_2bfa8 = uStack_47d78;
  uStack_2bcc0 = uStack_47d00;
  uStack_2b9d8 = uStack_47c88;
  uStack_2b6f0 = uStack_47c10;
  uStack_2b408 = uStack_47b98;
  uStack_2b120 = uStack_47b20;
  uStack_38258 = uStack_49c60;
  uStack_379a0 = uStack_49af8;
  uStack_36548 = uStack_49828;
  uStack_36260 = uStack_497b0;
  uStack_35f78 = uStack_49738;
  uStack_35c90 = uStack_496c0;
  uStack_359a8 = uStack_49648;
  uStack_356c0 = uStack_495d0;
  uStack_353d8 = uStack_49558;
  uStack_350f0 = uStack_494e0;
  uStack_34e08 = uStack_49468;
  uStack_34b20 = uStack_493f0;
  uStack_34838 = uStack_49378;
  uStack_34550 = uStack_49300;
  uStack_34268 = uStack_49288;
  uStack_33f80 = uStack_49210;
  uStack_33c98 = uStack_49198;
  uStack_339b0 = uStack_49120;
  uStack_336c8 = uStack_490a8;
  uStack_333e0 = uStack_49030;
  uStack_330f8 = uStack_48fb8;
  uStack_32e10 = uStack_48f40;
  uStack_32b28 = uStack_48ec8;
  uStack_32840 = uStack_48e50;
  uStack_32558 = uStack_48dd8;
  uStack_32270 = uStack_48d60;
  uStack_31f88 = uStack_48ce8;
  uStack_31ca0 = uStack_48c70;
  uStack_319b8 = uStack_48bf8;
  uStack_316d0 = uStack_48b80;
  uStack_313e8 = uStack_48b08;
  uStack_31100 = uStack_48a90;
  uStack_30e18 = uStack_48a18;
  uStack_30b30 = uStack_489a0;
  uStack_30848 = uStack_48928;
  uStack_30560 = uStack_488b0;
  uStack_30278 = uStack_48838;
  uStack_2ff90 = uStack_487c0;
  uStack_2fca8 = uStack_48748;
  uStack_2f9c0 = uStack_486d0;
  uStack_2f6d8 = uStack_48658;
  uStack_2f3f0 = uStack_485e0;
  uStack_2f108 = uStack_48568;
  uStack_2ee20 = uStack_484f0;
  uStack_2eb38 = uStack_48478;
  uStack_2e850 = uStack_48400;
  uStack_2e568 = uStack_48388;
  uStack_2e280 = uStack_48310;
  uStack_2df98 = uStack_48298;
  uStack_2dcb0 = uStack_48220;
  uStack_2d9c8 = uStack_481a8;
  uStack_2d6e0 = uStack_48130;
  uStack_2d3f8 = uStack_480b8;
  uStack_2d110 = uStack_48040;
  uStack_2ce28 = uStack_47fc8;
  uStack_2cb40 = uStack_47f50;
  uStack_2c858 = uStack_47ed8;
  uStack_2c570 = uStack_47e60;
  uStack_2c288 = uStack_47de8;
  uStack_2bfa0 = uStack_47d70;
  uStack_2bcb8 = uStack_47cf8;
  uStack_2b9d0 = uStack_47c80;
  uStack_2b6e8 = uStack_47c08;
  uStack_2b400 = uStack_47b90;
  uStack_2b118 = uStack_47b18;
  uStack_37f68 = uStack_49be0;
  uStack_37998 = uStack_49af0;
  uStack_36540 = uStack_49820;
  uStack_36258 = uStack_497a8;
  uStack_35f70 = uStack_49730;
  uStack_35c88 = uStack_496b8;
  uStack_359a0 = uStack_49640;
  uStack_356b8 = uStack_495c8;
  uStack_353d0 = uStack_49550;
  uStack_350e8 = uStack_494d8;
  uStack_34e00 = uStack_49460;
  uStack_34b18 = uStack_493e8;
  uStack_34830 = uStack_49370;
  uStack_34548 = uStack_492f8;
  uStack_34260 = uStack_49280;
  uStack_33f78 = uStack_49208;
  uStack_33c90 = uStack_49190;
  uStack_339a8 = uStack_49118;
  uStack_336c0 = uStack_490a0;
  uStack_333d8 = uStack_49028;
  uStack_330f0 = uStack_48fb0;
  uStack_32e08 = uStack_48f38;
  uStack_32b20 = uStack_48ec0;
  uStack_32838 = uStack_48e48;
  uStack_32550 = uStack_48dd0;
  uStack_32268 = uStack_48d58;
  uStack_31f80 = uStack_48ce0;
  uStack_31c98 = uStack_48c68;
  uStack_319b0 = uStack_48bf0;
  uStack_316c8 = uStack_48b78;
  uStack_313e0 = uStack_48b00;
  uStack_310f8 = uStack_48a88;
  uStack_30e10 = uStack_48a10;
  uStack_30b28 = uStack_48998;
  uStack_30840 = uStack_48920;
  uStack_30558 = uStack_488a8;
  uStack_30270 = uStack_48830;
  uStack_2ff88 = uStack_487b8;
  uStack_2fca0 = uStack_48740;
  uStack_2f9b8 = uStack_486c8;
  uStack_2f6d0 = uStack_48650;
  uStack_2f3e8 = uStack_485d8;
  uStack_2f100 = uStack_48560;
  uStack_2ee18 = uStack_484e8;
  uStack_2eb30 = uStack_48470;
  uStack_2e848 = uStack_483f8;
  uStack_2e560 = uStack_48380;
  uStack_2e278 = uStack_48308;
  uStack_2df90 = uStack_48290;
  uStack_2dca8 = uStack_48218;
  uStack_2d9c0 = uStack_481a0;
  uStack_2d6d8 = uStack_48128;
  uStack_2d3f0 = uStack_480b0;
  uStack_2d108 = uStack_48038;
  uStack_2ce20 = uStack_47fc0;
  uStack_2cb38 = uStack_47f48;
  uStack_2c850 = uStack_47ed0;
  uStack_2c568 = uStack_47e58;
  uStack_2c280 = uStack_47de0;
  uStack_2bf98 = uStack_47d68;
  uStack_2bcb0 = uStack_47cf0;
  uStack_2b9c8 = uStack_47c78;
  uStack_2b6e0 = uStack_47c00;
  uStack_2b3f8 = uStack_47b88;
  uStack_2b110 = uStack_47b10;
  uStack_37c78 = uStack_49b60;
  uStack_37990 = uStack_49ae8;
  uStack_36538 = uStack_49818;
  uStack_36250 = uStack_497a0;
  uStack_35f68 = uStack_49728;
  uStack_35c80 = uStack_496b0;
  uStack_35998 = uStack_49638;
  uStack_356b0 = uStack_495c0;
  uStack_353c8 = uStack_49548;
  uStack_350e0 = uStack_494d0;
  uStack_34df8 = uStack_49458;
  uStack_34b10 = uStack_493e0;
  uStack_34828 = uStack_49368;
  uStack_34540 = uStack_492f0;
  uStack_34258 = uStack_49278;
  uStack_33f70 = uStack_49200;
  uStack_33c88 = uStack_49188;
  uStack_339a0 = uStack_49110;
  uStack_336b8 = uStack_49098;
  uStack_333d0 = uStack_49020;
  uStack_330e8 = uStack_48fa8;
  uStack_32e00 = uStack_48f30;
  uStack_32b18 = uStack_48eb8;
  uStack_32830 = uStack_48e40;
  uStack_32548 = uStack_48dc8;
  uStack_32260 = uStack_48d50;
  uStack_31f78 = uStack_48cd8;
  uStack_31c90 = uStack_48c60;
  uStack_319a8 = uStack_48be8;
  uStack_316c0 = uStack_48b70;
  uStack_313d8 = uStack_48af8;
  uStack_310f0 = uStack_48a80;
  uStack_30e08 = uStack_48a08;
  uStack_30b20 = uStack_48990;
  uStack_30838 = uStack_48918;
  uStack_30550 = uStack_488a0;
  uStack_30268 = uStack_48828;
  uStack_2ff80 = uStack_487b0;
  uStack_2fc98 = uStack_48738;
  uStack_2f9b0 = uStack_486c0;
  uStack_2f6c8 = uStack_48648;
  uStack_2f3e0 = uStack_485d0;
  uStack_2f0f8 = uStack_48558;
  uStack_2ee10 = uStack_484e0;
  uStack_2eb28 = uStack_48468;
  uStack_2e840 = uStack_483f0;
  uStack_2e558 = uStack_48378;
  uStack_2e270 = uStack_48300;
  uStack_2df88 = uStack_48288;
  uStack_2dca0 = uStack_48210;
  uStack_2d9b8 = uStack_48198;
  uStack_2d6d0 = uStack_48120;
  uStack_2d3e8 = uStack_480a8;
  uStack_2d100 = uStack_48030;
  uStack_2ce18 = uStack_47fb8;
  uStack_2cb30 = uStack_47f40;
  uStack_2c848 = uStack_47ec8;
  uStack_2c560 = uStack_47e50;
  uStack_2c278 = uStack_47dd8;
  uStack_2bf90 = uStack_47d60;
  uStack_2bca8 = uStack_47ce8;
  uStack_2b9c0 = uStack_47c70;
  uStack_2b6d8 = uStack_47bf8;
  uStack_2b3f0 = uStack_47b80;
  uStack_2b108 = uStack_47b08;
  auStack_2a168 = ZEXT816(0) << 0x20;
  uStack_2a158 = 0x5d;
  apPStack_2a180[0] = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)&pPStack_47948;
  pPStack_2a170 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)&pPStack_47948;
  Eigen::PartialPivLU<Eigen::Matrix<double,93,93,0,93,93>>::
  PartialPivLU<Eigen::Block<Eigen::Matrix<double,93,157,0,93,157>,93,93,false>>
            (&PStack_111b8,
             (EigenBase<Eigen::Block<Eigen::Matrix<double,_93,_157,_0,_93,_157>,_93,_93,_false>_> *)
             apPStack_2a180);
  CStack_47ae0._0_8_ = auStack_36b00;
  pCStack_47aa8 = &CStack_47ae0;
  uStack_47ac8 = 0;
  uStack_47ac0 = 0x5d;
  uStack_47ab8 = 0x5d;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)&pPStack_47948;
  pPStack_47ab0 = &PStack_111b8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,93,64,0,93,64>>::
  _set_noalias<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,93,93,0,93,93>>,Eigen::Block<Eigen::Matrix<double,93,157,0,93,157>,93,64,false>>>
            ((PlainObjectBase<Eigen::Matrix<double,93,64,0,93,64>> *)apPStack_2a180,
             (DenseBase<Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_>,_Eigen::Block<Eigen::Matrix<double,_93,_157,_0,_93,_157>,_93,_64,_false>_>_>
              *)&pPStack_47ab0);
  CStack_47ae0.m_functor.m_other = 0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,64,64,0,64,64>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,64,64,0,64,64>>>
            (dst,&CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_2a060;
  uStack_47ac8 = 0x24;
  uStack_47ac0 = 0;
  uStack_47ab8 = 1;
  pPStack_47ab0 = (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)dst;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0;
  uStack_47a90 = 0;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f70;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 1);
  uStack_47ac8 = 0x42;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 1;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f68;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 2);
  uStack_47ac8 = 0x43;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 2;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f60;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 3);
  uStack_47ac8 = 0x44;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 3;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f58;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 4);
  uStack_47ac8 = 0x45;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 4;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f50;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 5);
  uStack_47ac8 = 0x46;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 5;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f48;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 6);
  uStack_47ac8 = 0x47;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 6;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f08;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 8);
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array[7]
       = 1.0;
  uStack_47ac8 = 0x4f;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 8;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29f00;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 9);
  uStack_47ac8 = 0x50;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 9;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ef8;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 10);
  uStack_47ac8 = 0x51;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 10;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ef0;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0xb);
  uStack_47ac8 = 0x52;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0xb;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ee8;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0xc);
  uStack_47ac8 = 0x53;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0xc;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ee0;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0xd);
  uStack_47ac8 = 0x54;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0xd;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ed8;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0xe);
  uStack_47ac8 = 0x55;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0xe;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ed0;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0xf);
  uStack_47ac8 = 0x56;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0xf;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ec8;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0x10);
  uStack_47ac8 = 0x57;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0x10;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ec0;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0x11);
  uStack_47ac8 = 0x58;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0x11;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29eb8;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0x12);
  uStack_47ac8 = 0x59;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0x12;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29eb0;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0x13);
  uStack_47ac8 = 0x5a;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0x13;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ea8;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0x14);
  uStack_47ac8 = 0x5b;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0x14;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  CStack_47ae0._0_8_ = auStack_29ea0;
  pPStack_47ab0 =
       (PartialPivLU<Eigen::Matrix<double,_93,_93,_0,_93,_93>_> *)
       ((dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.
        array + 0x15);
  uStack_47ac8 = 0x5c;
  uStack_47ac0 = 0;
  pMStack_47aa0 = dst;
  uStack_47a98 = 0x15;
  uStack_47a90 = 0;
  uStack_47ab8 = 1;
  uStack_47a88 = 1;
  pPStack_47ad0 = (PlainObjectBase<Eigen::Matrix<double,93,157,0,93,157>> *)apPStack_2a180;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>>::operator-=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,64,64,0,64,64>,1,64,false>> *)
             &pPStack_47ab0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_93,_64,_0,_93,_64>,_1,_64,_false>_> *)
             &CStack_47ae0);
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x56] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x97] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xd8] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x119] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x15a] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x19b] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x1dc] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x39d] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x3de] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x41f] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x460] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x4a1] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x4e2] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x523] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x564] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x5a5] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x5e6] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x627] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x668] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x6a9] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x6ea] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x72b] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x8ac] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x8ed] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x92e] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x96f] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x9b0] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0x9f1] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xa32] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xa73] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xab4] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xaf5] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xc36] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xc77] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xcb8] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xcf9] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xd3a] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xd7b] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xe7c] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xebd] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xefe] = 1.0;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>).m_storage.m_data.array
  [0xfbf] = 1.0;
  lVar3 = 0x858;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)
               ((long)&_Stack_2b100._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void
opengv::relative_pose::modules::sixpt::setupAction(
    const std::vector<Eigen::Matrix<double,6,1>,Eigen::aligned_allocator< Eigen::Matrix<double,6,1> > > & L1,
    const std::vector<Eigen::Matrix<double,6,1>,Eigen::aligned_allocator< Eigen::Matrix<double,6,1> > > & L2,
    Eigen::Matrix<double,64,64> & Action )
{
  std::vector<double> m[DECA_EQS][5][3];
  for( int primI = 0; primI < DECA_EQS; primI++ )
  {
    for( int secI = 0; secI < 6; secI++ )
    {
      if( primI != secI )
      {
        const Eigen::Matrix<double,6,1> & l01 = L1[primI];
        const Eigen::Matrix<double,6,1> & l02 = L2[primI];
        const Eigen::Matrix<double,6,1> & l11 = L1[secI];
        const Eigen::Matrix<double,6,1> & l12 = L2[secI];
        
        int r = secI;
        if(secI > primI)
          r--;
        
        fillRow1( l01, l02, l11, l12, m[primI][r][0], m[primI][r][1], m[primI][r][2] );
      }
    }
  }

  Eigen::Matrix<double,EQS,84> M1p = Eigen::Matrix<double,EQS,84>::Zero();
  
  int decaIndex = 0;
  int row0 = 0;
  int row1 = 1;
  int row2 = 2;
  
  for( int row = 0; row < EQS; row++ )
  {
    fillRow2( M1p, row, m[decaIndex][row0], m[decaIndex][row1], m[decaIndex][row2] );
    
    row2++;
    if( row2 > 4 )
    {
      row1++;
      row2 = row1 + 1;
      if( row1 > 3 )
      {
        row0++;
        row1 = row0 + 1;
        row2 = row1 + 1;
        
        if( row0 > 2)
        {
          decaIndex++;
          row0 = 0;
          row1 = 1;
          row2 = 2;
        }
      }
    }
  }
  
  //this is currently hardcoded for 15 equations!
  //Eigen::Matrix<double,15,15> M1_part1 = M1.block<15,15>(0,0);
  //Eigen::Matrix<double,15,84> M1_part2 = M1_part1.inverse() * M1;
  //M1 = M1_part2;
  
  Eigen::Matrix<double,EQS,15> B = M1p.block<EQS,15>(0,0);
  Eigen::Matrix<double,15,EQS> Bt = B.transpose();
  Eigen::Matrix<double,15,15> BtB = Bt * B;
  Eigen::Matrix<double,15,84> M1 = BtB.inverse() * Bt * M1p;
  
  Eigen::Matrix<double,93,157> M2 = Eigen::Matrix<double,93,157>::Zero();
M2(0,23) = M1(14,14); M2(0,24) = M1(14,15); M2(0,25) = M1(14,16); M2(0,26) = M1(14,17); M2(0,27) = M1(14,18); M2(0,28) = M1(14,19); M2(0,29) = M1(14,20); M2(0,30) = M1(14,21); M2(0,31) = M1(14,22); M2(0,32) = M1(14,23); M2(0,33) = M1(14,24); M2(0,34) = M1(14,25); M2(0,35) = M1(14,26); M2(0,36) = M1(14,27); M2(0,52) = M1(14,28); M2(0,53) = M1(14,29); M2(0,54) = M1(14,30); M2(0,55) = M1(14,31); M2(0,56) = M1(14,32); M2(0,57) = M1(14,33); M2(0,58) = M1(14,34); M2(0,59) = M1(14,35); M2(0,60) = M1(14,36); M2(0,61) = M1(14,37); M2(0,62) = M1(14,38); M2(0,63) = M1(14,39); M2(0,64) = M1(14,40); M2(0,65) = M1(14,41); M2(0,66) = M1(14,42); M2(0,67) = M1(14,43); M2(0,68) = M1(14,44); M2(0,69) = M1(14,45); M2(0,70) = M1(14,46); M2(0,71) = M1(14,47); M2(0,85) = M1(14,49); M2(0,86) = M1(14,50); M2(0,87) = M1(14,51); M2(0,88) = M1(14,52); M2(0,89) = M1(14,53); M2(0,90) = M1(14,54); M2(0,91) = M1(14,55); M2(0,92) = M1(14,56); M2(0,93) = M1(14,48); M2(0,94) = M1(14,57); M2(0,95) = M1(14,58); M2(0,96) = M1(14,59); M2(0,97) = M1(14,60); M2(0,98) = M1(14,61); M2(0,99) = M1(14,62); M2(0,100) = M1(14,63); M2(0,112) = M1(14,64); M2(0,113) = M1(14,65); M2(0,114) = M1(14,66); M2(0,115) = M1(14,67); M2(0,116) = M1(14,68); M2(0,117) = M1(14,69); M2(0,118) = M1(14,70); M2(0,119) = M1(14,71); M2(0,120) = M1(14,72); M2(0,121) = M1(14,73); M2(0,131) = M1(14,74); M2(0,132) = M1(14,75); M2(0,133) = M1(14,76); M2(0,134) = M1(14,77); M2(0,135) = M1(14,78); M2(0,136) = M1(14,79); M2(0,144) = M1(14,80); M2(0,145) = M1(14,81); M2(0,146) = M1(14,82); M2(0,152) = M1(14,83); 
M2(1,18) = M1(14,14); M2(1,19) = M1(14,15); M2(1,20) = M1(14,16); M2(1,21) = M1(14,17); M2(1,23) = M1(14,18); M2(1,24) = M1(14,19); M2(1,25) = M1(14,20); M2(1,26) = M1(14,21); M2(1,28) = M1(14,22); M2(1,29) = M1(14,23); M2(1,30) = M1(14,24); M2(1,32) = M1(14,25); M2(1,33) = M1(14,26); M2(1,35) = M1(14,27); M2(1,46) = M1(14,28); M2(1,47) = M1(14,29); M2(1,48) = M1(14,30); M2(1,49) = M1(14,31); M2(1,50) = M1(14,32); M2(1,51) = M1(14,33); M2(1,53) = M1(14,34); M2(1,54) = M1(14,35); M2(1,55) = M1(14,36); M2(1,56) = M1(14,37); M2(1,57) = M1(14,38); M2(1,59) = M1(14,39); M2(1,60) = M1(14,40); M2(1,61) = M1(14,41); M2(1,62) = M1(14,42); M2(1,64) = M1(14,43); M2(1,65) = M1(14,44); M2(1,66) = M1(14,45); M2(1,68) = M1(14,46); M2(1,69) = M1(14,47); M2(1,71) = M1(14,48); M2(1,80) = M1(14,49); M2(1,81) = M1(14,50); M2(1,82) = M1(14,51); M2(1,83) = M1(14,52); M2(1,84) = M1(14,53); M2(1,86) = M1(14,54); M2(1,87) = M1(14,55); M2(1,88) = M1(14,56); M2(1,89) = M1(14,57); M2(1,91) = M1(14,58); M2(1,92) = M1(14,59); M2(1,94) = M1(14,60); M2(1,96) = M1(14,61); M2(1,97) = M1(14,62); M2(1,99) = M1(14,63); M2(1,108) = M1(14,64); M2(1,109) = M1(14,65); M2(1,110) = M1(14,66); M2(1,111) = M1(14,67); M2(1,113) = M1(14,68); M2(1,114) = M1(14,69); M2(1,115) = M1(14,70); M2(1,117) = M1(14,71); M2(1,118) = M1(14,72); M2(1,120) = M1(14,73); M2(1,128) = M1(14,74); M2(1,129) = M1(14,75); M2(1,130) = M1(14,76); M2(1,132) = M1(14,77); M2(1,133) = M1(14,78); M2(1,135) = M1(14,79); M2(1,142) = M1(14,80); M2(1,143) = M1(14,81); M2(1,145) = M1(14,82); M2(1,151) = M1(14,83); 
M2(2,6) = M1(8,8); M2(2,13) = M1(8,15); M2(2,14) = M1(8,16); M2(2,15) = M1(8,17); M2(2,18) = M1(8,18); M2(2,19) = M1(8,19); M2(2,20) = M1(8,20); M2(2,21) = M1(8,21); M2(2,24) = M1(8,22); M2(2,25) = M1(8,23); M2(2,26) = M1(8,24); M2(2,29) = M1(8,25); M2(2,30) = M1(8,26); M2(2,33) = M1(8,27); M2(2,39) = M1(8,28); M2(2,40) = M1(8,29); M2(2,41) = M1(8,30); M2(2,42) = M1(8,31); M2(2,43) = M1(8,32); M2(2,44) = M1(8,33); M2(2,47) = M1(8,34); M2(2,48) = M1(8,35); M2(2,49) = M1(8,36); M2(2,50) = M1(8,37); M2(2,51) = M1(8,38); M2(2,54) = M1(8,39); M2(2,55) = M1(8,40); M2(2,56) = M1(8,41); M2(2,57) = M1(8,42); M2(2,60) = M1(8,43); M2(2,61) = M1(8,44); M2(2,62) = M1(8,45); M2(2,65) = M1(8,46); M2(2,66) = M1(8,47); M2(2,69) = M1(8,48); M2(2,74) = M1(8,49); M2(2,75) = M1(8,50); M2(2,76) = M1(8,51); M2(2,77) = M1(8,52); M2(2,78) = M1(8,53); M2(2,81) = M1(8,54); M2(2,82) = M1(8,55); M2(2,83) = M1(8,56); M2(2,84) = M1(8,57); M2(2,87) = M1(8,58); M2(2,88) = M1(8,59); M2(2,89) = M1(8,60); M2(2,92) = M1(8,61); M2(2,94) = M1(8,62); M2(2,97) = M1(8,63); M2(2,103) = M1(8,64); M2(2,104) = M1(8,65); M2(2,105) = M1(8,66); M2(2,106) = M1(8,67); M2(2,109) = M1(8,68); M2(2,110) = M1(8,69); M2(2,111) = M1(8,70); M2(2,114) = M1(8,71); M2(2,115) = M1(8,72); M2(2,118) = M1(8,73); M2(2,124) = M1(8,74); M2(2,125) = M1(8,75); M2(2,126) = M1(8,76); M2(2,129) = M1(8,77); M2(2,130) = M1(8,78); M2(2,133) = M1(8,79); M2(2,139) = M1(8,80); M2(2,140) = M1(8,81); M2(2,143) = M1(8,82); M2(2,149) = M1(8,83); 
M2(3,7) = M1(9,9); M2(3,13) = M1(9,15); M2(3,14) = M1(9,16); M2(3,15) = M1(9,17); M2(3,18) = M1(9,18); M2(3,19) = M1(9,19); M2(3,20) = M1(9,20); M2(3,21) = M1(9,21); M2(3,24) = M1(9,22); M2(3,25) = M1(9,23); M2(3,26) = M1(9,24); M2(3,29) = M1(9,25); M2(3,30) = M1(9,26); M2(3,33) = M1(9,27); M2(3,39) = M1(9,28); M2(3,40) = M1(9,29); M2(3,41) = M1(9,30); M2(3,42) = M1(9,31); M2(3,43) = M1(9,32); M2(3,44) = M1(9,33); M2(3,47) = M1(9,34); M2(3,48) = M1(9,35); M2(3,49) = M1(9,36); M2(3,50) = M1(9,37); M2(3,51) = M1(9,38); M2(3,54) = M1(9,39); M2(3,55) = M1(9,40); M2(3,56) = M1(9,41); M2(3,57) = M1(9,42); M2(3,60) = M1(9,43); M2(3,61) = M1(9,44); M2(3,62) = M1(9,45); M2(3,65) = M1(9,46); M2(3,66) = M1(9,47); M2(3,69) = M1(9,48); M2(3,74) = M1(9,49); M2(3,75) = M1(9,50); M2(3,76) = M1(9,51); M2(3,77) = M1(9,52); M2(3,78) = M1(9,53); M2(3,81) = M1(9,54); M2(3,82) = M1(9,55); M2(3,83) = M1(9,56); M2(3,84) = M1(9,57); M2(3,87) = M1(9,58); M2(3,88) = M1(9,59); M2(3,89) = M1(9,60); M2(3,92) = M1(9,61); M2(3,94) = M1(9,62); M2(3,97) = M1(9,63); M2(3,103) = M1(9,64); M2(3,104) = M1(9,65); M2(3,105) = M1(9,66); M2(3,106) = M1(9,67); M2(3,109) = M1(9,68); M2(3,110) = M1(9,69); M2(3,111) = M1(9,70); M2(3,114) = M1(9,71); M2(3,115) = M1(9,72); M2(3,118) = M1(9,73); M2(3,124) = M1(9,74); M2(3,125) = M1(9,75); M2(3,126) = M1(9,76); M2(3,129) = M1(9,77); M2(3,130) = M1(9,78); M2(3,133) = M1(9,79); M2(3,139) = M1(9,80); M2(3,140) = M1(9,81); M2(3,143) = M1(9,82); M2(3,149) = M1(9,83); 
M2(4,8) = M1(10,10); M2(4,13) = M1(10,15); M2(4,14) = M1(10,16); M2(4,15) = M1(10,17); M2(4,18) = M1(10,18); M2(4,19) = M1(10,19); M2(4,20) = M1(10,20); M2(4,21) = M1(10,21); M2(4,24) = M1(10,22); M2(4,25) = M1(10,23); M2(4,26) = M1(10,24); M2(4,29) = M1(10,25); M2(4,30) = M1(10,26); M2(4,33) = M1(10,27); M2(4,39) = M1(10,28); M2(4,40) = M1(10,29); M2(4,41) = M1(10,30); M2(4,42) = M1(10,31); M2(4,43) = M1(10,32); M2(4,44) = M1(10,33); M2(4,47) = M1(10,34); M2(4,48) = M1(10,35); M2(4,49) = M1(10,36); M2(4,50) = M1(10,37); M2(4,51) = M1(10,38); M2(4,54) = M1(10,39); M2(4,55) = M1(10,40); M2(4,56) = M1(10,41); M2(4,57) = M1(10,42); M2(4,60) = M1(10,43); M2(4,61) = M1(10,44); M2(4,62) = M1(10,45); M2(4,65) = M1(10,46); M2(4,66) = M1(10,47); M2(4,69) = M1(10,48); M2(4,74) = M1(10,49); M2(4,75) = M1(10,50); M2(4,76) = M1(10,51); M2(4,77) = M1(10,52); M2(4,78) = M1(10,53); M2(4,81) = M1(10,54); M2(4,82) = M1(10,55); M2(4,83) = M1(10,56); M2(4,84) = M1(10,57); M2(4,87) = M1(10,58); M2(4,88) = M1(10,59); M2(4,89) = M1(10,60); M2(4,92) = M1(10,61); M2(4,94) = M1(10,62); M2(4,97) = M1(10,63); M2(4,103) = M1(10,64); M2(4,104) = M1(10,65); M2(4,105) = M1(10,66); M2(4,106) = M1(10,67); M2(4,109) = M1(10,68); M2(4,110) = M1(10,69); M2(4,111) = M1(10,70); M2(4,114) = M1(10,71); M2(4,115) = M1(10,72); M2(4,118) = M1(10,73); M2(4,124) = M1(10,74); M2(4,125) = M1(10,75); M2(4,126) = M1(10,76); M2(4,129) = M1(10,77); M2(4,130) = M1(10,78); M2(4,133) = M1(10,79); M2(4,139) = M1(10,80); M2(4,140) = M1(10,81); M2(4,143) = M1(10,82); M2(4,149) = M1(10,83); 
M2(5,9) = M1(11,11); M2(5,13) = M1(11,15); M2(5,14) = M1(11,16); M2(5,15) = M1(11,17); M2(5,18) = M1(11,18); M2(5,19) = M1(11,19); M2(5,20) = M1(11,20); M2(5,21) = M1(11,21); M2(5,24) = M1(11,22); M2(5,25) = M1(11,23); M2(5,26) = M1(11,24); M2(5,29) = M1(11,25); M2(5,30) = M1(11,26); M2(5,33) = M1(11,27); M2(5,39) = M1(11,28); M2(5,40) = M1(11,29); M2(5,41) = M1(11,30); M2(5,42) = M1(11,31); M2(5,43) = M1(11,32); M2(5,44) = M1(11,33); M2(5,47) = M1(11,34); M2(5,48) = M1(11,35); M2(5,49) = M1(11,36); M2(5,50) = M1(11,37); M2(5,51) = M1(11,38); M2(5,54) = M1(11,39); M2(5,55) = M1(11,40); M2(5,56) = M1(11,41); M2(5,57) = M1(11,42); M2(5,60) = M1(11,43); M2(5,61) = M1(11,44); M2(5,62) = M1(11,45); M2(5,65) = M1(11,46); M2(5,66) = M1(11,47); M2(5,69) = M1(11,48); M2(5,74) = M1(11,49); M2(5,75) = M1(11,50); M2(5,76) = M1(11,51); M2(5,77) = M1(11,52); M2(5,78) = M1(11,53); M2(5,81) = M1(11,54); M2(5,82) = M1(11,55); M2(5,83) = M1(11,56); M2(5,84) = M1(11,57); M2(5,87) = M1(11,58); M2(5,88) = M1(11,59); M2(5,89) = M1(11,60); M2(5,92) = M1(11,61); M2(5,94) = M1(11,62); M2(5,97) = M1(11,63); M2(5,103) = M1(11,64); M2(5,104) = M1(11,65); M2(5,105) = M1(11,66); M2(5,106) = M1(11,67); M2(5,109) = M1(11,68); M2(5,110) = M1(11,69); M2(5,111) = M1(11,70); M2(5,114) = M1(11,71); M2(5,115) = M1(11,72); M2(5,118) = M1(11,73); M2(5,124) = M1(11,74); M2(5,125) = M1(11,75); M2(5,126) = M1(11,76); M2(5,129) = M1(11,77); M2(5,130) = M1(11,78); M2(5,133) = M1(11,79); M2(5,139) = M1(11,80); M2(5,140) = M1(11,81); M2(5,143) = M1(11,82); M2(5,149) = M1(11,83); 
M2(6,11) = M1(13,13); M2(6,13) = M1(13,15); M2(6,14) = M1(13,16); M2(6,15) = M1(13,17); M2(6,18) = M1(13,18); M2(6,19) = M1(13,19); M2(6,20) = M1(13,20); M2(6,21) = M1(13,21); M2(6,24) = M1(13,22); M2(6,25) = M1(13,23); M2(6,26) = M1(13,24); M2(6,29) = M1(13,25); M2(6,30) = M1(13,26); M2(6,33) = M1(13,27); M2(6,39) = M1(13,28); M2(6,40) = M1(13,29); M2(6,41) = M1(13,30); M2(6,42) = M1(13,31); M2(6,43) = M1(13,32); M2(6,44) = M1(13,33); M2(6,47) = M1(13,34); M2(6,48) = M1(13,35); M2(6,49) = M1(13,36); M2(6,50) = M1(13,37); M2(6,51) = M1(13,38); M2(6,54) = M1(13,39); M2(6,55) = M1(13,40); M2(6,56) = M1(13,41); M2(6,57) = M1(13,42); M2(6,60) = M1(13,43); M2(6,61) = M1(13,44); M2(6,62) = M1(13,45); M2(6,65) = M1(13,46); M2(6,66) = M1(13,47); M2(6,69) = M1(13,48); M2(6,74) = M1(13,49); M2(6,75) = M1(13,50); M2(6,76) = M1(13,51); M2(6,77) = M1(13,52); M2(6,78) = M1(13,53); M2(6,81) = M1(13,54); M2(6,82) = M1(13,55); M2(6,83) = M1(13,56); M2(6,84) = M1(13,57); M2(6,87) = M1(13,58); M2(6,88) = M1(13,59); M2(6,89) = M1(13,60); M2(6,92) = M1(13,61); M2(6,94) = M1(13,62); M2(6,97) = M1(13,63); M2(6,103) = M1(13,64); M2(6,104) = M1(13,65); M2(6,105) = M1(13,66); M2(6,106) = M1(13,67); M2(6,109) = M1(13,68); M2(6,110) = M1(13,69); M2(6,111) = M1(13,70); M2(6,114) = M1(13,71); M2(6,115) = M1(13,72); M2(6,118) = M1(13,73); M2(6,124) = M1(13,74); M2(6,125) = M1(13,75); M2(6,126) = M1(13,76); M2(6,129) = M1(13,77); M2(6,130) = M1(13,78); M2(6,133) = M1(13,79); M2(6,139) = M1(13,80); M2(6,140) = M1(13,81); M2(6,143) = M1(13,82); M2(6,149) = M1(13,83); 
M2(7,12) = M1(14,14); M2(7,13) = M1(14,15); M2(7,14) = M1(14,16); M2(7,15) = M1(14,17); M2(7,18) = M1(14,18); M2(7,19) = M1(14,19); M2(7,20) = M1(14,20); M2(7,21) = M1(14,21); M2(7,24) = M1(14,22); M2(7,25) = M1(14,23); M2(7,26) = M1(14,24); M2(7,29) = M1(14,25); M2(7,30) = M1(14,26); M2(7,33) = M1(14,27); M2(7,39) = M1(14,28); M2(7,40) = M1(14,29); M2(7,41) = M1(14,30); M2(7,42) = M1(14,31); M2(7,43) = M1(14,32); M2(7,44) = M1(14,33); M2(7,47) = M1(14,34); M2(7,48) = M1(14,35); M2(7,49) = M1(14,36); M2(7,50) = M1(14,37); M2(7,51) = M1(14,38); M2(7,54) = M1(14,39); M2(7,55) = M1(14,40); M2(7,56) = M1(14,41); M2(7,57) = M1(14,42); M2(7,60) = M1(14,43); M2(7,61) = M1(14,44); M2(7,62) = M1(14,45); M2(7,65) = M1(14,46); M2(7,66) = M1(14,47); M2(7,69) = M1(14,48); M2(7,74) = M1(14,49); M2(7,75) = M1(14,50); M2(7,76) = M1(14,51); M2(7,77) = M1(14,52); M2(7,78) = M1(14,53); M2(7,81) = M1(14,54); M2(7,82) = M1(14,55); M2(7,83) = M1(14,56); M2(7,84) = M1(14,57); M2(7,87) = M1(14,58); M2(7,88) = M1(14,59); M2(7,89) = M1(14,60); M2(7,92) = M1(14,61); M2(7,94) = M1(14,62); M2(7,97) = M1(14,63); M2(7,103) = M1(14,64); M2(7,104) = M1(14,65); M2(7,105) = M1(14,66); M2(7,106) = M1(14,67); M2(7,109) = M1(14,68); M2(7,110) = M1(14,69); M2(7,111) = M1(14,70); M2(7,114) = M1(14,71); M2(7,115) = M1(14,72); M2(7,118) = M1(14,73); M2(7,124) = M1(14,74); M2(7,125) = M1(14,75); M2(7,126) = M1(14,76); M2(7,129) = M1(14,77); M2(7,130) = M1(14,78); M2(7,133) = M1(14,79); M2(7,139) = M1(14,80); M2(7,140) = M1(14,81); M2(7,143) = M1(14,82); M2(7,149) = M1(14,83); 
M2(8,10) = M1(8,8); M2(8,18) = M1(8,15); M2(8,19) = M1(8,16); M2(8,20) = M1(8,17); M2(8,22) = M1(8,18); M2(8,23) = M1(8,19); M2(8,24) = M1(8,20); M2(8,25) = M1(8,21); M2(8,27) = M1(8,22); M2(8,28) = M1(8,23); M2(8,29) = M1(8,24); M2(8,31) = M1(8,25); M2(8,32) = M1(8,26); M2(8,34) = M1(8,27); M2(8,45) = M1(8,28); M2(8,46) = M1(8,29); M2(8,47) = M1(8,30); M2(8,48) = M1(8,31); M2(8,49) = M1(8,32); M2(8,50) = M1(8,33); M2(8,52) = M1(8,34); M2(8,53) = M1(8,35); M2(8,54) = M1(8,36); M2(8,55) = M1(8,37); M2(8,56) = M1(8,38); M2(8,58) = M1(8,39); M2(8,59) = M1(8,40); M2(8,60) = M1(8,41); M2(8,61) = M1(8,42); M2(8,63) = M1(8,43); M2(8,64) = M1(8,44); M2(8,65) = M1(8,45); M2(8,67) = M1(8,46); M2(8,68) = M1(8,47); M2(8,70) = M1(8,48); M2(8,79) = M1(8,49); M2(8,80) = M1(8,50); M2(8,81) = M1(8,51); M2(8,82) = M1(8,52); M2(8,83) = M1(8,53); M2(8,85) = M1(8,54); M2(8,86) = M1(8,55); M2(8,87) = M1(8,56); M2(8,88) = M1(8,57); M2(8,90) = M1(8,58); M2(8,91) = M1(8,59); M2(8,92) = M1(8,60); M2(8,95) = M1(8,61); M2(8,96) = M1(8,62); M2(8,98) = M1(8,63); M2(8,107) = M1(8,64); M2(8,108) = M1(8,65); M2(8,109) = M1(8,66); M2(8,110) = M1(8,67); M2(8,112) = M1(8,68); M2(8,113) = M1(8,69); M2(8,114) = M1(8,70); M2(8,116) = M1(8,71); M2(8,117) = M1(8,72); M2(8,119) = M1(8,73); M2(8,127) = M1(8,74); M2(8,128) = M1(8,75); M2(8,129) = M1(8,76); M2(8,131) = M1(8,77); M2(8,132) = M1(8,78); M2(8,134) = M1(8,79); M2(8,141) = M1(8,80); M2(8,142) = M1(8,81); M2(8,144) = M1(8,82); M2(8,150) = M1(8,83); 
M2(9,11) = M1(9,9); M2(9,18) = M1(9,15); M2(9,19) = M1(9,16); M2(9,20) = M1(9,17); M2(9,22) = M1(9,18); M2(9,23) = M1(9,19); M2(9,24) = M1(9,20); M2(9,25) = M1(9,21); M2(9,27) = M1(9,22); M2(9,28) = M1(9,23); M2(9,29) = M1(9,24); M2(9,31) = M1(9,25); M2(9,32) = M1(9,26); M2(9,34) = M1(9,27); M2(9,45) = M1(9,28); M2(9,46) = M1(9,29); M2(9,47) = M1(9,30); M2(9,48) = M1(9,31); M2(9,49) = M1(9,32); M2(9,50) = M1(9,33); M2(9,52) = M1(9,34); M2(9,53) = M1(9,35); M2(9,54) = M1(9,36); M2(9,55) = M1(9,37); M2(9,56) = M1(9,38); M2(9,58) = M1(9,39); M2(9,59) = M1(9,40); M2(9,60) = M1(9,41); M2(9,61) = M1(9,42); M2(9,63) = M1(9,43); M2(9,64) = M1(9,44); M2(9,65) = M1(9,45); M2(9,67) = M1(9,46); M2(9,68) = M1(9,47); M2(9,70) = M1(9,48); M2(9,79) = M1(9,49); M2(9,80) = M1(9,50); M2(9,81) = M1(9,51); M2(9,82) = M1(9,52); M2(9,83) = M1(9,53); M2(9,85) = M1(9,54); M2(9,86) = M1(9,55); M2(9,87) = M1(9,56); M2(9,88) = M1(9,57); M2(9,90) = M1(9,58); M2(9,91) = M1(9,59); M2(9,92) = M1(9,60); M2(9,95) = M1(9,61); M2(9,96) = M1(9,62); M2(9,98) = M1(9,63); M2(9,107) = M1(9,64); M2(9,108) = M1(9,65); M2(9,109) = M1(9,66); M2(9,110) = M1(9,67); M2(9,112) = M1(9,68); M2(9,113) = M1(9,69); M2(9,114) = M1(9,70); M2(9,116) = M1(9,71); M2(9,117) = M1(9,72); M2(9,119) = M1(9,73); M2(9,127) = M1(9,74); M2(9,128) = M1(9,75); M2(9,129) = M1(9,76); M2(9,131) = M1(9,77); M2(9,132) = M1(9,78); M2(9,134) = M1(9,79); M2(9,141) = M1(9,80); M2(9,142) = M1(9,81); M2(9,144) = M1(9,82); M2(9,150) = M1(9,83); 
M2(10,12) = M1(10,10); M2(10,18) = M1(10,15); M2(10,19) = M1(10,16); M2(10,20) = M1(10,17); M2(10,22) = M1(10,18); M2(10,23) = M1(10,19); M2(10,24) = M1(10,20); M2(10,25) = M1(10,21); M2(10,27) = M1(10,22); M2(10,28) = M1(10,23); M2(10,29) = M1(10,24); M2(10,31) = M1(10,25); M2(10,32) = M1(10,26); M2(10,34) = M1(10,27); M2(10,45) = M1(10,28); M2(10,46) = M1(10,29); M2(10,47) = M1(10,30); M2(10,48) = M1(10,31); M2(10,49) = M1(10,32); M2(10,50) = M1(10,33); M2(10,52) = M1(10,34); M2(10,53) = M1(10,35); M2(10,54) = M1(10,36); M2(10,55) = M1(10,37); M2(10,56) = M1(10,38); M2(10,58) = M1(10,39); M2(10,59) = M1(10,40); M2(10,60) = M1(10,41); M2(10,61) = M1(10,42); M2(10,63) = M1(10,43); M2(10,64) = M1(10,44); M2(10,65) = M1(10,45); M2(10,67) = M1(10,46); M2(10,68) = M1(10,47); M2(10,70) = M1(10,48); M2(10,79) = M1(10,49); M2(10,80) = M1(10,50); M2(10,81) = M1(10,51); M2(10,82) = M1(10,52); M2(10,83) = M1(10,53); M2(10,85) = M1(10,54); M2(10,86) = M1(10,55); M2(10,87) = M1(10,56); M2(10,88) = M1(10,57); M2(10,90) = M1(10,58); M2(10,91) = M1(10,59); M2(10,92) = M1(10,60); M2(10,95) = M1(10,61); M2(10,96) = M1(10,62); M2(10,98) = M1(10,63); M2(10,107) = M1(10,64); M2(10,108) = M1(10,65); M2(10,109) = M1(10,66); M2(10,110) = M1(10,67); M2(10,112) = M1(10,68); M2(10,113) = M1(10,69); M2(10,114) = M1(10,70); M2(10,116) = M1(10,71); M2(10,117) = M1(10,72); M2(10,119) = M1(10,73); M2(10,127) = M1(10,74); M2(10,128) = M1(10,75); M2(10,129) = M1(10,76); M2(10,131) = M1(10,77); M2(10,132) = M1(10,78); M2(10,134) = M1(10,79); M2(10,141) = M1(10,80); M2(10,142) = M1(10,81); M2(10,144) = M1(10,82); M2(10,150) = M1(10,83); 
M2(11,13) = M1(11,11); M2(11,18) = M1(11,15); M2(11,19) = M1(11,16); M2(11,20) = M1(11,17); M2(11,22) = M1(11,18); M2(11,23) = M1(11,19); M2(11,24) = M1(11,20); M2(11,25) = M1(11,21); M2(11,27) = M1(11,22); M2(11,28) = M1(11,23); M2(11,29) = M1(11,24); M2(11,31) = M1(11,25); M2(11,32) = M1(11,26); M2(11,34) = M1(11,27); M2(11,45) = M1(11,28); M2(11,46) = M1(11,29); M2(11,47) = M1(11,30); M2(11,48) = M1(11,31); M2(11,49) = M1(11,32); M2(11,50) = M1(11,33); M2(11,52) = M1(11,34); M2(11,53) = M1(11,35); M2(11,54) = M1(11,36); M2(11,55) = M1(11,37); M2(11,56) = M1(11,38); M2(11,58) = M1(11,39); M2(11,59) = M1(11,40); M2(11,60) = M1(11,41); M2(11,61) = M1(11,42); M2(11,63) = M1(11,43); M2(11,64) = M1(11,44); M2(11,65) = M1(11,45); M2(11,67) = M1(11,46); M2(11,68) = M1(11,47); M2(11,70) = M1(11,48); M2(11,79) = M1(11,49); M2(11,80) = M1(11,50); M2(11,81) = M1(11,51); M2(11,82) = M1(11,52); M2(11,83) = M1(11,53); M2(11,85) = M1(11,54); M2(11,86) = M1(11,55); M2(11,87) = M1(11,56); M2(11,88) = M1(11,57); M2(11,90) = M1(11,58); M2(11,91) = M1(11,59); M2(11,92) = M1(11,60); M2(11,95) = M1(11,61); M2(11,96) = M1(11,62); M2(11,98) = M1(11,63); M2(11,107) = M1(11,64); M2(11,108) = M1(11,65); M2(11,109) = M1(11,66); M2(11,110) = M1(11,67); M2(11,112) = M1(11,68); M2(11,113) = M1(11,69); M2(11,114) = M1(11,70); M2(11,116) = M1(11,71); M2(11,117) = M1(11,72); M2(11,119) = M1(11,73); M2(11,127) = M1(11,74); M2(11,128) = M1(11,75); M2(11,129) = M1(11,76); M2(11,131) = M1(11,77); M2(11,132) = M1(11,78); M2(11,134) = M1(11,79); M2(11,141) = M1(11,80); M2(11,142) = M1(11,81); M2(11,144) = M1(11,82); M2(11,150) = M1(11,83); 
M2(12,14) = M1(12,12); M2(12,18) = M1(12,15); M2(12,19) = M1(12,16); M2(12,20) = M1(12,17); M2(12,22) = M1(12,18); M2(12,23) = M1(12,19); M2(12,24) = M1(12,20); M2(12,25) = M1(12,21); M2(12,27) = M1(12,22); M2(12,28) = M1(12,23); M2(12,29) = M1(12,24); M2(12,31) = M1(12,25); M2(12,32) = M1(12,26); M2(12,34) = M1(12,27); M2(12,45) = M1(12,28); M2(12,46) = M1(12,29); M2(12,47) = M1(12,30); M2(12,48) = M1(12,31); M2(12,49) = M1(12,32); M2(12,50) = M1(12,33); M2(12,52) = M1(12,34); M2(12,53) = M1(12,35); M2(12,54) = M1(12,36); M2(12,55) = M1(12,37); M2(12,56) = M1(12,38); M2(12,58) = M1(12,39); M2(12,59) = M1(12,40); M2(12,60) = M1(12,41); M2(12,61) = M1(12,42); M2(12,63) = M1(12,43); M2(12,64) = M1(12,44); M2(12,65) = M1(12,45); M2(12,67) = M1(12,46); M2(12,68) = M1(12,47); M2(12,70) = M1(12,48); M2(12,79) = M1(12,49); M2(12,80) = M1(12,50); M2(12,81) = M1(12,51); M2(12,82) = M1(12,52); M2(12,83) = M1(12,53); M2(12,85) = M1(12,54); M2(12,86) = M1(12,55); M2(12,87) = M1(12,56); M2(12,88) = M1(12,57); M2(12,90) = M1(12,58); M2(12,91) = M1(12,59); M2(12,92) = M1(12,60); M2(12,95) = M1(12,61); M2(12,96) = M1(12,62); M2(12,98) = M1(12,63); M2(12,107) = M1(12,64); M2(12,108) = M1(12,65); M2(12,109) = M1(12,66); M2(12,110) = M1(12,67); M2(12,112) = M1(12,68); M2(12,113) = M1(12,69); M2(12,114) = M1(12,70); M2(12,116) = M1(12,71); M2(12,117) = M1(12,72); M2(12,119) = M1(12,73); M2(12,127) = M1(12,74); M2(12,128) = M1(12,75); M2(12,129) = M1(12,76); M2(12,131) = M1(12,77); M2(12,132) = M1(12,78); M2(12,134) = M1(12,79); M2(12,141) = M1(12,80); M2(12,142) = M1(12,81); M2(12,144) = M1(12,82); M2(12,150) = M1(12,83); 
M2(13,16) = M1(13,13); M2(13,18) = M1(13,15); M2(13,19) = M1(13,16); M2(13,20) = M1(13,17); M2(13,22) = M1(13,18); M2(13,23) = M1(13,19); M2(13,24) = M1(13,20); M2(13,25) = M1(13,21); M2(13,27) = M1(13,22); M2(13,28) = M1(13,23); M2(13,29) = M1(13,24); M2(13,31) = M1(13,25); M2(13,32) = M1(13,26); M2(13,34) = M1(13,27); M2(13,45) = M1(13,28); M2(13,46) = M1(13,29); M2(13,47) = M1(13,30); M2(13,48) = M1(13,31); M2(13,49) = M1(13,32); M2(13,50) = M1(13,33); M2(13,52) = M1(13,34); M2(13,53) = M1(13,35); M2(13,54) = M1(13,36); M2(13,55) = M1(13,37); M2(13,56) = M1(13,38); M2(13,58) = M1(13,39); M2(13,59) = M1(13,40); M2(13,60) = M1(13,41); M2(13,61) = M1(13,42); M2(13,63) = M1(13,43); M2(13,64) = M1(13,44); M2(13,65) = M1(13,45); M2(13,67) = M1(13,46); M2(13,68) = M1(13,47); M2(13,70) = M1(13,48); M2(13,79) = M1(13,49); M2(13,80) = M1(13,50); M2(13,81) = M1(13,51); M2(13,82) = M1(13,52); M2(13,83) = M1(13,53); M2(13,85) = M1(13,54); M2(13,86) = M1(13,55); M2(13,87) = M1(13,56); M2(13,88) = M1(13,57); M2(13,90) = M1(13,58); M2(13,91) = M1(13,59); M2(13,92) = M1(13,60); M2(13,95) = M1(13,61); M2(13,96) = M1(13,62); M2(13,98) = M1(13,63); M2(13,107) = M1(13,64); M2(13,108) = M1(13,65); M2(13,109) = M1(13,66); M2(13,110) = M1(13,67); M2(13,112) = M1(13,68); M2(13,113) = M1(13,69); M2(13,114) = M1(13,70); M2(13,116) = M1(13,71); M2(13,117) = M1(13,72); M2(13,119) = M1(13,73); M2(13,127) = M1(13,74); M2(13,128) = M1(13,75); M2(13,129) = M1(13,76); M2(13,131) = M1(13,77); M2(13,132) = M1(13,78); M2(13,134) = M1(13,79); M2(13,141) = M1(13,80); M2(13,142) = M1(13,81); M2(13,144) = M1(13,82); M2(13,150) = M1(13,83); 
M2(14,17) = M1(14,14); M2(14,18) = M1(14,15); M2(14,19) = M1(14,16); M2(14,20) = M1(14,17); M2(14,22) = M1(14,18); M2(14,23) = M1(14,19); M2(14,24) = M1(14,20); M2(14,25) = M1(14,21); M2(14,27) = M1(14,22); M2(14,28) = M1(14,23); M2(14,29) = M1(14,24); M2(14,31) = M1(14,25); M2(14,32) = M1(14,26); M2(14,34) = M1(14,27); M2(14,45) = M1(14,28); M2(14,46) = M1(14,29); M2(14,47) = M1(14,30); M2(14,48) = M1(14,31); M2(14,49) = M1(14,32); M2(14,50) = M1(14,33); M2(14,52) = M1(14,34); M2(14,53) = M1(14,35); M2(14,54) = M1(14,36); M2(14,55) = M1(14,37); M2(14,56) = M1(14,38); M2(14,58) = M1(14,39); M2(14,59) = M1(14,40); M2(14,60) = M1(14,41); M2(14,61) = M1(14,42); M2(14,63) = M1(14,43); M2(14,64) = M1(14,44); M2(14,65) = M1(14,45); M2(14,67) = M1(14,46); M2(14,68) = M1(14,47); M2(14,70) = M1(14,48); M2(14,79) = M1(14,49); M2(14,80) = M1(14,50); M2(14,81) = M1(14,51); M2(14,82) = M1(14,52); M2(14,83) = M1(14,53); M2(14,85) = M1(14,54); M2(14,86) = M1(14,55); M2(14,87) = M1(14,56); M2(14,88) = M1(14,57); M2(14,90) = M1(14,58); M2(14,91) = M1(14,59); M2(14,92) = M1(14,60); M2(14,95) = M1(14,61); M2(14,96) = M1(14,62); M2(14,98) = M1(14,63); M2(14,107) = M1(14,64); M2(14,108) = M1(14,65); M2(14,109) = M1(14,66); M2(14,110) = M1(14,67); M2(14,112) = M1(14,68); M2(14,113) = M1(14,69); M2(14,114) = M1(14,70); M2(14,116) = M1(14,71); M2(14,117) = M1(14,72); M2(14,119) = M1(14,73); M2(14,127) = M1(14,74); M2(14,128) = M1(14,75); M2(14,129) = M1(14,76); M2(14,131) = M1(14,77); M2(14,132) = M1(14,78); M2(14,134) = M1(14,79); M2(14,141) = M1(14,80); M2(14,142) = M1(14,81); M2(14,144) = M1(14,82); M2(14,150) = M1(14,83); 
M2(15,0) = M1(2,2); M2(15,12) = M1(2,15); M2(15,13) = M1(2,16); M2(15,14) = M1(2,17); M2(15,17) = M1(2,18); M2(15,18) = M1(2,19); M2(15,19) = M1(2,20); M2(15,20) = M1(2,21); M2(15,23) = M1(2,22); M2(15,24) = M1(2,23); M2(15,25) = M1(2,24); M2(15,28) = M1(2,25); M2(15,29) = M1(2,26); M2(15,32) = M1(2,27); M2(15,38) = M1(2,28); M2(15,39) = M1(2,29); M2(15,40) = M1(2,30); M2(15,41) = M1(2,31); M2(15,42) = M1(2,32); M2(15,43) = M1(2,33); M2(15,46) = M1(2,34); M2(15,47) = M1(2,35); M2(15,48) = M1(2,36); M2(15,49) = M1(2,37); M2(15,50) = M1(2,38); M2(15,53) = M1(2,39); M2(15,54) = M1(2,40); M2(15,55) = M1(2,41); M2(15,56) = M1(2,42); M2(15,59) = M1(2,43); M2(15,60) = M1(2,44); M2(15,61) = M1(2,45); M2(15,64) = M1(2,46); M2(15,65) = M1(2,47); M2(15,68) = M1(2,48); M2(15,73) = M1(2,49); M2(15,74) = M1(2,50); M2(15,75) = M1(2,51); M2(15,76) = M1(2,52); M2(15,77) = M1(2,53); M2(15,80) = M1(2,54); M2(15,81) = M1(2,55); M2(15,82) = M1(2,56); M2(15,83) = M1(2,57); M2(15,86) = M1(2,58); M2(15,87) = M1(2,59); M2(15,88) = M1(2,60); M2(15,91) = M1(2,61); M2(15,92) = M1(2,62); M2(15,96) = M1(2,63); M2(15,102) = M1(2,64); M2(15,103) = M1(2,65); M2(15,104) = M1(2,66); M2(15,105) = M1(2,67); M2(15,108) = M1(2,68); M2(15,109) = M1(2,69); M2(15,110) = M1(2,70); M2(15,113) = M1(2,71); M2(15,114) = M1(2,72); M2(15,117) = M1(2,73); M2(15,123) = M1(2,74); M2(15,124) = M1(2,75); M2(15,125) = M1(2,76); M2(15,128) = M1(2,77); M2(15,129) = M1(2,78); M2(15,132) = M1(2,79); M2(15,138) = M1(2,80); M2(15,139) = M1(2,81); M2(15,142) = M1(2,82); M2(15,148) = M1(2,83); 
M2(16,1) = M1(3,3); M2(16,12) = M1(3,15); M2(16,13) = M1(3,16); M2(16,14) = M1(3,17); M2(16,17) = M1(3,18); M2(16,18) = M1(3,19); M2(16,19) = M1(3,20); M2(16,20) = M1(3,21); M2(16,23) = M1(3,22); M2(16,24) = M1(3,23); M2(16,25) = M1(3,24); M2(16,28) = M1(3,25); M2(16,29) = M1(3,26); M2(16,32) = M1(3,27); M2(16,38) = M1(3,28); M2(16,39) = M1(3,29); M2(16,40) = M1(3,30); M2(16,41) = M1(3,31); M2(16,42) = M1(3,32); M2(16,43) = M1(3,33); M2(16,46) = M1(3,34); M2(16,47) = M1(3,35); M2(16,48) = M1(3,36); M2(16,49) = M1(3,37); M2(16,50) = M1(3,38); M2(16,53) = M1(3,39); M2(16,54) = M1(3,40); M2(16,55) = M1(3,41); M2(16,56) = M1(3,42); M2(16,59) = M1(3,43); M2(16,60) = M1(3,44); M2(16,61) = M1(3,45); M2(16,64) = M1(3,46); M2(16,65) = M1(3,47); M2(16,68) = M1(3,48); M2(16,73) = M1(3,49); M2(16,74) = M1(3,50); M2(16,75) = M1(3,51); M2(16,76) = M1(3,52); M2(16,77) = M1(3,53); M2(16,80) = M1(3,54); M2(16,81) = M1(3,55); M2(16,82) = M1(3,56); M2(16,83) = M1(3,57); M2(16,86) = M1(3,58); M2(16,87) = M1(3,59); M2(16,88) = M1(3,60); M2(16,91) = M1(3,61); M2(16,92) = M1(3,62); M2(16,96) = M1(3,63); M2(16,102) = M1(3,64); M2(16,103) = M1(3,65); M2(16,104) = M1(3,66); M2(16,105) = M1(3,67); M2(16,108) = M1(3,68); M2(16,109) = M1(3,69); M2(16,110) = M1(3,70); M2(16,113) = M1(3,71); M2(16,114) = M1(3,72); M2(16,117) = M1(3,73); M2(16,123) = M1(3,74); M2(16,124) = M1(3,75); M2(16,125) = M1(3,76); M2(16,128) = M1(3,77); M2(16,129) = M1(3,78); M2(16,132) = M1(3,79); M2(16,138) = M1(3,80); M2(16,139) = M1(3,81); M2(16,142) = M1(3,82); M2(16,148) = M1(3,83); 
M2(17,2) = M1(4,4); M2(17,12) = M1(4,15); M2(17,13) = M1(4,16); M2(17,14) = M1(4,17); M2(17,17) = M1(4,18); M2(17,18) = M1(4,19); M2(17,19) = M1(4,20); M2(17,20) = M1(4,21); M2(17,23) = M1(4,22); M2(17,24) = M1(4,23); M2(17,25) = M1(4,24); M2(17,28) = M1(4,25); M2(17,29) = M1(4,26); M2(17,32) = M1(4,27); M2(17,38) = M1(4,28); M2(17,39) = M1(4,29); M2(17,40) = M1(4,30); M2(17,41) = M1(4,31); M2(17,42) = M1(4,32); M2(17,43) = M1(4,33); M2(17,46) = M1(4,34); M2(17,47) = M1(4,35); M2(17,48) = M1(4,36); M2(17,49) = M1(4,37); M2(17,50) = M1(4,38); M2(17,53) = M1(4,39); M2(17,54) = M1(4,40); M2(17,55) = M1(4,41); M2(17,56) = M1(4,42); M2(17,59) = M1(4,43); M2(17,60) = M1(4,44); M2(17,61) = M1(4,45); M2(17,64) = M1(4,46); M2(17,65) = M1(4,47); M2(17,68) = M1(4,48); M2(17,73) = M1(4,49); M2(17,74) = M1(4,50); M2(17,75) = M1(4,51); M2(17,76) = M1(4,52); M2(17,77) = M1(4,53); M2(17,80) = M1(4,54); M2(17,81) = M1(4,55); M2(17,82) = M1(4,56); M2(17,83) = M1(4,57); M2(17,86) = M1(4,58); M2(17,87) = M1(4,59); M2(17,88) = M1(4,60); M2(17,91) = M1(4,61); M2(17,92) = M1(4,62); M2(17,96) = M1(4,63); M2(17,102) = M1(4,64); M2(17,103) = M1(4,65); M2(17,104) = M1(4,66); M2(17,105) = M1(4,67); M2(17,108) = M1(4,68); M2(17,109) = M1(4,69); M2(17,110) = M1(4,70); M2(17,113) = M1(4,71); M2(17,114) = M1(4,72); M2(17,117) = M1(4,73); M2(17,123) = M1(4,74); M2(17,124) = M1(4,75); M2(17,125) = M1(4,76); M2(17,128) = M1(4,77); M2(17,129) = M1(4,78); M2(17,132) = M1(4,79); M2(17,138) = M1(4,80); M2(17,139) = M1(4,81); M2(17,142) = M1(4,82); M2(17,148) = M1(4,83); 
M2(18,3) = M1(5,5); M2(18,12) = M1(5,15); M2(18,13) = M1(5,16); M2(18,14) = M1(5,17); M2(18,17) = M1(5,18); M2(18,18) = M1(5,19); M2(18,19) = M1(5,20); M2(18,20) = M1(5,21); M2(18,23) = M1(5,22); M2(18,24) = M1(5,23); M2(18,25) = M1(5,24); M2(18,28) = M1(5,25); M2(18,29) = M1(5,26); M2(18,32) = M1(5,27); M2(18,38) = M1(5,28); M2(18,39) = M1(5,29); M2(18,40) = M1(5,30); M2(18,41) = M1(5,31); M2(18,42) = M1(5,32); M2(18,43) = M1(5,33); M2(18,46) = M1(5,34); M2(18,47) = M1(5,35); M2(18,48) = M1(5,36); M2(18,49) = M1(5,37); M2(18,50) = M1(5,38); M2(18,53) = M1(5,39); M2(18,54) = M1(5,40); M2(18,55) = M1(5,41); M2(18,56) = M1(5,42); M2(18,59) = M1(5,43); M2(18,60) = M1(5,44); M2(18,61) = M1(5,45); M2(18,64) = M1(5,46); M2(18,65) = M1(5,47); M2(18,68) = M1(5,48); M2(18,73) = M1(5,49); M2(18,74) = M1(5,50); M2(18,75) = M1(5,51); M2(18,76) = M1(5,52); M2(18,77) = M1(5,53); M2(18,80) = M1(5,54); M2(18,81) = M1(5,55); M2(18,82) = M1(5,56); M2(18,83) = M1(5,57); M2(18,86) = M1(5,58); M2(18,87) = M1(5,59); M2(18,88) = M1(5,60); M2(18,91) = M1(5,61); M2(18,92) = M1(5,62); M2(18,96) = M1(5,63); M2(18,102) = M1(5,64); M2(18,103) = M1(5,65); M2(18,104) = M1(5,66); M2(18,105) = M1(5,67); M2(18,108) = M1(5,68); M2(18,109) = M1(5,69); M2(18,110) = M1(5,70); M2(18,113) = M1(5,71); M2(18,114) = M1(5,72); M2(18,117) = M1(5,73); M2(18,123) = M1(5,74); M2(18,124) = M1(5,75); M2(18,125) = M1(5,76); M2(18,128) = M1(5,77); M2(18,129) = M1(5,78); M2(18,132) = M1(5,79); M2(18,138) = M1(5,80); M2(18,139) = M1(5,81); M2(18,142) = M1(5,82); M2(18,148) = M1(5,83); 
M2(19,4) = M1(7,7); M2(19,12) = M1(7,15); M2(19,13) = M1(7,16); M2(19,14) = M1(7,17); M2(19,17) = M1(7,18); M2(19,18) = M1(7,19); M2(19,19) = M1(7,20); M2(19,20) = M1(7,21); M2(19,23) = M1(7,22); M2(19,24) = M1(7,23); M2(19,25) = M1(7,24); M2(19,28) = M1(7,25); M2(19,29) = M1(7,26); M2(19,32) = M1(7,27); M2(19,38) = M1(7,28); M2(19,39) = M1(7,29); M2(19,40) = M1(7,30); M2(19,41) = M1(7,31); M2(19,42) = M1(7,32); M2(19,43) = M1(7,33); M2(19,46) = M1(7,34); M2(19,47) = M1(7,35); M2(19,48) = M1(7,36); M2(19,49) = M1(7,37); M2(19,50) = M1(7,38); M2(19,53) = M1(7,39); M2(19,54) = M1(7,40); M2(19,55) = M1(7,41); M2(19,56) = M1(7,42); M2(19,59) = M1(7,43); M2(19,60) = M1(7,44); M2(19,61) = M1(7,45); M2(19,64) = M1(7,46); M2(19,65) = M1(7,47); M2(19,68) = M1(7,48); M2(19,73) = M1(7,49); M2(19,74) = M1(7,50); M2(19,75) = M1(7,51); M2(19,76) = M1(7,52); M2(19,77) = M1(7,53); M2(19,80) = M1(7,54); M2(19,81) = M1(7,55); M2(19,82) = M1(7,56); M2(19,83) = M1(7,57); M2(19,86) = M1(7,58); M2(19,87) = M1(7,59); M2(19,88) = M1(7,60); M2(19,91) = M1(7,61); M2(19,92) = M1(7,62); M2(19,96) = M1(7,63); M2(19,102) = M1(7,64); M2(19,103) = M1(7,65); M2(19,104) = M1(7,66); M2(19,105) = M1(7,67); M2(19,108) = M1(7,68); M2(19,109) = M1(7,69); M2(19,110) = M1(7,70); M2(19,113) = M1(7,71); M2(19,114) = M1(7,72); M2(19,117) = M1(7,73); M2(19,123) = M1(7,74); M2(19,124) = M1(7,75); M2(19,125) = M1(7,76); M2(19,128) = M1(7,77); M2(19,129) = M1(7,78); M2(19,132) = M1(7,79); M2(19,138) = M1(7,80); M2(19,139) = M1(7,81); M2(19,142) = M1(7,82); M2(19,148) = M1(7,83); 
M2(20,5) = M1(8,8); M2(20,12) = M1(8,15); M2(20,13) = M1(8,16); M2(20,14) = M1(8,17); M2(20,17) = M1(8,18); M2(20,18) = M1(8,19); M2(20,19) = M1(8,20); M2(20,20) = M1(8,21); M2(20,23) = M1(8,22); M2(20,24) = M1(8,23); M2(20,25) = M1(8,24); M2(20,28) = M1(8,25); M2(20,29) = M1(8,26); M2(20,32) = M1(8,27); M2(20,38) = M1(8,28); M2(20,39) = M1(8,29); M2(20,40) = M1(8,30); M2(20,41) = M1(8,31); M2(20,42) = M1(8,32); M2(20,43) = M1(8,33); M2(20,46) = M1(8,34); M2(20,47) = M1(8,35); M2(20,48) = M1(8,36); M2(20,49) = M1(8,37); M2(20,50) = M1(8,38); M2(20,53) = M1(8,39); M2(20,54) = M1(8,40); M2(20,55) = M1(8,41); M2(20,56) = M1(8,42); M2(20,59) = M1(8,43); M2(20,60) = M1(8,44); M2(20,61) = M1(8,45); M2(20,64) = M1(8,46); M2(20,65) = M1(8,47); M2(20,68) = M1(8,48); M2(20,73) = M1(8,49); M2(20,74) = M1(8,50); M2(20,75) = M1(8,51); M2(20,76) = M1(8,52); M2(20,77) = M1(8,53); M2(20,80) = M1(8,54); M2(20,81) = M1(8,55); M2(20,82) = M1(8,56); M2(20,83) = M1(8,57); M2(20,86) = M1(8,58); M2(20,87) = M1(8,59); M2(20,88) = M1(8,60); M2(20,91) = M1(8,61); M2(20,92) = M1(8,62); M2(20,96) = M1(8,63); M2(20,102) = M1(8,64); M2(20,103) = M1(8,65); M2(20,104) = M1(8,66); M2(20,105) = M1(8,67); M2(20,108) = M1(8,68); M2(20,109) = M1(8,69); M2(20,110) = M1(8,70); M2(20,113) = M1(8,71); M2(20,114) = M1(8,72); M2(20,117) = M1(8,73); M2(20,123) = M1(8,74); M2(20,124) = M1(8,75); M2(20,125) = M1(8,76); M2(20,128) = M1(8,77); M2(20,129) = M1(8,78); M2(20,132) = M1(8,79); M2(20,138) = M1(8,80); M2(20,139) = M1(8,81); M2(20,142) = M1(8,82); M2(20,148) = M1(8,83); 
M2(21,6) = M1(9,9); M2(21,12) = M1(9,15); M2(21,13) = M1(9,16); M2(21,14) = M1(9,17); M2(21,17) = M1(9,18); M2(21,18) = M1(9,19); M2(21,19) = M1(9,20); M2(21,20) = M1(9,21); M2(21,23) = M1(9,22); M2(21,24) = M1(9,23); M2(21,25) = M1(9,24); M2(21,28) = M1(9,25); M2(21,29) = M1(9,26); M2(21,32) = M1(9,27); M2(21,38) = M1(9,28); M2(21,39) = M1(9,29); M2(21,40) = M1(9,30); M2(21,41) = M1(9,31); M2(21,42) = M1(9,32); M2(21,43) = M1(9,33); M2(21,46) = M1(9,34); M2(21,47) = M1(9,35); M2(21,48) = M1(9,36); M2(21,49) = M1(9,37); M2(21,50) = M1(9,38); M2(21,53) = M1(9,39); M2(21,54) = M1(9,40); M2(21,55) = M1(9,41); M2(21,56) = M1(9,42); M2(21,59) = M1(9,43); M2(21,60) = M1(9,44); M2(21,61) = M1(9,45); M2(21,64) = M1(9,46); M2(21,65) = M1(9,47); M2(21,68) = M1(9,48); M2(21,73) = M1(9,49); M2(21,74) = M1(9,50); M2(21,75) = M1(9,51); M2(21,76) = M1(9,52); M2(21,77) = M1(9,53); M2(21,80) = M1(9,54); M2(21,81) = M1(9,55); M2(21,82) = M1(9,56); M2(21,83) = M1(9,57); M2(21,86) = M1(9,58); M2(21,87) = M1(9,59); M2(21,88) = M1(9,60); M2(21,91) = M1(9,61); M2(21,92) = M1(9,62); M2(21,96) = M1(9,63); M2(21,102) = M1(9,64); M2(21,103) = M1(9,65); M2(21,104) = M1(9,66); M2(21,105) = M1(9,67); M2(21,108) = M1(9,68); M2(21,109) = M1(9,69); M2(21,110) = M1(9,70); M2(21,113) = M1(9,71); M2(21,114) = M1(9,72); M2(21,117) = M1(9,73); M2(21,123) = M1(9,74); M2(21,124) = M1(9,75); M2(21,125) = M1(9,76); M2(21,128) = M1(9,77); M2(21,129) = M1(9,78); M2(21,132) = M1(9,79); M2(21,138) = M1(9,80); M2(21,139) = M1(9,81); M2(21,142) = M1(9,82); M2(21,148) = M1(9,83); 
M2(22,7) = M1(10,10); M2(22,12) = M1(10,15); M2(22,13) = M1(10,16); M2(22,14) = M1(10,17); M2(22,17) = M1(10,18); M2(22,18) = M1(10,19); M2(22,19) = M1(10,20); M2(22,20) = M1(10,21); M2(22,23) = M1(10,22); M2(22,24) = M1(10,23); M2(22,25) = M1(10,24); M2(22,28) = M1(10,25); M2(22,29) = M1(10,26); M2(22,32) = M1(10,27); M2(22,38) = M1(10,28); M2(22,39) = M1(10,29); M2(22,40) = M1(10,30); M2(22,41) = M1(10,31); M2(22,42) = M1(10,32); M2(22,43) = M1(10,33); M2(22,46) = M1(10,34); M2(22,47) = M1(10,35); M2(22,48) = M1(10,36); M2(22,49) = M1(10,37); M2(22,50) = M1(10,38); M2(22,53) = M1(10,39); M2(22,54) = M1(10,40); M2(22,55) = M1(10,41); M2(22,56) = M1(10,42); M2(22,59) = M1(10,43); M2(22,60) = M1(10,44); M2(22,61) = M1(10,45); M2(22,64) = M1(10,46); M2(22,65) = M1(10,47); M2(22,68) = M1(10,48); M2(22,73) = M1(10,49); M2(22,74) = M1(10,50); M2(22,75) = M1(10,51); M2(22,76) = M1(10,52); M2(22,77) = M1(10,53); M2(22,80) = M1(10,54); M2(22,81) = M1(10,55); M2(22,82) = M1(10,56); M2(22,83) = M1(10,57); M2(22,86) = M1(10,58); M2(22,87) = M1(10,59); M2(22,88) = M1(10,60); M2(22,91) = M1(10,61); M2(22,92) = M1(10,62); M2(22,96) = M1(10,63); M2(22,102) = M1(10,64); M2(22,103) = M1(10,65); M2(22,104) = M1(10,66); M2(22,105) = M1(10,67); M2(22,108) = M1(10,68); M2(22,109) = M1(10,69); M2(22,110) = M1(10,70); M2(22,113) = M1(10,71); M2(22,114) = M1(10,72); M2(22,117) = M1(10,73); M2(22,123) = M1(10,74); M2(22,124) = M1(10,75); M2(22,125) = M1(10,76); M2(22,128) = M1(10,77); M2(22,129) = M1(10,78); M2(22,132) = M1(10,79); M2(22,138) = M1(10,80); M2(22,139) = M1(10,81); M2(22,142) = M1(10,82); M2(22,148) = M1(10,83); 
M2(23,8) = M1(11,11); M2(23,12) = M1(11,15); M2(23,13) = M1(11,16); M2(23,14) = M1(11,17); M2(23,17) = M1(11,18); M2(23,18) = M1(11,19); M2(23,19) = M1(11,20); M2(23,20) = M1(11,21); M2(23,23) = M1(11,22); M2(23,24) = M1(11,23); M2(23,25) = M1(11,24); M2(23,28) = M1(11,25); M2(23,29) = M1(11,26); M2(23,32) = M1(11,27); M2(23,38) = M1(11,28); M2(23,39) = M1(11,29); M2(23,40) = M1(11,30); M2(23,41) = M1(11,31); M2(23,42) = M1(11,32); M2(23,43) = M1(11,33); M2(23,46) = M1(11,34); M2(23,47) = M1(11,35); M2(23,48) = M1(11,36); M2(23,49) = M1(11,37); M2(23,50) = M1(11,38); M2(23,53) = M1(11,39); M2(23,54) = M1(11,40); M2(23,55) = M1(11,41); M2(23,56) = M1(11,42); M2(23,59) = M1(11,43); M2(23,60) = M1(11,44); M2(23,61) = M1(11,45); M2(23,64) = M1(11,46); M2(23,65) = M1(11,47); M2(23,68) = M1(11,48); M2(23,73) = M1(11,49); M2(23,74) = M1(11,50); M2(23,75) = M1(11,51); M2(23,76) = M1(11,52); M2(23,77) = M1(11,53); M2(23,80) = M1(11,54); M2(23,81) = M1(11,55); M2(23,82) = M1(11,56); M2(23,83) = M1(11,57); M2(23,86) = M1(11,58); M2(23,87) = M1(11,59); M2(23,88) = M1(11,60); M2(23,91) = M1(11,61); M2(23,92) = M1(11,62); M2(23,96) = M1(11,63); M2(23,102) = M1(11,64); M2(23,103) = M1(11,65); M2(23,104) = M1(11,66); M2(23,105) = M1(11,67); M2(23,108) = M1(11,68); M2(23,109) = M1(11,69); M2(23,110) = M1(11,70); M2(23,113) = M1(11,71); M2(23,114) = M1(11,72); M2(23,117) = M1(11,73); M2(23,123) = M1(11,74); M2(23,124) = M1(11,75); M2(23,125) = M1(11,76); M2(23,128) = M1(11,77); M2(23,129) = M1(11,78); M2(23,132) = M1(11,79); M2(23,138) = M1(11,80); M2(23,139) = M1(11,81); M2(23,142) = M1(11,82); M2(23,148) = M1(11,83); 
M2(24,9) = M1(12,12); M2(24,12) = M1(12,15); M2(24,13) = M1(12,16); M2(24,14) = M1(12,17); M2(24,17) = M1(12,18); M2(24,18) = M1(12,19); M2(24,19) = M1(12,20); M2(24,20) = M1(12,21); M2(24,23) = M1(12,22); M2(24,24) = M1(12,23); M2(24,25) = M1(12,24); M2(24,28) = M1(12,25); M2(24,29) = M1(12,26); M2(24,32) = M1(12,27); M2(24,38) = M1(12,28); M2(24,39) = M1(12,29); M2(24,40) = M1(12,30); M2(24,41) = M1(12,31); M2(24,42) = M1(12,32); M2(24,43) = M1(12,33); M2(24,46) = M1(12,34); M2(24,47) = M1(12,35); M2(24,48) = M1(12,36); M2(24,49) = M1(12,37); M2(24,50) = M1(12,38); M2(24,53) = M1(12,39); M2(24,54) = M1(12,40); M2(24,55) = M1(12,41); M2(24,56) = M1(12,42); M2(24,59) = M1(12,43); M2(24,60) = M1(12,44); M2(24,61) = M1(12,45); M2(24,64) = M1(12,46); M2(24,65) = M1(12,47); M2(24,68) = M1(12,48); M2(24,73) = M1(12,49); M2(24,74) = M1(12,50); M2(24,75) = M1(12,51); M2(24,76) = M1(12,52); M2(24,77) = M1(12,53); M2(24,80) = M1(12,54); M2(24,81) = M1(12,55); M2(24,82) = M1(12,56); M2(24,83) = M1(12,57); M2(24,86) = M1(12,58); M2(24,87) = M1(12,59); M2(24,88) = M1(12,60); M2(24,91) = M1(12,61); M2(24,92) = M1(12,62); M2(24,96) = M1(12,63); M2(24,102) = M1(12,64); M2(24,103) = M1(12,65); M2(24,104) = M1(12,66); M2(24,105) = M1(12,67); M2(24,108) = M1(12,68); M2(24,109) = M1(12,69); M2(24,110) = M1(12,70); M2(24,113) = M1(12,71); M2(24,114) = M1(12,72); M2(24,117) = M1(12,73); M2(24,123) = M1(12,74); M2(24,124) = M1(12,75); M2(24,125) = M1(12,76); M2(24,128) = M1(12,77); M2(24,129) = M1(12,78); M2(24,132) = M1(12,79); M2(24,138) = M1(12,80); M2(24,139) = M1(12,81); M2(24,142) = M1(12,82); M2(24,148) = M1(12,83); 
M2(25,10) = M1(13,13); M2(25,12) = M1(13,15); M2(25,13) = M1(13,16); M2(25,14) = M1(13,17); M2(25,17) = M1(13,18); M2(25,18) = M1(13,19); M2(25,19) = M1(13,20); M2(25,20) = M1(13,21); M2(25,23) = M1(13,22); M2(25,24) = M1(13,23); M2(25,25) = M1(13,24); M2(25,28) = M1(13,25); M2(25,29) = M1(13,26); M2(25,32) = M1(13,27); M2(25,38) = M1(13,28); M2(25,39) = M1(13,29); M2(25,40) = M1(13,30); M2(25,41) = M1(13,31); M2(25,42) = M1(13,32); M2(25,43) = M1(13,33); M2(25,46) = M1(13,34); M2(25,47) = M1(13,35); M2(25,48) = M1(13,36); M2(25,49) = M1(13,37); M2(25,50) = M1(13,38); M2(25,53) = M1(13,39); M2(25,54) = M1(13,40); M2(25,55) = M1(13,41); M2(25,56) = M1(13,42); M2(25,59) = M1(13,43); M2(25,60) = M1(13,44); M2(25,61) = M1(13,45); M2(25,64) = M1(13,46); M2(25,65) = M1(13,47); M2(25,68) = M1(13,48); M2(25,73) = M1(13,49); M2(25,74) = M1(13,50); M2(25,75) = M1(13,51); M2(25,76) = M1(13,52); M2(25,77) = M1(13,53); M2(25,80) = M1(13,54); M2(25,81) = M1(13,55); M2(25,82) = M1(13,56); M2(25,83) = M1(13,57); M2(25,86) = M1(13,58); M2(25,87) = M1(13,59); M2(25,88) = M1(13,60); M2(25,91) = M1(13,61); M2(25,92) = M1(13,62); M2(25,96) = M1(13,63); M2(25,102) = M1(13,64); M2(25,103) = M1(13,65); M2(25,104) = M1(13,66); M2(25,105) = M1(13,67); M2(25,108) = M1(13,68); M2(25,109) = M1(13,69); M2(25,110) = M1(13,70); M2(25,113) = M1(13,71); M2(25,114) = M1(13,72); M2(25,117) = M1(13,73); M2(25,123) = M1(13,74); M2(25,124) = M1(13,75); M2(25,125) = M1(13,76); M2(25,128) = M1(13,77); M2(25,129) = M1(13,78); M2(25,132) = M1(13,79); M2(25,138) = M1(13,80); M2(25,139) = M1(13,81); M2(25,142) = M1(13,82); M2(25,148) = M1(13,83); 
M2(26,11) = M1(14,14); M2(26,12) = M1(14,15); M2(26,13) = M1(14,16); M2(26,14) = M1(14,17); M2(26,17) = M1(14,18); M2(26,18) = M1(14,19); M2(26,19) = M1(14,20); M2(26,20) = M1(14,21); M2(26,23) = M1(14,22); M2(26,24) = M1(14,23); M2(26,25) = M1(14,24); M2(26,28) = M1(14,25); M2(26,29) = M1(14,26); M2(26,32) = M1(14,27); M2(26,38) = M1(14,28); M2(26,39) = M1(14,29); M2(26,40) = M1(14,30); M2(26,41) = M1(14,31); M2(26,42) = M1(14,32); M2(26,43) = M1(14,33); M2(26,46) = M1(14,34); M2(26,47) = M1(14,35); M2(26,48) = M1(14,36); M2(26,49) = M1(14,37); M2(26,50) = M1(14,38); M2(26,53) = M1(14,39); M2(26,54) = M1(14,40); M2(26,55) = M1(14,41); M2(26,56) = M1(14,42); M2(26,59) = M1(14,43); M2(26,60) = M1(14,44); M2(26,61) = M1(14,45); M2(26,64) = M1(14,46); M2(26,65) = M1(14,47); M2(26,68) = M1(14,48); M2(26,73) = M1(14,49); M2(26,74) = M1(14,50); M2(26,75) = M1(14,51); M2(26,76) = M1(14,52); M2(26,77) = M1(14,53); M2(26,80) = M1(14,54); M2(26,81) = M1(14,55); M2(26,82) = M1(14,56); M2(26,83) = M1(14,57); M2(26,86) = M1(14,58); M2(26,87) = M1(14,59); M2(26,88) = M1(14,60); M2(26,91) = M1(14,61); M2(26,92) = M1(14,62); M2(26,96) = M1(14,63); M2(26,102) = M1(14,64); M2(26,103) = M1(14,65); M2(26,104) = M1(14,66); M2(26,105) = M1(14,67); M2(26,108) = M1(14,68); M2(26,109) = M1(14,69); M2(26,110) = M1(14,70); M2(26,113) = M1(14,71); M2(26,114) = M1(14,72); M2(26,117) = M1(14,73); M2(26,123) = M1(14,74); M2(26,124) = M1(14,75); M2(26,125) = M1(14,76); M2(26,128) = M1(14,77); M2(26,129) = M1(14,78); M2(26,132) = M1(14,79); M2(26,138) = M1(14,80); M2(26,139) = M1(14,81); M2(26,142) = M1(14,82); M2(26,148) = M1(14,83); 
M2(27,0) = M1(3,3); M2(27,11) = M1(3,15); M2(27,12) = M1(3,16); M2(27,13) = M1(3,17); M2(27,16) = M1(3,18); M2(27,17) = M1(3,19); M2(27,18) = M1(3,20); M2(27,19) = M1(3,21); M2(27,22) = M1(3,22); M2(27,23) = M1(3,23); M2(27,24) = M1(3,24); M2(27,27) = M1(3,25); M2(27,28) = M1(3,26); M2(27,31) = M1(3,27); M2(27,37) = M1(3,28); M2(27,38) = M1(3,29); M2(27,39) = M1(3,30); M2(27,40) = M1(3,31); M2(27,41) = M1(3,32); M2(27,42) = M1(3,33); M2(27,45) = M1(3,34); M2(27,46) = M1(3,35); M2(27,47) = M1(3,36); M2(27,48) = M1(3,37); M2(27,49) = M1(3,38); M2(27,52) = M1(3,39); M2(27,53) = M1(3,40); M2(27,54) = M1(3,41); M2(27,55) = M1(3,42); M2(27,58) = M1(3,43); M2(27,59) = M1(3,44); M2(27,60) = M1(3,45); M2(27,63) = M1(3,46); M2(27,64) = M1(3,47); M2(27,67) = M1(3,48); M2(27,72) = M1(3,49); M2(27,73) = M1(3,50); M2(27,74) = M1(3,51); M2(27,75) = M1(3,52); M2(27,76) = M1(3,53); M2(27,79) = M1(3,54); M2(27,80) = M1(3,55); M2(27,81) = M1(3,56); M2(27,82) = M1(3,57); M2(27,85) = M1(3,58); M2(27,86) = M1(3,59); M2(27,87) = M1(3,60); M2(27,90) = M1(3,61); M2(27,91) = M1(3,62); M2(27,95) = M1(3,63); M2(27,101) = M1(3,64); M2(27,102) = M1(3,65); M2(27,103) = M1(3,66); M2(27,104) = M1(3,67); M2(27,107) = M1(3,68); M2(27,108) = M1(3,69); M2(27,109) = M1(3,70); M2(27,112) = M1(3,71); M2(27,113) = M1(3,72); M2(27,116) = M1(3,73); M2(27,122) = M1(3,74); M2(27,123) = M1(3,75); M2(27,124) = M1(3,76); M2(27,127) = M1(3,77); M2(27,128) = M1(3,78); M2(27,131) = M1(3,79); M2(27,137) = M1(3,80); M2(27,138) = M1(3,81); M2(27,141) = M1(3,82); M2(27,147) = M1(3,83); 
M2(28,1) = M1(4,4); M2(28,11) = M1(4,15); M2(28,12) = M1(4,16); M2(28,13) = M1(4,17); M2(28,16) = M1(4,18); M2(28,17) = M1(4,19); M2(28,18) = M1(4,20); M2(28,19) = M1(4,21); M2(28,22) = M1(4,22); M2(28,23) = M1(4,23); M2(28,24) = M1(4,24); M2(28,27) = M1(4,25); M2(28,28) = M1(4,26); M2(28,31) = M1(4,27); M2(28,37) = M1(4,28); M2(28,38) = M1(4,29); M2(28,39) = M1(4,30); M2(28,40) = M1(4,31); M2(28,41) = M1(4,32); M2(28,42) = M1(4,33); M2(28,45) = M1(4,34); M2(28,46) = M1(4,35); M2(28,47) = M1(4,36); M2(28,48) = M1(4,37); M2(28,49) = M1(4,38); M2(28,52) = M1(4,39); M2(28,53) = M1(4,40); M2(28,54) = M1(4,41); M2(28,55) = M1(4,42); M2(28,58) = M1(4,43); M2(28,59) = M1(4,44); M2(28,60) = M1(4,45); M2(28,63) = M1(4,46); M2(28,64) = M1(4,47); M2(28,67) = M1(4,48); M2(28,72) = M1(4,49); M2(28,73) = M1(4,50); M2(28,74) = M1(4,51); M2(28,75) = M1(4,52); M2(28,76) = M1(4,53); M2(28,79) = M1(4,54); M2(28,80) = M1(4,55); M2(28,81) = M1(4,56); M2(28,82) = M1(4,57); M2(28,85) = M1(4,58); M2(28,86) = M1(4,59); M2(28,87) = M1(4,60); M2(28,90) = M1(4,61); M2(28,91) = M1(4,62); M2(28,95) = M1(4,63); M2(28,101) = M1(4,64); M2(28,102) = M1(4,65); M2(28,103) = M1(4,66); M2(28,104) = M1(4,67); M2(28,107) = M1(4,68); M2(28,108) = M1(4,69); M2(28,109) = M1(4,70); M2(28,112) = M1(4,71); M2(28,113) = M1(4,72); M2(28,116) = M1(4,73); M2(28,122) = M1(4,74); M2(28,123) = M1(4,75); M2(28,124) = M1(4,76); M2(28,127) = M1(4,77); M2(28,128) = M1(4,78); M2(28,131) = M1(4,79); M2(28,137) = M1(4,80); M2(28,138) = M1(4,81); M2(28,141) = M1(4,82); M2(28,147) = M1(4,83); 
M2(29,2) = M1(5,5); M2(29,11) = M1(5,15); M2(29,12) = M1(5,16); M2(29,13) = M1(5,17); M2(29,16) = M1(5,18); M2(29,17) = M1(5,19); M2(29,18) = M1(5,20); M2(29,19) = M1(5,21); M2(29,22) = M1(5,22); M2(29,23) = M1(5,23); M2(29,24) = M1(5,24); M2(29,27) = M1(5,25); M2(29,28) = M1(5,26); M2(29,31) = M1(5,27); M2(29,37) = M1(5,28); M2(29,38) = M1(5,29); M2(29,39) = M1(5,30); M2(29,40) = M1(5,31); M2(29,41) = M1(5,32); M2(29,42) = M1(5,33); M2(29,45) = M1(5,34); M2(29,46) = M1(5,35); M2(29,47) = M1(5,36); M2(29,48) = M1(5,37); M2(29,49) = M1(5,38); M2(29,52) = M1(5,39); M2(29,53) = M1(5,40); M2(29,54) = M1(5,41); M2(29,55) = M1(5,42); M2(29,58) = M1(5,43); M2(29,59) = M1(5,44); M2(29,60) = M1(5,45); M2(29,63) = M1(5,46); M2(29,64) = M1(5,47); M2(29,67) = M1(5,48); M2(29,72) = M1(5,49); M2(29,73) = M1(5,50); M2(29,74) = M1(5,51); M2(29,75) = M1(5,52); M2(29,76) = M1(5,53); M2(29,79) = M1(5,54); M2(29,80) = M1(5,55); M2(29,81) = M1(5,56); M2(29,82) = M1(5,57); M2(29,85) = M1(5,58); M2(29,86) = M1(5,59); M2(29,87) = M1(5,60); M2(29,90) = M1(5,61); M2(29,91) = M1(5,62); M2(29,95) = M1(5,63); M2(29,101) = M1(5,64); M2(29,102) = M1(5,65); M2(29,103) = M1(5,66); M2(29,104) = M1(5,67); M2(29,107) = M1(5,68); M2(29,108) = M1(5,69); M2(29,109) = M1(5,70); M2(29,112) = M1(5,71); M2(29,113) = M1(5,72); M2(29,116) = M1(5,73); M2(29,122) = M1(5,74); M2(29,123) = M1(5,75); M2(29,124) = M1(5,76); M2(29,127) = M1(5,77); M2(29,128) = M1(5,78); M2(29,131) = M1(5,79); M2(29,137) = M1(5,80); M2(29,138) = M1(5,81); M2(29,141) = M1(5,82); M2(29,147) = M1(5,83); 
M2(30,3) = M1(6,6); M2(30,11) = M1(6,15); M2(30,12) = M1(6,16); M2(30,13) = M1(6,17); M2(30,16) = M1(6,18); M2(30,17) = M1(6,19); M2(30,18) = M1(6,20); M2(30,19) = M1(6,21); M2(30,22) = M1(6,22); M2(30,23) = M1(6,23); M2(30,24) = M1(6,24); M2(30,27) = M1(6,25); M2(30,28) = M1(6,26); M2(30,31) = M1(6,27); M2(30,37) = M1(6,28); M2(30,38) = M1(6,29); M2(30,39) = M1(6,30); M2(30,40) = M1(6,31); M2(30,41) = M1(6,32); M2(30,42) = M1(6,33); M2(30,45) = M1(6,34); M2(30,46) = M1(6,35); M2(30,47) = M1(6,36); M2(30,48) = M1(6,37); M2(30,49) = M1(6,38); M2(30,52) = M1(6,39); M2(30,53) = M1(6,40); M2(30,54) = M1(6,41); M2(30,55) = M1(6,42); M2(30,58) = M1(6,43); M2(30,59) = M1(6,44); M2(30,60) = M1(6,45); M2(30,63) = M1(6,46); M2(30,64) = M1(6,47); M2(30,67) = M1(6,48); M2(30,72) = M1(6,49); M2(30,73) = M1(6,50); M2(30,74) = M1(6,51); M2(30,75) = M1(6,52); M2(30,76) = M1(6,53); M2(30,79) = M1(6,54); M2(30,80) = M1(6,55); M2(30,81) = M1(6,56); M2(30,82) = M1(6,57); M2(30,85) = M1(6,58); M2(30,86) = M1(6,59); M2(30,87) = M1(6,60); M2(30,90) = M1(6,61); M2(30,91) = M1(6,62); M2(30,95) = M1(6,63); M2(30,101) = M1(6,64); M2(30,102) = M1(6,65); M2(30,103) = M1(6,66); M2(30,104) = M1(6,67); M2(30,107) = M1(6,68); M2(30,108) = M1(6,69); M2(30,109) = M1(6,70); M2(30,112) = M1(6,71); M2(30,113) = M1(6,72); M2(30,116) = M1(6,73); M2(30,122) = M1(6,74); M2(30,123) = M1(6,75); M2(30,124) = M1(6,76); M2(30,127) = M1(6,77); M2(30,128) = M1(6,78); M2(30,131) = M1(6,79); M2(30,137) = M1(6,80); M2(30,138) = M1(6,81); M2(30,141) = M1(6,82); M2(30,147) = M1(6,83); 
M2(31,4) = M1(8,8); M2(31,11) = M1(8,15); M2(31,12) = M1(8,16); M2(31,13) = M1(8,17); M2(31,16) = M1(8,18); M2(31,17) = M1(8,19); M2(31,18) = M1(8,20); M2(31,19) = M1(8,21); M2(31,22) = M1(8,22); M2(31,23) = M1(8,23); M2(31,24) = M1(8,24); M2(31,27) = M1(8,25); M2(31,28) = M1(8,26); M2(31,31) = M1(8,27); M2(31,37) = M1(8,28); M2(31,38) = M1(8,29); M2(31,39) = M1(8,30); M2(31,40) = M1(8,31); M2(31,41) = M1(8,32); M2(31,42) = M1(8,33); M2(31,45) = M1(8,34); M2(31,46) = M1(8,35); M2(31,47) = M1(8,36); M2(31,48) = M1(8,37); M2(31,49) = M1(8,38); M2(31,52) = M1(8,39); M2(31,53) = M1(8,40); M2(31,54) = M1(8,41); M2(31,55) = M1(8,42); M2(31,58) = M1(8,43); M2(31,59) = M1(8,44); M2(31,60) = M1(8,45); M2(31,63) = M1(8,46); M2(31,64) = M1(8,47); M2(31,67) = M1(8,48); M2(31,72) = M1(8,49); M2(31,73) = M1(8,50); M2(31,74) = M1(8,51); M2(31,75) = M1(8,52); M2(31,76) = M1(8,53); M2(31,79) = M1(8,54); M2(31,80) = M1(8,55); M2(31,81) = M1(8,56); M2(31,82) = M1(8,57); M2(31,85) = M1(8,58); M2(31,86) = M1(8,59); M2(31,87) = M1(8,60); M2(31,90) = M1(8,61); M2(31,91) = M1(8,62); M2(31,95) = M1(8,63); M2(31,101) = M1(8,64); M2(31,102) = M1(8,65); M2(31,103) = M1(8,66); M2(31,104) = M1(8,67); M2(31,107) = M1(8,68); M2(31,108) = M1(8,69); M2(31,109) = M1(8,70); M2(31,112) = M1(8,71); M2(31,113) = M1(8,72); M2(31,116) = M1(8,73); M2(31,122) = M1(8,74); M2(31,123) = M1(8,75); M2(31,124) = M1(8,76); M2(31,127) = M1(8,77); M2(31,128) = M1(8,78); M2(31,131) = M1(8,79); M2(31,137) = M1(8,80); M2(31,138) = M1(8,81); M2(31,141) = M1(8,82); M2(31,147) = M1(8,83); 
M2(32,5) = M1(9,9); M2(32,11) = M1(9,15); M2(32,12) = M1(9,16); M2(32,13) = M1(9,17); M2(32,16) = M1(9,18); M2(32,17) = M1(9,19); M2(32,18) = M1(9,20); M2(32,19) = M1(9,21); M2(32,22) = M1(9,22); M2(32,23) = M1(9,23); M2(32,24) = M1(9,24); M2(32,27) = M1(9,25); M2(32,28) = M1(9,26); M2(32,31) = M1(9,27); M2(32,37) = M1(9,28); M2(32,38) = M1(9,29); M2(32,39) = M1(9,30); M2(32,40) = M1(9,31); M2(32,41) = M1(9,32); M2(32,42) = M1(9,33); M2(32,45) = M1(9,34); M2(32,46) = M1(9,35); M2(32,47) = M1(9,36); M2(32,48) = M1(9,37); M2(32,49) = M1(9,38); M2(32,52) = M1(9,39); M2(32,53) = M1(9,40); M2(32,54) = M1(9,41); M2(32,55) = M1(9,42); M2(32,58) = M1(9,43); M2(32,59) = M1(9,44); M2(32,60) = M1(9,45); M2(32,63) = M1(9,46); M2(32,64) = M1(9,47); M2(32,67) = M1(9,48); M2(32,72) = M1(9,49); M2(32,73) = M1(9,50); M2(32,74) = M1(9,51); M2(32,75) = M1(9,52); M2(32,76) = M1(9,53); M2(32,79) = M1(9,54); M2(32,80) = M1(9,55); M2(32,81) = M1(9,56); M2(32,82) = M1(9,57); M2(32,85) = M1(9,58); M2(32,86) = M1(9,59); M2(32,87) = M1(9,60); M2(32,90) = M1(9,61); M2(32,91) = M1(9,62); M2(32,95) = M1(9,63); M2(32,101) = M1(9,64); M2(32,102) = M1(9,65); M2(32,103) = M1(9,66); M2(32,104) = M1(9,67); M2(32,107) = M1(9,68); M2(32,108) = M1(9,69); M2(32,109) = M1(9,70); M2(32,112) = M1(9,71); M2(32,113) = M1(9,72); M2(32,116) = M1(9,73); M2(32,122) = M1(9,74); M2(32,123) = M1(9,75); M2(32,124) = M1(9,76); M2(32,127) = M1(9,77); M2(32,128) = M1(9,78); M2(32,131) = M1(9,79); M2(32,137) = M1(9,80); M2(32,138) = M1(9,81); M2(32,141) = M1(9,82); M2(32,147) = M1(9,83); 
M2(33,6) = M1(10,10); M2(33,11) = M1(10,15); M2(33,12) = M1(10,16); M2(33,13) = M1(10,17); M2(33,16) = M1(10,18); M2(33,17) = M1(10,19); M2(33,18) = M1(10,20); M2(33,19) = M1(10,21); M2(33,22) = M1(10,22); M2(33,23) = M1(10,23); M2(33,24) = M1(10,24); M2(33,27) = M1(10,25); M2(33,28) = M1(10,26); M2(33,31) = M1(10,27); M2(33,37) = M1(10,28); M2(33,38) = M1(10,29); M2(33,39) = M1(10,30); M2(33,40) = M1(10,31); M2(33,41) = M1(10,32); M2(33,42) = M1(10,33); M2(33,45) = M1(10,34); M2(33,46) = M1(10,35); M2(33,47) = M1(10,36); M2(33,48) = M1(10,37); M2(33,49) = M1(10,38); M2(33,52) = M1(10,39); M2(33,53) = M1(10,40); M2(33,54) = M1(10,41); M2(33,55) = M1(10,42); M2(33,58) = M1(10,43); M2(33,59) = M1(10,44); M2(33,60) = M1(10,45); M2(33,63) = M1(10,46); M2(33,64) = M1(10,47); M2(33,67) = M1(10,48); M2(33,72) = M1(10,49); M2(33,73) = M1(10,50); M2(33,74) = M1(10,51); M2(33,75) = M1(10,52); M2(33,76) = M1(10,53); M2(33,79) = M1(10,54); M2(33,80) = M1(10,55); M2(33,81) = M1(10,56); M2(33,82) = M1(10,57); M2(33,85) = M1(10,58); M2(33,86) = M1(10,59); M2(33,87) = M1(10,60); M2(33,90) = M1(10,61); M2(33,91) = M1(10,62); M2(33,95) = M1(10,63); M2(33,101) = M1(10,64); M2(33,102) = M1(10,65); M2(33,103) = M1(10,66); M2(33,104) = M1(10,67); M2(33,107) = M1(10,68); M2(33,108) = M1(10,69); M2(33,109) = M1(10,70); M2(33,112) = M1(10,71); M2(33,113) = M1(10,72); M2(33,116) = M1(10,73); M2(33,122) = M1(10,74); M2(33,123) = M1(10,75); M2(33,124) = M1(10,76); M2(33,127) = M1(10,77); M2(33,128) = M1(10,78); M2(33,131) = M1(10,79); M2(33,137) = M1(10,80); M2(33,138) = M1(10,81); M2(33,141) = M1(10,82); M2(33,147) = M1(10,83); 
M2(34,7) = M1(11,11); M2(34,11) = M1(11,15); M2(34,12) = M1(11,16); M2(34,13) = M1(11,17); M2(34,16) = M1(11,18); M2(34,17) = M1(11,19); M2(34,18) = M1(11,20); M2(34,19) = M1(11,21); M2(34,22) = M1(11,22); M2(34,23) = M1(11,23); M2(34,24) = M1(11,24); M2(34,27) = M1(11,25); M2(34,28) = M1(11,26); M2(34,31) = M1(11,27); M2(34,37) = M1(11,28); M2(34,38) = M1(11,29); M2(34,39) = M1(11,30); M2(34,40) = M1(11,31); M2(34,41) = M1(11,32); M2(34,42) = M1(11,33); M2(34,45) = M1(11,34); M2(34,46) = M1(11,35); M2(34,47) = M1(11,36); M2(34,48) = M1(11,37); M2(34,49) = M1(11,38); M2(34,52) = M1(11,39); M2(34,53) = M1(11,40); M2(34,54) = M1(11,41); M2(34,55) = M1(11,42); M2(34,58) = M1(11,43); M2(34,59) = M1(11,44); M2(34,60) = M1(11,45); M2(34,63) = M1(11,46); M2(34,64) = M1(11,47); M2(34,67) = M1(11,48); M2(34,72) = M1(11,49); M2(34,73) = M1(11,50); M2(34,74) = M1(11,51); M2(34,75) = M1(11,52); M2(34,76) = M1(11,53); M2(34,79) = M1(11,54); M2(34,80) = M1(11,55); M2(34,81) = M1(11,56); M2(34,82) = M1(11,57); M2(34,85) = M1(11,58); M2(34,86) = M1(11,59); M2(34,87) = M1(11,60); M2(34,90) = M1(11,61); M2(34,91) = M1(11,62); M2(34,95) = M1(11,63); M2(34,101) = M1(11,64); M2(34,102) = M1(11,65); M2(34,103) = M1(11,66); M2(34,104) = M1(11,67); M2(34,107) = M1(11,68); M2(34,108) = M1(11,69); M2(34,109) = M1(11,70); M2(34,112) = M1(11,71); M2(34,113) = M1(11,72); M2(34,116) = M1(11,73); M2(34,122) = M1(11,74); M2(34,123) = M1(11,75); M2(34,124) = M1(11,76); M2(34,127) = M1(11,77); M2(34,128) = M1(11,78); M2(34,131) = M1(11,79); M2(34,137) = M1(11,80); M2(34,138) = M1(11,81); M2(34,141) = M1(11,82); M2(34,147) = M1(11,83); 
M2(35,8) = M1(12,12); M2(35,11) = M1(12,15); M2(35,12) = M1(12,16); M2(35,13) = M1(12,17); M2(35,16) = M1(12,18); M2(35,17) = M1(12,19); M2(35,18) = M1(12,20); M2(35,19) = M1(12,21); M2(35,22) = M1(12,22); M2(35,23) = M1(12,23); M2(35,24) = M1(12,24); M2(35,27) = M1(12,25); M2(35,28) = M1(12,26); M2(35,31) = M1(12,27); M2(35,37) = M1(12,28); M2(35,38) = M1(12,29); M2(35,39) = M1(12,30); M2(35,40) = M1(12,31); M2(35,41) = M1(12,32); M2(35,42) = M1(12,33); M2(35,45) = M1(12,34); M2(35,46) = M1(12,35); M2(35,47) = M1(12,36); M2(35,48) = M1(12,37); M2(35,49) = M1(12,38); M2(35,52) = M1(12,39); M2(35,53) = M1(12,40); M2(35,54) = M1(12,41); M2(35,55) = M1(12,42); M2(35,58) = M1(12,43); M2(35,59) = M1(12,44); M2(35,60) = M1(12,45); M2(35,63) = M1(12,46); M2(35,64) = M1(12,47); M2(35,67) = M1(12,48); M2(35,72) = M1(12,49); M2(35,73) = M1(12,50); M2(35,74) = M1(12,51); M2(35,75) = M1(12,52); M2(35,76) = M1(12,53); M2(35,79) = M1(12,54); M2(35,80) = M1(12,55); M2(35,81) = M1(12,56); M2(35,82) = M1(12,57); M2(35,85) = M1(12,58); M2(35,86) = M1(12,59); M2(35,87) = M1(12,60); M2(35,90) = M1(12,61); M2(35,91) = M1(12,62); M2(35,95) = M1(12,63); M2(35,101) = M1(12,64); M2(35,102) = M1(12,65); M2(35,103) = M1(12,66); M2(35,104) = M1(12,67); M2(35,107) = M1(12,68); M2(35,108) = M1(12,69); M2(35,109) = M1(12,70); M2(35,112) = M1(12,71); M2(35,113) = M1(12,72); M2(35,116) = M1(12,73); M2(35,122) = M1(12,74); M2(35,123) = M1(12,75); M2(35,124) = M1(12,76); M2(35,127) = M1(12,77); M2(35,128) = M1(12,78); M2(35,131) = M1(12,79); M2(35,137) = M1(12,80); M2(35,138) = M1(12,81); M2(35,141) = M1(12,82); M2(35,147) = M1(12,83); 
M2(36,10) = M1(14,14); M2(36,11) = M1(14,15); M2(36,12) = M1(14,16); M2(36,13) = M1(14,17); M2(36,16) = M1(14,18); M2(36,17) = M1(14,19); M2(36,18) = M1(14,20); M2(36,19) = M1(14,21); M2(36,22) = M1(14,22); M2(36,23) = M1(14,23); M2(36,24) = M1(14,24); M2(36,27) = M1(14,25); M2(36,28) = M1(14,26); M2(36,31) = M1(14,27); M2(36,37) = M1(14,28); M2(36,38) = M1(14,29); M2(36,39) = M1(14,30); M2(36,40) = M1(14,31); M2(36,41) = M1(14,32); M2(36,42) = M1(14,33); M2(36,45) = M1(14,34); M2(36,46) = M1(14,35); M2(36,47) = M1(14,36); M2(36,48) = M1(14,37); M2(36,49) = M1(14,38); M2(36,52) = M1(14,39); M2(36,53) = M1(14,40); M2(36,54) = M1(14,41); M2(36,55) = M1(14,42); M2(36,58) = M1(14,43); M2(36,59) = M1(14,44); M2(36,60) = M1(14,45); M2(36,63) = M1(14,46); M2(36,64) = M1(14,47); M2(36,67) = M1(14,48); M2(36,72) = M1(14,49); M2(36,73) = M1(14,50); M2(36,74) = M1(14,51); M2(36,75) = M1(14,52); M2(36,76) = M1(14,53); M2(36,79) = M1(14,54); M2(36,80) = M1(14,55); M2(36,81) = M1(14,56); M2(36,82) = M1(14,57); M2(36,85) = M1(14,58); M2(36,86) = M1(14,59); M2(36,87) = M1(14,60); M2(36,90) = M1(14,61); M2(36,91) = M1(14,62); M2(36,95) = M1(14,63); M2(36,101) = M1(14,64); M2(36,102) = M1(14,65); M2(36,103) = M1(14,66); M2(36,104) = M1(14,67); M2(36,107) = M1(14,68); M2(36,108) = M1(14,69); M2(36,109) = M1(14,70); M2(36,112) = M1(14,71); M2(36,113) = M1(14,72); M2(36,116) = M1(14,73); M2(36,122) = M1(14,74); M2(36,123) = M1(14,75); M2(36,124) = M1(14,76); M2(36,127) = M1(14,77); M2(36,128) = M1(14,78); M2(36,131) = M1(14,79); M2(36,137) = M1(14,80); M2(36,138) = M1(14,81); M2(36,141) = M1(14,82); M2(36,147) = M1(14,83); 
M2(37,48) = M1(3,3); M2(37,60) = M1(3,15); M2(37,61) = M1(3,16); M2(37,62) = M1(3,17); M2(37,63) = M1(3,18); M2(37,64) = M1(3,19); M2(37,65) = M1(3,20); M2(37,66) = M1(3,21); M2(37,67) = M1(3,22); M2(37,68) = M1(3,23); M2(37,69) = M1(3,24); M2(37,70) = M1(3,25); M2(37,71) = M1(3,26); M2(37,79) = M1(3,28); M2(37,80) = M1(3,29); M2(37,81) = M1(3,30); M2(37,82) = M1(3,31); M2(37,83) = M1(3,32); M2(37,84) = M1(3,33); M2(37,85) = M1(3,34); M2(37,86) = M1(3,35); M2(37,87) = M1(3,36); M2(37,88) = M1(3,37); M2(37,89) = M1(3,38); M2(37,90) = M1(3,39); M2(37,91) = M1(3,40); M2(37,92) = M1(3,41); M2(37,93) = M1(3,27); M2(37,94) = M1(3,42); M2(37,95) = M1(3,43); M2(37,96) = M1(3,44); M2(37,97) = M1(3,45); M2(37,98) = M1(3,46); M2(37,99) = M1(3,47); M2(37,100) = M1(3,48); M2(37,107) = M1(3,49); M2(37,108) = M1(3,50); M2(37,109) = M1(3,51); M2(37,110) = M1(3,52); M2(37,111) = M1(3,53); M2(37,112) = M1(3,54); M2(37,113) = M1(3,55); M2(37,114) = M1(3,56); M2(37,115) = M1(3,57); M2(37,116) = M1(3,58); M2(37,117) = M1(3,59); M2(37,118) = M1(3,60); M2(37,119) = M1(3,61); M2(37,120) = M1(3,62); M2(37,121) = M1(3,63); M2(37,127) = M1(3,64); M2(37,128) = M1(3,65); M2(37,129) = M1(3,66); M2(37,130) = M1(3,67); M2(37,131) = M1(3,68); M2(37,132) = M1(3,69); M2(37,133) = M1(3,70); M2(37,134) = M1(3,71); M2(37,135) = M1(3,72); M2(37,136) = M1(3,73); M2(37,141) = M1(3,74); M2(37,142) = M1(3,75); M2(37,143) = M1(3,76); M2(37,144) = M1(3,77); M2(37,145) = M1(3,78); M2(37,146) = M1(3,79); M2(37,150) = M1(3,80); M2(37,151) = M1(3,81); M2(37,152) = M1(3,82); M2(37,155) = M1(3,83); 
M2(38,49) = M1(4,4); M2(38,60) = M1(4,15); M2(38,61) = M1(4,16); M2(38,62) = M1(4,17); M2(38,63) = M1(4,18); M2(38,64) = M1(4,19); M2(38,65) = M1(4,20); M2(38,66) = M1(4,21); M2(38,67) = M1(4,22); M2(38,68) = M1(4,23); M2(38,69) = M1(4,24); M2(38,70) = M1(4,25); M2(38,71) = M1(4,26); M2(38,79) = M1(4,28); M2(38,80) = M1(4,29); M2(38,81) = M1(4,30); M2(38,82) = M1(4,31); M2(38,83) = M1(4,32); M2(38,84) = M1(4,33); M2(38,85) = M1(4,34); M2(38,86) = M1(4,35); M2(38,87) = M1(4,36); M2(38,88) = M1(4,37); M2(38,89) = M1(4,38); M2(38,90) = M1(4,39); M2(38,91) = M1(4,40); M2(38,92) = M1(4,41); M2(38,93) = M1(4,27); M2(38,94) = M1(4,42); M2(38,95) = M1(4,43); M2(38,96) = M1(4,44); M2(38,97) = M1(4,45); M2(38,98) = M1(4,46); M2(38,99) = M1(4,47); M2(38,100) = M1(4,48); M2(38,107) = M1(4,49); M2(38,108) = M1(4,50); M2(38,109) = M1(4,51); M2(38,110) = M1(4,52); M2(38,111) = M1(4,53); M2(38,112) = M1(4,54); M2(38,113) = M1(4,55); M2(38,114) = M1(4,56); M2(38,115) = M1(4,57); M2(38,116) = M1(4,58); M2(38,117) = M1(4,59); M2(38,118) = M1(4,60); M2(38,119) = M1(4,61); M2(38,120) = M1(4,62); M2(38,121) = M1(4,63); M2(38,127) = M1(4,64); M2(38,128) = M1(4,65); M2(38,129) = M1(4,66); M2(38,130) = M1(4,67); M2(38,131) = M1(4,68); M2(38,132) = M1(4,69); M2(38,133) = M1(4,70); M2(38,134) = M1(4,71); M2(38,135) = M1(4,72); M2(38,136) = M1(4,73); M2(38,141) = M1(4,74); M2(38,142) = M1(4,75); M2(38,143) = M1(4,76); M2(38,144) = M1(4,77); M2(38,145) = M1(4,78); M2(38,146) = M1(4,79); M2(38,150) = M1(4,80); M2(38,151) = M1(4,81); M2(38,152) = M1(4,82); M2(38,155) = M1(4,83); 
M2(39,50) = M1(5,5); M2(39,60) = M1(5,15); M2(39,61) = M1(5,16); M2(39,62) = M1(5,17); M2(39,63) = M1(5,18); M2(39,64) = M1(5,19); M2(39,65) = M1(5,20); M2(39,66) = M1(5,21); M2(39,67) = M1(5,22); M2(39,68) = M1(5,23); M2(39,69) = M1(5,24); M2(39,70) = M1(5,25); M2(39,71) = M1(5,26); M2(39,79) = M1(5,28); M2(39,80) = M1(5,29); M2(39,81) = M1(5,30); M2(39,82) = M1(5,31); M2(39,83) = M1(5,32); M2(39,84) = M1(5,33); M2(39,85) = M1(5,34); M2(39,86) = M1(5,35); M2(39,87) = M1(5,36); M2(39,88) = M1(5,37); M2(39,89) = M1(5,38); M2(39,90) = M1(5,39); M2(39,91) = M1(5,40); M2(39,92) = M1(5,41); M2(39,93) = M1(5,27); M2(39,94) = M1(5,42); M2(39,95) = M1(5,43); M2(39,96) = M1(5,44); M2(39,97) = M1(5,45); M2(39,98) = M1(5,46); M2(39,99) = M1(5,47); M2(39,100) = M1(5,48); M2(39,107) = M1(5,49); M2(39,108) = M1(5,50); M2(39,109) = M1(5,51); M2(39,110) = M1(5,52); M2(39,111) = M1(5,53); M2(39,112) = M1(5,54); M2(39,113) = M1(5,55); M2(39,114) = M1(5,56); M2(39,115) = M1(5,57); M2(39,116) = M1(5,58); M2(39,117) = M1(5,59); M2(39,118) = M1(5,60); M2(39,119) = M1(5,61); M2(39,120) = M1(5,62); M2(39,121) = M1(5,63); M2(39,127) = M1(5,64); M2(39,128) = M1(5,65); M2(39,129) = M1(5,66); M2(39,130) = M1(5,67); M2(39,131) = M1(5,68); M2(39,132) = M1(5,69); M2(39,133) = M1(5,70); M2(39,134) = M1(5,71); M2(39,135) = M1(5,72); M2(39,136) = M1(5,73); M2(39,141) = M1(5,74); M2(39,142) = M1(5,75); M2(39,143) = M1(5,76); M2(39,144) = M1(5,77); M2(39,145) = M1(5,78); M2(39,146) = M1(5,79); M2(39,150) = M1(5,80); M2(39,151) = M1(5,81); M2(39,152) = M1(5,82); M2(39,155) = M1(5,83); 
M2(40,51) = M1(6,6); M2(40,60) = M1(6,15); M2(40,61) = M1(6,16); M2(40,62) = M1(6,17); M2(40,63) = M1(6,18); M2(40,64) = M1(6,19); M2(40,65) = M1(6,20); M2(40,66) = M1(6,21); M2(40,67) = M1(6,22); M2(40,68) = M1(6,23); M2(40,69) = M1(6,24); M2(40,70) = M1(6,25); M2(40,71) = M1(6,26); M2(40,79) = M1(6,28); M2(40,80) = M1(6,29); M2(40,81) = M1(6,30); M2(40,82) = M1(6,31); M2(40,83) = M1(6,32); M2(40,84) = M1(6,33); M2(40,85) = M1(6,34); M2(40,86) = M1(6,35); M2(40,87) = M1(6,36); M2(40,88) = M1(6,37); M2(40,89) = M1(6,38); M2(40,90) = M1(6,39); M2(40,91) = M1(6,40); M2(40,92) = M1(6,41); M2(40,93) = M1(6,27); M2(40,94) = M1(6,42); M2(40,95) = M1(6,43); M2(40,96) = M1(6,44); M2(40,97) = M1(6,45); M2(40,98) = M1(6,46); M2(40,99) = M1(6,47); M2(40,100) = M1(6,48); M2(40,107) = M1(6,49); M2(40,108) = M1(6,50); M2(40,109) = M1(6,51); M2(40,110) = M1(6,52); M2(40,111) = M1(6,53); M2(40,112) = M1(6,54); M2(40,113) = M1(6,55); M2(40,114) = M1(6,56); M2(40,115) = M1(6,57); M2(40,116) = M1(6,58); M2(40,117) = M1(6,59); M2(40,118) = M1(6,60); M2(40,119) = M1(6,61); M2(40,120) = M1(6,62); M2(40,121) = M1(6,63); M2(40,127) = M1(6,64); M2(40,128) = M1(6,65); M2(40,129) = M1(6,66); M2(40,130) = M1(6,67); M2(40,131) = M1(6,68); M2(40,132) = M1(6,69); M2(40,133) = M1(6,70); M2(40,134) = M1(6,71); M2(40,135) = M1(6,72); M2(40,136) = M1(6,73); M2(40,141) = M1(6,74); M2(40,142) = M1(6,75); M2(40,143) = M1(6,76); M2(40,144) = M1(6,77); M2(40,145) = M1(6,78); M2(40,146) = M1(6,79); M2(40,150) = M1(6,80); M2(40,151) = M1(6,81); M2(40,152) = M1(6,82); M2(40,155) = M1(6,83); 
M2(41,52) = M1(7,7); M2(41,60) = M1(7,15); M2(41,61) = M1(7,16); M2(41,62) = M1(7,17); M2(41,63) = M1(7,18); M2(41,64) = M1(7,19); M2(41,65) = M1(7,20); M2(41,66) = M1(7,21); M2(41,67) = M1(7,22); M2(41,68) = M1(7,23); M2(41,69) = M1(7,24); M2(41,70) = M1(7,25); M2(41,71) = M1(7,26); M2(41,79) = M1(7,28); M2(41,80) = M1(7,29); M2(41,81) = M1(7,30); M2(41,82) = M1(7,31); M2(41,83) = M1(7,32); M2(41,84) = M1(7,33); M2(41,85) = M1(7,34); M2(41,86) = M1(7,35); M2(41,87) = M1(7,36); M2(41,88) = M1(7,37); M2(41,89) = M1(7,38); M2(41,90) = M1(7,39); M2(41,91) = M1(7,40); M2(41,92) = M1(7,41); M2(41,93) = M1(7,27); M2(41,94) = M1(7,42); M2(41,95) = M1(7,43); M2(41,96) = M1(7,44); M2(41,97) = M1(7,45); M2(41,98) = M1(7,46); M2(41,99) = M1(7,47); M2(41,100) = M1(7,48); M2(41,107) = M1(7,49); M2(41,108) = M1(7,50); M2(41,109) = M1(7,51); M2(41,110) = M1(7,52); M2(41,111) = M1(7,53); M2(41,112) = M1(7,54); M2(41,113) = M1(7,55); M2(41,114) = M1(7,56); M2(41,115) = M1(7,57); M2(41,116) = M1(7,58); M2(41,117) = M1(7,59); M2(41,118) = M1(7,60); M2(41,119) = M1(7,61); M2(41,120) = M1(7,62); M2(41,121) = M1(7,63); M2(41,127) = M1(7,64); M2(41,128) = M1(7,65); M2(41,129) = M1(7,66); M2(41,130) = M1(7,67); M2(41,131) = M1(7,68); M2(41,132) = M1(7,69); M2(41,133) = M1(7,70); M2(41,134) = M1(7,71); M2(41,135) = M1(7,72); M2(41,136) = M1(7,73); M2(41,141) = M1(7,74); M2(41,142) = M1(7,75); M2(41,143) = M1(7,76); M2(41,144) = M1(7,77); M2(41,145) = M1(7,78); M2(41,146) = M1(7,79); M2(41,150) = M1(7,80); M2(41,151) = M1(7,81); M2(41,152) = M1(7,82); M2(41,155) = M1(7,83); 
M2(42,53) = M1(8,8); M2(42,60) = M1(8,15); M2(42,61) = M1(8,16); M2(42,62) = M1(8,17); M2(42,63) = M1(8,18); M2(42,64) = M1(8,19); M2(42,65) = M1(8,20); M2(42,66) = M1(8,21); M2(42,67) = M1(8,22); M2(42,68) = M1(8,23); M2(42,69) = M1(8,24); M2(42,70) = M1(8,25); M2(42,71) = M1(8,26); M2(42,79) = M1(8,28); M2(42,80) = M1(8,29); M2(42,81) = M1(8,30); M2(42,82) = M1(8,31); M2(42,83) = M1(8,32); M2(42,84) = M1(8,33); M2(42,85) = M1(8,34); M2(42,86) = M1(8,35); M2(42,87) = M1(8,36); M2(42,88) = M1(8,37); M2(42,89) = M1(8,38); M2(42,90) = M1(8,39); M2(42,91) = M1(8,40); M2(42,92) = M1(8,41); M2(42,93) = M1(8,27); M2(42,94) = M1(8,42); M2(42,95) = M1(8,43); M2(42,96) = M1(8,44); M2(42,97) = M1(8,45); M2(42,98) = M1(8,46); M2(42,99) = M1(8,47); M2(42,100) = M1(8,48); M2(42,107) = M1(8,49); M2(42,108) = M1(8,50); M2(42,109) = M1(8,51); M2(42,110) = M1(8,52); M2(42,111) = M1(8,53); M2(42,112) = M1(8,54); M2(42,113) = M1(8,55); M2(42,114) = M1(8,56); M2(42,115) = M1(8,57); M2(42,116) = M1(8,58); M2(42,117) = M1(8,59); M2(42,118) = M1(8,60); M2(42,119) = M1(8,61); M2(42,120) = M1(8,62); M2(42,121) = M1(8,63); M2(42,127) = M1(8,64); M2(42,128) = M1(8,65); M2(42,129) = M1(8,66); M2(42,130) = M1(8,67); M2(42,131) = M1(8,68); M2(42,132) = M1(8,69); M2(42,133) = M1(8,70); M2(42,134) = M1(8,71); M2(42,135) = M1(8,72); M2(42,136) = M1(8,73); M2(42,141) = M1(8,74); M2(42,142) = M1(8,75); M2(42,143) = M1(8,76); M2(42,144) = M1(8,77); M2(42,145) = M1(8,78); M2(42,146) = M1(8,79); M2(42,150) = M1(8,80); M2(42,151) = M1(8,81); M2(42,152) = M1(8,82); M2(42,155) = M1(8,83); 
M2(43,54) = M1(9,9); M2(43,60) = M1(9,15); M2(43,61) = M1(9,16); M2(43,62) = M1(9,17); M2(43,63) = M1(9,18); M2(43,64) = M1(9,19); M2(43,65) = M1(9,20); M2(43,66) = M1(9,21); M2(43,67) = M1(9,22); M2(43,68) = M1(9,23); M2(43,69) = M1(9,24); M2(43,70) = M1(9,25); M2(43,71) = M1(9,26); M2(43,79) = M1(9,28); M2(43,80) = M1(9,29); M2(43,81) = M1(9,30); M2(43,82) = M1(9,31); M2(43,83) = M1(9,32); M2(43,84) = M1(9,33); M2(43,85) = M1(9,34); M2(43,86) = M1(9,35); M2(43,87) = M1(9,36); M2(43,88) = M1(9,37); M2(43,89) = M1(9,38); M2(43,90) = M1(9,39); M2(43,91) = M1(9,40); M2(43,92) = M1(9,41); M2(43,93) = M1(9,27); M2(43,94) = M1(9,42); M2(43,95) = M1(9,43); M2(43,96) = M1(9,44); M2(43,97) = M1(9,45); M2(43,98) = M1(9,46); M2(43,99) = M1(9,47); M2(43,100) = M1(9,48); M2(43,107) = M1(9,49); M2(43,108) = M1(9,50); M2(43,109) = M1(9,51); M2(43,110) = M1(9,52); M2(43,111) = M1(9,53); M2(43,112) = M1(9,54); M2(43,113) = M1(9,55); M2(43,114) = M1(9,56); M2(43,115) = M1(9,57); M2(43,116) = M1(9,58); M2(43,117) = M1(9,59); M2(43,118) = M1(9,60); M2(43,119) = M1(9,61); M2(43,120) = M1(9,62); M2(43,121) = M1(9,63); M2(43,127) = M1(9,64); M2(43,128) = M1(9,65); M2(43,129) = M1(9,66); M2(43,130) = M1(9,67); M2(43,131) = M1(9,68); M2(43,132) = M1(9,69); M2(43,133) = M1(9,70); M2(43,134) = M1(9,71); M2(43,135) = M1(9,72); M2(43,136) = M1(9,73); M2(43,141) = M1(9,74); M2(43,142) = M1(9,75); M2(43,143) = M1(9,76); M2(43,144) = M1(9,77); M2(43,145) = M1(9,78); M2(43,146) = M1(9,79); M2(43,150) = M1(9,80); M2(43,151) = M1(9,81); M2(43,152) = M1(9,82); M2(43,155) = M1(9,83); 
M2(44,55) = M1(10,10); M2(44,60) = M1(10,15); M2(44,61) = M1(10,16); M2(44,62) = M1(10,17); M2(44,63) = M1(10,18); M2(44,64) = M1(10,19); M2(44,65) = M1(10,20); M2(44,66) = M1(10,21); M2(44,67) = M1(10,22); M2(44,68) = M1(10,23); M2(44,69) = M1(10,24); M2(44,70) = M1(10,25); M2(44,71) = M1(10,26); M2(44,79) = M1(10,28); M2(44,80) = M1(10,29); M2(44,81) = M1(10,30); M2(44,82) = M1(10,31); M2(44,83) = M1(10,32); M2(44,84) = M1(10,33); M2(44,85) = M1(10,34); M2(44,86) = M1(10,35); M2(44,87) = M1(10,36); M2(44,88) = M1(10,37); M2(44,89) = M1(10,38); M2(44,90) = M1(10,39); M2(44,91) = M1(10,40); M2(44,92) = M1(10,41); M2(44,93) = M1(10,27); M2(44,94) = M1(10,42); M2(44,95) = M1(10,43); M2(44,96) = M1(10,44); M2(44,97) = M1(10,45); M2(44,98) = M1(10,46); M2(44,99) = M1(10,47); M2(44,100) = M1(10,48); M2(44,107) = M1(10,49); M2(44,108) = M1(10,50); M2(44,109) = M1(10,51); M2(44,110) = M1(10,52); M2(44,111) = M1(10,53); M2(44,112) = M1(10,54); M2(44,113) = M1(10,55); M2(44,114) = M1(10,56); M2(44,115) = M1(10,57); M2(44,116) = M1(10,58); M2(44,117) = M1(10,59); M2(44,118) = M1(10,60); M2(44,119) = M1(10,61); M2(44,120) = M1(10,62); M2(44,121) = M1(10,63); M2(44,127) = M1(10,64); M2(44,128) = M1(10,65); M2(44,129) = M1(10,66); M2(44,130) = M1(10,67); M2(44,131) = M1(10,68); M2(44,132) = M1(10,69); M2(44,133) = M1(10,70); M2(44,134) = M1(10,71); M2(44,135) = M1(10,72); M2(44,136) = M1(10,73); M2(44,141) = M1(10,74); M2(44,142) = M1(10,75); M2(44,143) = M1(10,76); M2(44,144) = M1(10,77); M2(44,145) = M1(10,78); M2(44,146) = M1(10,79); M2(44,150) = M1(10,80); M2(44,151) = M1(10,81); M2(44,152) = M1(10,82); M2(44,155) = M1(10,83); 
M2(45,56) = M1(11,11); M2(45,60) = M1(11,15); M2(45,61) = M1(11,16); M2(45,62) = M1(11,17); M2(45,63) = M1(11,18); M2(45,64) = M1(11,19); M2(45,65) = M1(11,20); M2(45,66) = M1(11,21); M2(45,67) = M1(11,22); M2(45,68) = M1(11,23); M2(45,69) = M1(11,24); M2(45,70) = M1(11,25); M2(45,71) = M1(11,26); M2(45,79) = M1(11,28); M2(45,80) = M1(11,29); M2(45,81) = M1(11,30); M2(45,82) = M1(11,31); M2(45,83) = M1(11,32); M2(45,84) = M1(11,33); M2(45,85) = M1(11,34); M2(45,86) = M1(11,35); M2(45,87) = M1(11,36); M2(45,88) = M1(11,37); M2(45,89) = M1(11,38); M2(45,90) = M1(11,39); M2(45,91) = M1(11,40); M2(45,92) = M1(11,41); M2(45,93) = M1(11,27); M2(45,94) = M1(11,42); M2(45,95) = M1(11,43); M2(45,96) = M1(11,44); M2(45,97) = M1(11,45); M2(45,98) = M1(11,46); M2(45,99) = M1(11,47); M2(45,100) = M1(11,48); M2(45,107) = M1(11,49); M2(45,108) = M1(11,50); M2(45,109) = M1(11,51); M2(45,110) = M1(11,52); M2(45,111) = M1(11,53); M2(45,112) = M1(11,54); M2(45,113) = M1(11,55); M2(45,114) = M1(11,56); M2(45,115) = M1(11,57); M2(45,116) = M1(11,58); M2(45,117) = M1(11,59); M2(45,118) = M1(11,60); M2(45,119) = M1(11,61); M2(45,120) = M1(11,62); M2(45,121) = M1(11,63); M2(45,127) = M1(11,64); M2(45,128) = M1(11,65); M2(45,129) = M1(11,66); M2(45,130) = M1(11,67); M2(45,131) = M1(11,68); M2(45,132) = M1(11,69); M2(45,133) = M1(11,70); M2(45,134) = M1(11,71); M2(45,135) = M1(11,72); M2(45,136) = M1(11,73); M2(45,141) = M1(11,74); M2(45,142) = M1(11,75); M2(45,143) = M1(11,76); M2(45,144) = M1(11,77); M2(45,145) = M1(11,78); M2(45,146) = M1(11,79); M2(45,150) = M1(11,80); M2(45,151) = M1(11,81); M2(45,152) = M1(11,82); M2(45,155) = M1(11,83); 
M2(46,57) = M1(12,12); M2(46,60) = M1(12,15); M2(46,61) = M1(12,16); M2(46,62) = M1(12,17); M2(46,63) = M1(12,18); M2(46,64) = M1(12,19); M2(46,65) = M1(12,20); M2(46,66) = M1(12,21); M2(46,67) = M1(12,22); M2(46,68) = M1(12,23); M2(46,69) = M1(12,24); M2(46,70) = M1(12,25); M2(46,71) = M1(12,26); M2(46,79) = M1(12,28); M2(46,80) = M1(12,29); M2(46,81) = M1(12,30); M2(46,82) = M1(12,31); M2(46,83) = M1(12,32); M2(46,84) = M1(12,33); M2(46,85) = M1(12,34); M2(46,86) = M1(12,35); M2(46,87) = M1(12,36); M2(46,88) = M1(12,37); M2(46,89) = M1(12,38); M2(46,90) = M1(12,39); M2(46,91) = M1(12,40); M2(46,92) = M1(12,41); M2(46,93) = M1(12,27); M2(46,94) = M1(12,42); M2(46,95) = M1(12,43); M2(46,96) = M1(12,44); M2(46,97) = M1(12,45); M2(46,98) = M1(12,46); M2(46,99) = M1(12,47); M2(46,100) = M1(12,48); M2(46,107) = M1(12,49); M2(46,108) = M1(12,50); M2(46,109) = M1(12,51); M2(46,110) = M1(12,52); M2(46,111) = M1(12,53); M2(46,112) = M1(12,54); M2(46,113) = M1(12,55); M2(46,114) = M1(12,56); M2(46,115) = M1(12,57); M2(46,116) = M1(12,58); M2(46,117) = M1(12,59); M2(46,118) = M1(12,60); M2(46,119) = M1(12,61); M2(46,120) = M1(12,62); M2(46,121) = M1(12,63); M2(46,127) = M1(12,64); M2(46,128) = M1(12,65); M2(46,129) = M1(12,66); M2(46,130) = M1(12,67); M2(46,131) = M1(12,68); M2(46,132) = M1(12,69); M2(46,133) = M1(12,70); M2(46,134) = M1(12,71); M2(46,135) = M1(12,72); M2(46,136) = M1(12,73); M2(46,141) = M1(12,74); M2(46,142) = M1(12,75); M2(46,143) = M1(12,76); M2(46,144) = M1(12,77); M2(46,145) = M1(12,78); M2(46,146) = M1(12,79); M2(46,150) = M1(12,80); M2(46,151) = M1(12,81); M2(46,152) = M1(12,82); M2(46,155) = M1(12,83); 
M2(47,58) = M1(13,13); M2(47,60) = M1(13,15); M2(47,61) = M1(13,16); M2(47,62) = M1(13,17); M2(47,63) = M1(13,18); M2(47,64) = M1(13,19); M2(47,65) = M1(13,20); M2(47,66) = M1(13,21); M2(47,67) = M1(13,22); M2(47,68) = M1(13,23); M2(47,69) = M1(13,24); M2(47,70) = M1(13,25); M2(47,71) = M1(13,26); M2(47,79) = M1(13,28); M2(47,80) = M1(13,29); M2(47,81) = M1(13,30); M2(47,82) = M1(13,31); M2(47,83) = M1(13,32); M2(47,84) = M1(13,33); M2(47,85) = M1(13,34); M2(47,86) = M1(13,35); M2(47,87) = M1(13,36); M2(47,88) = M1(13,37); M2(47,89) = M1(13,38); M2(47,90) = M1(13,39); M2(47,91) = M1(13,40); M2(47,92) = M1(13,41); M2(47,93) = M1(13,27); M2(47,94) = M1(13,42); M2(47,95) = M1(13,43); M2(47,96) = M1(13,44); M2(47,97) = M1(13,45); M2(47,98) = M1(13,46); M2(47,99) = M1(13,47); M2(47,100) = M1(13,48); M2(47,107) = M1(13,49); M2(47,108) = M1(13,50); M2(47,109) = M1(13,51); M2(47,110) = M1(13,52); M2(47,111) = M1(13,53); M2(47,112) = M1(13,54); M2(47,113) = M1(13,55); M2(47,114) = M1(13,56); M2(47,115) = M1(13,57); M2(47,116) = M1(13,58); M2(47,117) = M1(13,59); M2(47,118) = M1(13,60); M2(47,119) = M1(13,61); M2(47,120) = M1(13,62); M2(47,121) = M1(13,63); M2(47,127) = M1(13,64); M2(47,128) = M1(13,65); M2(47,129) = M1(13,66); M2(47,130) = M1(13,67); M2(47,131) = M1(13,68); M2(47,132) = M1(13,69); M2(47,133) = M1(13,70); M2(47,134) = M1(13,71); M2(47,135) = M1(13,72); M2(47,136) = M1(13,73); M2(47,141) = M1(13,74); M2(47,142) = M1(13,75); M2(47,143) = M1(13,76); M2(47,144) = M1(13,77); M2(47,145) = M1(13,78); M2(47,146) = M1(13,79); M2(47,150) = M1(13,80); M2(47,151) = M1(13,81); M2(47,152) = M1(13,82); M2(47,155) = M1(13,83); 
M2(48,59) = M1(14,14); M2(48,60) = M1(14,15); M2(48,61) = M1(14,16); M2(48,62) = M1(14,17); M2(48,63) = M1(14,18); M2(48,64) = M1(14,19); M2(48,65) = M1(14,20); M2(48,66) = M1(14,21); M2(48,67) = M1(14,22); M2(48,68) = M1(14,23); M2(48,69) = M1(14,24); M2(48,70) = M1(14,25); M2(48,71) = M1(14,26); M2(48,79) = M1(14,28); M2(48,80) = M1(14,29); M2(48,81) = M1(14,30); M2(48,82) = M1(14,31); M2(48,83) = M1(14,32); M2(48,84) = M1(14,33); M2(48,85) = M1(14,34); M2(48,86) = M1(14,35); M2(48,87) = M1(14,36); M2(48,88) = M1(14,37); M2(48,89) = M1(14,38); M2(48,90) = M1(14,39); M2(48,91) = M1(14,40); M2(48,92) = M1(14,41); M2(48,93) = M1(14,27); M2(48,94) = M1(14,42); M2(48,95) = M1(14,43); M2(48,96) = M1(14,44); M2(48,97) = M1(14,45); M2(48,98) = M1(14,46); M2(48,99) = M1(14,47); M2(48,100) = M1(14,48); M2(48,107) = M1(14,49); M2(48,108) = M1(14,50); M2(48,109) = M1(14,51); M2(48,110) = M1(14,52); M2(48,111) = M1(14,53); M2(48,112) = M1(14,54); M2(48,113) = M1(14,55); M2(48,114) = M1(14,56); M2(48,115) = M1(14,57); M2(48,116) = M1(14,58); M2(48,117) = M1(14,59); M2(48,118) = M1(14,60); M2(48,119) = M1(14,61); M2(48,120) = M1(14,62); M2(48,121) = M1(14,63); M2(48,127) = M1(14,64); M2(48,128) = M1(14,65); M2(48,129) = M1(14,66); M2(48,130) = M1(14,67); M2(48,131) = M1(14,68); M2(48,132) = M1(14,69); M2(48,133) = M1(14,70); M2(48,134) = M1(14,71); M2(48,135) = M1(14,72); M2(48,136) = M1(14,73); M2(48,141) = M1(14,74); M2(48,142) = M1(14,75); M2(48,143) = M1(14,76); M2(48,144) = M1(14,77); M2(48,145) = M1(14,78); M2(48,146) = M1(14,79); M2(48,150) = M1(14,80); M2(48,151) = M1(14,81); M2(48,152) = M1(14,82); M2(48,155) = M1(14,83); 
M2(49,39) = M1(1,1); M2(49,55) = M1(1,15); M2(49,56) = M1(1,16); M2(49,57) = M1(1,17); M2(49,59) = M1(1,18); M2(49,60) = M1(1,19); M2(49,61) = M1(1,20); M2(49,62) = M1(1,21); M2(49,64) = M1(1,22); M2(49,65) = M1(1,23); M2(49,66) = M1(1,24); M2(49,68) = M1(1,25); M2(49,69) = M1(1,26); M2(49,71) = M1(1,27); M2(49,73) = M1(1,28); M2(49,74) = M1(1,29); M2(49,75) = M1(1,30); M2(49,76) = M1(1,31); M2(49,77) = M1(1,32); M2(49,78) = M1(1,33); M2(49,80) = M1(1,34); M2(49,81) = M1(1,35); M2(49,82) = M1(1,36); M2(49,83) = M1(1,37); M2(49,84) = M1(1,38); M2(49,86) = M1(1,39); M2(49,87) = M1(1,40); M2(49,88) = M1(1,41); M2(49,89) = M1(1,42); M2(49,91) = M1(1,43); M2(49,92) = M1(1,44); M2(49,94) = M1(1,45); M2(49,96) = M1(1,46); M2(49,97) = M1(1,47); M2(49,99) = M1(1,48); M2(49,102) = M1(1,49); M2(49,103) = M1(1,50); M2(49,104) = M1(1,51); M2(49,105) = M1(1,52); M2(49,106) = M1(1,53); M2(49,108) = M1(1,54); M2(49,109) = M1(1,55); M2(49,110) = M1(1,56); M2(49,111) = M1(1,57); M2(49,113) = M1(1,58); M2(49,114) = M1(1,59); M2(49,115) = M1(1,60); M2(49,117) = M1(1,61); M2(49,118) = M1(1,62); M2(49,120) = M1(1,63); M2(49,123) = M1(1,64); M2(49,124) = M1(1,65); M2(49,125) = M1(1,66); M2(49,126) = M1(1,67); M2(49,128) = M1(1,68); M2(49,129) = M1(1,69); M2(49,130) = M1(1,70); M2(49,132) = M1(1,71); M2(49,133) = M1(1,72); M2(49,135) = M1(1,73); M2(49,138) = M1(1,74); M2(49,139) = M1(1,75); M2(49,140) = M1(1,76); M2(49,142) = M1(1,77); M2(49,143) = M1(1,78); M2(49,145) = M1(1,79); M2(49,148) = M1(1,80); M2(49,149) = M1(1,81); M2(49,151) = M1(1,82); M2(49,154) = M1(1,83); 
M2(50,40) = M1(2,2); M2(50,55) = M1(2,15); M2(50,56) = M1(2,16); M2(50,57) = M1(2,17); M2(50,59) = M1(2,18); M2(50,60) = M1(2,19); M2(50,61) = M1(2,20); M2(50,62) = M1(2,21); M2(50,64) = M1(2,22); M2(50,65) = M1(2,23); M2(50,66) = M1(2,24); M2(50,68) = M1(2,25); M2(50,69) = M1(2,26); M2(50,71) = M1(2,27); M2(50,73) = M1(2,28); M2(50,74) = M1(2,29); M2(50,75) = M1(2,30); M2(50,76) = M1(2,31); M2(50,77) = M1(2,32); M2(50,78) = M1(2,33); M2(50,80) = M1(2,34); M2(50,81) = M1(2,35); M2(50,82) = M1(2,36); M2(50,83) = M1(2,37); M2(50,84) = M1(2,38); M2(50,86) = M1(2,39); M2(50,87) = M1(2,40); M2(50,88) = M1(2,41); M2(50,89) = M1(2,42); M2(50,91) = M1(2,43); M2(50,92) = M1(2,44); M2(50,94) = M1(2,45); M2(50,96) = M1(2,46); M2(50,97) = M1(2,47); M2(50,99) = M1(2,48); M2(50,102) = M1(2,49); M2(50,103) = M1(2,50); M2(50,104) = M1(2,51); M2(50,105) = M1(2,52); M2(50,106) = M1(2,53); M2(50,108) = M1(2,54); M2(50,109) = M1(2,55); M2(50,110) = M1(2,56); M2(50,111) = M1(2,57); M2(50,113) = M1(2,58); M2(50,114) = M1(2,59); M2(50,115) = M1(2,60); M2(50,117) = M1(2,61); M2(50,118) = M1(2,62); M2(50,120) = M1(2,63); M2(50,123) = M1(2,64); M2(50,124) = M1(2,65); M2(50,125) = M1(2,66); M2(50,126) = M1(2,67); M2(50,128) = M1(2,68); M2(50,129) = M1(2,69); M2(50,130) = M1(2,70); M2(50,132) = M1(2,71); M2(50,133) = M1(2,72); M2(50,135) = M1(2,73); M2(50,138) = M1(2,74); M2(50,139) = M1(2,75); M2(50,140) = M1(2,76); M2(50,142) = M1(2,77); M2(50,143) = M1(2,78); M2(50,145) = M1(2,79); M2(50,148) = M1(2,80); M2(50,149) = M1(2,81); M2(50,151) = M1(2,82); M2(50,154) = M1(2,83); 
M2(51,41) = M1(3,3); M2(51,55) = M1(3,15); M2(51,56) = M1(3,16); M2(51,57) = M1(3,17); M2(51,59) = M1(3,18); M2(51,60) = M1(3,19); M2(51,61) = M1(3,20); M2(51,62) = M1(3,21); M2(51,64) = M1(3,22); M2(51,65) = M1(3,23); M2(51,66) = M1(3,24); M2(51,68) = M1(3,25); M2(51,69) = M1(3,26); M2(51,71) = M1(3,27); M2(51,73) = M1(3,28); M2(51,74) = M1(3,29); M2(51,75) = M1(3,30); M2(51,76) = M1(3,31); M2(51,77) = M1(3,32); M2(51,78) = M1(3,33); M2(51,80) = M1(3,34); M2(51,81) = M1(3,35); M2(51,82) = M1(3,36); M2(51,83) = M1(3,37); M2(51,84) = M1(3,38); M2(51,86) = M1(3,39); M2(51,87) = M1(3,40); M2(51,88) = M1(3,41); M2(51,89) = M1(3,42); M2(51,91) = M1(3,43); M2(51,92) = M1(3,44); M2(51,94) = M1(3,45); M2(51,96) = M1(3,46); M2(51,97) = M1(3,47); M2(51,99) = M1(3,48); M2(51,102) = M1(3,49); M2(51,103) = M1(3,50); M2(51,104) = M1(3,51); M2(51,105) = M1(3,52); M2(51,106) = M1(3,53); M2(51,108) = M1(3,54); M2(51,109) = M1(3,55); M2(51,110) = M1(3,56); M2(51,111) = M1(3,57); M2(51,113) = M1(3,58); M2(51,114) = M1(3,59); M2(51,115) = M1(3,60); M2(51,117) = M1(3,61); M2(51,118) = M1(3,62); M2(51,120) = M1(3,63); M2(51,123) = M1(3,64); M2(51,124) = M1(3,65); M2(51,125) = M1(3,66); M2(51,126) = M1(3,67); M2(51,128) = M1(3,68); M2(51,129) = M1(3,69); M2(51,130) = M1(3,70); M2(51,132) = M1(3,71); M2(51,133) = M1(3,72); M2(51,135) = M1(3,73); M2(51,138) = M1(3,74); M2(51,139) = M1(3,75); M2(51,140) = M1(3,76); M2(51,142) = M1(3,77); M2(51,143) = M1(3,78); M2(51,145) = M1(3,79); M2(51,148) = M1(3,80); M2(51,149) = M1(3,81); M2(51,151) = M1(3,82); M2(51,154) = M1(3,83); 
M2(52,42) = M1(4,4); M2(52,55) = M1(4,15); M2(52,56) = M1(4,16); M2(52,57) = M1(4,17); M2(52,59) = M1(4,18); M2(52,60) = M1(4,19); M2(52,61) = M1(4,20); M2(52,62) = M1(4,21); M2(52,64) = M1(4,22); M2(52,65) = M1(4,23); M2(52,66) = M1(4,24); M2(52,68) = M1(4,25); M2(52,69) = M1(4,26); M2(52,71) = M1(4,27); M2(52,73) = M1(4,28); M2(52,74) = M1(4,29); M2(52,75) = M1(4,30); M2(52,76) = M1(4,31); M2(52,77) = M1(4,32); M2(52,78) = M1(4,33); M2(52,80) = M1(4,34); M2(52,81) = M1(4,35); M2(52,82) = M1(4,36); M2(52,83) = M1(4,37); M2(52,84) = M1(4,38); M2(52,86) = M1(4,39); M2(52,87) = M1(4,40); M2(52,88) = M1(4,41); M2(52,89) = M1(4,42); M2(52,91) = M1(4,43); M2(52,92) = M1(4,44); M2(52,94) = M1(4,45); M2(52,96) = M1(4,46); M2(52,97) = M1(4,47); M2(52,99) = M1(4,48); M2(52,102) = M1(4,49); M2(52,103) = M1(4,50); M2(52,104) = M1(4,51); M2(52,105) = M1(4,52); M2(52,106) = M1(4,53); M2(52,108) = M1(4,54); M2(52,109) = M1(4,55); M2(52,110) = M1(4,56); M2(52,111) = M1(4,57); M2(52,113) = M1(4,58); M2(52,114) = M1(4,59); M2(52,115) = M1(4,60); M2(52,117) = M1(4,61); M2(52,118) = M1(4,62); M2(52,120) = M1(4,63); M2(52,123) = M1(4,64); M2(52,124) = M1(4,65); M2(52,125) = M1(4,66); M2(52,126) = M1(4,67); M2(52,128) = M1(4,68); M2(52,129) = M1(4,69); M2(52,130) = M1(4,70); M2(52,132) = M1(4,71); M2(52,133) = M1(4,72); M2(52,135) = M1(4,73); M2(52,138) = M1(4,74); M2(52,139) = M1(4,75); M2(52,140) = M1(4,76); M2(52,142) = M1(4,77); M2(52,143) = M1(4,78); M2(52,145) = M1(4,79); M2(52,148) = M1(4,80); M2(52,149) = M1(4,81); M2(52,151) = M1(4,82); M2(52,154) = M1(4,83); 
M2(53,43) = M1(5,5); M2(53,55) = M1(5,15); M2(53,56) = M1(5,16); M2(53,57) = M1(5,17); M2(53,59) = M1(5,18); M2(53,60) = M1(5,19); M2(53,61) = M1(5,20); M2(53,62) = M1(5,21); M2(53,64) = M1(5,22); M2(53,65) = M1(5,23); M2(53,66) = M1(5,24); M2(53,68) = M1(5,25); M2(53,69) = M1(5,26); M2(53,71) = M1(5,27); M2(53,73) = M1(5,28); M2(53,74) = M1(5,29); M2(53,75) = M1(5,30); M2(53,76) = M1(5,31); M2(53,77) = M1(5,32); M2(53,78) = M1(5,33); M2(53,80) = M1(5,34); M2(53,81) = M1(5,35); M2(53,82) = M1(5,36); M2(53,83) = M1(5,37); M2(53,84) = M1(5,38); M2(53,86) = M1(5,39); M2(53,87) = M1(5,40); M2(53,88) = M1(5,41); M2(53,89) = M1(5,42); M2(53,91) = M1(5,43); M2(53,92) = M1(5,44); M2(53,94) = M1(5,45); M2(53,96) = M1(5,46); M2(53,97) = M1(5,47); M2(53,99) = M1(5,48); M2(53,102) = M1(5,49); M2(53,103) = M1(5,50); M2(53,104) = M1(5,51); M2(53,105) = M1(5,52); M2(53,106) = M1(5,53); M2(53,108) = M1(5,54); M2(53,109) = M1(5,55); M2(53,110) = M1(5,56); M2(53,111) = M1(5,57); M2(53,113) = M1(5,58); M2(53,114) = M1(5,59); M2(53,115) = M1(5,60); M2(53,117) = M1(5,61); M2(53,118) = M1(5,62); M2(53,120) = M1(5,63); M2(53,123) = M1(5,64); M2(53,124) = M1(5,65); M2(53,125) = M1(5,66); M2(53,126) = M1(5,67); M2(53,128) = M1(5,68); M2(53,129) = M1(5,69); M2(53,130) = M1(5,70); M2(53,132) = M1(5,71); M2(53,133) = M1(5,72); M2(53,135) = M1(5,73); M2(53,138) = M1(5,74); M2(53,139) = M1(5,75); M2(53,140) = M1(5,76); M2(53,142) = M1(5,77); M2(53,143) = M1(5,78); M2(53,145) = M1(5,79); M2(53,148) = M1(5,80); M2(53,149) = M1(5,81); M2(53,151) = M1(5,82); M2(53,154) = M1(5,83); 
M2(54,44) = M1(6,6); M2(54,55) = M1(6,15); M2(54,56) = M1(6,16); M2(54,57) = M1(6,17); M2(54,59) = M1(6,18); M2(54,60) = M1(6,19); M2(54,61) = M1(6,20); M2(54,62) = M1(6,21); M2(54,64) = M1(6,22); M2(54,65) = M1(6,23); M2(54,66) = M1(6,24); M2(54,68) = M1(6,25); M2(54,69) = M1(6,26); M2(54,71) = M1(6,27); M2(54,73) = M1(6,28); M2(54,74) = M1(6,29); M2(54,75) = M1(6,30); M2(54,76) = M1(6,31); M2(54,77) = M1(6,32); M2(54,78) = M1(6,33); M2(54,80) = M1(6,34); M2(54,81) = M1(6,35); M2(54,82) = M1(6,36); M2(54,83) = M1(6,37); M2(54,84) = M1(6,38); M2(54,86) = M1(6,39); M2(54,87) = M1(6,40); M2(54,88) = M1(6,41); M2(54,89) = M1(6,42); M2(54,91) = M1(6,43); M2(54,92) = M1(6,44); M2(54,94) = M1(6,45); M2(54,96) = M1(6,46); M2(54,97) = M1(6,47); M2(54,99) = M1(6,48); M2(54,102) = M1(6,49); M2(54,103) = M1(6,50); M2(54,104) = M1(6,51); M2(54,105) = M1(6,52); M2(54,106) = M1(6,53); M2(54,108) = M1(6,54); M2(54,109) = M1(6,55); M2(54,110) = M1(6,56); M2(54,111) = M1(6,57); M2(54,113) = M1(6,58); M2(54,114) = M1(6,59); M2(54,115) = M1(6,60); M2(54,117) = M1(6,61); M2(54,118) = M1(6,62); M2(54,120) = M1(6,63); M2(54,123) = M1(6,64); M2(54,124) = M1(6,65); M2(54,125) = M1(6,66); M2(54,126) = M1(6,67); M2(54,128) = M1(6,68); M2(54,129) = M1(6,69); M2(54,130) = M1(6,70); M2(54,132) = M1(6,71); M2(54,133) = M1(6,72); M2(54,135) = M1(6,73); M2(54,138) = M1(6,74); M2(54,139) = M1(6,75); M2(54,140) = M1(6,76); M2(54,142) = M1(6,77); M2(54,143) = M1(6,78); M2(54,145) = M1(6,79); M2(54,148) = M1(6,80); M2(54,149) = M1(6,81); M2(54,151) = M1(6,82); M2(54,154) = M1(6,83); 
M2(55,46) = M1(7,7); M2(55,55) = M1(7,15); M2(55,56) = M1(7,16); M2(55,57) = M1(7,17); M2(55,59) = M1(7,18); M2(55,60) = M1(7,19); M2(55,61) = M1(7,20); M2(55,62) = M1(7,21); M2(55,64) = M1(7,22); M2(55,65) = M1(7,23); M2(55,66) = M1(7,24); M2(55,68) = M1(7,25); M2(55,69) = M1(7,26); M2(55,71) = M1(7,27); M2(55,73) = M1(7,28); M2(55,74) = M1(7,29); M2(55,75) = M1(7,30); M2(55,76) = M1(7,31); M2(55,77) = M1(7,32); M2(55,78) = M1(7,33); M2(55,80) = M1(7,34); M2(55,81) = M1(7,35); M2(55,82) = M1(7,36); M2(55,83) = M1(7,37); M2(55,84) = M1(7,38); M2(55,86) = M1(7,39); M2(55,87) = M1(7,40); M2(55,88) = M1(7,41); M2(55,89) = M1(7,42); M2(55,91) = M1(7,43); M2(55,92) = M1(7,44); M2(55,94) = M1(7,45); M2(55,96) = M1(7,46); M2(55,97) = M1(7,47); M2(55,99) = M1(7,48); M2(55,102) = M1(7,49); M2(55,103) = M1(7,50); M2(55,104) = M1(7,51); M2(55,105) = M1(7,52); M2(55,106) = M1(7,53); M2(55,108) = M1(7,54); M2(55,109) = M1(7,55); M2(55,110) = M1(7,56); M2(55,111) = M1(7,57); M2(55,113) = M1(7,58); M2(55,114) = M1(7,59); M2(55,115) = M1(7,60); M2(55,117) = M1(7,61); M2(55,118) = M1(7,62); M2(55,120) = M1(7,63); M2(55,123) = M1(7,64); M2(55,124) = M1(7,65); M2(55,125) = M1(7,66); M2(55,126) = M1(7,67); M2(55,128) = M1(7,68); M2(55,129) = M1(7,69); M2(55,130) = M1(7,70); M2(55,132) = M1(7,71); M2(55,133) = M1(7,72); M2(55,135) = M1(7,73); M2(55,138) = M1(7,74); M2(55,139) = M1(7,75); M2(55,140) = M1(7,76); M2(55,142) = M1(7,77); M2(55,143) = M1(7,78); M2(55,145) = M1(7,79); M2(55,148) = M1(7,80); M2(55,149) = M1(7,81); M2(55,151) = M1(7,82); M2(55,154) = M1(7,83); 
M2(56,47) = M1(8,8); M2(56,55) = M1(8,15); M2(56,56) = M1(8,16); M2(56,57) = M1(8,17); M2(56,59) = M1(8,18); M2(56,60) = M1(8,19); M2(56,61) = M1(8,20); M2(56,62) = M1(8,21); M2(56,64) = M1(8,22); M2(56,65) = M1(8,23); M2(56,66) = M1(8,24); M2(56,68) = M1(8,25); M2(56,69) = M1(8,26); M2(56,71) = M1(8,27); M2(56,73) = M1(8,28); M2(56,74) = M1(8,29); M2(56,75) = M1(8,30); M2(56,76) = M1(8,31); M2(56,77) = M1(8,32); M2(56,78) = M1(8,33); M2(56,80) = M1(8,34); M2(56,81) = M1(8,35); M2(56,82) = M1(8,36); M2(56,83) = M1(8,37); M2(56,84) = M1(8,38); M2(56,86) = M1(8,39); M2(56,87) = M1(8,40); M2(56,88) = M1(8,41); M2(56,89) = M1(8,42); M2(56,91) = M1(8,43); M2(56,92) = M1(8,44); M2(56,94) = M1(8,45); M2(56,96) = M1(8,46); M2(56,97) = M1(8,47); M2(56,99) = M1(8,48); M2(56,102) = M1(8,49); M2(56,103) = M1(8,50); M2(56,104) = M1(8,51); M2(56,105) = M1(8,52); M2(56,106) = M1(8,53); M2(56,108) = M1(8,54); M2(56,109) = M1(8,55); M2(56,110) = M1(8,56); M2(56,111) = M1(8,57); M2(56,113) = M1(8,58); M2(56,114) = M1(8,59); M2(56,115) = M1(8,60); M2(56,117) = M1(8,61); M2(56,118) = M1(8,62); M2(56,120) = M1(8,63); M2(56,123) = M1(8,64); M2(56,124) = M1(8,65); M2(56,125) = M1(8,66); M2(56,126) = M1(8,67); M2(56,128) = M1(8,68); M2(56,129) = M1(8,69); M2(56,130) = M1(8,70); M2(56,132) = M1(8,71); M2(56,133) = M1(8,72); M2(56,135) = M1(8,73); M2(56,138) = M1(8,74); M2(56,139) = M1(8,75); M2(56,140) = M1(8,76); M2(56,142) = M1(8,77); M2(56,143) = M1(8,78); M2(56,145) = M1(8,79); M2(56,148) = M1(8,80); M2(56,149) = M1(8,81); M2(56,151) = M1(8,82); M2(56,154) = M1(8,83); 
M2(57,48) = M1(9,9); M2(57,55) = M1(9,15); M2(57,56) = M1(9,16); M2(57,57) = M1(9,17); M2(57,59) = M1(9,18); M2(57,60) = M1(9,19); M2(57,61) = M1(9,20); M2(57,62) = M1(9,21); M2(57,64) = M1(9,22); M2(57,65) = M1(9,23); M2(57,66) = M1(9,24); M2(57,68) = M1(9,25); M2(57,69) = M1(9,26); M2(57,71) = M1(9,27); M2(57,73) = M1(9,28); M2(57,74) = M1(9,29); M2(57,75) = M1(9,30); M2(57,76) = M1(9,31); M2(57,77) = M1(9,32); M2(57,78) = M1(9,33); M2(57,80) = M1(9,34); M2(57,81) = M1(9,35); M2(57,82) = M1(9,36); M2(57,83) = M1(9,37); M2(57,84) = M1(9,38); M2(57,86) = M1(9,39); M2(57,87) = M1(9,40); M2(57,88) = M1(9,41); M2(57,89) = M1(9,42); M2(57,91) = M1(9,43); M2(57,92) = M1(9,44); M2(57,94) = M1(9,45); M2(57,96) = M1(9,46); M2(57,97) = M1(9,47); M2(57,99) = M1(9,48); M2(57,102) = M1(9,49); M2(57,103) = M1(9,50); M2(57,104) = M1(9,51); M2(57,105) = M1(9,52); M2(57,106) = M1(9,53); M2(57,108) = M1(9,54); M2(57,109) = M1(9,55); M2(57,110) = M1(9,56); M2(57,111) = M1(9,57); M2(57,113) = M1(9,58); M2(57,114) = M1(9,59); M2(57,115) = M1(9,60); M2(57,117) = M1(9,61); M2(57,118) = M1(9,62); M2(57,120) = M1(9,63); M2(57,123) = M1(9,64); M2(57,124) = M1(9,65); M2(57,125) = M1(9,66); M2(57,126) = M1(9,67); M2(57,128) = M1(9,68); M2(57,129) = M1(9,69); M2(57,130) = M1(9,70); M2(57,132) = M1(9,71); M2(57,133) = M1(9,72); M2(57,135) = M1(9,73); M2(57,138) = M1(9,74); M2(57,139) = M1(9,75); M2(57,140) = M1(9,76); M2(57,142) = M1(9,77); M2(57,143) = M1(9,78); M2(57,145) = M1(9,79); M2(57,148) = M1(9,80); M2(57,149) = M1(9,81); M2(57,151) = M1(9,82); M2(57,154) = M1(9,83); 
M2(58,49) = M1(10,10); M2(58,55) = M1(10,15); M2(58,56) = M1(10,16); M2(58,57) = M1(10,17); M2(58,59) = M1(10,18); M2(58,60) = M1(10,19); M2(58,61) = M1(10,20); M2(58,62) = M1(10,21); M2(58,64) = M1(10,22); M2(58,65) = M1(10,23); M2(58,66) = M1(10,24); M2(58,68) = M1(10,25); M2(58,69) = M1(10,26); M2(58,71) = M1(10,27); M2(58,73) = M1(10,28); M2(58,74) = M1(10,29); M2(58,75) = M1(10,30); M2(58,76) = M1(10,31); M2(58,77) = M1(10,32); M2(58,78) = M1(10,33); M2(58,80) = M1(10,34); M2(58,81) = M1(10,35); M2(58,82) = M1(10,36); M2(58,83) = M1(10,37); M2(58,84) = M1(10,38); M2(58,86) = M1(10,39); M2(58,87) = M1(10,40); M2(58,88) = M1(10,41); M2(58,89) = M1(10,42); M2(58,91) = M1(10,43); M2(58,92) = M1(10,44); M2(58,94) = M1(10,45); M2(58,96) = M1(10,46); M2(58,97) = M1(10,47); M2(58,99) = M1(10,48); M2(58,102) = M1(10,49); M2(58,103) = M1(10,50); M2(58,104) = M1(10,51); M2(58,105) = M1(10,52); M2(58,106) = M1(10,53); M2(58,108) = M1(10,54); M2(58,109) = M1(10,55); M2(58,110) = M1(10,56); M2(58,111) = M1(10,57); M2(58,113) = M1(10,58); M2(58,114) = M1(10,59); M2(58,115) = M1(10,60); M2(58,117) = M1(10,61); M2(58,118) = M1(10,62); M2(58,120) = M1(10,63); M2(58,123) = M1(10,64); M2(58,124) = M1(10,65); M2(58,125) = M1(10,66); M2(58,126) = M1(10,67); M2(58,128) = M1(10,68); M2(58,129) = M1(10,69); M2(58,130) = M1(10,70); M2(58,132) = M1(10,71); M2(58,133) = M1(10,72); M2(58,135) = M1(10,73); M2(58,138) = M1(10,74); M2(58,139) = M1(10,75); M2(58,140) = M1(10,76); M2(58,142) = M1(10,77); M2(58,143) = M1(10,78); M2(58,145) = M1(10,79); M2(58,148) = M1(10,80); M2(58,149) = M1(10,81); M2(58,151) = M1(10,82); M2(58,154) = M1(10,83); 
M2(59,50) = M1(11,11); M2(59,55) = M1(11,15); M2(59,56) = M1(11,16); M2(59,57) = M1(11,17); M2(59,59) = M1(11,18); M2(59,60) = M1(11,19); M2(59,61) = M1(11,20); M2(59,62) = M1(11,21); M2(59,64) = M1(11,22); M2(59,65) = M1(11,23); M2(59,66) = M1(11,24); M2(59,68) = M1(11,25); M2(59,69) = M1(11,26); M2(59,71) = M1(11,27); M2(59,73) = M1(11,28); M2(59,74) = M1(11,29); M2(59,75) = M1(11,30); M2(59,76) = M1(11,31); M2(59,77) = M1(11,32); M2(59,78) = M1(11,33); M2(59,80) = M1(11,34); M2(59,81) = M1(11,35); M2(59,82) = M1(11,36); M2(59,83) = M1(11,37); M2(59,84) = M1(11,38); M2(59,86) = M1(11,39); M2(59,87) = M1(11,40); M2(59,88) = M1(11,41); M2(59,89) = M1(11,42); M2(59,91) = M1(11,43); M2(59,92) = M1(11,44); M2(59,94) = M1(11,45); M2(59,96) = M1(11,46); M2(59,97) = M1(11,47); M2(59,99) = M1(11,48); M2(59,102) = M1(11,49); M2(59,103) = M1(11,50); M2(59,104) = M1(11,51); M2(59,105) = M1(11,52); M2(59,106) = M1(11,53); M2(59,108) = M1(11,54); M2(59,109) = M1(11,55); M2(59,110) = M1(11,56); M2(59,111) = M1(11,57); M2(59,113) = M1(11,58); M2(59,114) = M1(11,59); M2(59,115) = M1(11,60); M2(59,117) = M1(11,61); M2(59,118) = M1(11,62); M2(59,120) = M1(11,63); M2(59,123) = M1(11,64); M2(59,124) = M1(11,65); M2(59,125) = M1(11,66); M2(59,126) = M1(11,67); M2(59,128) = M1(11,68); M2(59,129) = M1(11,69); M2(59,130) = M1(11,70); M2(59,132) = M1(11,71); M2(59,133) = M1(11,72); M2(59,135) = M1(11,73); M2(59,138) = M1(11,74); M2(59,139) = M1(11,75); M2(59,140) = M1(11,76); M2(59,142) = M1(11,77); M2(59,143) = M1(11,78); M2(59,145) = M1(11,79); M2(59,148) = M1(11,80); M2(59,149) = M1(11,81); M2(59,151) = M1(11,82); M2(59,154) = M1(11,83); 
M2(60,51) = M1(12,12); M2(60,55) = M1(12,15); M2(60,56) = M1(12,16); M2(60,57) = M1(12,17); M2(60,59) = M1(12,18); M2(60,60) = M1(12,19); M2(60,61) = M1(12,20); M2(60,62) = M1(12,21); M2(60,64) = M1(12,22); M2(60,65) = M1(12,23); M2(60,66) = M1(12,24); M2(60,68) = M1(12,25); M2(60,69) = M1(12,26); M2(60,71) = M1(12,27); M2(60,73) = M1(12,28); M2(60,74) = M1(12,29); M2(60,75) = M1(12,30); M2(60,76) = M1(12,31); M2(60,77) = M1(12,32); M2(60,78) = M1(12,33); M2(60,80) = M1(12,34); M2(60,81) = M1(12,35); M2(60,82) = M1(12,36); M2(60,83) = M1(12,37); M2(60,84) = M1(12,38); M2(60,86) = M1(12,39); M2(60,87) = M1(12,40); M2(60,88) = M1(12,41); M2(60,89) = M1(12,42); M2(60,91) = M1(12,43); M2(60,92) = M1(12,44); M2(60,94) = M1(12,45); M2(60,96) = M1(12,46); M2(60,97) = M1(12,47); M2(60,99) = M1(12,48); M2(60,102) = M1(12,49); M2(60,103) = M1(12,50); M2(60,104) = M1(12,51); M2(60,105) = M1(12,52); M2(60,106) = M1(12,53); M2(60,108) = M1(12,54); M2(60,109) = M1(12,55); M2(60,110) = M1(12,56); M2(60,111) = M1(12,57); M2(60,113) = M1(12,58); M2(60,114) = M1(12,59); M2(60,115) = M1(12,60); M2(60,117) = M1(12,61); M2(60,118) = M1(12,62); M2(60,120) = M1(12,63); M2(60,123) = M1(12,64); M2(60,124) = M1(12,65); M2(60,125) = M1(12,66); M2(60,126) = M1(12,67); M2(60,128) = M1(12,68); M2(60,129) = M1(12,69); M2(60,130) = M1(12,70); M2(60,132) = M1(12,71); M2(60,133) = M1(12,72); M2(60,135) = M1(12,73); M2(60,138) = M1(12,74); M2(60,139) = M1(12,75); M2(60,140) = M1(12,76); M2(60,142) = M1(12,77); M2(60,143) = M1(12,78); M2(60,145) = M1(12,79); M2(60,148) = M1(12,80); M2(60,149) = M1(12,81); M2(60,151) = M1(12,82); M2(60,154) = M1(12,83); 
M2(61,53) = M1(13,13); M2(61,55) = M1(13,15); M2(61,56) = M1(13,16); M2(61,57) = M1(13,17); M2(61,59) = M1(13,18); M2(61,60) = M1(13,19); M2(61,61) = M1(13,20); M2(61,62) = M1(13,21); M2(61,64) = M1(13,22); M2(61,65) = M1(13,23); M2(61,66) = M1(13,24); M2(61,68) = M1(13,25); M2(61,69) = M1(13,26); M2(61,71) = M1(13,27); M2(61,73) = M1(13,28); M2(61,74) = M1(13,29); M2(61,75) = M1(13,30); M2(61,76) = M1(13,31); M2(61,77) = M1(13,32); M2(61,78) = M1(13,33); M2(61,80) = M1(13,34); M2(61,81) = M1(13,35); M2(61,82) = M1(13,36); M2(61,83) = M1(13,37); M2(61,84) = M1(13,38); M2(61,86) = M1(13,39); M2(61,87) = M1(13,40); M2(61,88) = M1(13,41); M2(61,89) = M1(13,42); M2(61,91) = M1(13,43); M2(61,92) = M1(13,44); M2(61,94) = M1(13,45); M2(61,96) = M1(13,46); M2(61,97) = M1(13,47); M2(61,99) = M1(13,48); M2(61,102) = M1(13,49); M2(61,103) = M1(13,50); M2(61,104) = M1(13,51); M2(61,105) = M1(13,52); M2(61,106) = M1(13,53); M2(61,108) = M1(13,54); M2(61,109) = M1(13,55); M2(61,110) = M1(13,56); M2(61,111) = M1(13,57); M2(61,113) = M1(13,58); M2(61,114) = M1(13,59); M2(61,115) = M1(13,60); M2(61,117) = M1(13,61); M2(61,118) = M1(13,62); M2(61,120) = M1(13,63); M2(61,123) = M1(13,64); M2(61,124) = M1(13,65); M2(61,125) = M1(13,66); M2(61,126) = M1(13,67); M2(61,128) = M1(13,68); M2(61,129) = M1(13,69); M2(61,130) = M1(13,70); M2(61,132) = M1(13,71); M2(61,133) = M1(13,72); M2(61,135) = M1(13,73); M2(61,138) = M1(13,74); M2(61,139) = M1(13,75); M2(61,140) = M1(13,76); M2(61,142) = M1(13,77); M2(61,143) = M1(13,78); M2(61,145) = M1(13,79); M2(61,148) = M1(13,80); M2(61,149) = M1(13,81); M2(61,151) = M1(13,82); M2(61,154) = M1(13,83); 
M2(62,54) = M1(14,14); M2(62,55) = M1(14,15); M2(62,56) = M1(14,16); M2(62,57) = M1(14,17); M2(62,59) = M1(14,18); M2(62,60) = M1(14,19); M2(62,61) = M1(14,20); M2(62,62) = M1(14,21); M2(62,64) = M1(14,22); M2(62,65) = M1(14,23); M2(62,66) = M1(14,24); M2(62,68) = M1(14,25); M2(62,69) = M1(14,26); M2(62,71) = M1(14,27); M2(62,73) = M1(14,28); M2(62,74) = M1(14,29); M2(62,75) = M1(14,30); M2(62,76) = M1(14,31); M2(62,77) = M1(14,32); M2(62,78) = M1(14,33); M2(62,80) = M1(14,34); M2(62,81) = M1(14,35); M2(62,82) = M1(14,36); M2(62,83) = M1(14,37); M2(62,84) = M1(14,38); M2(62,86) = M1(14,39); M2(62,87) = M1(14,40); M2(62,88) = M1(14,41); M2(62,89) = M1(14,42); M2(62,91) = M1(14,43); M2(62,92) = M1(14,44); M2(62,94) = M1(14,45); M2(62,96) = M1(14,46); M2(62,97) = M1(14,47); M2(62,99) = M1(14,48); M2(62,102) = M1(14,49); M2(62,103) = M1(14,50); M2(62,104) = M1(14,51); M2(62,105) = M1(14,52); M2(62,106) = M1(14,53); M2(62,108) = M1(14,54); M2(62,109) = M1(14,55); M2(62,110) = M1(14,56); M2(62,111) = M1(14,57); M2(62,113) = M1(14,58); M2(62,114) = M1(14,59); M2(62,115) = M1(14,60); M2(62,117) = M1(14,61); M2(62,118) = M1(14,62); M2(62,120) = M1(14,63); M2(62,123) = M1(14,64); M2(62,124) = M1(14,65); M2(62,125) = M1(14,66); M2(62,126) = M1(14,67); M2(62,128) = M1(14,68); M2(62,129) = M1(14,69); M2(62,130) = M1(14,70); M2(62,132) = M1(14,71); M2(62,133) = M1(14,72); M2(62,135) = M1(14,73); M2(62,138) = M1(14,74); M2(62,139) = M1(14,75); M2(62,140) = M1(14,76); M2(62,142) = M1(14,77); M2(62,143) = M1(14,78); M2(62,145) = M1(14,79); M2(62,148) = M1(14,80); M2(62,149) = M1(14,81); M2(62,151) = M1(14,82); M2(62,154) = M1(14,83); 
M2(63,37) = M1(0,0); M2(63,54) = M1(0,15); M2(63,55) = M1(0,16); M2(63,56) = M1(0,17); M2(63,58) = M1(0,18); M2(63,59) = M1(0,19); M2(63,60) = M1(0,20); M2(63,61) = M1(0,21); M2(63,63) = M1(0,22); M2(63,64) = M1(0,23); M2(63,65) = M1(0,24); M2(63,67) = M1(0,25); M2(63,68) = M1(0,26); M2(63,70) = M1(0,27); M2(63,72) = M1(0,28); M2(63,73) = M1(0,29); M2(63,74) = M1(0,30); M2(63,75) = M1(0,31); M2(63,76) = M1(0,32); M2(63,77) = M1(0,33); M2(63,79) = M1(0,34); M2(63,80) = M1(0,35); M2(63,81) = M1(0,36); M2(63,82) = M1(0,37); M2(63,83) = M1(0,38); M2(63,85) = M1(0,39); M2(63,86) = M1(0,40); M2(63,87) = M1(0,41); M2(63,88) = M1(0,42); M2(63,90) = M1(0,43); M2(63,91) = M1(0,44); M2(63,92) = M1(0,45); M2(63,95) = M1(0,46); M2(63,96) = M1(0,47); M2(63,98) = M1(0,48); M2(63,101) = M1(0,49); M2(63,102) = M1(0,50); M2(63,103) = M1(0,51); M2(63,104) = M1(0,52); M2(63,105) = M1(0,53); M2(63,107) = M1(0,54); M2(63,108) = M1(0,55); M2(63,109) = M1(0,56); M2(63,110) = M1(0,57); M2(63,112) = M1(0,58); M2(63,113) = M1(0,59); M2(63,114) = M1(0,60); M2(63,116) = M1(0,61); M2(63,117) = M1(0,62); M2(63,119) = M1(0,63); M2(63,122) = M1(0,64); M2(63,123) = M1(0,65); M2(63,124) = M1(0,66); M2(63,125) = M1(0,67); M2(63,127) = M1(0,68); M2(63,128) = M1(0,69); M2(63,129) = M1(0,70); M2(63,131) = M1(0,71); M2(63,132) = M1(0,72); M2(63,134) = M1(0,73); M2(63,137) = M1(0,74); M2(63,138) = M1(0,75); M2(63,139) = M1(0,76); M2(63,141) = M1(0,77); M2(63,142) = M1(0,78); M2(63,144) = M1(0,79); M2(63,147) = M1(0,80); M2(63,148) = M1(0,81); M2(63,150) = M1(0,82); M2(63,153) = M1(0,83); 
M2(64,38) = M1(1,1); M2(64,54) = M1(1,15); M2(64,55) = M1(1,16); M2(64,56) = M1(1,17); M2(64,58) = M1(1,18); M2(64,59) = M1(1,19); M2(64,60) = M1(1,20); M2(64,61) = M1(1,21); M2(64,63) = M1(1,22); M2(64,64) = M1(1,23); M2(64,65) = M1(1,24); M2(64,67) = M1(1,25); M2(64,68) = M1(1,26); M2(64,70) = M1(1,27); M2(64,72) = M1(1,28); M2(64,73) = M1(1,29); M2(64,74) = M1(1,30); M2(64,75) = M1(1,31); M2(64,76) = M1(1,32); M2(64,77) = M1(1,33); M2(64,79) = M1(1,34); M2(64,80) = M1(1,35); M2(64,81) = M1(1,36); M2(64,82) = M1(1,37); M2(64,83) = M1(1,38); M2(64,85) = M1(1,39); M2(64,86) = M1(1,40); M2(64,87) = M1(1,41); M2(64,88) = M1(1,42); M2(64,90) = M1(1,43); M2(64,91) = M1(1,44); M2(64,92) = M1(1,45); M2(64,95) = M1(1,46); M2(64,96) = M1(1,47); M2(64,98) = M1(1,48); M2(64,101) = M1(1,49); M2(64,102) = M1(1,50); M2(64,103) = M1(1,51); M2(64,104) = M1(1,52); M2(64,105) = M1(1,53); M2(64,107) = M1(1,54); M2(64,108) = M1(1,55); M2(64,109) = M1(1,56); M2(64,110) = M1(1,57); M2(64,112) = M1(1,58); M2(64,113) = M1(1,59); M2(64,114) = M1(1,60); M2(64,116) = M1(1,61); M2(64,117) = M1(1,62); M2(64,119) = M1(1,63); M2(64,122) = M1(1,64); M2(64,123) = M1(1,65); M2(64,124) = M1(1,66); M2(64,125) = M1(1,67); M2(64,127) = M1(1,68); M2(64,128) = M1(1,69); M2(64,129) = M1(1,70); M2(64,131) = M1(1,71); M2(64,132) = M1(1,72); M2(64,134) = M1(1,73); M2(64,137) = M1(1,74); M2(64,138) = M1(1,75); M2(64,139) = M1(1,76); M2(64,141) = M1(1,77); M2(64,142) = M1(1,78); M2(64,144) = M1(1,79); M2(64,147) = M1(1,80); M2(64,148) = M1(1,81); M2(64,150) = M1(1,82); M2(64,153) = M1(1,83); 
M2(65,39) = M1(2,2); M2(65,54) = M1(2,15); M2(65,55) = M1(2,16); M2(65,56) = M1(2,17); M2(65,58) = M1(2,18); M2(65,59) = M1(2,19); M2(65,60) = M1(2,20); M2(65,61) = M1(2,21); M2(65,63) = M1(2,22); M2(65,64) = M1(2,23); M2(65,65) = M1(2,24); M2(65,67) = M1(2,25); M2(65,68) = M1(2,26); M2(65,70) = M1(2,27); M2(65,72) = M1(2,28); M2(65,73) = M1(2,29); M2(65,74) = M1(2,30); M2(65,75) = M1(2,31); M2(65,76) = M1(2,32); M2(65,77) = M1(2,33); M2(65,79) = M1(2,34); M2(65,80) = M1(2,35); M2(65,81) = M1(2,36); M2(65,82) = M1(2,37); M2(65,83) = M1(2,38); M2(65,85) = M1(2,39); M2(65,86) = M1(2,40); M2(65,87) = M1(2,41); M2(65,88) = M1(2,42); M2(65,90) = M1(2,43); M2(65,91) = M1(2,44); M2(65,92) = M1(2,45); M2(65,95) = M1(2,46); M2(65,96) = M1(2,47); M2(65,98) = M1(2,48); M2(65,101) = M1(2,49); M2(65,102) = M1(2,50); M2(65,103) = M1(2,51); M2(65,104) = M1(2,52); M2(65,105) = M1(2,53); M2(65,107) = M1(2,54); M2(65,108) = M1(2,55); M2(65,109) = M1(2,56); M2(65,110) = M1(2,57); M2(65,112) = M1(2,58); M2(65,113) = M1(2,59); M2(65,114) = M1(2,60); M2(65,116) = M1(2,61); M2(65,117) = M1(2,62); M2(65,119) = M1(2,63); M2(65,122) = M1(2,64); M2(65,123) = M1(2,65); M2(65,124) = M1(2,66); M2(65,125) = M1(2,67); M2(65,127) = M1(2,68); M2(65,128) = M1(2,69); M2(65,129) = M1(2,70); M2(65,131) = M1(2,71); M2(65,132) = M1(2,72); M2(65,134) = M1(2,73); M2(65,137) = M1(2,74); M2(65,138) = M1(2,75); M2(65,139) = M1(2,76); M2(65,141) = M1(2,77); M2(65,142) = M1(2,78); M2(65,144) = M1(2,79); M2(65,147) = M1(2,80); M2(65,148) = M1(2,81); M2(65,150) = M1(2,82); M2(65,153) = M1(2,83); 
M2(66,40) = M1(3,3); M2(66,54) = M1(3,15); M2(66,55) = M1(3,16); M2(66,56) = M1(3,17); M2(66,58) = M1(3,18); M2(66,59) = M1(3,19); M2(66,60) = M1(3,20); M2(66,61) = M1(3,21); M2(66,63) = M1(3,22); M2(66,64) = M1(3,23); M2(66,65) = M1(3,24); M2(66,67) = M1(3,25); M2(66,68) = M1(3,26); M2(66,70) = M1(3,27); M2(66,72) = M1(3,28); M2(66,73) = M1(3,29); M2(66,74) = M1(3,30); M2(66,75) = M1(3,31); M2(66,76) = M1(3,32); M2(66,77) = M1(3,33); M2(66,79) = M1(3,34); M2(66,80) = M1(3,35); M2(66,81) = M1(3,36); M2(66,82) = M1(3,37); M2(66,83) = M1(3,38); M2(66,85) = M1(3,39); M2(66,86) = M1(3,40); M2(66,87) = M1(3,41); M2(66,88) = M1(3,42); M2(66,90) = M1(3,43); M2(66,91) = M1(3,44); M2(66,92) = M1(3,45); M2(66,95) = M1(3,46); M2(66,96) = M1(3,47); M2(66,98) = M1(3,48); M2(66,101) = M1(3,49); M2(66,102) = M1(3,50); M2(66,103) = M1(3,51); M2(66,104) = M1(3,52); M2(66,105) = M1(3,53); M2(66,107) = M1(3,54); M2(66,108) = M1(3,55); M2(66,109) = M1(3,56); M2(66,110) = M1(3,57); M2(66,112) = M1(3,58); M2(66,113) = M1(3,59); M2(66,114) = M1(3,60); M2(66,116) = M1(3,61); M2(66,117) = M1(3,62); M2(66,119) = M1(3,63); M2(66,122) = M1(3,64); M2(66,123) = M1(3,65); M2(66,124) = M1(3,66); M2(66,125) = M1(3,67); M2(66,127) = M1(3,68); M2(66,128) = M1(3,69); M2(66,129) = M1(3,70); M2(66,131) = M1(3,71); M2(66,132) = M1(3,72); M2(66,134) = M1(3,73); M2(66,137) = M1(3,74); M2(66,138) = M1(3,75); M2(66,139) = M1(3,76); M2(66,141) = M1(3,77); M2(66,142) = M1(3,78); M2(66,144) = M1(3,79); M2(66,147) = M1(3,80); M2(66,148) = M1(3,81); M2(66,150) = M1(3,82); M2(66,153) = M1(3,83); 
M2(67,41) = M1(4,4); M2(67,54) = M1(4,15); M2(67,55) = M1(4,16); M2(67,56) = M1(4,17); M2(67,58) = M1(4,18); M2(67,59) = M1(4,19); M2(67,60) = M1(4,20); M2(67,61) = M1(4,21); M2(67,63) = M1(4,22); M2(67,64) = M1(4,23); M2(67,65) = M1(4,24); M2(67,67) = M1(4,25); M2(67,68) = M1(4,26); M2(67,70) = M1(4,27); M2(67,72) = M1(4,28); M2(67,73) = M1(4,29); M2(67,74) = M1(4,30); M2(67,75) = M1(4,31); M2(67,76) = M1(4,32); M2(67,77) = M1(4,33); M2(67,79) = M1(4,34); M2(67,80) = M1(4,35); M2(67,81) = M1(4,36); M2(67,82) = M1(4,37); M2(67,83) = M1(4,38); M2(67,85) = M1(4,39); M2(67,86) = M1(4,40); M2(67,87) = M1(4,41); M2(67,88) = M1(4,42); M2(67,90) = M1(4,43); M2(67,91) = M1(4,44); M2(67,92) = M1(4,45); M2(67,95) = M1(4,46); M2(67,96) = M1(4,47); M2(67,98) = M1(4,48); M2(67,101) = M1(4,49); M2(67,102) = M1(4,50); M2(67,103) = M1(4,51); M2(67,104) = M1(4,52); M2(67,105) = M1(4,53); M2(67,107) = M1(4,54); M2(67,108) = M1(4,55); M2(67,109) = M1(4,56); M2(67,110) = M1(4,57); M2(67,112) = M1(4,58); M2(67,113) = M1(4,59); M2(67,114) = M1(4,60); M2(67,116) = M1(4,61); M2(67,117) = M1(4,62); M2(67,119) = M1(4,63); M2(67,122) = M1(4,64); M2(67,123) = M1(4,65); M2(67,124) = M1(4,66); M2(67,125) = M1(4,67); M2(67,127) = M1(4,68); M2(67,128) = M1(4,69); M2(67,129) = M1(4,70); M2(67,131) = M1(4,71); M2(67,132) = M1(4,72); M2(67,134) = M1(4,73); M2(67,137) = M1(4,74); M2(67,138) = M1(4,75); M2(67,139) = M1(4,76); M2(67,141) = M1(4,77); M2(67,142) = M1(4,78); M2(67,144) = M1(4,79); M2(67,147) = M1(4,80); M2(67,148) = M1(4,81); M2(67,150) = M1(4,82); M2(67,153) = M1(4,83); 
M2(68,42) = M1(5,5); M2(68,54) = M1(5,15); M2(68,55) = M1(5,16); M2(68,56) = M1(5,17); M2(68,58) = M1(5,18); M2(68,59) = M1(5,19); M2(68,60) = M1(5,20); M2(68,61) = M1(5,21); M2(68,63) = M1(5,22); M2(68,64) = M1(5,23); M2(68,65) = M1(5,24); M2(68,67) = M1(5,25); M2(68,68) = M1(5,26); M2(68,70) = M1(5,27); M2(68,72) = M1(5,28); M2(68,73) = M1(5,29); M2(68,74) = M1(5,30); M2(68,75) = M1(5,31); M2(68,76) = M1(5,32); M2(68,77) = M1(5,33); M2(68,79) = M1(5,34); M2(68,80) = M1(5,35); M2(68,81) = M1(5,36); M2(68,82) = M1(5,37); M2(68,83) = M1(5,38); M2(68,85) = M1(5,39); M2(68,86) = M1(5,40); M2(68,87) = M1(5,41); M2(68,88) = M1(5,42); M2(68,90) = M1(5,43); M2(68,91) = M1(5,44); M2(68,92) = M1(5,45); M2(68,95) = M1(5,46); M2(68,96) = M1(5,47); M2(68,98) = M1(5,48); M2(68,101) = M1(5,49); M2(68,102) = M1(5,50); M2(68,103) = M1(5,51); M2(68,104) = M1(5,52); M2(68,105) = M1(5,53); M2(68,107) = M1(5,54); M2(68,108) = M1(5,55); M2(68,109) = M1(5,56); M2(68,110) = M1(5,57); M2(68,112) = M1(5,58); M2(68,113) = M1(5,59); M2(68,114) = M1(5,60); M2(68,116) = M1(5,61); M2(68,117) = M1(5,62); M2(68,119) = M1(5,63); M2(68,122) = M1(5,64); M2(68,123) = M1(5,65); M2(68,124) = M1(5,66); M2(68,125) = M1(5,67); M2(68,127) = M1(5,68); M2(68,128) = M1(5,69); M2(68,129) = M1(5,70); M2(68,131) = M1(5,71); M2(68,132) = M1(5,72); M2(68,134) = M1(5,73); M2(68,137) = M1(5,74); M2(68,138) = M1(5,75); M2(68,139) = M1(5,76); M2(68,141) = M1(5,77); M2(68,142) = M1(5,78); M2(68,144) = M1(5,79); M2(68,147) = M1(5,80); M2(68,148) = M1(5,81); M2(68,150) = M1(5,82); M2(68,153) = M1(5,83); 
M2(69,43) = M1(6,6); M2(69,54) = M1(6,15); M2(69,55) = M1(6,16); M2(69,56) = M1(6,17); M2(69,58) = M1(6,18); M2(69,59) = M1(6,19); M2(69,60) = M1(6,20); M2(69,61) = M1(6,21); M2(69,63) = M1(6,22); M2(69,64) = M1(6,23); M2(69,65) = M1(6,24); M2(69,67) = M1(6,25); M2(69,68) = M1(6,26); M2(69,70) = M1(6,27); M2(69,72) = M1(6,28); M2(69,73) = M1(6,29); M2(69,74) = M1(6,30); M2(69,75) = M1(6,31); M2(69,76) = M1(6,32); M2(69,77) = M1(6,33); M2(69,79) = M1(6,34); M2(69,80) = M1(6,35); M2(69,81) = M1(6,36); M2(69,82) = M1(6,37); M2(69,83) = M1(6,38); M2(69,85) = M1(6,39); M2(69,86) = M1(6,40); M2(69,87) = M1(6,41); M2(69,88) = M1(6,42); M2(69,90) = M1(6,43); M2(69,91) = M1(6,44); M2(69,92) = M1(6,45); M2(69,95) = M1(6,46); M2(69,96) = M1(6,47); M2(69,98) = M1(6,48); M2(69,101) = M1(6,49); M2(69,102) = M1(6,50); M2(69,103) = M1(6,51); M2(69,104) = M1(6,52); M2(69,105) = M1(6,53); M2(69,107) = M1(6,54); M2(69,108) = M1(6,55); M2(69,109) = M1(6,56); M2(69,110) = M1(6,57); M2(69,112) = M1(6,58); M2(69,113) = M1(6,59); M2(69,114) = M1(6,60); M2(69,116) = M1(6,61); M2(69,117) = M1(6,62); M2(69,119) = M1(6,63); M2(69,122) = M1(6,64); M2(69,123) = M1(6,65); M2(69,124) = M1(6,66); M2(69,125) = M1(6,67); M2(69,127) = M1(6,68); M2(69,128) = M1(6,69); M2(69,129) = M1(6,70); M2(69,131) = M1(6,71); M2(69,132) = M1(6,72); M2(69,134) = M1(6,73); M2(69,137) = M1(6,74); M2(69,138) = M1(6,75); M2(69,139) = M1(6,76); M2(69,141) = M1(6,77); M2(69,142) = M1(6,78); M2(69,144) = M1(6,79); M2(69,147) = M1(6,80); M2(69,148) = M1(6,81); M2(69,150) = M1(6,82); M2(69,153) = M1(6,83); 
M2(70,45) = M1(7,7); M2(70,54) = M1(7,15); M2(70,55) = M1(7,16); M2(70,56) = M1(7,17); M2(70,58) = M1(7,18); M2(70,59) = M1(7,19); M2(70,60) = M1(7,20); M2(70,61) = M1(7,21); M2(70,63) = M1(7,22); M2(70,64) = M1(7,23); M2(70,65) = M1(7,24); M2(70,67) = M1(7,25); M2(70,68) = M1(7,26); M2(70,70) = M1(7,27); M2(70,72) = M1(7,28); M2(70,73) = M1(7,29); M2(70,74) = M1(7,30); M2(70,75) = M1(7,31); M2(70,76) = M1(7,32); M2(70,77) = M1(7,33); M2(70,79) = M1(7,34); M2(70,80) = M1(7,35); M2(70,81) = M1(7,36); M2(70,82) = M1(7,37); M2(70,83) = M1(7,38); M2(70,85) = M1(7,39); M2(70,86) = M1(7,40); M2(70,87) = M1(7,41); M2(70,88) = M1(7,42); M2(70,90) = M1(7,43); M2(70,91) = M1(7,44); M2(70,92) = M1(7,45); M2(70,95) = M1(7,46); M2(70,96) = M1(7,47); M2(70,98) = M1(7,48); M2(70,101) = M1(7,49); M2(70,102) = M1(7,50); M2(70,103) = M1(7,51); M2(70,104) = M1(7,52); M2(70,105) = M1(7,53); M2(70,107) = M1(7,54); M2(70,108) = M1(7,55); M2(70,109) = M1(7,56); M2(70,110) = M1(7,57); M2(70,112) = M1(7,58); M2(70,113) = M1(7,59); M2(70,114) = M1(7,60); M2(70,116) = M1(7,61); M2(70,117) = M1(7,62); M2(70,119) = M1(7,63); M2(70,122) = M1(7,64); M2(70,123) = M1(7,65); M2(70,124) = M1(7,66); M2(70,125) = M1(7,67); M2(70,127) = M1(7,68); M2(70,128) = M1(7,69); M2(70,129) = M1(7,70); M2(70,131) = M1(7,71); M2(70,132) = M1(7,72); M2(70,134) = M1(7,73); M2(70,137) = M1(7,74); M2(70,138) = M1(7,75); M2(70,139) = M1(7,76); M2(70,141) = M1(7,77); M2(70,142) = M1(7,78); M2(70,144) = M1(7,79); M2(70,147) = M1(7,80); M2(70,148) = M1(7,81); M2(70,150) = M1(7,82); M2(70,153) = M1(7,83); 
M2(71,46) = M1(8,8); M2(71,54) = M1(8,15); M2(71,55) = M1(8,16); M2(71,56) = M1(8,17); M2(71,58) = M1(8,18); M2(71,59) = M1(8,19); M2(71,60) = M1(8,20); M2(71,61) = M1(8,21); M2(71,63) = M1(8,22); M2(71,64) = M1(8,23); M2(71,65) = M1(8,24); M2(71,67) = M1(8,25); M2(71,68) = M1(8,26); M2(71,70) = M1(8,27); M2(71,72) = M1(8,28); M2(71,73) = M1(8,29); M2(71,74) = M1(8,30); M2(71,75) = M1(8,31); M2(71,76) = M1(8,32); M2(71,77) = M1(8,33); M2(71,79) = M1(8,34); M2(71,80) = M1(8,35); M2(71,81) = M1(8,36); M2(71,82) = M1(8,37); M2(71,83) = M1(8,38); M2(71,85) = M1(8,39); M2(71,86) = M1(8,40); M2(71,87) = M1(8,41); M2(71,88) = M1(8,42); M2(71,90) = M1(8,43); M2(71,91) = M1(8,44); M2(71,92) = M1(8,45); M2(71,95) = M1(8,46); M2(71,96) = M1(8,47); M2(71,98) = M1(8,48); M2(71,101) = M1(8,49); M2(71,102) = M1(8,50); M2(71,103) = M1(8,51); M2(71,104) = M1(8,52); M2(71,105) = M1(8,53); M2(71,107) = M1(8,54); M2(71,108) = M1(8,55); M2(71,109) = M1(8,56); M2(71,110) = M1(8,57); M2(71,112) = M1(8,58); M2(71,113) = M1(8,59); M2(71,114) = M1(8,60); M2(71,116) = M1(8,61); M2(71,117) = M1(8,62); M2(71,119) = M1(8,63); M2(71,122) = M1(8,64); M2(71,123) = M1(8,65); M2(71,124) = M1(8,66); M2(71,125) = M1(8,67); M2(71,127) = M1(8,68); M2(71,128) = M1(8,69); M2(71,129) = M1(8,70); M2(71,131) = M1(8,71); M2(71,132) = M1(8,72); M2(71,134) = M1(8,73); M2(71,137) = M1(8,74); M2(71,138) = M1(8,75); M2(71,139) = M1(8,76); M2(71,141) = M1(8,77); M2(71,142) = M1(8,78); M2(71,144) = M1(8,79); M2(71,147) = M1(8,80); M2(71,148) = M1(8,81); M2(71,150) = M1(8,82); M2(71,153) = M1(8,83); 
M2(72,47) = M1(9,9); M2(72,54) = M1(9,15); M2(72,55) = M1(9,16); M2(72,56) = M1(9,17); M2(72,58) = M1(9,18); M2(72,59) = M1(9,19); M2(72,60) = M1(9,20); M2(72,61) = M1(9,21); M2(72,63) = M1(9,22); M2(72,64) = M1(9,23); M2(72,65) = M1(9,24); M2(72,67) = M1(9,25); M2(72,68) = M1(9,26); M2(72,70) = M1(9,27); M2(72,72) = M1(9,28); M2(72,73) = M1(9,29); M2(72,74) = M1(9,30); M2(72,75) = M1(9,31); M2(72,76) = M1(9,32); M2(72,77) = M1(9,33); M2(72,79) = M1(9,34); M2(72,80) = M1(9,35); M2(72,81) = M1(9,36); M2(72,82) = M1(9,37); M2(72,83) = M1(9,38); M2(72,85) = M1(9,39); M2(72,86) = M1(9,40); M2(72,87) = M1(9,41); M2(72,88) = M1(9,42); M2(72,90) = M1(9,43); M2(72,91) = M1(9,44); M2(72,92) = M1(9,45); M2(72,95) = M1(9,46); M2(72,96) = M1(9,47); M2(72,98) = M1(9,48); M2(72,101) = M1(9,49); M2(72,102) = M1(9,50); M2(72,103) = M1(9,51); M2(72,104) = M1(9,52); M2(72,105) = M1(9,53); M2(72,107) = M1(9,54); M2(72,108) = M1(9,55); M2(72,109) = M1(9,56); M2(72,110) = M1(9,57); M2(72,112) = M1(9,58); M2(72,113) = M1(9,59); M2(72,114) = M1(9,60); M2(72,116) = M1(9,61); M2(72,117) = M1(9,62); M2(72,119) = M1(9,63); M2(72,122) = M1(9,64); M2(72,123) = M1(9,65); M2(72,124) = M1(9,66); M2(72,125) = M1(9,67); M2(72,127) = M1(9,68); M2(72,128) = M1(9,69); M2(72,129) = M1(9,70); M2(72,131) = M1(9,71); M2(72,132) = M1(9,72); M2(72,134) = M1(9,73); M2(72,137) = M1(9,74); M2(72,138) = M1(9,75); M2(72,139) = M1(9,76); M2(72,141) = M1(9,77); M2(72,142) = M1(9,78); M2(72,144) = M1(9,79); M2(72,147) = M1(9,80); M2(72,148) = M1(9,81); M2(72,150) = M1(9,82); M2(72,153) = M1(9,83); 
M2(73,48) = M1(10,10); M2(73,54) = M1(10,15); M2(73,55) = M1(10,16); M2(73,56) = M1(10,17); M2(73,58) = M1(10,18); M2(73,59) = M1(10,19); M2(73,60) = M1(10,20); M2(73,61) = M1(10,21); M2(73,63) = M1(10,22); M2(73,64) = M1(10,23); M2(73,65) = M1(10,24); M2(73,67) = M1(10,25); M2(73,68) = M1(10,26); M2(73,70) = M1(10,27); M2(73,72) = M1(10,28); M2(73,73) = M1(10,29); M2(73,74) = M1(10,30); M2(73,75) = M1(10,31); M2(73,76) = M1(10,32); M2(73,77) = M1(10,33); M2(73,79) = M1(10,34); M2(73,80) = M1(10,35); M2(73,81) = M1(10,36); M2(73,82) = M1(10,37); M2(73,83) = M1(10,38); M2(73,85) = M1(10,39); M2(73,86) = M1(10,40); M2(73,87) = M1(10,41); M2(73,88) = M1(10,42); M2(73,90) = M1(10,43); M2(73,91) = M1(10,44); M2(73,92) = M1(10,45); M2(73,95) = M1(10,46); M2(73,96) = M1(10,47); M2(73,98) = M1(10,48); M2(73,101) = M1(10,49); M2(73,102) = M1(10,50); M2(73,103) = M1(10,51); M2(73,104) = M1(10,52); M2(73,105) = M1(10,53); M2(73,107) = M1(10,54); M2(73,108) = M1(10,55); M2(73,109) = M1(10,56); M2(73,110) = M1(10,57); M2(73,112) = M1(10,58); M2(73,113) = M1(10,59); M2(73,114) = M1(10,60); M2(73,116) = M1(10,61); M2(73,117) = M1(10,62); M2(73,119) = M1(10,63); M2(73,122) = M1(10,64); M2(73,123) = M1(10,65); M2(73,124) = M1(10,66); M2(73,125) = M1(10,67); M2(73,127) = M1(10,68); M2(73,128) = M1(10,69); M2(73,129) = M1(10,70); M2(73,131) = M1(10,71); M2(73,132) = M1(10,72); M2(73,134) = M1(10,73); M2(73,137) = M1(10,74); M2(73,138) = M1(10,75); M2(73,139) = M1(10,76); M2(73,141) = M1(10,77); M2(73,142) = M1(10,78); M2(73,144) = M1(10,79); M2(73,147) = M1(10,80); M2(73,148) = M1(10,81); M2(73,150) = M1(10,82); M2(73,153) = M1(10,83); 
M2(74,49) = M1(11,11); M2(74,54) = M1(11,15); M2(74,55) = M1(11,16); M2(74,56) = M1(11,17); M2(74,58) = M1(11,18); M2(74,59) = M1(11,19); M2(74,60) = M1(11,20); M2(74,61) = M1(11,21); M2(74,63) = M1(11,22); M2(74,64) = M1(11,23); M2(74,65) = M1(11,24); M2(74,67) = M1(11,25); M2(74,68) = M1(11,26); M2(74,70) = M1(11,27); M2(74,72) = M1(11,28); M2(74,73) = M1(11,29); M2(74,74) = M1(11,30); M2(74,75) = M1(11,31); M2(74,76) = M1(11,32); M2(74,77) = M1(11,33); M2(74,79) = M1(11,34); M2(74,80) = M1(11,35); M2(74,81) = M1(11,36); M2(74,82) = M1(11,37); M2(74,83) = M1(11,38); M2(74,85) = M1(11,39); M2(74,86) = M1(11,40); M2(74,87) = M1(11,41); M2(74,88) = M1(11,42); M2(74,90) = M1(11,43); M2(74,91) = M1(11,44); M2(74,92) = M1(11,45); M2(74,95) = M1(11,46); M2(74,96) = M1(11,47); M2(74,98) = M1(11,48); M2(74,101) = M1(11,49); M2(74,102) = M1(11,50); M2(74,103) = M1(11,51); M2(74,104) = M1(11,52); M2(74,105) = M1(11,53); M2(74,107) = M1(11,54); M2(74,108) = M1(11,55); M2(74,109) = M1(11,56); M2(74,110) = M1(11,57); M2(74,112) = M1(11,58); M2(74,113) = M1(11,59); M2(74,114) = M1(11,60); M2(74,116) = M1(11,61); M2(74,117) = M1(11,62); M2(74,119) = M1(11,63); M2(74,122) = M1(11,64); M2(74,123) = M1(11,65); M2(74,124) = M1(11,66); M2(74,125) = M1(11,67); M2(74,127) = M1(11,68); M2(74,128) = M1(11,69); M2(74,129) = M1(11,70); M2(74,131) = M1(11,71); M2(74,132) = M1(11,72); M2(74,134) = M1(11,73); M2(74,137) = M1(11,74); M2(74,138) = M1(11,75); M2(74,139) = M1(11,76); M2(74,141) = M1(11,77); M2(74,142) = M1(11,78); M2(74,144) = M1(11,79); M2(74,147) = M1(11,80); M2(74,148) = M1(11,81); M2(74,150) = M1(11,82); M2(74,153) = M1(11,83); 
M2(75,50) = M1(12,12); M2(75,54) = M1(12,15); M2(75,55) = M1(12,16); M2(75,56) = M1(12,17); M2(75,58) = M1(12,18); M2(75,59) = M1(12,19); M2(75,60) = M1(12,20); M2(75,61) = M1(12,21); M2(75,63) = M1(12,22); M2(75,64) = M1(12,23); M2(75,65) = M1(12,24); M2(75,67) = M1(12,25); M2(75,68) = M1(12,26); M2(75,70) = M1(12,27); M2(75,72) = M1(12,28); M2(75,73) = M1(12,29); M2(75,74) = M1(12,30); M2(75,75) = M1(12,31); M2(75,76) = M1(12,32); M2(75,77) = M1(12,33); M2(75,79) = M1(12,34); M2(75,80) = M1(12,35); M2(75,81) = M1(12,36); M2(75,82) = M1(12,37); M2(75,83) = M1(12,38); M2(75,85) = M1(12,39); M2(75,86) = M1(12,40); M2(75,87) = M1(12,41); M2(75,88) = M1(12,42); M2(75,90) = M1(12,43); M2(75,91) = M1(12,44); M2(75,92) = M1(12,45); M2(75,95) = M1(12,46); M2(75,96) = M1(12,47); M2(75,98) = M1(12,48); M2(75,101) = M1(12,49); M2(75,102) = M1(12,50); M2(75,103) = M1(12,51); M2(75,104) = M1(12,52); M2(75,105) = M1(12,53); M2(75,107) = M1(12,54); M2(75,108) = M1(12,55); M2(75,109) = M1(12,56); M2(75,110) = M1(12,57); M2(75,112) = M1(12,58); M2(75,113) = M1(12,59); M2(75,114) = M1(12,60); M2(75,116) = M1(12,61); M2(75,117) = M1(12,62); M2(75,119) = M1(12,63); M2(75,122) = M1(12,64); M2(75,123) = M1(12,65); M2(75,124) = M1(12,66); M2(75,125) = M1(12,67); M2(75,127) = M1(12,68); M2(75,128) = M1(12,69); M2(75,129) = M1(12,70); M2(75,131) = M1(12,71); M2(75,132) = M1(12,72); M2(75,134) = M1(12,73); M2(75,137) = M1(12,74); M2(75,138) = M1(12,75); M2(75,139) = M1(12,76); M2(75,141) = M1(12,77); M2(75,142) = M1(12,78); M2(75,144) = M1(12,79); M2(75,147) = M1(12,80); M2(75,148) = M1(12,81); M2(75,150) = M1(12,82); M2(75,153) = M1(12,83); 
M2(76,52) = M1(13,13); M2(76,54) = M1(13,15); M2(76,55) = M1(13,16); M2(76,56) = M1(13,17); M2(76,58) = M1(13,18); M2(76,59) = M1(13,19); M2(76,60) = M1(13,20); M2(76,61) = M1(13,21); M2(76,63) = M1(13,22); M2(76,64) = M1(13,23); M2(76,65) = M1(13,24); M2(76,67) = M1(13,25); M2(76,68) = M1(13,26); M2(76,70) = M1(13,27); M2(76,72) = M1(13,28); M2(76,73) = M1(13,29); M2(76,74) = M1(13,30); M2(76,75) = M1(13,31); M2(76,76) = M1(13,32); M2(76,77) = M1(13,33); M2(76,79) = M1(13,34); M2(76,80) = M1(13,35); M2(76,81) = M1(13,36); M2(76,82) = M1(13,37); M2(76,83) = M1(13,38); M2(76,85) = M1(13,39); M2(76,86) = M1(13,40); M2(76,87) = M1(13,41); M2(76,88) = M1(13,42); M2(76,90) = M1(13,43); M2(76,91) = M1(13,44); M2(76,92) = M1(13,45); M2(76,95) = M1(13,46); M2(76,96) = M1(13,47); M2(76,98) = M1(13,48); M2(76,101) = M1(13,49); M2(76,102) = M1(13,50); M2(76,103) = M1(13,51); M2(76,104) = M1(13,52); M2(76,105) = M1(13,53); M2(76,107) = M1(13,54); M2(76,108) = M1(13,55); M2(76,109) = M1(13,56); M2(76,110) = M1(13,57); M2(76,112) = M1(13,58); M2(76,113) = M1(13,59); M2(76,114) = M1(13,60); M2(76,116) = M1(13,61); M2(76,117) = M1(13,62); M2(76,119) = M1(13,63); M2(76,122) = M1(13,64); M2(76,123) = M1(13,65); M2(76,124) = M1(13,66); M2(76,125) = M1(13,67); M2(76,127) = M1(13,68); M2(76,128) = M1(13,69); M2(76,129) = M1(13,70); M2(76,131) = M1(13,71); M2(76,132) = M1(13,72); M2(76,134) = M1(13,73); M2(76,137) = M1(13,74); M2(76,138) = M1(13,75); M2(76,139) = M1(13,76); M2(76,141) = M1(13,77); M2(76,142) = M1(13,78); M2(76,144) = M1(13,79); M2(76,147) = M1(13,80); M2(76,148) = M1(13,81); M2(76,150) = M1(13,82); M2(76,153) = M1(13,83); 
M2(77,53) = M1(14,14); M2(77,54) = M1(14,15); M2(77,55) = M1(14,16); M2(77,56) = M1(14,17); M2(77,58) = M1(14,18); M2(77,59) = M1(14,19); M2(77,60) = M1(14,20); M2(77,61) = M1(14,21); M2(77,63) = M1(14,22); M2(77,64) = M1(14,23); M2(77,65) = M1(14,24); M2(77,67) = M1(14,25); M2(77,68) = M1(14,26); M2(77,70) = M1(14,27); M2(77,72) = M1(14,28); M2(77,73) = M1(14,29); M2(77,74) = M1(14,30); M2(77,75) = M1(14,31); M2(77,76) = M1(14,32); M2(77,77) = M1(14,33); M2(77,79) = M1(14,34); M2(77,80) = M1(14,35); M2(77,81) = M1(14,36); M2(77,82) = M1(14,37); M2(77,83) = M1(14,38); M2(77,85) = M1(14,39); M2(77,86) = M1(14,40); M2(77,87) = M1(14,41); M2(77,88) = M1(14,42); M2(77,90) = M1(14,43); M2(77,91) = M1(14,44); M2(77,92) = M1(14,45); M2(77,95) = M1(14,46); M2(77,96) = M1(14,47); M2(77,98) = M1(14,48); M2(77,101) = M1(14,49); M2(77,102) = M1(14,50); M2(77,103) = M1(14,51); M2(77,104) = M1(14,52); M2(77,105) = M1(14,53); M2(77,107) = M1(14,54); M2(77,108) = M1(14,55); M2(77,109) = M1(14,56); M2(77,110) = M1(14,57); M2(77,112) = M1(14,58); M2(77,113) = M1(14,59); M2(77,114) = M1(14,60); M2(77,116) = M1(14,61); M2(77,117) = M1(14,62); M2(77,119) = M1(14,63); M2(77,122) = M1(14,64); M2(77,123) = M1(14,65); M2(77,124) = M1(14,66); M2(77,125) = M1(14,67); M2(77,127) = M1(14,68); M2(77,128) = M1(14,69); M2(77,129) = M1(14,70); M2(77,131) = M1(14,71); M2(77,132) = M1(14,72); M2(77,134) = M1(14,73); M2(77,137) = M1(14,74); M2(77,138) = M1(14,75); M2(77,139) = M1(14,76); M2(77,141) = M1(14,77); M2(77,142) = M1(14,78); M2(77,144) = M1(14,79); M2(77,147) = M1(14,80); M2(77,148) = M1(14,81); M2(77,150) = M1(14,82); M2(77,153) = M1(14,83); 
M2(78,72) = M1(0,0); M2(78,87) = M1(0,15); M2(78,88) = M1(0,16); M2(78,89) = M1(0,17); M2(78,90) = M1(0,18); M2(78,91) = M1(0,19); M2(78,92) = M1(0,20); M2(78,94) = M1(0,21); M2(78,95) = M1(0,22); M2(78,96) = M1(0,23); M2(78,97) = M1(0,24); M2(78,98) = M1(0,25); M2(78,99) = M1(0,26); M2(78,100) = M1(0,27); M2(78,101) = M1(0,28); M2(78,102) = M1(0,29); M2(78,103) = M1(0,30); M2(78,104) = M1(0,31); M2(78,105) = M1(0,32); M2(78,106) = M1(0,33); M2(78,107) = M1(0,34); M2(78,108) = M1(0,35); M2(78,109) = M1(0,36); M2(78,110) = M1(0,37); M2(78,111) = M1(0,38); M2(78,112) = M1(0,39); M2(78,113) = M1(0,40); M2(78,114) = M1(0,41); M2(78,115) = M1(0,42); M2(78,116) = M1(0,43); M2(78,117) = M1(0,44); M2(78,118) = M1(0,45); M2(78,119) = M1(0,46); M2(78,120) = M1(0,47); M2(78,121) = M1(0,48); M2(78,122) = M1(0,49); M2(78,123) = M1(0,50); M2(78,124) = M1(0,51); M2(78,125) = M1(0,52); M2(78,126) = M1(0,53); M2(78,127) = M1(0,54); M2(78,128) = M1(0,55); M2(78,129) = M1(0,56); M2(78,130) = M1(0,57); M2(78,131) = M1(0,58); M2(78,132) = M1(0,59); M2(78,133) = M1(0,60); M2(78,134) = M1(0,61); M2(78,135) = M1(0,62); M2(78,136) = M1(0,63); M2(78,137) = M1(0,64); M2(78,138) = M1(0,65); M2(78,139) = M1(0,66); M2(78,140) = M1(0,67); M2(78,141) = M1(0,68); M2(78,142) = M1(0,69); M2(78,143) = M1(0,70); M2(78,144) = M1(0,71); M2(78,145) = M1(0,72); M2(78,146) = M1(0,73); M2(78,147) = M1(0,74); M2(78,148) = M1(0,75); M2(78,149) = M1(0,76); M2(78,150) = M1(0,77); M2(78,151) = M1(0,78); M2(78,152) = M1(0,79); M2(78,153) = M1(0,80); M2(78,154) = M1(0,81); M2(78,155) = M1(0,82); M2(78,156) = M1(0,83); 
M2(79,73) = M1(1,1); M2(79,87) = M1(1,15); M2(79,88) = M1(1,16); M2(79,89) = M1(1,17); M2(79,90) = M1(1,18); M2(79,91) = M1(1,19); M2(79,92) = M1(1,20); M2(79,94) = M1(1,21); M2(79,95) = M1(1,22); M2(79,96) = M1(1,23); M2(79,97) = M1(1,24); M2(79,98) = M1(1,25); M2(79,99) = M1(1,26); M2(79,100) = M1(1,27); M2(79,101) = M1(1,28); M2(79,102) = M1(1,29); M2(79,103) = M1(1,30); M2(79,104) = M1(1,31); M2(79,105) = M1(1,32); M2(79,106) = M1(1,33); M2(79,107) = M1(1,34); M2(79,108) = M1(1,35); M2(79,109) = M1(1,36); M2(79,110) = M1(1,37); M2(79,111) = M1(1,38); M2(79,112) = M1(1,39); M2(79,113) = M1(1,40); M2(79,114) = M1(1,41); M2(79,115) = M1(1,42); M2(79,116) = M1(1,43); M2(79,117) = M1(1,44); M2(79,118) = M1(1,45); M2(79,119) = M1(1,46); M2(79,120) = M1(1,47); M2(79,121) = M1(1,48); M2(79,122) = M1(1,49); M2(79,123) = M1(1,50); M2(79,124) = M1(1,51); M2(79,125) = M1(1,52); M2(79,126) = M1(1,53); M2(79,127) = M1(1,54); M2(79,128) = M1(1,55); M2(79,129) = M1(1,56); M2(79,130) = M1(1,57); M2(79,131) = M1(1,58); M2(79,132) = M1(1,59); M2(79,133) = M1(1,60); M2(79,134) = M1(1,61); M2(79,135) = M1(1,62); M2(79,136) = M1(1,63); M2(79,137) = M1(1,64); M2(79,138) = M1(1,65); M2(79,139) = M1(1,66); M2(79,140) = M1(1,67); M2(79,141) = M1(1,68); M2(79,142) = M1(1,69); M2(79,143) = M1(1,70); M2(79,144) = M1(1,71); M2(79,145) = M1(1,72); M2(79,146) = M1(1,73); M2(79,147) = M1(1,74); M2(79,148) = M1(1,75); M2(79,149) = M1(1,76); M2(79,150) = M1(1,77); M2(79,151) = M1(1,78); M2(79,152) = M1(1,79); M2(79,153) = M1(1,80); M2(79,154) = M1(1,81); M2(79,155) = M1(1,82); M2(79,156) = M1(1,83); 
M2(80,74) = M1(2,2); M2(80,87) = M1(2,15); M2(80,88) = M1(2,16); M2(80,89) = M1(2,17); M2(80,90) = M1(2,18); M2(80,91) = M1(2,19); M2(80,92) = M1(2,20); M2(80,94) = M1(2,21); M2(80,95) = M1(2,22); M2(80,96) = M1(2,23); M2(80,97) = M1(2,24); M2(80,98) = M1(2,25); M2(80,99) = M1(2,26); M2(80,100) = M1(2,27); M2(80,101) = M1(2,28); M2(80,102) = M1(2,29); M2(80,103) = M1(2,30); M2(80,104) = M1(2,31); M2(80,105) = M1(2,32); M2(80,106) = M1(2,33); M2(80,107) = M1(2,34); M2(80,108) = M1(2,35); M2(80,109) = M1(2,36); M2(80,110) = M1(2,37); M2(80,111) = M1(2,38); M2(80,112) = M1(2,39); M2(80,113) = M1(2,40); M2(80,114) = M1(2,41); M2(80,115) = M1(2,42); M2(80,116) = M1(2,43); M2(80,117) = M1(2,44); M2(80,118) = M1(2,45); M2(80,119) = M1(2,46); M2(80,120) = M1(2,47); M2(80,121) = M1(2,48); M2(80,122) = M1(2,49); M2(80,123) = M1(2,50); M2(80,124) = M1(2,51); M2(80,125) = M1(2,52); M2(80,126) = M1(2,53); M2(80,127) = M1(2,54); M2(80,128) = M1(2,55); M2(80,129) = M1(2,56); M2(80,130) = M1(2,57); M2(80,131) = M1(2,58); M2(80,132) = M1(2,59); M2(80,133) = M1(2,60); M2(80,134) = M1(2,61); M2(80,135) = M1(2,62); M2(80,136) = M1(2,63); M2(80,137) = M1(2,64); M2(80,138) = M1(2,65); M2(80,139) = M1(2,66); M2(80,140) = M1(2,67); M2(80,141) = M1(2,68); M2(80,142) = M1(2,69); M2(80,143) = M1(2,70); M2(80,144) = M1(2,71); M2(80,145) = M1(2,72); M2(80,146) = M1(2,73); M2(80,147) = M1(2,74); M2(80,148) = M1(2,75); M2(80,149) = M1(2,76); M2(80,150) = M1(2,77); M2(80,151) = M1(2,78); M2(80,152) = M1(2,79); M2(80,153) = M1(2,80); M2(80,154) = M1(2,81); M2(80,155) = M1(2,82); M2(80,156) = M1(2,83); 
M2(81,75) = M1(3,3); M2(81,87) = M1(3,15); M2(81,88) = M1(3,16); M2(81,89) = M1(3,17); M2(81,90) = M1(3,18); M2(81,91) = M1(3,19); M2(81,92) = M1(3,20); M2(81,94) = M1(3,21); M2(81,95) = M1(3,22); M2(81,96) = M1(3,23); M2(81,97) = M1(3,24); M2(81,98) = M1(3,25); M2(81,99) = M1(3,26); M2(81,100) = M1(3,27); M2(81,101) = M1(3,28); M2(81,102) = M1(3,29); M2(81,103) = M1(3,30); M2(81,104) = M1(3,31); M2(81,105) = M1(3,32); M2(81,106) = M1(3,33); M2(81,107) = M1(3,34); M2(81,108) = M1(3,35); M2(81,109) = M1(3,36); M2(81,110) = M1(3,37); M2(81,111) = M1(3,38); M2(81,112) = M1(3,39); M2(81,113) = M1(3,40); M2(81,114) = M1(3,41); M2(81,115) = M1(3,42); M2(81,116) = M1(3,43); M2(81,117) = M1(3,44); M2(81,118) = M1(3,45); M2(81,119) = M1(3,46); M2(81,120) = M1(3,47); M2(81,121) = M1(3,48); M2(81,122) = M1(3,49); M2(81,123) = M1(3,50); M2(81,124) = M1(3,51); M2(81,125) = M1(3,52); M2(81,126) = M1(3,53); M2(81,127) = M1(3,54); M2(81,128) = M1(3,55); M2(81,129) = M1(3,56); M2(81,130) = M1(3,57); M2(81,131) = M1(3,58); M2(81,132) = M1(3,59); M2(81,133) = M1(3,60); M2(81,134) = M1(3,61); M2(81,135) = M1(3,62); M2(81,136) = M1(3,63); M2(81,137) = M1(3,64); M2(81,138) = M1(3,65); M2(81,139) = M1(3,66); M2(81,140) = M1(3,67); M2(81,141) = M1(3,68); M2(81,142) = M1(3,69); M2(81,143) = M1(3,70); M2(81,144) = M1(3,71); M2(81,145) = M1(3,72); M2(81,146) = M1(3,73); M2(81,147) = M1(3,74); M2(81,148) = M1(3,75); M2(81,149) = M1(3,76); M2(81,150) = M1(3,77); M2(81,151) = M1(3,78); M2(81,152) = M1(3,79); M2(81,153) = M1(3,80); M2(81,154) = M1(3,81); M2(81,155) = M1(3,82); M2(81,156) = M1(3,83); 
M2(82,76) = M1(4,4); M2(82,87) = M1(4,15); M2(82,88) = M1(4,16); M2(82,89) = M1(4,17); M2(82,90) = M1(4,18); M2(82,91) = M1(4,19); M2(82,92) = M1(4,20); M2(82,94) = M1(4,21); M2(82,95) = M1(4,22); M2(82,96) = M1(4,23); M2(82,97) = M1(4,24); M2(82,98) = M1(4,25); M2(82,99) = M1(4,26); M2(82,100) = M1(4,27); M2(82,101) = M1(4,28); M2(82,102) = M1(4,29); M2(82,103) = M1(4,30); M2(82,104) = M1(4,31); M2(82,105) = M1(4,32); M2(82,106) = M1(4,33); M2(82,107) = M1(4,34); M2(82,108) = M1(4,35); M2(82,109) = M1(4,36); M2(82,110) = M1(4,37); M2(82,111) = M1(4,38); M2(82,112) = M1(4,39); M2(82,113) = M1(4,40); M2(82,114) = M1(4,41); M2(82,115) = M1(4,42); M2(82,116) = M1(4,43); M2(82,117) = M1(4,44); M2(82,118) = M1(4,45); M2(82,119) = M1(4,46); M2(82,120) = M1(4,47); M2(82,121) = M1(4,48); M2(82,122) = M1(4,49); M2(82,123) = M1(4,50); M2(82,124) = M1(4,51); M2(82,125) = M1(4,52); M2(82,126) = M1(4,53); M2(82,127) = M1(4,54); M2(82,128) = M1(4,55); M2(82,129) = M1(4,56); M2(82,130) = M1(4,57); M2(82,131) = M1(4,58); M2(82,132) = M1(4,59); M2(82,133) = M1(4,60); M2(82,134) = M1(4,61); M2(82,135) = M1(4,62); M2(82,136) = M1(4,63); M2(82,137) = M1(4,64); M2(82,138) = M1(4,65); M2(82,139) = M1(4,66); M2(82,140) = M1(4,67); M2(82,141) = M1(4,68); M2(82,142) = M1(4,69); M2(82,143) = M1(4,70); M2(82,144) = M1(4,71); M2(82,145) = M1(4,72); M2(82,146) = M1(4,73); M2(82,147) = M1(4,74); M2(82,148) = M1(4,75); M2(82,149) = M1(4,76); M2(82,150) = M1(4,77); M2(82,151) = M1(4,78); M2(82,152) = M1(4,79); M2(82,153) = M1(4,80); M2(82,154) = M1(4,81); M2(82,155) = M1(4,82); M2(82,156) = M1(4,83); 
M2(83,77) = M1(5,5); M2(83,87) = M1(5,15); M2(83,88) = M1(5,16); M2(83,89) = M1(5,17); M2(83,90) = M1(5,18); M2(83,91) = M1(5,19); M2(83,92) = M1(5,20); M2(83,94) = M1(5,21); M2(83,95) = M1(5,22); M2(83,96) = M1(5,23); M2(83,97) = M1(5,24); M2(83,98) = M1(5,25); M2(83,99) = M1(5,26); M2(83,100) = M1(5,27); M2(83,101) = M1(5,28); M2(83,102) = M1(5,29); M2(83,103) = M1(5,30); M2(83,104) = M1(5,31); M2(83,105) = M1(5,32); M2(83,106) = M1(5,33); M2(83,107) = M1(5,34); M2(83,108) = M1(5,35); M2(83,109) = M1(5,36); M2(83,110) = M1(5,37); M2(83,111) = M1(5,38); M2(83,112) = M1(5,39); M2(83,113) = M1(5,40); M2(83,114) = M1(5,41); M2(83,115) = M1(5,42); M2(83,116) = M1(5,43); M2(83,117) = M1(5,44); M2(83,118) = M1(5,45); M2(83,119) = M1(5,46); M2(83,120) = M1(5,47); M2(83,121) = M1(5,48); M2(83,122) = M1(5,49); M2(83,123) = M1(5,50); M2(83,124) = M1(5,51); M2(83,125) = M1(5,52); M2(83,126) = M1(5,53); M2(83,127) = M1(5,54); M2(83,128) = M1(5,55); M2(83,129) = M1(5,56); M2(83,130) = M1(5,57); M2(83,131) = M1(5,58); M2(83,132) = M1(5,59); M2(83,133) = M1(5,60); M2(83,134) = M1(5,61); M2(83,135) = M1(5,62); M2(83,136) = M1(5,63); M2(83,137) = M1(5,64); M2(83,138) = M1(5,65); M2(83,139) = M1(5,66); M2(83,140) = M1(5,67); M2(83,141) = M1(5,68); M2(83,142) = M1(5,69); M2(83,143) = M1(5,70); M2(83,144) = M1(5,71); M2(83,145) = M1(5,72); M2(83,146) = M1(5,73); M2(83,147) = M1(5,74); M2(83,148) = M1(5,75); M2(83,149) = M1(5,76); M2(83,150) = M1(5,77); M2(83,151) = M1(5,78); M2(83,152) = M1(5,79); M2(83,153) = M1(5,80); M2(83,154) = M1(5,81); M2(83,155) = M1(5,82); M2(83,156) = M1(5,83); 
M2(84,78) = M1(6,6); M2(84,87) = M1(6,15); M2(84,88) = M1(6,16); M2(84,89) = M1(6,17); M2(84,90) = M1(6,18); M2(84,91) = M1(6,19); M2(84,92) = M1(6,20); M2(84,94) = M1(6,21); M2(84,95) = M1(6,22); M2(84,96) = M1(6,23); M2(84,97) = M1(6,24); M2(84,98) = M1(6,25); M2(84,99) = M1(6,26); M2(84,100) = M1(6,27); M2(84,101) = M1(6,28); M2(84,102) = M1(6,29); M2(84,103) = M1(6,30); M2(84,104) = M1(6,31); M2(84,105) = M1(6,32); M2(84,106) = M1(6,33); M2(84,107) = M1(6,34); M2(84,108) = M1(6,35); M2(84,109) = M1(6,36); M2(84,110) = M1(6,37); M2(84,111) = M1(6,38); M2(84,112) = M1(6,39); M2(84,113) = M1(6,40); M2(84,114) = M1(6,41); M2(84,115) = M1(6,42); M2(84,116) = M1(6,43); M2(84,117) = M1(6,44); M2(84,118) = M1(6,45); M2(84,119) = M1(6,46); M2(84,120) = M1(6,47); M2(84,121) = M1(6,48); M2(84,122) = M1(6,49); M2(84,123) = M1(6,50); M2(84,124) = M1(6,51); M2(84,125) = M1(6,52); M2(84,126) = M1(6,53); M2(84,127) = M1(6,54); M2(84,128) = M1(6,55); M2(84,129) = M1(6,56); M2(84,130) = M1(6,57); M2(84,131) = M1(6,58); M2(84,132) = M1(6,59); M2(84,133) = M1(6,60); M2(84,134) = M1(6,61); M2(84,135) = M1(6,62); M2(84,136) = M1(6,63); M2(84,137) = M1(6,64); M2(84,138) = M1(6,65); M2(84,139) = M1(6,66); M2(84,140) = M1(6,67); M2(84,141) = M1(6,68); M2(84,142) = M1(6,69); M2(84,143) = M1(6,70); M2(84,144) = M1(6,71); M2(84,145) = M1(6,72); M2(84,146) = M1(6,73); M2(84,147) = M1(6,74); M2(84,148) = M1(6,75); M2(84,149) = M1(6,76); M2(84,150) = M1(6,77); M2(84,151) = M1(6,78); M2(84,152) = M1(6,79); M2(84,153) = M1(6,80); M2(84,154) = M1(6,81); M2(84,155) = M1(6,82); M2(84,156) = M1(6,83); 
M2(85,79) = M1(7,7); M2(85,87) = M1(7,15); M2(85,88) = M1(7,16); M2(85,89) = M1(7,17); M2(85,90) = M1(7,18); M2(85,91) = M1(7,19); M2(85,92) = M1(7,20); M2(85,94) = M1(7,21); M2(85,95) = M1(7,22); M2(85,96) = M1(7,23); M2(85,97) = M1(7,24); M2(85,98) = M1(7,25); M2(85,99) = M1(7,26); M2(85,100) = M1(7,27); M2(85,101) = M1(7,28); M2(85,102) = M1(7,29); M2(85,103) = M1(7,30); M2(85,104) = M1(7,31); M2(85,105) = M1(7,32); M2(85,106) = M1(7,33); M2(85,107) = M1(7,34); M2(85,108) = M1(7,35); M2(85,109) = M1(7,36); M2(85,110) = M1(7,37); M2(85,111) = M1(7,38); M2(85,112) = M1(7,39); M2(85,113) = M1(7,40); M2(85,114) = M1(7,41); M2(85,115) = M1(7,42); M2(85,116) = M1(7,43); M2(85,117) = M1(7,44); M2(85,118) = M1(7,45); M2(85,119) = M1(7,46); M2(85,120) = M1(7,47); M2(85,121) = M1(7,48); M2(85,122) = M1(7,49); M2(85,123) = M1(7,50); M2(85,124) = M1(7,51); M2(85,125) = M1(7,52); M2(85,126) = M1(7,53); M2(85,127) = M1(7,54); M2(85,128) = M1(7,55); M2(85,129) = M1(7,56); M2(85,130) = M1(7,57); M2(85,131) = M1(7,58); M2(85,132) = M1(7,59); M2(85,133) = M1(7,60); M2(85,134) = M1(7,61); M2(85,135) = M1(7,62); M2(85,136) = M1(7,63); M2(85,137) = M1(7,64); M2(85,138) = M1(7,65); M2(85,139) = M1(7,66); M2(85,140) = M1(7,67); M2(85,141) = M1(7,68); M2(85,142) = M1(7,69); M2(85,143) = M1(7,70); M2(85,144) = M1(7,71); M2(85,145) = M1(7,72); M2(85,146) = M1(7,73); M2(85,147) = M1(7,74); M2(85,148) = M1(7,75); M2(85,149) = M1(7,76); M2(85,150) = M1(7,77); M2(85,151) = M1(7,78); M2(85,152) = M1(7,79); M2(85,153) = M1(7,80); M2(85,154) = M1(7,81); M2(85,155) = M1(7,82); M2(85,156) = M1(7,83); 
M2(86,80) = M1(8,8); M2(86,87) = M1(8,15); M2(86,88) = M1(8,16); M2(86,89) = M1(8,17); M2(86,90) = M1(8,18); M2(86,91) = M1(8,19); M2(86,92) = M1(8,20); M2(86,94) = M1(8,21); M2(86,95) = M1(8,22); M2(86,96) = M1(8,23); M2(86,97) = M1(8,24); M2(86,98) = M1(8,25); M2(86,99) = M1(8,26); M2(86,100) = M1(8,27); M2(86,101) = M1(8,28); M2(86,102) = M1(8,29); M2(86,103) = M1(8,30); M2(86,104) = M1(8,31); M2(86,105) = M1(8,32); M2(86,106) = M1(8,33); M2(86,107) = M1(8,34); M2(86,108) = M1(8,35); M2(86,109) = M1(8,36); M2(86,110) = M1(8,37); M2(86,111) = M1(8,38); M2(86,112) = M1(8,39); M2(86,113) = M1(8,40); M2(86,114) = M1(8,41); M2(86,115) = M1(8,42); M2(86,116) = M1(8,43); M2(86,117) = M1(8,44); M2(86,118) = M1(8,45); M2(86,119) = M1(8,46); M2(86,120) = M1(8,47); M2(86,121) = M1(8,48); M2(86,122) = M1(8,49); M2(86,123) = M1(8,50); M2(86,124) = M1(8,51); M2(86,125) = M1(8,52); M2(86,126) = M1(8,53); M2(86,127) = M1(8,54); M2(86,128) = M1(8,55); M2(86,129) = M1(8,56); M2(86,130) = M1(8,57); M2(86,131) = M1(8,58); M2(86,132) = M1(8,59); M2(86,133) = M1(8,60); M2(86,134) = M1(8,61); M2(86,135) = M1(8,62); M2(86,136) = M1(8,63); M2(86,137) = M1(8,64); M2(86,138) = M1(8,65); M2(86,139) = M1(8,66); M2(86,140) = M1(8,67); M2(86,141) = M1(8,68); M2(86,142) = M1(8,69); M2(86,143) = M1(8,70); M2(86,144) = M1(8,71); M2(86,145) = M1(8,72); M2(86,146) = M1(8,73); M2(86,147) = M1(8,74); M2(86,148) = M1(8,75); M2(86,149) = M1(8,76); M2(86,150) = M1(8,77); M2(86,151) = M1(8,78); M2(86,152) = M1(8,79); M2(86,153) = M1(8,80); M2(86,154) = M1(8,81); M2(86,155) = M1(8,82); M2(86,156) = M1(8,83); 
M2(87,81) = M1(9,9); M2(87,87) = M1(9,15); M2(87,88) = M1(9,16); M2(87,89) = M1(9,17); M2(87,90) = M1(9,18); M2(87,91) = M1(9,19); M2(87,92) = M1(9,20); M2(87,94) = M1(9,21); M2(87,95) = M1(9,22); M2(87,96) = M1(9,23); M2(87,97) = M1(9,24); M2(87,98) = M1(9,25); M2(87,99) = M1(9,26); M2(87,100) = M1(9,27); M2(87,101) = M1(9,28); M2(87,102) = M1(9,29); M2(87,103) = M1(9,30); M2(87,104) = M1(9,31); M2(87,105) = M1(9,32); M2(87,106) = M1(9,33); M2(87,107) = M1(9,34); M2(87,108) = M1(9,35); M2(87,109) = M1(9,36); M2(87,110) = M1(9,37); M2(87,111) = M1(9,38); M2(87,112) = M1(9,39); M2(87,113) = M1(9,40); M2(87,114) = M1(9,41); M2(87,115) = M1(9,42); M2(87,116) = M1(9,43); M2(87,117) = M1(9,44); M2(87,118) = M1(9,45); M2(87,119) = M1(9,46); M2(87,120) = M1(9,47); M2(87,121) = M1(9,48); M2(87,122) = M1(9,49); M2(87,123) = M1(9,50); M2(87,124) = M1(9,51); M2(87,125) = M1(9,52); M2(87,126) = M1(9,53); M2(87,127) = M1(9,54); M2(87,128) = M1(9,55); M2(87,129) = M1(9,56); M2(87,130) = M1(9,57); M2(87,131) = M1(9,58); M2(87,132) = M1(9,59); M2(87,133) = M1(9,60); M2(87,134) = M1(9,61); M2(87,135) = M1(9,62); M2(87,136) = M1(9,63); M2(87,137) = M1(9,64); M2(87,138) = M1(9,65); M2(87,139) = M1(9,66); M2(87,140) = M1(9,67); M2(87,141) = M1(9,68); M2(87,142) = M1(9,69); M2(87,143) = M1(9,70); M2(87,144) = M1(9,71); M2(87,145) = M1(9,72); M2(87,146) = M1(9,73); M2(87,147) = M1(9,74); M2(87,148) = M1(9,75); M2(87,149) = M1(9,76); M2(87,150) = M1(9,77); M2(87,151) = M1(9,78); M2(87,152) = M1(9,79); M2(87,153) = M1(9,80); M2(87,154) = M1(9,81); M2(87,155) = M1(9,82); M2(87,156) = M1(9,83); 
M2(88,82) = M1(10,10); M2(88,87) = M1(10,15); M2(88,88) = M1(10,16); M2(88,89) = M1(10,17); M2(88,90) = M1(10,18); M2(88,91) = M1(10,19); M2(88,92) = M1(10,20); M2(88,94) = M1(10,21); M2(88,95) = M1(10,22); M2(88,96) = M1(10,23); M2(88,97) = M1(10,24); M2(88,98) = M1(10,25); M2(88,99) = M1(10,26); M2(88,100) = M1(10,27); M2(88,101) = M1(10,28); M2(88,102) = M1(10,29); M2(88,103) = M1(10,30); M2(88,104) = M1(10,31); M2(88,105) = M1(10,32); M2(88,106) = M1(10,33); M2(88,107) = M1(10,34); M2(88,108) = M1(10,35); M2(88,109) = M1(10,36); M2(88,110) = M1(10,37); M2(88,111) = M1(10,38); M2(88,112) = M1(10,39); M2(88,113) = M1(10,40); M2(88,114) = M1(10,41); M2(88,115) = M1(10,42); M2(88,116) = M1(10,43); M2(88,117) = M1(10,44); M2(88,118) = M1(10,45); M2(88,119) = M1(10,46); M2(88,120) = M1(10,47); M2(88,121) = M1(10,48); M2(88,122) = M1(10,49); M2(88,123) = M1(10,50); M2(88,124) = M1(10,51); M2(88,125) = M1(10,52); M2(88,126) = M1(10,53); M2(88,127) = M1(10,54); M2(88,128) = M1(10,55); M2(88,129) = M1(10,56); M2(88,130) = M1(10,57); M2(88,131) = M1(10,58); M2(88,132) = M1(10,59); M2(88,133) = M1(10,60); M2(88,134) = M1(10,61); M2(88,135) = M1(10,62); M2(88,136) = M1(10,63); M2(88,137) = M1(10,64); M2(88,138) = M1(10,65); M2(88,139) = M1(10,66); M2(88,140) = M1(10,67); M2(88,141) = M1(10,68); M2(88,142) = M1(10,69); M2(88,143) = M1(10,70); M2(88,144) = M1(10,71); M2(88,145) = M1(10,72); M2(88,146) = M1(10,73); M2(88,147) = M1(10,74); M2(88,148) = M1(10,75); M2(88,149) = M1(10,76); M2(88,150) = M1(10,77); M2(88,151) = M1(10,78); M2(88,152) = M1(10,79); M2(88,153) = M1(10,80); M2(88,154) = M1(10,81); M2(88,155) = M1(10,82); M2(88,156) = M1(10,83); 
M2(89,83) = M1(11,11); M2(89,87) = M1(11,15); M2(89,88) = M1(11,16); M2(89,89) = M1(11,17); M2(89,90) = M1(11,18); M2(89,91) = M1(11,19); M2(89,92) = M1(11,20); M2(89,94) = M1(11,21); M2(89,95) = M1(11,22); M2(89,96) = M1(11,23); M2(89,97) = M1(11,24); M2(89,98) = M1(11,25); M2(89,99) = M1(11,26); M2(89,100) = M1(11,27); M2(89,101) = M1(11,28); M2(89,102) = M1(11,29); M2(89,103) = M1(11,30); M2(89,104) = M1(11,31); M2(89,105) = M1(11,32); M2(89,106) = M1(11,33); M2(89,107) = M1(11,34); M2(89,108) = M1(11,35); M2(89,109) = M1(11,36); M2(89,110) = M1(11,37); M2(89,111) = M1(11,38); M2(89,112) = M1(11,39); M2(89,113) = M1(11,40); M2(89,114) = M1(11,41); M2(89,115) = M1(11,42); M2(89,116) = M1(11,43); M2(89,117) = M1(11,44); M2(89,118) = M1(11,45); M2(89,119) = M1(11,46); M2(89,120) = M1(11,47); M2(89,121) = M1(11,48); M2(89,122) = M1(11,49); M2(89,123) = M1(11,50); M2(89,124) = M1(11,51); M2(89,125) = M1(11,52); M2(89,126) = M1(11,53); M2(89,127) = M1(11,54); M2(89,128) = M1(11,55); M2(89,129) = M1(11,56); M2(89,130) = M1(11,57); M2(89,131) = M1(11,58); M2(89,132) = M1(11,59); M2(89,133) = M1(11,60); M2(89,134) = M1(11,61); M2(89,135) = M1(11,62); M2(89,136) = M1(11,63); M2(89,137) = M1(11,64); M2(89,138) = M1(11,65); M2(89,139) = M1(11,66); M2(89,140) = M1(11,67); M2(89,141) = M1(11,68); M2(89,142) = M1(11,69); M2(89,143) = M1(11,70); M2(89,144) = M1(11,71); M2(89,145) = M1(11,72); M2(89,146) = M1(11,73); M2(89,147) = M1(11,74); M2(89,148) = M1(11,75); M2(89,149) = M1(11,76); M2(89,150) = M1(11,77); M2(89,151) = M1(11,78); M2(89,152) = M1(11,79); M2(89,153) = M1(11,80); M2(89,154) = M1(11,81); M2(89,155) = M1(11,82); M2(89,156) = M1(11,83); 
M2(90,84) = M1(12,12); M2(90,87) = M1(12,15); M2(90,88) = M1(12,16); M2(90,89) = M1(12,17); M2(90,90) = M1(12,18); M2(90,91) = M1(12,19); M2(90,92) = M1(12,20); M2(90,94) = M1(12,21); M2(90,95) = M1(12,22); M2(90,96) = M1(12,23); M2(90,97) = M1(12,24); M2(90,98) = M1(12,25); M2(90,99) = M1(12,26); M2(90,100) = M1(12,27); M2(90,101) = M1(12,28); M2(90,102) = M1(12,29); M2(90,103) = M1(12,30); M2(90,104) = M1(12,31); M2(90,105) = M1(12,32); M2(90,106) = M1(12,33); M2(90,107) = M1(12,34); M2(90,108) = M1(12,35); M2(90,109) = M1(12,36); M2(90,110) = M1(12,37); M2(90,111) = M1(12,38); M2(90,112) = M1(12,39); M2(90,113) = M1(12,40); M2(90,114) = M1(12,41); M2(90,115) = M1(12,42); M2(90,116) = M1(12,43); M2(90,117) = M1(12,44); M2(90,118) = M1(12,45); M2(90,119) = M1(12,46); M2(90,120) = M1(12,47); M2(90,121) = M1(12,48); M2(90,122) = M1(12,49); M2(90,123) = M1(12,50); M2(90,124) = M1(12,51); M2(90,125) = M1(12,52); M2(90,126) = M1(12,53); M2(90,127) = M1(12,54); M2(90,128) = M1(12,55); M2(90,129) = M1(12,56); M2(90,130) = M1(12,57); M2(90,131) = M1(12,58); M2(90,132) = M1(12,59); M2(90,133) = M1(12,60); M2(90,134) = M1(12,61); M2(90,135) = M1(12,62); M2(90,136) = M1(12,63); M2(90,137) = M1(12,64); M2(90,138) = M1(12,65); M2(90,139) = M1(12,66); M2(90,140) = M1(12,67); M2(90,141) = M1(12,68); M2(90,142) = M1(12,69); M2(90,143) = M1(12,70); M2(90,144) = M1(12,71); M2(90,145) = M1(12,72); M2(90,146) = M1(12,73); M2(90,147) = M1(12,74); M2(90,148) = M1(12,75); M2(90,149) = M1(12,76); M2(90,150) = M1(12,77); M2(90,151) = M1(12,78); M2(90,152) = M1(12,79); M2(90,153) = M1(12,80); M2(90,154) = M1(12,81); M2(90,155) = M1(12,82); M2(90,156) = M1(12,83); 
M2(91,85) = M1(13,13); M2(91,87) = M1(13,15); M2(91,88) = M1(13,16); M2(91,89) = M1(13,17); M2(91,90) = M1(13,18); M2(91,91) = M1(13,19); M2(91,92) = M1(13,20); M2(91,94) = M1(13,21); M2(91,95) = M1(13,22); M2(91,96) = M1(13,23); M2(91,97) = M1(13,24); M2(91,98) = M1(13,25); M2(91,99) = M1(13,26); M2(91,100) = M1(13,27); M2(91,101) = M1(13,28); M2(91,102) = M1(13,29); M2(91,103) = M1(13,30); M2(91,104) = M1(13,31); M2(91,105) = M1(13,32); M2(91,106) = M1(13,33); M2(91,107) = M1(13,34); M2(91,108) = M1(13,35); M2(91,109) = M1(13,36); M2(91,110) = M1(13,37); M2(91,111) = M1(13,38); M2(91,112) = M1(13,39); M2(91,113) = M1(13,40); M2(91,114) = M1(13,41); M2(91,115) = M1(13,42); M2(91,116) = M1(13,43); M2(91,117) = M1(13,44); M2(91,118) = M1(13,45); M2(91,119) = M1(13,46); M2(91,120) = M1(13,47); M2(91,121) = M1(13,48); M2(91,122) = M1(13,49); M2(91,123) = M1(13,50); M2(91,124) = M1(13,51); M2(91,125) = M1(13,52); M2(91,126) = M1(13,53); M2(91,127) = M1(13,54); M2(91,128) = M1(13,55); M2(91,129) = M1(13,56); M2(91,130) = M1(13,57); M2(91,131) = M1(13,58); M2(91,132) = M1(13,59); M2(91,133) = M1(13,60); M2(91,134) = M1(13,61); M2(91,135) = M1(13,62); M2(91,136) = M1(13,63); M2(91,137) = M1(13,64); M2(91,138) = M1(13,65); M2(91,139) = M1(13,66); M2(91,140) = M1(13,67); M2(91,141) = M1(13,68); M2(91,142) = M1(13,69); M2(91,143) = M1(13,70); M2(91,144) = M1(13,71); M2(91,145) = M1(13,72); M2(91,146) = M1(13,73); M2(91,147) = M1(13,74); M2(91,148) = M1(13,75); M2(91,149) = M1(13,76); M2(91,150) = M1(13,77); M2(91,151) = M1(13,78); M2(91,152) = M1(13,79); M2(91,153) = M1(13,80); M2(91,154) = M1(13,81); M2(91,155) = M1(13,82); M2(91,156) = M1(13,83); 
M2(92,86) = M1(14,14); M2(92,87) = M1(14,15); M2(92,88) = M1(14,16); M2(92,89) = M1(14,17); M2(92,90) = M1(14,18); M2(92,91) = M1(14,19); M2(92,92) = M1(14,20); M2(92,94) = M1(14,21); M2(92,95) = M1(14,22); M2(92,96) = M1(14,23); M2(92,97) = M1(14,24); M2(92,98) = M1(14,25); M2(92,99) = M1(14,26); M2(92,100) = M1(14,27); M2(92,101) = M1(14,28); M2(92,102) = M1(14,29); M2(92,103) = M1(14,30); M2(92,104) = M1(14,31); M2(92,105) = M1(14,32); M2(92,106) = M1(14,33); M2(92,107) = M1(14,34); M2(92,108) = M1(14,35); M2(92,109) = M1(14,36); M2(92,110) = M1(14,37); M2(92,111) = M1(14,38); M2(92,112) = M1(14,39); M2(92,113) = M1(14,40); M2(92,114) = M1(14,41); M2(92,115) = M1(14,42); M2(92,116) = M1(14,43); M2(92,117) = M1(14,44); M2(92,118) = M1(14,45); M2(92,119) = M1(14,46); M2(92,120) = M1(14,47); M2(92,121) = M1(14,48); M2(92,122) = M1(14,49); M2(92,123) = M1(14,50); M2(92,124) = M1(14,51); M2(92,125) = M1(14,52); M2(92,126) = M1(14,53); M2(92,127) = M1(14,54); M2(92,128) = M1(14,55); M2(92,129) = M1(14,56); M2(92,130) = M1(14,57); M2(92,131) = M1(14,58); M2(92,132) = M1(14,59); M2(92,133) = M1(14,60); M2(92,134) = M1(14,61); M2(92,135) = M1(14,62); M2(92,136) = M1(14,63); M2(92,137) = M1(14,64); M2(92,138) = M1(14,65); M2(92,139) = M1(14,66); M2(92,140) = M1(14,67); M2(92,141) = M1(14,68); M2(92,142) = M1(14,69); M2(92,143) = M1(14,70); M2(92,144) = M1(14,71); M2(92,145) = M1(14,72); M2(92,146) = M1(14,73); M2(92,147) = M1(14,74); M2(92,148) = M1(14,75); M2(92,149) = M1(14,76); M2(92,150) = M1(14,77); M2(92,151) = M1(14,78); M2(92,152) = M1(14,79); M2(92,153) = M1(14,80); M2(92,154) = M1(14,81); M2(92,155) = M1(14,82); M2(92,156) = M1(14,83); 

Eigen::PartialPivLU< Eigen::Matrix<double,93,93> > lu(M2.block<93,93>(0,0));
Eigen::Matrix<double,93,64> M3 = lu.solve(M2.block<93,64>(0,93));
Action = Eigen::Matrix<double,64,64>::Zero();
Action.row(0) -= M3.block<1,64>(36,0);
Action.row(1) -= M3.block<1,64>(66,0);
Action.row(2) -= M3.block<1,64>(67,0);
Action.row(3) -= M3.block<1,64>(68,0);
Action.row(4) -= M3.block<1,64>(69,0);
Action.row(5) -= M3.block<1,64>(70,0);
Action.row(6) -= M3.block<1,64>(71,0);
Action(7,0) = 1.0;
Action.row(8) -= M3.block<1,64>(79,0);
Action.row(9) -= M3.block<1,64>(80,0);
Action.row(10) -= M3.block<1,64>(81,0);
Action.row(11) -= M3.block<1,64>(82,0);
Action.row(12) -= M3.block<1,64>(83,0);
Action.row(13) -= M3.block<1,64>(84,0);
Action.row(14) -= M3.block<1,64>(85,0);
Action.row(15) -= M3.block<1,64>(86,0);
Action.row(16) -= M3.block<1,64>(87,0);
Action.row(17) -= M3.block<1,64>(88,0);
Action.row(18) -= M3.block<1,64>(89,0);
Action.row(19) -= M3.block<1,64>(90,0);
Action.row(20) -= M3.block<1,64>(91,0);
Action.row(21) -= M3.block<1,64>(92,0);
Action(22,1) = 1.0;
Action(23,2) = 1.0;
Action(24,3) = 1.0;
Action(25,4) = 1.0;
Action(26,5) = 1.0;
Action(27,6) = 1.0;
Action(28,7) = 1.0;
Action(29,14) = 1.0;
Action(30,15) = 1.0;
Action(31,16) = 1.0;
Action(32,17) = 1.0;
Action(33,18) = 1.0;
Action(34,19) = 1.0;
Action(35,20) = 1.0;
Action(36,21) = 1.0;
Action(37,22) = 1.0;
Action(38,23) = 1.0;
Action(39,24) = 1.0;
Action(40,25) = 1.0;
Action(41,26) = 1.0;
Action(42,27) = 1.0;
Action(43,28) = 1.0;
Action(44,34) = 1.0;
Action(45,35) = 1.0;
Action(46,36) = 1.0;
Action(47,37) = 1.0;
Action(48,38) = 1.0;
Action(49,39) = 1.0;
Action(50,40) = 1.0;
Action(51,41) = 1.0;
Action(52,42) = 1.0;
Action(53,43) = 1.0;
Action(54,48) = 1.0;
Action(55,49) = 1.0;
Action(56,50) = 1.0;
Action(57,51) = 1.0;
Action(58,52) = 1.0;
Action(59,53) = 1.0;
Action(60,57) = 1.0;
Action(61,58) = 1.0;
Action(62,59) = 1.0;
Action(63,62) = 1.0;
//columns of Action mean:
// x_3^7 x_2^3*x_3^3 x_1^2*x_3^4 x_1*x_2*x_3^4 x_2^2*x_3^4 x_1*x_3^5 x_2*x_3^5 x_3^6 x_1^5 x_1^4*x_2 x_1^3*x_2^2 x_1^2*x_2^3 x_1*x_2^4 x_2^5 x_1^4*x_3 x_1^3*x_2*x_3 x_1^2*x_2^2*x_3 x_1*x_2^3*x_3 x_2^4*x_3 x_1^3*x_3^2 x_1^2*x_2*x_3^2 x_1*x_2^2*x_3^2 x_2^3*x_3^2 x_1^2*x_3^3 x_1*x_2*x_3^3 x_2^2*x_3^3 x_1*x_3^4 x_2*x_3^4 x_3^5 x_1^4 x_1^3*x_2 x_1^2*x_2^2 x_1*x_2^3 x_2^4 x_1^3*x_3 x_1^2*x_2*x_3 x_1*x_2^2*x_3 x_2^3*x_3 x_1^2*x_3^2 x_1*x_2*x_3^2 x_2^2*x_3^2 x_1*x_3^3 x_2*x_3^3 x_3^4 x_1^3 x_1^2*x_2 x_1*x_2^2 x_2^3 x_1^2*x_3 x_1*x_2*x_3 x_2^2*x_3 x_1*x_3^2 x_2*x_3^2 x_3^3 x_1^2 x_1*x_2 x_2^2 x_1*x_3 x_2*x_3 x_3^2 x_1 x_2 x_3 1
}